

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vprintf.c
# Opt level: O3

int main(void)

{
  undefined4 uVar1;
  undefined8 uVar2;
  int iVar3;
  FILE *__stream;
  size_t sVar4;
  FILE *pFVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  char result_buffer [100];
  int val2;
  int val1;
  undefined1 local_448 [16];
  undefined1 local_438 [16];
  undefined1 local_428 [16];
  undefined1 local_418 [16];
  undefined1 local_408 [16];
  undefined1 local_3f8 [16];
  undefined4 local_3e8;
  char local_3d8;
  char cStack_3d7;
  char cStack_3d6;
  char cStack_3d5;
  char cStack_3d4;
  char cStack_3d3;
  char cStack_3d2;
  char cStack_3d1;
  undefined2 uStack_3d0;
  undefined6 uStack_3ce;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  undefined8 local_398;
  undefined8 uStack_390;
  undefined8 local_388;
  undefined8 uStack_380;
  undefined8 local_378;
  undefined8 uStack_370;
  undefined8 local_368;
  undefined8 uStack_360;
  undefined8 local_358;
  undefined8 uStack_350;
  undefined8 local_348;
  undefined8 uStack_340;
  undefined8 local_338;
  undefined8 uStack_330;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined8 local_308;
  undefined8 uStack_300;
  int local_2f0;
  int local_2ec [5];
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  __stream = freopen("test_support/testfile","wb+",(FILE *)stdout);
  pFVar5 = __stream;
  if (__stream == (FILE *)0x0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdio/vprintf.c, line %d - %s\n"
           ,0x2b,"( target = freopen( testfile, \"wb+\", stdout ) ) != NULL");
    pFVar5 = (FILE *)0x0;
  }
  local_3f8 = ZEXT816(0);
  local_408 = ZEXT816(0);
  local_418 = ZEXT816(0);
  local_428 = ZEXT816(0);
  local_438 = ZEXT816(0);
  local_448 = ZEXT816(0);
  local_3e8 = 0;
  rewind(pFVar5);
  iVar3 = testprintf((FILE *)pFVar5,"%hhd",0xffffff80);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_1();
  }
  if (iVar3 == 4) {
    if (local_448[4] != '\0' || local_448._0_4_ != 0x3832312d) goto LAB_0011bf11;
  }
  else {
LAB_0011bf11:
    main_cold_2();
  }
  local_3f8 = ZEXT816(0);
  local_408 = ZEXT816(0);
  local_418 = ZEXT816(0);
  local_428 = ZEXT816(0);
  local_438 = ZEXT816(0);
  local_448 = ZEXT816(0);
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%hhd",0x7f);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_3();
  }
  if ((iVar3 != 3) || (local_448._0_4_ != 0x373231)) {
    main_cold_4();
  }
  local_3f8 = ZEXT816(0);
  local_408 = ZEXT816(0);
  local_418 = ZEXT816(0);
  local_428 = ZEXT816(0);
  local_438 = ZEXT816(0);
  local_448 = ZEXT816(0);
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%hhd",0);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_5();
  }
  if ((iVar3 != 1) || (local_448._0_2_ != 0x30)) {
    main_cold_6();
  }
  local_3f8 = ZEXT816(0);
  local_408 = ZEXT816(0);
  local_418 = ZEXT816(0);
  local_428 = ZEXT816(0);
  local_438 = ZEXT816(0);
  local_448 = ZEXT816(0);
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%hd",0xffff8000);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_7();
  }
  if (iVar3 == 6) {
    uVar1 = local_448._0_4_;
    if (local_448._3_4_ != 0x383637 || uVar1 != 0x3732332d) goto LAB_0011bf22;
  }
  else {
LAB_0011bf22:
    main_cold_8();
  }
  local_3f8 = ZEXT816(0);
  local_408 = ZEXT816(0);
  local_418 = ZEXT816(0);
  local_428 = ZEXT816(0);
  local_438 = ZEXT816(0);
  local_448 = ZEXT816(0);
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%hd",0x7fff);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_9();
  }
  if (iVar3 == 5) {
    if (local_448._4_2_ != 0x37 || local_448._0_4_ != 0x36373233) goto LAB_0011bf33;
  }
  else {
LAB_0011bf33:
    main_cold_10();
  }
  local_3f8 = ZEXT816(0);
  local_408 = ZEXT816(0);
  local_418 = ZEXT816(0);
  local_428 = ZEXT816(0);
  local_438 = ZEXT816(0);
  local_448 = ZEXT816(0);
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%hd",0);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_11();
  }
  if ((iVar3 != 1) || (local_448._0_2_ != 0x30)) {
    main_cold_12();
  }
  local_3f8 = ZEXT816(0);
  local_408 = ZEXT816(0);
  local_418 = ZEXT816(0);
  local_428 = ZEXT816(0);
  local_438 = ZEXT816(0);
  local_448 = ZEXT816(0);
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%d",0x80000000);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_13();
  }
  if (iVar3 == 0xb) {
    if (local_448._8_4_ != 0x383436 || local_448._0_8_ != 0x333834373431322d) goto LAB_0011bf44;
  }
  else {
LAB_0011bf44:
    main_cold_14();
  }
  local_3f8 = ZEXT816(0);
  local_408 = ZEXT816(0);
  local_418 = ZEXT816(0);
  local_428 = ZEXT816(0);
  local_438 = ZEXT816(0);
  local_448 = ZEXT816(0);
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%d",0x7fffffff);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_15();
  }
  if (iVar3 == 10) {
    uVar2 = local_448._0_8_;
    if (local_448._3_8_ != 0x37343633383437 || uVar2 != 0x3633383437343132) goto LAB_0011bf55;
  }
  else {
LAB_0011bf55:
    main_cold_16();
  }
  local_3f8 = ZEXT816(0);
  local_408 = ZEXT816(0);
  local_418 = ZEXT816(0);
  local_428 = ZEXT816(0);
  local_438 = ZEXT816(0);
  local_448 = ZEXT816(0);
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%d",0);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_17();
  }
  if ((iVar3 != 1) || (local_448._0_2_ != 0x30)) {
    main_cold_18();
  }
  local_3f8 = ZEXT816(0);
  local_408 = ZEXT816(0);
  local_418 = ZEXT816(0);
  local_428 = ZEXT816(0);
  local_438 = ZEXT816(0);
  local_448 = ZEXT816(0);
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%ld",0x8000000000000000);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_19();
  }
  local_3d8 = '-';
  cStack_3d7 = '9';
  cStack_3d6 = '2';
  cStack_3d5 = '2';
  cStack_3d4 = '3';
  cStack_3d3 = '3';
  cStack_3d2 = '7';
  cStack_3d1 = '2';
  uStack_3d0 = 0;
  uStack_3ce = 0;
  local_3c8 = 0x3538363330323733;
  uStack_3c0 = 0;
  local_3a8 = 0x38303835373734;
  uStack_3a0 = 0;
  local_398 = 0x3737343538363330;
  uStack_390 = 0;
  if (iVar3 == 0x14) {
    auVar6[0] = -(local_448[0] == '-');
    auVar6[1] = -(local_448[1] == '9');
    auVar6[2] = -(local_448[2] == '2');
    auVar6[3] = -(local_448[3] == '2');
    auVar6[4] = -(local_448[4] == '3');
    auVar6[5] = -(local_448[5] == '3');
    auVar6[6] = -(local_448[6] == '7');
    auVar6[7] = -(local_448[7] == '2');
    auVar6[8] = -(local_448[8] == '0');
    auVar6[9] = -(local_448[9] == '3');
    auVar6[10] = -(local_448[10] == '6');
    auVar6[0xb] = -(local_448[0xb] == '8');
    auVar6[0xc] = -(local_448[0xc] == '5');
    auVar6[0xd] = -(local_448[0xd] == '4');
    auVar6[0xe] = -(local_448[0xe] == '7');
    auVar6[0xf] = -(local_448[0xf] == '7');
    auVar183[0] = -(local_448[5] == '3');
    auVar183[1] = -(local_448[6] == '7');
    auVar183[2] = -(local_448[7] == '2');
    auVar183[3] = -(local_448[8] == '0');
    auVar183[4] = -(local_448[9] == '3');
    auVar183[5] = -(local_448[10] == '6');
    auVar183[6] = -(local_448[0xb] == '8');
    auVar183[7] = -(local_448[0xc] == '5');
    auVar183[8] = -(local_448[0xd] == '4');
    auVar183[9] = -(local_448[0xe] == '7');
    auVar183[10] = -(local_448[0xf] == '7');
    auVar183[0xb] = -(local_438[0] == '5');
    auVar183[0xc] = -(local_438[1] == '8');
    auVar183[0xd] = -(local_438[2] == '0');
    auVar183[0xe] = -(local_438[3] == '8');
    auVar183[0xf] = -(local_438[4] == '\0');
    auVar6 = auVar6 & auVar183;
    if ((ushort)((ushort)(SUB161(auVar6 >> 7,0) & 1) | (ushort)(SUB161(auVar6 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar6 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar6 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar6 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar6 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar6 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar6 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar6 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar6 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar6 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar6 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar6 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar6 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar6 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar6[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011bf66;
  }
  else {
LAB_0011bf66:
    main_cold_20();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%ld",0x7fffffffffffffff);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_21();
  }
  local_3b8 = 0x3032373333323239;
  uStack_3b0 = 0;
  local_388 = 0x3537373435383633;
  uStack_380 = 0;
  if (iVar3 == 0x13) {
    auVar7[0] = -(local_448[0] == '9');
    auVar7[1] = -(local_448[1] == '2');
    auVar7[2] = -(local_448[2] == '2');
    auVar7[3] = -(local_448[3] == '3');
    auVar7[4] = -(local_448[4] == '3');
    auVar7[5] = -(local_448[5] == '7');
    auVar7[6] = -(local_448[6] == '2');
    auVar7[7] = -(local_448[7] == '0');
    auVar7[8] = -(local_448[8] == '3');
    auVar7[9] = -(local_448[9] == '6');
    auVar7[10] = -(local_448[10] == '8');
    auVar7[0xb] = -(local_448[0xb] == '5');
    auVar7[0xc] = -(local_448[0xc] == '4');
    auVar7[0xd] = -(local_448[0xd] == '7');
    auVar7[0xe] = -(local_448[0xe] == '7');
    auVar7[0xf] = -(local_448[0xf] == '5');
    auVar152[0] = -(local_438[0] == '8');
    auVar152[1] = -(local_438[1] == '0');
    auVar152[2] = -(local_438[2] == '7');
    auVar152[3] = -(local_438[3] == '\0');
    auVar152[4] = 0xff;
    auVar152[5] = 0xff;
    auVar152[6] = 0xff;
    auVar152[7] = 0xff;
    auVar152[8] = 0xff;
    auVar152[9] = 0xff;
    auVar152[10] = 0xff;
    auVar152[0xb] = 0xff;
    auVar152[0xc] = 0xff;
    auVar152[0xd] = 0xff;
    auVar152[0xe] = 0xff;
    auVar152[0xf] = 0xff;
    auVar152 = auVar152 & auVar7;
    if ((ushort)((ushort)(SUB161(auVar152 >> 7,0) & 1) |
                 (ushort)(SUB161(auVar152 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar152 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar152 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar152 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar152 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar152 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar152 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar152 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar152 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar152 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar152 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar152 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar152 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar152 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar152[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011bf77;
  }
  else {
LAB_0011bf77:
    main_cold_22();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%ld",0);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_23();
  }
  if ((iVar3 != 1) || (local_448._0_2_ != 0x30)) {
    main_cold_24();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%lld",0x8000000000000000);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_25();
  }
  if (iVar3 == 0x14) {
    auVar153[0] = -(local_3d8 == local_448[0]);
    auVar153[1] = -(cStack_3d7 == local_448[1]);
    auVar153[2] = -(cStack_3d6 == local_448[2]);
    auVar153[3] = -(cStack_3d5 == local_448[3]);
    auVar153[4] = -(cStack_3d4 == local_448[4]);
    auVar153[5] = -(cStack_3d3 == local_448[5]);
    auVar153[6] = -(cStack_3d2 == local_448[6]);
    auVar153[7] = -(cStack_3d1 == local_448[7]);
    auVar153[8] = -((char)local_398 == local_448[8]);
    auVar153[9] = -((char)((ulong)local_398 >> 8) == local_448[9]);
    auVar153[10] = -((char)((ulong)local_398 >> 0x10) == local_448[10]);
    auVar153[0xb] = -((char)((ulong)local_398 >> 0x18) == local_448[0xb]);
    auVar153[0xc] = -((char)((ulong)local_398 >> 0x20) == local_448[0xc]);
    auVar153[0xd] = -((char)((ulong)local_398 >> 0x28) == local_448[0xd]);
    auVar153[0xe] = -((char)((ulong)local_398 >> 0x30) == local_448[0xe]);
    auVar153[0xf] = -((char)((ulong)local_398 >> 0x38) == local_448[0xf]);
    auVar184[0] = -((char)local_3c8 == local_448[5]);
    auVar184[1] = -(local_3c8._1_1_ == local_448[6]);
    auVar184[2] = -(local_3c8._2_1_ == local_448[7]);
    auVar184[3] = -(local_3c8._3_1_ == local_448[8]);
    auVar184[4] = -(local_3c8._4_1_ == local_448[9]);
    auVar184[5] = -(local_3c8._5_1_ == local_448[10]);
    auVar184[6] = -(local_3c8._6_1_ == local_448[0xb]);
    auVar184[7] = -(local_3c8._7_1_ == local_448[0xc]);
    auVar184[8] = -((char)local_3a8 == local_448[0xd]);
    auVar184[9] = -((char)((ulong)local_3a8 >> 8) == local_448[0xe]);
    auVar184[10] = -((char)((ulong)local_3a8 >> 0x10) == local_448[0xf]);
    auVar184[0xb] = -((char)((ulong)local_3a8 >> 0x18) == local_438[0]);
    auVar184[0xc] = -((char)((ulong)local_3a8 >> 0x20) == local_438[1]);
    auVar184[0xd] = -((char)((ulong)local_3a8 >> 0x28) == local_438[2]);
    auVar184[0xe] = -((char)((ulong)local_3a8 >> 0x30) == local_438[3]);
    auVar184[0xf] = -((char)((ulong)local_3a8 >> 0x38) == local_438[4]);
    auVar153 = auVar153 & auVar184;
    if ((ushort)((ushort)(SUB161(auVar153 >> 7,0) & 1) |
                 (ushort)(SUB161(auVar153 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar153 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar153 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar153 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar153 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar153 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar153 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar153 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar153 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar153 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar153 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar153 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar153 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar153 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar153[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011bf88;
  }
  else {
LAB_0011bf88:
    main_cold_26();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%lld",0x7fffffffffffffff);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_27();
  }
  if (iVar3 == 0x13) {
    auVar154[0] = -((char)local_3b8 == local_448[0]);
    auVar154[1] = -(local_3b8._1_1_ == local_448[1]);
    auVar154[2] = -(local_3b8._2_1_ == local_448[2]);
    auVar154[3] = -(local_3b8._3_1_ == local_448[3]);
    auVar154[4] = -(local_3b8._4_1_ == local_448[4]);
    auVar154[5] = -(local_3b8._5_1_ == local_448[5]);
    auVar154[6] = -(local_3b8._6_1_ == local_448[6]);
    auVar154[7] = -(local_3b8._7_1_ == local_448[7]);
    auVar154[8] = -((char)local_388 == local_448[8]);
    auVar154[9] = -((char)((ulong)local_388 >> 8) == local_448[9]);
    auVar154[10] = -((char)((ulong)local_388 >> 0x10) == local_448[10]);
    auVar154[0xb] = -((char)((ulong)local_388 >> 0x18) == local_448[0xb]);
    auVar154[0xc] = -((char)((ulong)local_388 >> 0x20) == local_448[0xc]);
    auVar154[0xd] = -((char)((ulong)local_388 >> 0x28) == local_448[0xd]);
    auVar154[0xe] = -((char)((ulong)local_388 >> 0x30) == local_448[0xe]);
    auVar154[0xf] = -((char)((ulong)local_388 >> 0x38) == local_448[0xf]);
    auVar8[0] = -(local_438[0] == '8');
    auVar8[1] = -(local_438[1] == '0');
    auVar8[2] = -(local_438[2] == '7');
    auVar8[3] = -(local_438[3] == '\0');
    auVar8[4] = 0xff;
    auVar8[5] = 0xff;
    auVar8[6] = 0xff;
    auVar8[7] = 0xff;
    auVar8[8] = 0xff;
    auVar8[9] = 0xff;
    auVar8[10] = 0xff;
    auVar8[0xb] = 0xff;
    auVar8[0xc] = 0xff;
    auVar8[0xd] = 0xff;
    auVar8[0xe] = 0xff;
    auVar8[0xf] = 0xff;
    auVar8 = auVar8 & auVar154;
    if ((ushort)((ushort)(SUB161(auVar8 >> 7,0) & 1) | (ushort)(SUB161(auVar8 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar8 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar8 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar8 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar8 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar8 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar8 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar8 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar8 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar8 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar8 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar8 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar8 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar8 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar8[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011bf99;
  }
  else {
LAB_0011bf99:
    main_cold_28();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%lld",0);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_29();
  }
  if ((iVar3 != 1) || (local_448._0_2_ != 0x30)) {
    main_cold_30();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%hhu",0xff);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_31();
  }
  if ((iVar3 != 3) || (local_448._0_4_ != 0x353532)) {
    main_cold_32();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%hhu",0xff);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_33();
  }
  if ((iVar3 != 3) || (local_448._0_4_ != 0x353532)) {
    main_cold_34();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%hu",0xffff);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_35();
  }
  if (iVar3 == 5) {
    if (local_448._4_2_ != 0x35 || local_448._0_4_ != 0x33353536) goto LAB_0011bfaa;
  }
  else {
LAB_0011bfaa:
    main_cold_36();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%hu",0xffff);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_37();
  }
  if (iVar3 == 5) {
    if (local_448._4_2_ != 0x35 || local_448._0_4_ != 0x33353536) goto LAB_0011bfbb;
  }
  else {
LAB_0011bfbb:
    main_cold_38();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%u",0xffffffff);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_39();
  }
  if (iVar3 == 10) {
    uVar2 = local_448._0_8_;
    if (local_448._3_8_ != 0x35393237363934 || uVar2 != 0x3237363934393234) goto LAB_0011bfcc;
  }
  else {
LAB_0011bfcc:
    main_cold_40();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%u",0xffffffff);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_41();
  }
  if (iVar3 == 10) {
    uVar2 = local_448._0_8_;
    if (local_448._3_8_ != 0x35393237363934 || uVar2 != 0x3237363934393234) goto LAB_0011bfdd;
  }
  else {
LAB_0011bfdd:
    main_cold_42();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%lu",0xffffffffffffffff);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_43();
  }
  local_3d8 = '1';
  cStack_3d7 = '8';
  cStack_3d6 = '4';
  cStack_3d5 = '4';
  cStack_3d4 = '6';
  cStack_3d3 = '7';
  cStack_3d2 = '4';
  cStack_3d1 = '4';
  uStack_3d0 = 0;
  uStack_3ce = 0;
  local_3c8 = 0x3037333730343437;
  uStack_3c0 = 0;
  local_3b8 = 0x35313631353539;
  uStack_3b0 = 0;
  local_3a8 = 0x3535393037333730;
  uStack_3a0 = 0;
  if (iVar3 == 0x14) {
    auVar9[0] = -(local_448[0] == '1');
    auVar9[1] = -(local_448[1] == '8');
    auVar9[2] = -(local_448[2] == '4');
    auVar9[3] = -(local_448[3] == '4');
    auVar9[4] = -(local_448[4] == '6');
    auVar9[5] = -(local_448[5] == '7');
    auVar9[6] = -(local_448[6] == '4');
    auVar9[7] = -(local_448[7] == '4');
    auVar9[8] = -(local_448[8] == '0');
    auVar9[9] = -(local_448[9] == '7');
    auVar9[10] = -(local_448[10] == '3');
    auVar9[0xb] = -(local_448[0xb] == '7');
    auVar9[0xc] = -(local_448[0xc] == '0');
    auVar9[0xd] = -(local_448[0xd] == '9');
    auVar9[0xe] = -(local_448[0xe] == '5');
    auVar9[0xf] = -(local_448[0xf] == '5');
    auVar185[0] = -(local_448[5] == '7');
    auVar185[1] = -(local_448[6] == '4');
    auVar185[2] = -(local_448[7] == '4');
    auVar185[3] = -(local_448[8] == '0');
    auVar185[4] = -(local_448[9] == '7');
    auVar185[5] = -(local_448[10] == '3');
    auVar185[6] = -(local_448[0xb] == '7');
    auVar185[7] = -(local_448[0xc] == '0');
    auVar185[8] = -(local_448[0xd] == '9');
    auVar185[9] = -(local_448[0xe] == '5');
    auVar185[10] = -(local_448[0xf] == '5');
    auVar185[0xb] = -(local_438[0] == '1');
    auVar185[0xc] = -(local_438[1] == '6');
    auVar185[0xd] = -(local_438[2] == '1');
    auVar185[0xe] = -(local_438[3] == '5');
    auVar185[0xf] = -(local_438[4] == '\0');
    auVar9 = auVar9 & auVar185;
    if ((ushort)((ushort)(SUB161(auVar9 >> 7,0) & 1) | (ushort)(SUB161(auVar9 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar9 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar9 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar9 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar9 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar9 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar9 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar9 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar9 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar9 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar9 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar9 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar9 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar9 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar9[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011bfee;
  }
  else {
LAB_0011bfee:
    main_cold_44();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%lu",0xffffffffffffffff);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_45();
  }
  if (iVar3 == 0x14) {
    auVar10[0] = -(local_3d8 == local_448[0]);
    auVar10[1] = -(cStack_3d7 == local_448[1]);
    auVar10[2] = -(cStack_3d6 == local_448[2]);
    auVar10[3] = -(cStack_3d5 == local_448[3]);
    auVar10[4] = -(cStack_3d4 == local_448[4]);
    auVar10[5] = -(cStack_3d3 == local_448[5]);
    auVar10[6] = -(cStack_3d2 == local_448[6]);
    auVar10[7] = -(cStack_3d1 == local_448[7]);
    auVar10[8] = -((char)local_3a8 == local_448[8]);
    auVar10[9] = -(local_3a8._1_1_ == local_448[9]);
    auVar10[10] = -(local_3a8._2_1_ == local_448[10]);
    auVar10[0xb] = -(local_3a8._3_1_ == local_448[0xb]);
    auVar10[0xc] = -(local_3a8._4_1_ == local_448[0xc]);
    auVar10[0xd] = -(local_3a8._5_1_ == local_448[0xd]);
    auVar10[0xe] = -(local_3a8._6_1_ == local_448[0xe]);
    auVar10[0xf] = -(local_3a8._7_1_ == local_448[0xf]);
    auVar186[0] = -((char)local_3c8 == local_448[5]);
    auVar186[1] = -(local_3c8._1_1_ == local_448[6]);
    auVar186[2] = -(local_3c8._2_1_ == local_448[7]);
    auVar186[3] = -(local_3c8._3_1_ == local_448[8]);
    auVar186[4] = -(local_3c8._4_1_ == local_448[9]);
    auVar186[5] = -(local_3c8._5_1_ == local_448[10]);
    auVar186[6] = -(local_3c8._6_1_ == local_448[0xb]);
    auVar186[7] = -(local_3c8._7_1_ == local_448[0xc]);
    auVar186[8] = -((char)local_3b8 == local_448[0xd]);
    auVar186[9] = -(local_3b8._1_1_ == local_448[0xe]);
    auVar186[10] = -(local_3b8._2_1_ == local_448[0xf]);
    auVar186[0xb] = -(local_3b8._3_1_ == local_438[0]);
    auVar186[0xc] = -(local_3b8._4_1_ == local_438[1]);
    auVar186[0xd] = -(local_3b8._5_1_ == local_438[2]);
    auVar186[0xe] = -(local_3b8._6_1_ == local_438[3]);
    auVar186[0xf] = -(local_3b8._7_1_ == local_438[4]);
    auVar10 = auVar10 & auVar186;
    if ((ushort)((ushort)(SUB161(auVar10 >> 7,0) & 1) | (ushort)(SUB161(auVar10 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar10 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar10 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar10 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar10 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar10 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar10 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar10 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar10 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar10 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar10 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar10 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar10 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar10 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar10[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011bfff;
  }
  else {
LAB_0011bfff:
    main_cold_46();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%llu",0xffffffffffffffff);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_47();
  }
  if (iVar3 == 0x14) {
    auVar11[0] = -(local_3d8 == local_448[0]);
    auVar11[1] = -(cStack_3d7 == local_448[1]);
    auVar11[2] = -(cStack_3d6 == local_448[2]);
    auVar11[3] = -(cStack_3d5 == local_448[3]);
    auVar11[4] = -(cStack_3d4 == local_448[4]);
    auVar11[5] = -(cStack_3d3 == local_448[5]);
    auVar11[6] = -(cStack_3d2 == local_448[6]);
    auVar11[7] = -(cStack_3d1 == local_448[7]);
    auVar11[8] = -((char)local_3a8 == local_448[8]);
    auVar11[9] = -(local_3a8._1_1_ == local_448[9]);
    auVar11[10] = -(local_3a8._2_1_ == local_448[10]);
    auVar11[0xb] = -(local_3a8._3_1_ == local_448[0xb]);
    auVar11[0xc] = -(local_3a8._4_1_ == local_448[0xc]);
    auVar11[0xd] = -(local_3a8._5_1_ == local_448[0xd]);
    auVar11[0xe] = -(local_3a8._6_1_ == local_448[0xe]);
    auVar11[0xf] = -(local_3a8._7_1_ == local_448[0xf]);
    auVar187[0] = -((char)local_3c8 == local_448[5]);
    auVar187[1] = -(local_3c8._1_1_ == local_448[6]);
    auVar187[2] = -(local_3c8._2_1_ == local_448[7]);
    auVar187[3] = -(local_3c8._3_1_ == local_448[8]);
    auVar187[4] = -(local_3c8._4_1_ == local_448[9]);
    auVar187[5] = -(local_3c8._5_1_ == local_448[10]);
    auVar187[6] = -(local_3c8._6_1_ == local_448[0xb]);
    auVar187[7] = -(local_3c8._7_1_ == local_448[0xc]);
    auVar187[8] = -((char)local_3b8 == local_448[0xd]);
    auVar187[9] = -(local_3b8._1_1_ == local_448[0xe]);
    auVar187[10] = -(local_3b8._2_1_ == local_448[0xf]);
    auVar187[0xb] = -(local_3b8._3_1_ == local_438[0]);
    auVar187[0xc] = -(local_3b8._4_1_ == local_438[1]);
    auVar187[0xd] = -(local_3b8._5_1_ == local_438[2]);
    auVar187[0xe] = -(local_3b8._6_1_ == local_438[3]);
    auVar187[0xf] = -(local_3b8._7_1_ == local_438[4]);
    auVar11 = auVar11 & auVar187;
    if ((ushort)((ushort)(SUB161(auVar11 >> 7,0) & 1) | (ushort)(SUB161(auVar11 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar11 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar11 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar11 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar11 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar11 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar11 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar11 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar11 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar11 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar11 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar11 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar11 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar11 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar11[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011c010;
  }
  else {
LAB_0011c010:
    main_cold_48();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%llu",0xffffffffffffffff);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_49();
  }
  if (iVar3 == 0x14) {
    auVar155[0] = -(local_3d8 == local_448[0]);
    auVar155[1] = -(cStack_3d7 == local_448[1]);
    auVar155[2] = -(cStack_3d6 == local_448[2]);
    auVar155[3] = -(cStack_3d5 == local_448[3]);
    auVar155[4] = -(cStack_3d4 == local_448[4]);
    auVar155[5] = -(cStack_3d3 == local_448[5]);
    auVar155[6] = -(cStack_3d2 == local_448[6]);
    auVar155[7] = -(cStack_3d1 == local_448[7]);
    auVar155[8] = -((char)local_3a8 == local_448[8]);
    auVar155[9] = -(local_3a8._1_1_ == local_448[9]);
    auVar155[10] = -(local_3a8._2_1_ == local_448[10]);
    auVar155[0xb] = -(local_3a8._3_1_ == local_448[0xb]);
    auVar155[0xc] = -(local_3a8._4_1_ == local_448[0xc]);
    auVar155[0xd] = -(local_3a8._5_1_ == local_448[0xd]);
    auVar155[0xe] = -(local_3a8._6_1_ == local_448[0xe]);
    auVar155[0xf] = -(local_3a8._7_1_ == local_448[0xf]);
    auVar188[0] = -((char)local_3c8 == local_448[5]);
    auVar188[1] = -(local_3c8._1_1_ == local_448[6]);
    auVar188[2] = -(local_3c8._2_1_ == local_448[7]);
    auVar188[3] = -(local_3c8._3_1_ == local_448[8]);
    auVar188[4] = -(local_3c8._4_1_ == local_448[9]);
    auVar188[5] = -(local_3c8._5_1_ == local_448[10]);
    auVar188[6] = -(local_3c8._6_1_ == local_448[0xb]);
    auVar188[7] = -(local_3c8._7_1_ == local_448[0xc]);
    auVar188[8] = -((char)local_3b8 == local_448[0xd]);
    auVar188[9] = -(local_3b8._1_1_ == local_448[0xe]);
    auVar188[10] = -(local_3b8._2_1_ == local_448[0xf]);
    auVar188[0xb] = -(local_3b8._3_1_ == local_438[0]);
    auVar188[0xc] = -(local_3b8._4_1_ == local_438[1]);
    auVar188[0xd] = -(local_3b8._5_1_ == local_438[2]);
    auVar188[0xe] = -(local_3b8._6_1_ == local_438[3]);
    auVar188[0xf] = -(local_3b8._7_1_ == local_438[4]);
    auVar155 = auVar155 & auVar188;
    if ((ushort)((ushort)(SUB161(auVar155 >> 7,0) & 1) |
                 (ushort)(SUB161(auVar155 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar155 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar155 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar155 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar155 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar155 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar155 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar155 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar155 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar155 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar155 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar155 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar155 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar155 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar155[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011c021;
  }
  else {
LAB_0011c021:
    main_cold_50();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%X",0xffffffff);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_51();
  }
  if (iVar3 == 8) {
    if (local_448[8] != '\0' || local_448._0_8_ != 0x4646464646464646) goto LAB_0011c032;
  }
  else {
LAB_0011c032:
    main_cold_52();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%#X",0xffffffff);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_53();
  }
  if (iVar3 == 10) {
    uVar2 = local_448._0_8_;
    if (local_448._3_8_ != 0x46464646464646 || uVar2 != 0x4646464646465830) goto LAB_0011c043;
  }
  else {
LAB_0011c043:
    main_cold_54();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%x",0xffffffff);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_55();
  }
  if (iVar3 == 8) {
    if (local_448[8] != '\0' || local_448._0_8_ != 0x6666666666666666) goto LAB_0011c054;
  }
  else {
LAB_0011c054:
    main_cold_56();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%#x",0xffffffff);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_57();
  }
  if (iVar3 == 10) {
    uVar2 = local_448._0_8_;
    if (local_448._3_8_ != 0x66666666666666 || uVar2 != 0x6666666666667830) goto LAB_0011c065;
  }
  else {
LAB_0011c065:
    main_cold_58();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%o",0xffffffff);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_59();
  }
  if (iVar3 == 0xb) {
    if (local_448._8_4_ != 0x373737 || local_448._0_8_ != 0x3737373737373733) goto LAB_0011c076;
  }
  else {
LAB_0011c076:
    main_cold_60();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%#o",0xffffffff);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_61();
  }
  if (iVar3 == 0xc) {
    uVar2 = local_448._0_8_;
    if (local_448._5_8_ != 0x37373737373737 || uVar2 != 0x3737373737373330) goto LAB_0011c087;
  }
  else {
LAB_0011c087:
    main_cold_62();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%+d",0x80000000);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_63();
  }
  if (iVar3 == 0xb) {
    if (local_448._8_4_ != 0x383436 || local_448._0_8_ != 0x333834373431322d) goto LAB_0011c098;
  }
  else {
LAB_0011c098:
    main_cold_64();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%+d",0x7fffffff);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_65();
  }
  if (iVar3 == 0xb) {
    if (local_448._8_4_ != 0x373436 || local_448._0_8_ != 0x333834373431322b) goto LAB_0011c0a9;
  }
  else {
LAB_0011c0a9:
    main_cold_66();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%+d",0);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_67();
  }
  if ((iVar3 != 2) || (local_448[2] != '\0' || local_448._0_2_ != 0x302b)) {
    main_cold_68();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%+u",0xffffffff);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_69();
  }
  if (iVar3 == 10) {
    uVar2 = local_448._0_8_;
    if (local_448._3_8_ != 0x35393237363934 || uVar2 != 0x3237363934393234) goto LAB_0011c0cb;
  }
  else {
LAB_0011c0cb:
    main_cold_70();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%+u",0xffffffff);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_71();
  }
  if (iVar3 == 10) {
    uVar2 = local_448._0_8_;
    if (local_448._3_8_ != 0x35393237363934 || uVar2 != 0x3237363934393234) goto LAB_0011c0dc;
  }
  else {
LAB_0011c0dc:
    main_cold_72();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"% d",0x80000000);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_73();
  }
  if (iVar3 == 0xb) {
    if (local_448._8_4_ != 0x383436 || local_448._0_8_ != 0x333834373431322d) goto LAB_0011c0ed;
  }
  else {
LAB_0011c0ed:
    main_cold_74();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"% d",0x7fffffff);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_75();
  }
  if (iVar3 == 0xb) {
    if (local_448._8_4_ != 0x373436 || local_448._0_8_ != 0x3338343734313220) goto LAB_0011c0fe;
  }
  else {
LAB_0011c0fe:
    main_cold_76();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"% d",0);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_77();
  }
  if ((iVar3 != 2) || (local_448[2] != '\0' || local_448._0_2_ != 0x3020)) {
    main_cold_78();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"% u",0xffffffff);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_79();
  }
  if (iVar3 == 10) {
    uVar2 = local_448._0_8_;
    if (local_448._3_8_ != 0x35393237363934 || uVar2 != 0x3237363934393234) goto LAB_0011c120;
  }
  else {
LAB_0011c120:
    main_cold_80();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"% u",0xffffffff);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_81();
  }
  if (iVar3 == 10) {
    uVar2 = local_448._0_8_;
    if (local_448._3_8_ != 0x35393237363934 || uVar2 != 0x3237363934393234) goto LAB_0011c131;
  }
  else {
LAB_0011c131:
    main_cold_82();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%9d",0x80000000);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_83();
  }
  if (iVar3 == 0xb) {
    if (local_448._8_4_ != 0x383436 || local_448._0_8_ != 0x333834373431322d) goto LAB_0011c142;
  }
  else {
LAB_0011c142:
    main_cold_84();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%9d",0x7fffffff);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_85();
  }
  if (iVar3 == 10) {
    uVar2 = local_448._0_8_;
    if (local_448._3_8_ != 0x37343633383437 || uVar2 != 0x3633383437343132) goto LAB_0011c153;
  }
  else {
LAB_0011c153:
    main_cold_86();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%10d",0x80000000);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_87();
  }
  if (iVar3 == 0xb) {
    if (local_448._8_4_ != 0x383436 || local_448._0_8_ != 0x333834373431322d) goto LAB_0011c164;
  }
  else {
LAB_0011c164:
    main_cold_88();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%10d",0x7fffffff);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_89();
  }
  if (iVar3 == 10) {
    uVar2 = local_448._0_8_;
    if (local_448._3_8_ != 0x37343633383437 || uVar2 != 0x3633383437343132) goto LAB_0011c175;
  }
  else {
LAB_0011c175:
    main_cold_90();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%11d",0x80000000);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_91();
  }
  if (iVar3 == 0xb) {
    if (local_448._8_4_ != 0x383436 || local_448._0_8_ != 0x333834373431322d) goto LAB_0011c186;
  }
  else {
LAB_0011c186:
    main_cold_92();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%11d",0x7fffffff);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_93();
  }
  if (iVar3 == 0xb) {
    if (local_448._8_4_ != 0x373436 || local_448._0_8_ != 0x3338343734313220) goto LAB_0011c197;
  }
  else {
LAB_0011c197:
    main_cold_94();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%12d",0x80000000);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_95();
  }
  if (iVar3 == 0xc) {
    uVar2 = local_448._0_8_;
    if (local_448._5_8_ != 0x38343633383437 || uVar2 != 0x3834373431322d20) goto LAB_0011c1a8;
  }
  else {
LAB_0011c1a8:
    main_cold_96();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%12d",0x7fffffff);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_97();
  }
  if (iVar3 == 0xc) {
    uVar2 = local_448._0_8_;
    if (local_448._5_8_ != 0x37343633383437 || uVar2 != 0x3834373431322020) goto LAB_0011c1b9;
  }
  else {
LAB_0011c1b9:
    main_cold_98();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%-9d",0x80000000);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_99();
  }
  if (iVar3 == 0xb) {
    if (local_448._8_4_ != 0x383436 || local_448._0_8_ != 0x333834373431322d) goto LAB_0011c1ca;
  }
  else {
LAB_0011c1ca:
    main_cold_100();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%-9d",0x7fffffff);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_101();
  }
  if (iVar3 == 10) {
    uVar2 = local_448._0_8_;
    if (local_448._3_8_ != 0x37343633383437 || uVar2 != 0x3633383437343132) goto LAB_0011c1db;
  }
  else {
LAB_0011c1db:
    main_cold_102();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%-10d",0x80000000);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_103();
  }
  if (iVar3 == 0xb) {
    if (local_448._8_4_ != 0x383436 || local_448._0_8_ != 0x333834373431322d) goto LAB_0011c1ec;
  }
  else {
LAB_0011c1ec:
    main_cold_104();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%-10d",0x7fffffff);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_105();
  }
  if (iVar3 == 10) {
    uVar2 = local_448._0_8_;
    if (local_448._3_8_ != 0x37343633383437 || uVar2 != 0x3633383437343132) goto LAB_0011c1fd;
  }
  else {
LAB_0011c1fd:
    main_cold_106();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%-11d",0x80000000);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_107();
  }
  if (iVar3 == 0xb) {
    if (local_448._8_4_ != 0x383436 || local_448._0_8_ != 0x333834373431322d) goto LAB_0011c20e;
  }
  else {
LAB_0011c20e:
    main_cold_108();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%-11d",0x7fffffff);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_109();
  }
  if (iVar3 == 0xb) {
    if (local_448._8_4_ != 0x203734 || local_448._0_8_ != 0x3633383437343132) goto LAB_0011c21f;
  }
  else {
LAB_0011c21f:
    main_cold_110();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%-12d",0x80000000);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_111();
  }
  if (iVar3 == 0xc) {
    uVar2 = local_448._0_8_;
    if (local_448._5_8_ != 0x20383436333834 || uVar2 != 0x333834373431322d) goto LAB_0011c230;
  }
  else {
LAB_0011c230:
    main_cold_112();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%-12d",0x7fffffff);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_113();
  }
  if (iVar3 == 0xc) {
    uVar2 = local_448._0_8_;
    if (local_448._5_8_ != 0x20203734363338 || uVar2 != 0x3633383437343132) goto LAB_0011c241;
  }
  else {
LAB_0011c241:
    main_cold_114();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%09d",0x80000000);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_115();
  }
  if (iVar3 == 0xb) {
    if (local_448._8_4_ != 0x383436 || local_448._0_8_ != 0x333834373431322d) goto LAB_0011c252;
  }
  else {
LAB_0011c252:
    main_cold_116();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%09d",0x7fffffff);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_117();
  }
  if (iVar3 == 10) {
    uVar2 = local_448._0_8_;
    if (local_448._3_8_ != 0x37343633383437 || uVar2 != 0x3633383437343132) goto LAB_0011c263;
  }
  else {
LAB_0011c263:
    main_cold_118();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%010d",0x80000000);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_119();
  }
  if (iVar3 == 0xb) {
    if (local_448._8_4_ != 0x383436 || local_448._0_8_ != 0x333834373431322d) goto LAB_0011c274;
  }
  else {
LAB_0011c274:
    main_cold_120();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%010d",0x7fffffff);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_121();
  }
  if (iVar3 == 10) {
    uVar2 = local_448._0_8_;
    if (local_448._3_8_ != 0x37343633383437 || uVar2 != 0x3633383437343132) goto LAB_0011c285;
  }
  else {
LAB_0011c285:
    main_cold_122();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%011d",0x80000000);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_123();
  }
  if (iVar3 == 0xb) {
    if (local_448._8_4_ != 0x383436 || local_448._0_8_ != 0x333834373431322d) goto LAB_0011c296;
  }
  else {
LAB_0011c296:
    main_cold_124();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%011d",0x7fffffff);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_125();
  }
  if (iVar3 == 0xb) {
    if (local_448._8_4_ != 0x373436 || local_448._0_8_ != 0x3338343734313230) goto LAB_0011c2a7;
  }
  else {
LAB_0011c2a7:
    main_cold_126();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%012d",0x80000000);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_127();
  }
  if (iVar3 == 0xc) {
    uVar2 = local_448._0_8_;
    if (local_448._5_8_ != 0x38343633383437 || uVar2 != 0x383437343132302d) goto LAB_0011c2b8;
  }
  else {
LAB_0011c2b8:
    main_cold_128();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%012d",0x7fffffff);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_129();
  }
  if (iVar3 == 0xc) {
    uVar2 = local_448._0_8_;
    if (local_448._5_8_ != 0x37343633383437 || uVar2 != 0x3834373431323030) goto LAB_0011c2c9;
  }
  else {
LAB_0011c2c9:
    main_cold_130();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%-09d",0x80000000);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_131();
  }
  if (iVar3 == 0xb) {
    if (local_448._8_4_ != 0x383436 || local_448._0_8_ != 0x333834373431322d) goto LAB_0011c2da;
  }
  else {
LAB_0011c2da:
    main_cold_132();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%-09d",0x7fffffff);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_133();
  }
  if (iVar3 == 10) {
    uVar2 = local_448._0_8_;
    if (local_448._3_8_ != 0x37343633383437 || uVar2 != 0x3633383437343132) goto LAB_0011c2eb;
  }
  else {
LAB_0011c2eb:
    main_cold_134();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%-010d",0x80000000);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_135();
  }
  if (iVar3 == 0xb) {
    if (local_448._8_4_ != 0x383436 || local_448._0_8_ != 0x333834373431322d) goto LAB_0011c2fc;
  }
  else {
LAB_0011c2fc:
    main_cold_136();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%-010d",0x7fffffff);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_137();
  }
  if (iVar3 == 10) {
    uVar2 = local_448._0_8_;
    if (local_448._3_8_ != 0x37343633383437 || uVar2 != 0x3633383437343132) goto LAB_0011c30d;
  }
  else {
LAB_0011c30d:
    main_cold_138();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%-011d",0x80000000);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_139();
  }
  if (iVar3 == 0xb) {
    if (local_448._8_4_ != 0x383436 || local_448._0_8_ != 0x333834373431322d) goto LAB_0011c31e;
  }
  else {
LAB_0011c31e:
    main_cold_140();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%-011d",0x7fffffff);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_141();
  }
  if (iVar3 == 0xb) {
    if (local_448._8_4_ != 0x203734 || local_448._0_8_ != 0x3633383437343132) goto LAB_0011c32f;
  }
  else {
LAB_0011c32f:
    main_cold_142();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%-012d",0x80000000);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_143();
  }
  if (iVar3 == 0xc) {
    uVar2 = local_448._0_8_;
    if (local_448._5_8_ != 0x20383436333834 || uVar2 != 0x333834373431322d) goto LAB_0011c340;
  }
  else {
LAB_0011c340:
    main_cold_144();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%-012d",0x7fffffff);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_145();
  }
  if (iVar3 == 0xc) {
    uVar2 = local_448._0_8_;
    if (local_448._5_8_ != 0x20203734363338 || uVar2 != 0x3633383437343132) goto LAB_0011c351;
  }
  else {
LAB_0011c351:
    main_cold_146();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%030.20d",0x7fffffff);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_147();
  }
  if (iVar3 == 0x1e) {
    auVar156[0] = -(local_448[0xf] == '0');
    auVar156[1] = -(local_438[0] == '0');
    auVar156[2] = -(local_438[1] == '0');
    auVar156[3] = -(local_438[2] == '0');
    auVar156[4] = -(local_438[3] == '0');
    auVar156[5] = -(local_438[4] == '2');
    auVar156[6] = -(local_438[5] == '1');
    auVar156[7] = -(local_438[6] == '4');
    auVar156[8] = -(local_438[7] == '7');
    auVar156[9] = -(local_438[8] == '4');
    auVar156[10] = -(local_438[9] == '8');
    auVar156[0xb] = -(local_438[10] == '3');
    auVar156[0xc] = -(local_438[0xb] == '6');
    auVar156[0xd] = -(local_438[0xc] == '4');
    auVar156[0xe] = -(local_438[0xd] == '7');
    auVar156[0xf] = -(local_438[0xe] == '\0');
    auVar12[0] = -(local_448[0] == ' ');
    auVar12[1] = -(local_448[1] == ' ');
    auVar12[2] = -(local_448[2] == ' ');
    auVar12[3] = -(local_448[3] == ' ');
    auVar12[4] = -(local_448[4] == ' ');
    auVar12[5] = -(local_448[5] == ' ');
    auVar12[6] = -(local_448[6] == ' ');
    auVar12[7] = -(local_448[7] == ' ');
    auVar12[8] = -(local_448[8] == ' ');
    auVar12[9] = -(local_448[9] == ' ');
    auVar12[10] = -(local_448[10] == '0');
    auVar12[0xb] = -(local_448[0xb] == '0');
    auVar12[0xc] = -(local_448[0xc] == '0');
    auVar12[0xd] = -(local_448[0xd] == '0');
    auVar12[0xe] = -(local_448[0xe] == '0');
    auVar12[0xf] = -(local_448[0xf] == '0');
    auVar12 = auVar12 & auVar156;
    if ((ushort)((ushort)(SUB161(auVar12 >> 7,0) & 1) | (ushort)(SUB161(auVar12 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar12 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar12 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar12 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar12 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar12 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar12 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar12 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar12 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar12 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar12 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar12 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar12 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar12 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar12[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011c362;
  }
  else {
LAB_0011c362:
    main_cold_148();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%.6x",0xffffffff);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_149();
  }
  if (iVar3 == 8) {
    if (local_448[8] != '\0' || local_448._0_8_ != 0x6666666666666666) goto LAB_0011c373;
  }
  else {
LAB_0011c373:
    main_cold_150();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%#6.3x",0xffffffff);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_151();
  }
  if (iVar3 == 10) {
    uVar2 = local_448._0_8_;
    if (local_448._3_8_ != 0x66666666666666 || uVar2 != 0x6666666666667830) goto LAB_0011c384;
  }
  else {
LAB_0011c384:
    main_cold_152();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%#3.6x",0xffffffff);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_153();
  }
  if (iVar3 == 10) {
    uVar2 = local_448._0_8_;
    if (local_448._3_8_ != 0x66666666666666 || uVar2 != 0x6666666666667830) goto LAB_0011c395;
  }
  else {
LAB_0011c395:
    main_cold_154();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%.6d",0x80000000);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_155();
  }
  if (iVar3 == 0xb) {
    if (local_448._8_4_ != 0x383436 || local_448._0_8_ != 0x333834373431322d) goto LAB_0011c3a6;
  }
  else {
LAB_0011c3a6:
    main_cold_156();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%6.3d",0x80000000);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_157();
  }
  if (iVar3 == 0xb) {
    if (local_448._8_4_ != 0x383436 || local_448._0_8_ != 0x333834373431322d) goto LAB_0011c3b7;
  }
  else {
LAB_0011c3b7:
    main_cold_158();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%3.6d",0x80000000);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_159();
  }
  if (iVar3 == 0xb) {
    if (local_448._8_4_ != 0x383436 || local_448._0_8_ != 0x333834373431322d) goto LAB_0011c3c8;
  }
  else {
LAB_0011c3c8:
    main_cold_160();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%#0.6x",0xffffffff);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_161();
  }
  if (iVar3 == 10) {
    uVar2 = local_448._0_8_;
    if (local_448._3_8_ != 0x66666666666666 || uVar2 != 0x6666666666667830) goto LAB_0011c3d9;
  }
  else {
LAB_0011c3d9:
    main_cold_162();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%#06.3x",0xffffffff);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_163();
  }
  if (iVar3 == 10) {
    uVar2 = local_448._0_8_;
    if (local_448._3_8_ != 0x66666666666666 || uVar2 != 0x6666666666667830) goto LAB_0011c3ea;
  }
  else {
LAB_0011c3ea:
    main_cold_164();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%#03.6x",0xffffffff);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_165();
  }
  if (iVar3 == 10) {
    uVar2 = local_448._0_8_;
    if (local_448._3_8_ != 0x66666666666666 || uVar2 != 0x6666666666667830) goto LAB_0011c3fb;
  }
  else {
LAB_0011c3fb:
    main_cold_166();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%#0.6d",0x7fffffff);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_167();
  }
  if (iVar3 == 10) {
    uVar2 = local_448._0_8_;
    if (local_448._3_8_ != 0x37343633383437 || uVar2 != 0x3633383437343132) goto LAB_0011c40c;
  }
  else {
LAB_0011c40c:
    main_cold_168();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%#06.3d",0x7fffffff);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_169();
  }
  if (iVar3 == 10) {
    uVar2 = local_448._0_8_;
    if (local_448._3_8_ != 0x37343633383437 || uVar2 != 0x3633383437343132) goto LAB_0011c41d;
  }
  else {
LAB_0011c41d:
    main_cold_170();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%#03.6d",0x7fffffff);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_171();
  }
  if (iVar3 == 10) {
    uVar2 = local_448._0_8_;
    if (local_448._3_8_ != 0x37343633383437 || uVar2 != 0x3633383437343132) goto LAB_0011c42e;
  }
  else {
LAB_0011c42e:
    main_cold_172();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%#+.6d",0x7fffffff);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_173();
  }
  if (iVar3 == 0xb) {
    if (local_448._8_4_ != 0x373436 || local_448._0_8_ != 0x333834373431322b) goto LAB_0011c43f;
  }
  else {
LAB_0011c43f:
    main_cold_174();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%#+6.3d",0x7fffffff);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_175();
  }
  if (iVar3 == 0xb) {
    if (local_448._8_4_ != 0x373436 || local_448._0_8_ != 0x333834373431322b) goto LAB_0011c450;
  }
  else {
LAB_0011c450:
    main_cold_176();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%#+3.6d",0x7fffffff);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_177();
  }
  if (iVar3 == 0xb) {
    if (local_448._8_4_ != 0x373436 || local_448._0_8_ != 0x333834373431322b) goto LAB_0011c461;
  }
  else {
LAB_0011c461:
    main_cold_178();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%+0.6d",0x7fffffff);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_179();
  }
  if (iVar3 == 0xb) {
    if (local_448._8_4_ != 0x373436 || local_448._0_8_ != 0x333834373431322b) goto LAB_0011c472;
  }
  else {
LAB_0011c472:
    main_cold_180();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%+06.3d",0x7fffffff);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_181();
  }
  if (iVar3 == 0xb) {
    if (local_448._8_4_ != 0x373436 || local_448._0_8_ != 0x333834373431322b) goto LAB_0011c483;
  }
  else {
LAB_0011c483:
    main_cold_182();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%+03.6d",0x7fffffff);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_183();
  }
  if (iVar3 == 0xb) {
    if (local_448._8_4_ != 0x373436 || local_448._0_8_ != 0x333834373431322b) goto LAB_0011c494;
  }
  else {
LAB_0011c494:
    main_cold_184();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"- %d",0x7fffffff);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_185();
  }
  if (iVar3 == 0xc) {
    uVar2 = local_448._0_8_;
    if (local_448._5_8_ != 0x37343633383437 || uVar2 != 0x383437343132202d) goto LAB_0011c4a5;
  }
  else {
LAB_0011c4a5:
    main_cold_186();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"- %d %% %d",0x7fffffff,0x80000000);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_187();
  }
  if (iVar3 == 0x1a) {
    auVar157[0] = -(local_448[0xb] == '7');
    auVar157[1] = -(local_448[0xc] == ' ');
    auVar157[2] = -(local_448[0xd] == '%');
    auVar157[3] = -(local_448[0xe] == ' ');
    auVar157[4] = -(local_448[0xf] == '-');
    auVar157[5] = -(local_438[0] == '2');
    auVar157[6] = -(local_438[1] == '1');
    auVar157[7] = -(local_438[2] == '4');
    auVar157[8] = -(local_438[3] == '7');
    auVar157[9] = -(local_438[4] == '4');
    auVar157[10] = -(local_438[5] == '8');
    auVar157[0xb] = -(local_438[6] == '3');
    auVar157[0xc] = -(local_438[7] == '6');
    auVar157[0xd] = -(local_438[8] == '4');
    auVar157[0xe] = -(local_438[9] == '8');
    auVar157[0xf] = -(local_438[10] == '\0');
    auVar13[0] = -(local_448[0] == '-');
    auVar13[1] = -(local_448[1] == ' ');
    auVar13[2] = -(local_448[2] == '2');
    auVar13[3] = -(local_448[3] == '1');
    auVar13[4] = -(local_448[4] == '4');
    auVar13[5] = -(local_448[5] == '7');
    auVar13[6] = -(local_448[6] == '4');
    auVar13[7] = -(local_448[7] == '8');
    auVar13[8] = -(local_448[8] == '3');
    auVar13[9] = -(local_448[9] == '6');
    auVar13[10] = -(local_448[10] == '4');
    auVar13[0xb] = -(local_448[0xb] == '7');
    auVar13[0xc] = -(local_448[0xc] == ' ');
    auVar13[0xd] = -(local_448[0xd] == '%');
    auVar13[0xe] = -(local_448[0xe] == ' ');
    auVar13[0xf] = -(local_448[0xf] == '-');
    auVar13 = auVar13 & auVar157;
    if ((ushort)((ushort)(SUB161(auVar13 >> 7,0) & 1) | (ushort)(SUB161(auVar13 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar13 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar13 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar13 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar13 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar13 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar13 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar13 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar13 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar13 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar13 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar13 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar13 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar13 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar13[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011c4b6;
  }
  else {
LAB_0011c4b6:
    main_cold_188();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%c",0x78);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_189();
  }
  if ((iVar3 != 1) || (local_448._0_2_ != 0x78)) {
    main_cold_190();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%s","abcdef");
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_191();
  }
  if (iVar3 == 6) {
    uVar1 = local_448._0_4_;
    if (local_448._3_4_ != 0x666564 || uVar1 != 0x64636261) goto LAB_0011c4c7;
  }
  else {
LAB_0011c4c7:
    main_cold_192();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%p",0xdeadbeef);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_193();
  }
  if (iVar3 == 10) {
    uVar2 = local_448._0_8_;
    if (local_448._3_8_ != 0x66656562646165 || uVar2 != 0x6562646165647830) goto LAB_0011c4d8;
  }
  else {
LAB_0011c4d8:
    main_cold_194();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%#6x",1);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_195();
  }
  if (iVar3 == 6) {
    uVar1 = local_448._0_4_;
    if (local_448._3_4_ != 0x317830 || uVar1 != 0x30202020) goto LAB_0011c4e9;
  }
  else {
LAB_0011c4e9:
    main_cold_196();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"123456%n789%n",local_2ec,&local_2f0);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_197();
  }
  if (iVar3 == 9) {
    if (local_448._8_2_ != 0x39 || local_448._0_8_ != 0x3837363534333231) goto LAB_0011c4fa;
  }
  else {
LAB_0011c4fa:
    main_cold_198();
  }
  if (local_2ec[0] != 6) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/printf_testcases.h, line %d - %s\n"
           ,0x7f,"val1 == 6");
  }
  if (local_2f0 != 9) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/printf_testcases.h, line %d - %s\n"
           ,0x80,"val2 == 9");
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%tu",1);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_199();
  }
  if ((iVar3 != 1) || (local_448._0_2_ != 0x31)) {
    main_cold_200();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%jd",0xffffffffffffffff);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_201();
  }
  if ((iVar3 != 2) || (local_448[2] != '\0' || local_448._0_2_ != 0x312d)) {
    main_cold_202();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%ju",1);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_203();
  }
  if ((iVar3 != 1) || (local_448._0_2_ != 0x31)) {
    main_cold_204();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%zd",1);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_205();
  }
  if ((iVar3 != 1) || (local_448._0_2_ != 0x31)) {
    main_cold_206();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%a",0);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_207();
  }
  if (iVar3 == 6) {
    uVar1 = local_448._0_4_;
    if (local_448._3_4_ != 0x302b70 || uVar1 != 0x70307830) goto LAB_0011c51c;
  }
  else {
LAB_0011c51c:
    main_cold_208();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%+a",0);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_209();
  }
  if ((iVar3 != 7) || (local_448._0_8_ != 0x302b703078302b)) {
    main_cold_210();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"% a",0);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_211();
  }
  if ((iVar3 != 7) || (local_448._0_8_ != 0x302b7030783020)) {
    main_cold_212();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%a",0x4010000000000000);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_213();
  }
  if (iVar3 == 6) {
    uVar1 = local_448._0_4_;
    if (local_448._3_4_ != 0x322b70 || uVar1 != 0x70317830) goto LAB_0011c52d;
  }
  else {
LAB_0011c52d:
    main_cold_214();
  }
  local_3f8 = ZEXT816(0);
  local_408 = ZEXT816(0);
  local_418 = ZEXT816(0);
  local_428 = ZEXT816(0);
  local_438 = ZEXT816(0);
  local_448 = ZEXT816(0);
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%a",0x3fd0000000000000);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_215();
  }
  if (iVar3 == 6) {
    uVar1 = local_448._0_4_;
    if (local_448._3_4_ != 0x322d70 || uVar1 != 0x70317830) goto LAB_0011c53e;
  }
  else {
LAB_0011c53e:
    main_cold_216();
  }
  local_3f8 = ZEXT816(0);
  local_408 = ZEXT816(0);
  local_418 = ZEXT816(0);
  local_428 = ZEXT816(0);
  local_438 = ZEXT816(0);
  local_448 = ZEXT816(0);
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%a",0xbff0000000000000);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_217();
  }
  if ((iVar3 != 7) || (local_448._0_8_ != 0x302b703178302d)) {
    main_cold_218();
  }
  local_3f8 = ZEXT816(0);
  local_408 = ZEXT816(0);
  local_418 = ZEXT816(0);
  local_428 = ZEXT816(0);
  local_438 = ZEXT816(0);
  local_448 = ZEXT816(0);
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%a",0x7fefffffffffffff);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_219();
  }
  if (iVar3 == 0x17) {
    auVar158[0] = -(local_438[0] == 'f');
    auVar158[1] = -(local_438[1] == 'p');
    auVar158[2] = -(local_438[2] == '+');
    auVar158[3] = -(local_438[3] == '1');
    auVar158[4] = -(local_438[4] == '0');
    auVar158[5] = -(local_438[5] == '2');
    auVar158[6] = -(local_438[6] == '3');
    auVar158[7] = -(local_438[7] == '\0');
    auVar158[8] = 0xff;
    auVar158[9] = 0xff;
    auVar158[10] = 0xff;
    auVar158[0xb] = 0xff;
    auVar158[0xc] = 0xff;
    auVar158[0xd] = 0xff;
    auVar158[0xe] = 0xff;
    auVar158[0xf] = 0xff;
    auVar14[0] = -(local_448[0] == '0');
    auVar14[1] = -(local_448[1] == 'x');
    auVar14[2] = -(local_448[2] == '1');
    auVar14[3] = -(local_448[3] == '.');
    auVar14[4] = -(local_448[4] == 'f');
    auVar14[5] = -(local_448[5] == 'f');
    auVar14[6] = -(local_448[6] == 'f');
    auVar14[7] = -(local_448[7] == 'f');
    auVar14[8] = -(local_448[8] == 'f');
    auVar14[9] = -(local_448[9] == 'f');
    auVar14[10] = -(local_448[10] == 'f');
    auVar14[0xb] = -(local_448[0xb] == 'f');
    auVar14[0xc] = -(local_448[0xc] == 'f');
    auVar14[0xd] = -(local_448[0xd] == 'f');
    auVar14[0xe] = -(local_448[0xe] == 'f');
    auVar14[0xf] = -(local_448[0xf] == 'f');
    auVar14 = auVar14 & auVar158;
    if ((ushort)((ushort)(SUB161(auVar14 >> 7,0) & 1) | (ushort)(SUB161(auVar14 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar14 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar14 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar14 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar14 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar14 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar14 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar14 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar14 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar14 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar14 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar14 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar14 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar14 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar14[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011c54f;
  }
  else {
LAB_0011c54f:
    main_cold_220();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%a",0x10000000000000);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_221();
  }
  if (iVar3 == 9) {
    if (local_448._8_2_ != 0x32 || local_448._0_8_ != 0x3230312d70317830) goto LAB_0011c560;
  }
  else {
LAB_0011c560:
    main_cold_222();
  }
  local_3f8 = ZEXT816(0);
  local_408 = ZEXT816(0);
  local_418 = ZEXT816(0);
  local_428 = ZEXT816(0);
  local_438 = ZEXT816(0);
  local_448 = ZEXT816(0);
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%a",1);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_223();
  }
  if (iVar3 == 0x17) {
    auVar159[0] = -(local_438[0] == '1');
    auVar159[1] = -(local_438[1] == 'p');
    auVar159[2] = -(local_438[2] == '-');
    auVar159[3] = -(local_438[3] == '1');
    auVar159[4] = -(local_438[4] == '0');
    auVar159[5] = -(local_438[5] == '2');
    auVar159[6] = -(local_438[6] == '2');
    auVar159[7] = -(local_438[7] == '\0');
    auVar159[8] = 0xff;
    auVar159[9] = 0xff;
    auVar159[10] = 0xff;
    auVar159[0xb] = 0xff;
    auVar159[0xc] = 0xff;
    auVar159[0xd] = 0xff;
    auVar159[0xe] = 0xff;
    auVar159[0xf] = 0xff;
    auVar15[0] = -(local_448[0] == '0');
    auVar15[1] = -(local_448[1] == 'x');
    auVar15[2] = -(local_448[2] == '0');
    auVar15[3] = -(local_448[3] == '.');
    auVar15[4] = -(local_448[4] == '0');
    auVar15[5] = -(local_448[5] == '0');
    auVar15[6] = -(local_448[6] == '0');
    auVar15[7] = -(local_448[7] == '0');
    auVar15[8] = -(local_448[8] == '0');
    auVar15[9] = -(local_448[9] == '0');
    auVar15[10] = -(local_448[10] == '0');
    auVar15[0xb] = -(local_448[0xb] == '0');
    auVar15[0xc] = -(local_448[0xc] == '0');
    auVar15[0xd] = -(local_448[0xd] == '0');
    auVar15[0xe] = -(local_448[0xe] == '0');
    auVar15[0xf] = -(local_448[0xf] == '0');
    auVar15 = auVar15 & auVar159;
    if ((ushort)((ushort)(SUB161(auVar15 >> 7,0) & 1) | (ushort)(SUB161(auVar15 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar15 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar15 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar15 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar15 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar15 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar15 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar15 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar15 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar15 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar15 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar15 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar15 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar15 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar15[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011c571;
  }
  else {
LAB_0011c571:
    main_cold_224();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%a",0x3ff0000000000001);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_225();
  }
  if (iVar3 == 0x14) {
    auVar160[0] = -(local_448[5] == '0');
    auVar160[1] = -(local_448[6] == '0');
    auVar160[2] = -(local_448[7] == '0');
    auVar160[3] = -(local_448[8] == '0');
    auVar160[4] = -(local_448[9] == '0');
    auVar160[5] = -(local_448[10] == '0');
    auVar160[6] = -(local_448[0xb] == '0');
    auVar160[7] = -(local_448[0xc] == '0');
    auVar160[8] = -(local_448[0xd] == '0');
    auVar160[9] = -(local_448[0xe] == '0');
    auVar160[10] = -(local_448[0xf] == '0');
    auVar160[0xb] = -(local_438[0] == '1');
    auVar160[0xc] = -(local_438[1] == 'p');
    auVar160[0xd] = -(local_438[2] == '+');
    auVar160[0xe] = -(local_438[3] == '0');
    auVar160[0xf] = -(local_438[4] == '\0');
    auVar16[0] = -(local_448[0] == '0');
    auVar16[1] = -(local_448[1] == 'x');
    auVar16[2] = -(local_448[2] == '1');
    auVar16[3] = -(local_448[3] == '.');
    auVar16[4] = -(local_448[4] == '0');
    auVar16[5] = -(local_448[5] == '0');
    auVar16[6] = -(local_448[6] == '0');
    auVar16[7] = -(local_448[7] == '0');
    auVar16[8] = -(local_448[8] == '0');
    auVar16[9] = -(local_448[9] == '0');
    auVar16[10] = -(local_448[10] == '0');
    auVar16[0xb] = -(local_448[0xb] == '0');
    auVar16[0xc] = -(local_448[0xc] == '0');
    auVar16[0xd] = -(local_448[0xd] == '0');
    auVar16[0xe] = -(local_448[0xe] == '0');
    auVar16[0xf] = -(local_448[0xf] == '0');
    auVar16 = auVar16 & auVar160;
    if ((ushort)((ushort)(SUB161(auVar16 >> 7,0) & 1) | (ushort)(SUB161(auVar16 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar16 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar16 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar16 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar16 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar16 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar16 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar16 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar16 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar16 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar16 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar16 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar16 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar16 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar16[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011c582;
  }
  else {
LAB_0011c582:
    main_cold_226();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"% 8a",0);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_227();
  }
  if (iVar3 == 8) {
    if (local_448[8] != '\0' || local_448._0_8_ != 0x302b703078302020) goto LAB_0011c593;
  }
  else {
LAB_0011c593:
    main_cold_228();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%- 8a",0);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_229();
  }
  if (iVar3 == 8) {
    if (local_448[8] != '\0' || local_448._0_8_ != 0x20302b7030783020) goto LAB_0011c5a4;
  }
  else {
LAB_0011c5a4:
    main_cold_230();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%08a",0);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_231();
  }
  if (iVar3 == 8) {
    if (local_448[8] != '\0' || local_448._0_8_ != 0x302b703030307830) goto LAB_0011c5b5;
  }
  else {
LAB_0011c5b5:
    main_cold_232();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%.4a",0x3ffffffde7210be9);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_233();
  }
  if (iVar3 == 0xb) {
    if (local_448._8_4_ != 0x302b70 || local_448._0_8_ != 0x303030302e327830) goto LAB_0011c5c6;
  }
  else {
LAB_0011c5c6:
    main_cold_234();
  }
  local_3f8 = ZEXT816(0);
  local_408 = ZEXT816(0);
  local_418 = ZEXT816(0);
  local_428 = ZEXT816(0);
  local_438 = ZEXT816(0);
  local_448 = ZEXT816(0);
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%.5a",0x3ffffffde7210be9);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_235();
  }
  if (iVar3 == 0xc) {
    uVar2 = local_448._0_8_;
    if (local_448._5_8_ != 0x302b7065666666 || uVar2 != 0x666666662e317830) goto LAB_0011c5d7;
  }
  else {
LAB_0011c5d7:
    main_cold_236();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%La");
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_237();
  }
  if (iVar3 == 6) {
    uVar1 = local_448._0_4_;
    if (local_448._3_4_ != 0x302b70 || uVar1 != 0x70307830) goto LAB_0011c5e8;
  }
  else {
LAB_0011c5e8:
    main_cold_238();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%+La");
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_239();
  }
  if ((iVar3 != 7) || (local_448._0_8_ != 0x302b703078302b)) {
    main_cold_240();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"% La");
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_241();
  }
  if ((iVar3 != 7) || (local_448._0_8_ != 0x302b7030783020)) {
    main_cold_242();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"% 8La");
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_243();
  }
  if (iVar3 == 8) {
    if (local_448[8] != '\0' || local_448._0_8_ != 0x302b703078302020) goto LAB_0011c5f9;
  }
  else {
LAB_0011c5f9:
    main_cold_244();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%- 8La");
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_245();
  }
  if (iVar3 == 8) {
    if (local_448[8] != '\0' || local_448._0_8_ != 0x20302b7030783020) goto LAB_0011c60a;
  }
  else {
LAB_0011c60a:
    main_cold_246();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%08La");
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_247();
  }
  if (iVar3 == 8) {
    if (local_448[8] != '\0' || local_448._0_8_ != 0x302b703030307830) goto LAB_0011c61b;
  }
  else {
LAB_0011c61b:
    main_cold_248();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%La");
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_249();
  }
  if (iVar3 == 6) {
    uVar1 = local_448._0_4_;
    if (local_448._3_4_ != 0x312d70 || uVar1 != 0x70387830) goto LAB_0011c62c;
  }
  else {
LAB_0011c62c:
    main_cold_250();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%La");
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_251();
  }
  if (iVar3 == 6) {
    uVar1 = local_448._0_4_;
    if (local_448._3_4_ != 0x352d70 || uVar1 != 0x70387830) goto LAB_0011c63d;
  }
  else {
LAB_0011c63d:
    main_cold_252();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%La");
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_253();
  }
  if ((iVar3 != 7) || (local_448._0_8_ != 0x332d703878302d)) {
    main_cold_254();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  local_3d8 = (char)_DAT_001250c0;
  cStack_3d7 = (char)((unkuint10)_DAT_001250c0 >> 8);
  cStack_3d6 = (char)((unkuint10)_DAT_001250c0 >> 0x10);
  cStack_3d5 = (char)((unkuint10)_DAT_001250c0 >> 0x18);
  cStack_3d4 = (char)((unkuint10)_DAT_001250c0 >> 0x20);
  cStack_3d3 = (char)((unkuint10)_DAT_001250c0 >> 0x28);
  cStack_3d2 = (char)((unkuint10)_DAT_001250c0 >> 0x30);
  cStack_3d1 = (char)((unkuint10)_DAT_001250c0 >> 0x38);
  uStack_3d0 = (undefined2)((unkuint10)_DAT_001250c0 >> 0x40);
  iVar3 = testprintf((FILE *)pFVar5,"%.4La");
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_255();
  }
  if (iVar3 == 0xb) {
    if (local_448._8_4_ != 0x332d70 || local_448._0_8_ != 0x666666662e667830) goto LAB_0011c64e;
  }
  else {
LAB_0011c64e:
    main_cold_256();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%.5La");
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_257();
  }
  if (iVar3 == 0xc) {
    uVar2 = local_448._0_8_;
    if (local_448._5_8_ != 0x332d7066656666 || uVar2 != 0x656666662e667830) goto LAB_0011c65f;
  }
  else {
LAB_0011c65f:
    main_cold_258();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"Hallo heimur");
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_259();
  }
  if (iVar3 == 0xc) {
    uVar2 = local_448._0_8_;
    if (local_448._5_8_ != 0x72756d69656820 || uVar2 != 0x6568206f6c6c6148) goto LAB_0011c670;
  }
  else {
LAB_0011c670:
    main_cold_260();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%s","Hallo heimur");
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_261();
  }
  if (iVar3 == 0xc) {
    uVar2 = local_448._0_8_;
    if (local_448._5_8_ != 0x72756d69656820 || uVar2 != 0x6568206f6c6c6148) goto LAB_0011c681;
  }
  else {
LAB_0011c681:
    main_cold_262();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%d",0x400);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_263();
  }
  if (iVar3 == 4) {
    if (local_448[4] != '\0' || local_448._0_4_ != 0x34323031) goto LAB_0011c692;
  }
  else {
LAB_0011c692:
    main_cold_264();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%d",0xfffffc00);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_265();
  }
  if (iVar3 == 5) {
    if (local_448._4_2_ != 0x34 || local_448._0_4_ != 0x3230312d) goto LAB_0011c6a3;
  }
  else {
LAB_0011c6a3:
    main_cold_266();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%i",0x400);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_267();
  }
  if (iVar3 == 4) {
    if (local_448[4] != '\0' || local_448._0_4_ != 0x34323031) goto LAB_0011c6b4;
  }
  else {
LAB_0011c6b4:
    main_cold_268();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%i",0xfffffc00);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_269();
  }
  if (iVar3 == 5) {
    if (local_448._4_2_ != 0x34 || local_448._0_4_ != 0x3230312d) goto LAB_0011c6c5;
  }
  else {
LAB_0011c6c5:
    main_cold_270();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%u",0x400);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_271();
  }
  if (iVar3 == 4) {
    if (local_448[4] != '\0' || local_448._0_4_ != 0x34323031) goto LAB_0011c6d6;
  }
  else {
LAB_0011c6d6:
    main_cold_272();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%u",0xfffffc00);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_273();
  }
  if (iVar3 == 10) {
    uVar2 = local_448._0_8_;
    if (local_448._3_8_ != 0x32373236363934 || uVar2 != 0x3236363934393234) goto LAB_0011c6e7;
  }
  else {
LAB_0011c6e7:
    main_cold_274();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%o",0x1ff);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_275();
  }
  if ((iVar3 != 3) || (local_448._0_4_ != 0x373737)) {
    main_cold_276();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%o",0xfffffe01);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_277();
  }
  if (iVar3 == 0xb) {
    if (local_448._8_4_ != 0x313030 || local_448._0_8_ != 0x3737373737373733) goto LAB_0011c6f8;
  }
  else {
LAB_0011c6f8:
    main_cold_278();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%x",0x1234abcd);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_279();
  }
  if (iVar3 == 8) {
    if (local_448[8] != '\0' || local_448._0_8_ != 0x6463626134333231) goto LAB_0011c709;
  }
  else {
LAB_0011c709:
    main_cold_280();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%x",0xedcb5433);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_281();
  }
  if (iVar3 == 8) {
    if (local_448[8] != '\0' || local_448._0_8_ != 0x3333343562636465) goto LAB_0011c71a;
  }
  else {
LAB_0011c71a:
    main_cold_282();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%X",0x1234abcd);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_283();
  }
  if (iVar3 == 8) {
    if (local_448[8] != '\0' || local_448._0_8_ != 0x4443424134333231) goto LAB_0011c72b;
  }
  else {
LAB_0011c72b:
    main_cold_284();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%X",0xedcb5433);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_285();
  }
  if (iVar3 == 8) {
    if (local_448[8] != '\0' || local_448._0_8_ != 0x3333343542434445) goto LAB_0011c73c;
  }
  else {
LAB_0011c73c:
    main_cold_286();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%c",0x78);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_287();
  }
  if ((iVar3 != 1) || (local_448._0_2_ != 0x78)) {
    main_cold_288();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%%");
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_289();
  }
  if ((iVar3 != 1) || (local_448._0_2_ != 0x25)) {
    main_cold_290();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%c",0);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_291();
  }
  if ((iVar3 != 1) || (local_448[0] != '\0')) {
    main_cold_292();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%+s","Hallo heimur");
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_293();
  }
  if (iVar3 == 0xc) {
    uVar2 = local_448._0_8_;
    if (local_448._5_8_ != 0x72756d69656820 || uVar2 != 0x6568206f6c6c6148) goto LAB_0011c74d;
  }
  else {
LAB_0011c74d:
    main_cold_294();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%+d",0x400);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_295();
  }
  if (iVar3 == 5) {
    if (local_448._4_2_ != 0x34 || local_448._0_4_ != 0x3230312b) goto LAB_0011c75e;
  }
  else {
LAB_0011c75e:
    main_cold_296();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%+d",0xfffffc00);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_297();
  }
  if (iVar3 == 5) {
    if (local_448._4_2_ != 0x34 || local_448._0_4_ != 0x3230312d) goto LAB_0011c76f;
  }
  else {
LAB_0011c76f:
    main_cold_298();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%+i",0x400);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_299();
  }
  if (iVar3 == 5) {
    if (local_448._4_2_ != 0x34 || local_448._0_4_ != 0x3230312b) goto LAB_0011c780;
  }
  else {
LAB_0011c780:
    main_cold_300();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%+i",0xfffffc00);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_301();
  }
  if (iVar3 == 5) {
    if (local_448._4_2_ != 0x34 || local_448._0_4_ != 0x3230312d) goto LAB_0011c791;
  }
  else {
LAB_0011c791:
    main_cold_302();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%+u",0x400);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_303();
  }
  if (iVar3 == 4) {
    if (local_448[4] != '\0' || local_448._0_4_ != 0x34323031) goto LAB_0011c7a2;
  }
  else {
LAB_0011c7a2:
    main_cold_304();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%+u",0xfffffc00);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_305();
  }
  if (iVar3 == 10) {
    uVar2 = local_448._0_8_;
    if (local_448._3_8_ != 0x32373236363934 || uVar2 != 0x3236363934393234) goto LAB_0011c7b3;
  }
  else {
LAB_0011c7b3:
    main_cold_306();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%+o",0x1ff);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_307();
  }
  if ((iVar3 != 3) || (local_448._0_4_ != 0x373737)) {
    main_cold_308();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%+o",0xfffffe01);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_309();
  }
  if (iVar3 == 0xb) {
    if (local_448._8_4_ != 0x313030 || local_448._0_8_ != 0x3737373737373733) goto LAB_0011c7c4;
  }
  else {
LAB_0011c7c4:
    main_cold_310();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%+x",0x1234abcd);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_311();
  }
  if (iVar3 == 8) {
    if (local_448[8] != '\0' || local_448._0_8_ != 0x6463626134333231) goto LAB_0011c7d5;
  }
  else {
LAB_0011c7d5:
    main_cold_312();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%+x",0xedcb5433);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_313();
  }
  if (iVar3 == 8) {
    if (local_448[8] != '\0' || local_448._0_8_ != 0x3333343562636465) goto LAB_0011c7e6;
  }
  else {
LAB_0011c7e6:
    main_cold_314();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%+X",0x1234abcd);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_315();
  }
  if (iVar3 == 8) {
    if (local_448[8] != '\0' || local_448._0_8_ != 0x4443424134333231) goto LAB_0011c7f7;
  }
  else {
LAB_0011c7f7:
    main_cold_316();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%+X",0xedcb5433);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_317();
  }
  if (iVar3 == 8) {
    if (local_448[8] != '\0' || local_448._0_8_ != 0x3333343542434445) goto LAB_0011c808;
  }
  else {
LAB_0011c808:
    main_cold_318();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%+c",0x78);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_319();
  }
  if ((iVar3 != 1) || (local_448._0_2_ != 0x78)) {
    main_cold_320();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"% s","Hallo heimur");
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_321();
  }
  if (iVar3 == 0xc) {
    uVar2 = local_448._0_8_;
    if (local_448._5_8_ != 0x72756d69656820 || uVar2 != 0x6568206f6c6c6148) goto LAB_0011c819;
  }
  else {
LAB_0011c819:
    main_cold_322();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"% d",0x400);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_323();
  }
  if (iVar3 == 5) {
    if (local_448._4_2_ != 0x34 || local_448._0_4_ != 0x32303120) goto LAB_0011c82a;
  }
  else {
LAB_0011c82a:
    main_cold_324();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"% d",0xfffffc00);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_325();
  }
  if (iVar3 == 5) {
    if (local_448._4_2_ != 0x34 || local_448._0_4_ != 0x3230312d) goto LAB_0011c83b;
  }
  else {
LAB_0011c83b:
    main_cold_326();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"% i",0x400);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_327();
  }
  if (iVar3 == 5) {
    if (local_448._4_2_ != 0x34 || local_448._0_4_ != 0x32303120) goto LAB_0011c84c;
  }
  else {
LAB_0011c84c:
    main_cold_328();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"% i",0xfffffc00);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_329();
  }
  if (iVar3 == 5) {
    if (local_448._4_2_ != 0x34 || local_448._0_4_ != 0x3230312d) goto LAB_0011c85d;
  }
  else {
LAB_0011c85d:
    main_cold_330();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"% u",0x400);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_331();
  }
  if (iVar3 == 4) {
    if (local_448[4] != '\0' || local_448._0_4_ != 0x34323031) goto LAB_0011c86e;
  }
  else {
LAB_0011c86e:
    main_cold_332();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"% u",0xfffffc00);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_333();
  }
  if (iVar3 == 10) {
    uVar2 = local_448._0_8_;
    if (local_448._3_8_ != 0x32373236363934 || uVar2 != 0x3236363934393234) goto LAB_0011c87f;
  }
  else {
LAB_0011c87f:
    main_cold_334();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"% o",0x1ff);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_335();
  }
  if ((iVar3 != 3) || (local_448._0_4_ != 0x373737)) {
    main_cold_336();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"% o",0xfffffe01);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_337();
  }
  if (iVar3 == 0xb) {
    if (local_448._8_4_ != 0x313030 || local_448._0_8_ != 0x3737373737373733) goto LAB_0011c890;
  }
  else {
LAB_0011c890:
    main_cold_338();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"% x",0x1234abcd);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_339();
  }
  if (iVar3 == 8) {
    if (local_448[8] != '\0' || local_448._0_8_ != 0x6463626134333231) goto LAB_0011c8a1;
  }
  else {
LAB_0011c8a1:
    main_cold_340();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"% x",0xedcb5433);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_341();
  }
  if (iVar3 == 8) {
    if (local_448[8] != '\0' || local_448._0_8_ != 0x3333343562636465) goto LAB_0011c8b2;
  }
  else {
LAB_0011c8b2:
    main_cold_342();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"% X",0x1234abcd);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_343();
  }
  if (iVar3 == 8) {
    if (local_448[8] != '\0' || local_448._0_8_ != 0x4443424134333231) goto LAB_0011c8c3;
  }
  else {
LAB_0011c8c3:
    main_cold_344();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"% X",0xedcb5433);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_345();
  }
  if (iVar3 == 8) {
    if (local_448[8] != '\0' || local_448._0_8_ != 0x3333343542434445) goto LAB_0011c8d4;
  }
  else {
LAB_0011c8d4:
    main_cold_346();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"% c",0x78);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_347();
  }
  if ((iVar3 != 1) || (local_448._0_2_ != 0x78)) {
    main_cold_348();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%+ s","Hallo heimur");
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_349();
  }
  if (iVar3 == 0xc) {
    uVar2 = local_448._0_8_;
    if (local_448._5_8_ != 0x72756d69656820 || uVar2 != 0x6568206f6c6c6148) goto LAB_0011c8e5;
  }
  else {
LAB_0011c8e5:
    main_cold_350();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%+ d",0x400);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_351();
  }
  if (iVar3 == 5) {
    if (local_448._4_2_ != 0x34 || local_448._0_4_ != 0x3230312b) goto LAB_0011c8f6;
  }
  else {
LAB_0011c8f6:
    main_cold_352();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%+ d",0xfffffc00);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_353();
  }
  if (iVar3 == 5) {
    if (local_448._4_2_ != 0x34 || local_448._0_4_ != 0x3230312d) goto LAB_0011c907;
  }
  else {
LAB_0011c907:
    main_cold_354();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%+ i",0x400);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_355();
  }
  if (iVar3 == 5) {
    if (local_448._4_2_ != 0x34 || local_448._0_4_ != 0x3230312b) goto LAB_0011c918;
  }
  else {
LAB_0011c918:
    main_cold_356();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%+ i",0xfffffc00);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_357();
  }
  if (iVar3 == 5) {
    if (local_448._4_2_ != 0x34 || local_448._0_4_ != 0x3230312d) goto LAB_0011c929;
  }
  else {
LAB_0011c929:
    main_cold_358();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%+ u",0x400);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_359();
  }
  if (iVar3 == 4) {
    if (local_448[4] != '\0' || local_448._0_4_ != 0x34323031) goto LAB_0011c93a;
  }
  else {
LAB_0011c93a:
    main_cold_360();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%+ u",0xfffffc00);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_361();
  }
  if (iVar3 == 10) {
    uVar2 = local_448._0_8_;
    if (local_448._3_8_ != 0x32373236363934 || uVar2 != 0x3236363934393234) goto LAB_0011c94b;
  }
  else {
LAB_0011c94b:
    main_cold_362();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%+ o",0x1ff);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_363();
  }
  if ((iVar3 != 3) || (local_448._0_4_ != 0x373737)) {
    main_cold_364();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%+ o",0xfffffe01);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_365();
  }
  if (iVar3 == 0xb) {
    if (local_448._8_4_ != 0x313030 || local_448._0_8_ != 0x3737373737373733) goto LAB_0011c95c;
  }
  else {
LAB_0011c95c:
    main_cold_366();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%+ x",0x1234abcd);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_367();
  }
  if (iVar3 == 8) {
    if (local_448[8] != '\0' || local_448._0_8_ != 0x6463626134333231) goto LAB_0011c96d;
  }
  else {
LAB_0011c96d:
    main_cold_368();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%+ x",0xedcb5433);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_369();
  }
  if (iVar3 == 8) {
    if (local_448[8] != '\0' || local_448._0_8_ != 0x3333343562636465) goto LAB_0011c97e;
  }
  else {
LAB_0011c97e:
    main_cold_370();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%+ X",0x1234abcd);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_371();
  }
  if (iVar3 == 8) {
    if (local_448[8] != '\0' || local_448._0_8_ != 0x4443424134333231) goto LAB_0011c98f;
  }
  else {
LAB_0011c98f:
    main_cold_372();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%+ X",0xedcb5433);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_373();
  }
  if (iVar3 == 8) {
    if (local_448[8] != '\0' || local_448._0_8_ != 0x3333343542434445) goto LAB_0011c9a0;
  }
  else {
LAB_0011c9a0:
    main_cold_374();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%+ c",0x78);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_375();
  }
  if ((iVar3 != 1) || (local_448._0_2_ != 0x78)) {
    main_cold_376();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%#o",0x1ff);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_377();
  }
  if (iVar3 == 4) {
    if (local_448[4] != '\0' || local_448._0_4_ != 0x37373730) goto LAB_0011c9b1;
  }
  else {
LAB_0011c9b1:
    main_cold_378();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%#o",0xfffffe01);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_379();
  }
  if (iVar3 == 0xc) {
    uVar2 = local_448._0_8_;
    if (local_448._5_8_ != 0x31303037373737 || uVar2 != 0x3737373737373330) goto LAB_0011c9c2;
  }
  else {
LAB_0011c9c2:
    main_cold_380();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%#x",0x1234abcd);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_381();
  }
  if (iVar3 == 10) {
    uVar2 = local_448._0_8_;
    if (local_448._3_8_ != 0x64636261343332 || uVar2 != 0x6261343332317830) goto LAB_0011c9d3;
  }
  else {
LAB_0011c9d3:
    main_cold_382();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%#x",0xedcb5433);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_383();
  }
  if (iVar3 == 10) {
    uVar2 = local_448._0_8_;
    if (local_448._3_8_ != 0x33333435626364 || uVar2 != 0x3435626364657830) goto LAB_0011c9e4;
  }
  else {
LAB_0011c9e4:
    main_cold_384();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%#X",0x1234abcd);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_385();
  }
  if (iVar3 == 10) {
    uVar2 = local_448._0_8_;
    if (local_448._3_8_ != 0x44434241343332 || uVar2 != 0x4241343332315830) goto LAB_0011c9f5;
  }
  else {
LAB_0011c9f5:
    main_cold_386();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%#X",0xedcb5433);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_387();
  }
  if (iVar3 == 10) {
    uVar2 = local_448._0_8_;
    if (local_448._3_8_ != 0x33333435424344 || uVar2 != 0x3435424344455830) goto LAB_0011ca06;
  }
  else {
LAB_0011ca06:
    main_cold_388();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%#o",0);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_389();
  }
  if ((iVar3 != 1) || (local_448._0_2_ != 0x30)) {
    main_cold_390();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%#x",0);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_391();
  }
  if ((iVar3 != 1) || (local_448._0_2_ != 0x30)) {
    main_cold_392();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%#X",0);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_393();
  }
  if ((iVar3 != 1) || (local_448._0_2_ != 0x30)) {
    main_cold_394();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%1s","Hallo heimur");
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_395();
  }
  if (iVar3 == 0xc) {
    uVar2 = local_448._0_8_;
    if (local_448._5_8_ != 0x72756d69656820 || uVar2 != 0x6568206f6c6c6148) goto LAB_0011ca17;
  }
  else {
LAB_0011ca17:
    main_cold_396();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%1d",0x400);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_397();
  }
  if (iVar3 == 4) {
    if (local_448[4] != '\0' || local_448._0_4_ != 0x34323031) goto LAB_0011ca28;
  }
  else {
LAB_0011ca28:
    main_cold_398();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%1d",0xfffffc00);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_399();
  }
  if (iVar3 == 5) {
    if (local_448._4_2_ != 0x34 || local_448._0_4_ != 0x3230312d) goto LAB_0011ca39;
  }
  else {
LAB_0011ca39:
    main_cold_400();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%1i",0x400);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_401();
  }
  if (iVar3 == 4) {
    if (local_448[4] != '\0' || local_448._0_4_ != 0x34323031) goto LAB_0011ca4a;
  }
  else {
LAB_0011ca4a:
    main_cold_402();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%1i",0xfffffc00);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_403();
  }
  if (iVar3 == 5) {
    if (local_448._4_2_ != 0x34 || local_448._0_4_ != 0x3230312d) goto LAB_0011ca5b;
  }
  else {
LAB_0011ca5b:
    main_cold_404();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%1u",0x400);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_405();
  }
  if (iVar3 == 4) {
    if (local_448[4] != '\0' || local_448._0_4_ != 0x34323031) goto LAB_0011ca6c;
  }
  else {
LAB_0011ca6c:
    main_cold_406();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%1u",0xfffffc00);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_407();
  }
  if (iVar3 == 10) {
    uVar2 = local_448._0_8_;
    if (local_448._3_8_ != 0x32373236363934 || uVar2 != 0x3236363934393234) goto LAB_0011ca7d;
  }
  else {
LAB_0011ca7d:
    main_cold_408();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%1o",0x1ff);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_409();
  }
  if ((iVar3 != 3) || (local_448._0_4_ != 0x373737)) {
    main_cold_410();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%1o",0xfffffe01);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_411();
  }
  if (iVar3 == 0xb) {
    if (local_448._8_4_ != 0x313030 || local_448._0_8_ != 0x3737373737373733) goto LAB_0011ca8e;
  }
  else {
LAB_0011ca8e:
    main_cold_412();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%1x",0x1234abcd);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_413();
  }
  if (iVar3 == 8) {
    if (local_448[8] != '\0' || local_448._0_8_ != 0x6463626134333231) goto LAB_0011ca9f;
  }
  else {
LAB_0011ca9f:
    main_cold_414();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%1x",0xedcb5433);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_415();
  }
  if (iVar3 == 8) {
    if (local_448[8] != '\0' || local_448._0_8_ != 0x3333343562636465) goto LAB_0011cab0;
  }
  else {
LAB_0011cab0:
    main_cold_416();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%1X",0x1234abcd);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_417();
  }
  if (iVar3 == 8) {
    if (local_448[8] != '\0' || local_448._0_8_ != 0x4443424134333231) goto LAB_0011cac1;
  }
  else {
LAB_0011cac1:
    main_cold_418();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%1X",0xedcb5433);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_419();
  }
  if (iVar3 == 8) {
    if (local_448[8] != '\0' || local_448._0_8_ != 0x3333343542434445) goto LAB_0011cad2;
  }
  else {
LAB_0011cad2:
    main_cold_420();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%1c",0x78);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_421();
  }
  if ((iVar3 != 1) || (local_448._0_2_ != 0x78)) {
    main_cold_422();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%20s","Hallo");
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_423();
  }
  local_278 = 0x6f6c6c61482020;
  uStack_270 = 0;
  local_1d8 = 0x4820202020202020;
  uStack_1d0 = 0;
  local_3d8 = ' ';
  cStack_3d7 = ' ';
  cStack_3d6 = ' ';
  cStack_3d5 = ' ';
  cStack_3d4 = ' ';
  cStack_3d3 = ' ';
  cStack_3d2 = ' ';
  cStack_3d1 = ' ';
  uStack_3d0 = 0;
  uStack_3ce = 0;
  if (iVar3 == 0x14) {
    auVar17[0] = -(local_448[0] == ' ');
    auVar17[1] = -(local_448[1] == ' ');
    auVar17[2] = -(local_448[2] == ' ');
    auVar17[3] = -(local_448[3] == ' ');
    auVar17[4] = -(local_448[4] == ' ');
    auVar17[5] = -(local_448[5] == ' ');
    auVar17[6] = -(local_448[6] == ' ');
    auVar17[7] = -(local_448[7] == ' ');
    auVar17[8] = -(local_448[8] == ' ');
    auVar17[9] = -(local_448[9] == ' ');
    auVar17[10] = -(local_448[10] == ' ');
    auVar17[0xb] = -(local_448[0xb] == ' ');
    auVar17[0xc] = -(local_448[0xc] == ' ');
    auVar17[0xd] = -(local_448[0xd] == ' ');
    auVar17[0xe] = -(local_448[0xe] == ' ');
    auVar17[0xf] = -(local_448[0xf] == 'H');
    auVar189[0] = -(local_448[5] == ' ');
    auVar189[1] = -(local_448[6] == ' ');
    auVar189[2] = -(local_448[7] == ' ');
    auVar189[3] = -(local_448[8] == ' ');
    auVar189[4] = -(local_448[9] == ' ');
    auVar189[5] = -(local_448[10] == ' ');
    auVar189[6] = -(local_448[0xb] == ' ');
    auVar189[7] = -(local_448[0xc] == ' ');
    auVar189[8] = -(local_448[0xd] == ' ');
    auVar189[9] = -(local_448[0xe] == ' ');
    auVar189[10] = -(local_448[0xf] == 'H');
    auVar189[0xb] = -(local_438[0] == 'a');
    auVar189[0xc] = -(local_438[1] == 'l');
    auVar189[0xd] = -(local_438[2] == 'l');
    auVar189[0xe] = -(local_438[3] == 'o');
    auVar189[0xf] = -(local_438[4] == '\0');
    auVar17 = auVar17 & auVar189;
    if ((ushort)((ushort)(SUB161(auVar17 >> 7,0) & 1) | (ushort)(SUB161(auVar17 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar17 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar17 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar17 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar17 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar17 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar17 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar17 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar17 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar17 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar17 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar17 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar17 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar17 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar17[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011cae3;
  }
  else {
LAB_0011cae3:
    main_cold_424();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%20d",0x400);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_425();
  }
  local_358 = 0x34323031202020;
  uStack_350 = 0;
  if (iVar3 == 0x14) {
    auVar18[0] = -(local_3d8 == local_448[0]);
    auVar18[1] = -(cStack_3d7 == local_448[1]);
    auVar18[2] = -(cStack_3d6 == local_448[2]);
    auVar18[3] = -(cStack_3d5 == local_448[3]);
    auVar18[4] = -(cStack_3d4 == local_448[4]);
    auVar18[5] = -(cStack_3d3 == local_448[5]);
    auVar18[6] = -(cStack_3d2 == local_448[6]);
    auVar18[7] = -(cStack_3d1 == local_448[7]);
    auVar18[8] = -(local_3d8 == local_448[8]);
    auVar18[9] = -(cStack_3d7 == local_448[9]);
    auVar18[10] = -(cStack_3d6 == local_448[10]);
    auVar18[0xb] = -(cStack_3d5 == local_448[0xb]);
    auVar18[0xc] = -(cStack_3d4 == local_448[0xc]);
    auVar18[0xd] = -(cStack_3d3 == local_448[0xd]);
    auVar18[0xe] = -(cStack_3d2 == local_448[0xe]);
    auVar18[0xf] = -(cStack_3d1 == local_448[0xf]);
    auVar190[0] = -(local_3d8 == local_448[5]);
    auVar190[1] = -(cStack_3d7 == local_448[6]);
    auVar190[2] = -(cStack_3d6 == local_448[7]);
    auVar190[3] = -(cStack_3d5 == local_448[8]);
    auVar190[4] = -(cStack_3d4 == local_448[9]);
    auVar190[5] = -(cStack_3d3 == local_448[10]);
    auVar190[6] = -(cStack_3d2 == local_448[0xb]);
    auVar190[7] = -(cStack_3d1 == local_448[0xc]);
    auVar190[8] = -(local_448[0xd] == ' ');
    auVar190[9] = -(local_448[0xe] == ' ');
    auVar190[10] = -(local_448[0xf] == ' ');
    auVar190[0xb] = -(local_438[0] == '1');
    auVar190[0xc] = -(local_438[1] == '0');
    auVar190[0xd] = -(local_438[2] == '2');
    auVar190[0xe] = -(local_438[3] == '4');
    auVar190[0xf] = -(local_438[4] == '\0');
    auVar18 = auVar18 & auVar190;
    if ((ushort)((ushort)(SUB161(auVar18 >> 7,0) & 1) | (ushort)(SUB161(auVar18 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar18 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar18 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar18 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar18 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar18 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar18 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar18 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar18 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar18 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar18 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar18 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar18 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar18 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar18[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011caf4;
  }
  else {
LAB_0011caf4:
    main_cold_426();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%20d",0xfffffc00);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_427();
  }
  local_288 = 0x343230312d2020;
  uStack_280 = 0;
  local_298 = 0x2d20202020202020;
  uStack_290 = 0;
  if (iVar3 == 0x14) {
    auVar19[0] = -(local_3d8 == local_448[0]);
    auVar19[1] = -(cStack_3d7 == local_448[1]);
    auVar19[2] = -(cStack_3d6 == local_448[2]);
    auVar19[3] = -(cStack_3d5 == local_448[3]);
    auVar19[4] = -(cStack_3d4 == local_448[4]);
    auVar19[5] = -(cStack_3d3 == local_448[5]);
    auVar19[6] = -(cStack_3d2 == local_448[6]);
    auVar19[7] = -(cStack_3d1 == local_448[7]);
    auVar19[8] = -(local_448[8] == ' ');
    auVar19[9] = -(local_448[9] == ' ');
    auVar19[10] = -(local_448[10] == ' ');
    auVar19[0xb] = -(local_448[0xb] == ' ');
    auVar19[0xc] = -(local_448[0xc] == ' ');
    auVar19[0xd] = -(local_448[0xd] == ' ');
    auVar19[0xe] = -(local_448[0xe] == ' ');
    auVar19[0xf] = -(local_448[0xf] == '-');
    auVar191[0] = -(local_3d8 == local_448[5]);
    auVar191[1] = -(cStack_3d7 == local_448[6]);
    auVar191[2] = -(cStack_3d6 == local_448[7]);
    auVar191[3] = -(cStack_3d5 == local_448[8]);
    auVar191[4] = -(cStack_3d4 == local_448[9]);
    auVar191[5] = -(cStack_3d3 == local_448[10]);
    auVar191[6] = -(cStack_3d2 == local_448[0xb]);
    auVar191[7] = -(cStack_3d1 == local_448[0xc]);
    auVar191[8] = -(local_448[0xd] == ' ');
    auVar191[9] = -(local_448[0xe] == ' ');
    auVar191[10] = -(local_448[0xf] == '-');
    auVar191[0xb] = -(local_438[0] == '1');
    auVar191[0xc] = -(local_438[1] == '0');
    auVar191[0xd] = -(local_438[2] == '2');
    auVar191[0xe] = -(local_438[3] == '4');
    auVar191[0xf] = -(local_438[4] == '\0');
    auVar19 = auVar19 & auVar191;
    if ((ushort)((ushort)(SUB161(auVar19 >> 7,0) & 1) | (ushort)(SUB161(auVar19 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar19 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar19 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar19 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar19 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar19 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar19 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar19 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar19 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar19 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar19 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar19 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar19 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar19 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar19[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011cb05;
  }
  else {
LAB_0011cb05:
    main_cold_428();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%20i",0x400);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_429();
  }
  if (iVar3 == 0x14) {
    auVar20[0] = -(local_3d8 == local_448[0]);
    auVar20[1] = -(cStack_3d7 == local_448[1]);
    auVar20[2] = -(cStack_3d6 == local_448[2]);
    auVar20[3] = -(cStack_3d5 == local_448[3]);
    auVar20[4] = -(cStack_3d4 == local_448[4]);
    auVar20[5] = -(cStack_3d3 == local_448[5]);
    auVar20[6] = -(cStack_3d2 == local_448[6]);
    auVar20[7] = -(cStack_3d1 == local_448[7]);
    auVar20[8] = -(local_3d8 == local_448[8]);
    auVar20[9] = -(cStack_3d7 == local_448[9]);
    auVar20[10] = -(cStack_3d6 == local_448[10]);
    auVar20[0xb] = -(cStack_3d5 == local_448[0xb]);
    auVar20[0xc] = -(cStack_3d4 == local_448[0xc]);
    auVar20[0xd] = -(cStack_3d3 == local_448[0xd]);
    auVar20[0xe] = -(cStack_3d2 == local_448[0xe]);
    auVar20[0xf] = -(cStack_3d1 == local_448[0xf]);
    auVar192[0] = -(local_3d8 == local_448[5]);
    auVar192[1] = -(cStack_3d7 == local_448[6]);
    auVar192[2] = -(cStack_3d6 == local_448[7]);
    auVar192[3] = -(cStack_3d5 == local_448[8]);
    auVar192[4] = -(cStack_3d4 == local_448[9]);
    auVar192[5] = -(cStack_3d3 == local_448[10]);
    auVar192[6] = -(cStack_3d2 == local_448[0xb]);
    auVar192[7] = -(cStack_3d1 == local_448[0xc]);
    auVar192[8] = -((char)local_358 == local_448[0xd]);
    auVar192[9] = -((char)((ulong)local_358 >> 8) == local_448[0xe]);
    auVar192[10] = -((char)((ulong)local_358 >> 0x10) == local_448[0xf]);
    auVar192[0xb] = -((char)((ulong)local_358 >> 0x18) == local_438[0]);
    auVar192[0xc] = -((char)((ulong)local_358 >> 0x20) == local_438[1]);
    auVar192[0xd] = -((char)((ulong)local_358 >> 0x28) == local_438[2]);
    auVar192[0xe] = -((char)((ulong)local_358 >> 0x30) == local_438[3]);
    auVar192[0xf] = -((char)((ulong)local_358 >> 0x38) == local_438[4]);
    auVar20 = auVar20 & auVar192;
    if ((ushort)((ushort)(SUB161(auVar20 >> 7,0) & 1) | (ushort)(SUB161(auVar20 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar20 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar20 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar20 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar20 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar20 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar20 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar20 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar20 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar20 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar20 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar20 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar20 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar20 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar20[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011cb16;
  }
  else {
LAB_0011cb16:
    main_cold_430();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%20i",0xfffffc00);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_431();
  }
  if (iVar3 == 0x14) {
    auVar21[0] = -(local_3d8 == local_448[0]);
    auVar21[1] = -(cStack_3d7 == local_448[1]);
    auVar21[2] = -(cStack_3d6 == local_448[2]);
    auVar21[3] = -(cStack_3d5 == local_448[3]);
    auVar21[4] = -(cStack_3d4 == local_448[4]);
    auVar21[5] = -(cStack_3d3 == local_448[5]);
    auVar21[6] = -(cStack_3d2 == local_448[6]);
    auVar21[7] = -(cStack_3d1 == local_448[7]);
    auVar21[8] = -((char)local_298 == local_448[8]);
    auVar21[9] = -((char)((ulong)local_298 >> 8) == local_448[9]);
    auVar21[10] = -((char)((ulong)local_298 >> 0x10) == local_448[10]);
    auVar21[0xb] = -((char)((ulong)local_298 >> 0x18) == local_448[0xb]);
    auVar21[0xc] = -((char)((ulong)local_298 >> 0x20) == local_448[0xc]);
    auVar21[0xd] = -((char)((ulong)local_298 >> 0x28) == local_448[0xd]);
    auVar21[0xe] = -((char)((ulong)local_298 >> 0x30) == local_448[0xe]);
    auVar21[0xf] = -((char)((ulong)local_298 >> 0x38) == local_448[0xf]);
    auVar193[0] = -(local_3d8 == local_448[5]);
    auVar193[1] = -(cStack_3d7 == local_448[6]);
    auVar193[2] = -(cStack_3d6 == local_448[7]);
    auVar193[3] = -(cStack_3d5 == local_448[8]);
    auVar193[4] = -(cStack_3d4 == local_448[9]);
    auVar193[5] = -(cStack_3d3 == local_448[10]);
    auVar193[6] = -(cStack_3d2 == local_448[0xb]);
    auVar193[7] = -(cStack_3d1 == local_448[0xc]);
    auVar193[8] = -((char)local_288 == local_448[0xd]);
    auVar193[9] = -((char)((ulong)local_288 >> 8) == local_448[0xe]);
    auVar193[10] = -((char)((ulong)local_288 >> 0x10) == local_448[0xf]);
    auVar193[0xb] = -((char)((ulong)local_288 >> 0x18) == local_438[0]);
    auVar193[0xc] = -((char)((ulong)local_288 >> 0x20) == local_438[1]);
    auVar193[0xd] = -((char)((ulong)local_288 >> 0x28) == local_438[2]);
    auVar193[0xe] = -((char)((ulong)local_288 >> 0x30) == local_438[3]);
    auVar193[0xf] = -((char)((ulong)local_288 >> 0x38) == local_438[4]);
    auVar21 = auVar21 & auVar193;
    if ((ushort)((ushort)(SUB161(auVar21 >> 7,0) & 1) | (ushort)(SUB161(auVar21 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar21 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar21 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar21 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar21 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar21 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar21 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar21 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar21 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar21 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar21 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar21 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar21 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar21 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar21[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011cb27;
  }
  else {
LAB_0011cb27:
    main_cold_432();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%20u",0x400);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_433();
  }
  if (iVar3 == 0x14) {
    auVar22[0] = -(local_3d8 == local_448[0]);
    auVar22[1] = -(cStack_3d7 == local_448[1]);
    auVar22[2] = -(cStack_3d6 == local_448[2]);
    auVar22[3] = -(cStack_3d5 == local_448[3]);
    auVar22[4] = -(cStack_3d4 == local_448[4]);
    auVar22[5] = -(cStack_3d3 == local_448[5]);
    auVar22[6] = -(cStack_3d2 == local_448[6]);
    auVar22[7] = -(cStack_3d1 == local_448[7]);
    auVar22[8] = -(local_3d8 == local_448[8]);
    auVar22[9] = -(cStack_3d7 == local_448[9]);
    auVar22[10] = -(cStack_3d6 == local_448[10]);
    auVar22[0xb] = -(cStack_3d5 == local_448[0xb]);
    auVar22[0xc] = -(cStack_3d4 == local_448[0xc]);
    auVar22[0xd] = -(cStack_3d3 == local_448[0xd]);
    auVar22[0xe] = -(cStack_3d2 == local_448[0xe]);
    auVar22[0xf] = -(cStack_3d1 == local_448[0xf]);
    auVar194[0] = -(local_3d8 == local_448[5]);
    auVar194[1] = -(cStack_3d7 == local_448[6]);
    auVar194[2] = -(cStack_3d6 == local_448[7]);
    auVar194[3] = -(cStack_3d5 == local_448[8]);
    auVar194[4] = -(cStack_3d4 == local_448[9]);
    auVar194[5] = -(cStack_3d3 == local_448[10]);
    auVar194[6] = -(cStack_3d2 == local_448[0xb]);
    auVar194[7] = -(cStack_3d1 == local_448[0xc]);
    auVar194[8] = -((char)local_358 == local_448[0xd]);
    auVar194[9] = -((char)((ulong)local_358 >> 8) == local_448[0xe]);
    auVar194[10] = -((char)((ulong)local_358 >> 0x10) == local_448[0xf]);
    auVar194[0xb] = -((char)((ulong)local_358 >> 0x18) == local_438[0]);
    auVar194[0xc] = -((char)((ulong)local_358 >> 0x20) == local_438[1]);
    auVar194[0xd] = -((char)((ulong)local_358 >> 0x28) == local_438[2]);
    auVar194[0xe] = -((char)((ulong)local_358 >> 0x30) == local_438[3]);
    auVar194[0xf] = -((char)((ulong)local_358 >> 0x38) == local_438[4]);
    auVar22 = auVar22 & auVar194;
    if ((ushort)((ushort)(SUB161(auVar22 >> 7,0) & 1) | (ushort)(SUB161(auVar22 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar22 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar22 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar22 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar22 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar22 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar22 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar22 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar22 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar22 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar22 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar22 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar22 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar22 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar22[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011cb38;
  }
  else {
LAB_0011cb38:
    main_cold_434();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%20u",0xfffffc00);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_435();
  }
  local_258 = 0x3932342020202020;
  uStack_250 = 0;
  local_2ec[1] = 0x36363934;
  local_2ec[2] = 0x323732;
  local_2ec[3] = 0;
  local_2ec[4] = 0;
  local_268 = 0x3639343932342020;
  uStack_260 = 0;
  if (iVar3 == 0x14) {
    auVar23[0] = -(local_3d8 == local_448[0]);
    auVar23[1] = -(cStack_3d7 == local_448[1]);
    auVar23[2] = -(cStack_3d6 == local_448[2]);
    auVar23[3] = -(cStack_3d5 == local_448[3]);
    auVar23[4] = -(cStack_3d4 == local_448[4]);
    auVar23[5] = -(cStack_3d3 == local_448[5]);
    auVar23[6] = -(cStack_3d2 == local_448[6]);
    auVar23[7] = -(cStack_3d1 == local_448[7]);
    auVar23[8] = -(local_448[8] == ' ');
    auVar23[9] = -(local_448[9] == ' ');
    auVar23[10] = -(local_448[10] == '4');
    auVar23[0xb] = -(local_448[0xb] == '2');
    auVar23[0xc] = -(local_448[0xc] == '9');
    auVar23[0xd] = -(local_448[0xd] == '4');
    auVar23[0xe] = -(local_448[0xe] == '9');
    auVar23[0xf] = -(local_448[0xf] == '6');
    auVar195[0] = -(local_448[5] == ' ');
    auVar195[1] = -(local_448[6] == ' ');
    auVar195[2] = -(local_448[7] == ' ');
    auVar195[3] = -(local_448[8] == ' ');
    auVar195[4] = -(local_448[9] == ' ');
    auVar195[5] = -(local_448[10] == '4');
    auVar195[6] = -(local_448[0xb] == '2');
    auVar195[7] = -(local_448[0xc] == '9');
    auVar195[8] = -(local_448[0xd] == '4');
    auVar195[9] = -(local_448[0xe] == '9');
    auVar195[10] = -(local_448[0xf] == '6');
    auVar195[0xb] = -(local_438[0] == '6');
    auVar195[0xc] = -(local_438[1] == '2');
    auVar195[0xd] = -(local_438[2] == '7');
    auVar195[0xe] = -(local_438[3] == '2');
    auVar195[0xf] = -(local_438[4] == '\0');
    auVar23 = auVar23 & auVar195;
    if ((ushort)((ushort)(SUB161(auVar23 >> 7,0) & 1) | (ushort)(SUB161(auVar23 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar23 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar23 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar23 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar23 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar23 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar23 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar23 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar23 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar23 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar23 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar23 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar23 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar23 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar23[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011cb49;
  }
  else {
LAB_0011cb49:
    main_cold_436();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%20o",0x1ff);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_437();
  }
  local_1c8 = 0x37373720202020;
  uStack_1c0 = 0;
  if (iVar3 == 0x14) {
    auVar24[0] = -(local_3d8 == local_448[0]);
    auVar24[1] = -(cStack_3d7 == local_448[1]);
    auVar24[2] = -(cStack_3d6 == local_448[2]);
    auVar24[3] = -(cStack_3d5 == local_448[3]);
    auVar24[4] = -(cStack_3d4 == local_448[4]);
    auVar24[5] = -(cStack_3d3 == local_448[5]);
    auVar24[6] = -(cStack_3d2 == local_448[6]);
    auVar24[7] = -(cStack_3d1 == local_448[7]);
    auVar24[8] = -(local_3d8 == local_448[8]);
    auVar24[9] = -(cStack_3d7 == local_448[9]);
    auVar24[10] = -(cStack_3d6 == local_448[10]);
    auVar24[0xb] = -(cStack_3d5 == local_448[0xb]);
    auVar24[0xc] = -(cStack_3d4 == local_448[0xc]);
    auVar24[0xd] = -(cStack_3d3 == local_448[0xd]);
    auVar24[0xe] = -(cStack_3d2 == local_448[0xe]);
    auVar24[0xf] = -(cStack_3d1 == local_448[0xf]);
    auVar196[0] = -(local_3d8 == local_448[5]);
    auVar196[1] = -(cStack_3d7 == local_448[6]);
    auVar196[2] = -(cStack_3d6 == local_448[7]);
    auVar196[3] = -(cStack_3d5 == local_448[8]);
    auVar196[4] = -(cStack_3d4 == local_448[9]);
    auVar196[5] = -(cStack_3d3 == local_448[10]);
    auVar196[6] = -(cStack_3d2 == local_448[0xb]);
    auVar196[7] = -(cStack_3d1 == local_448[0xc]);
    auVar196[8] = -(local_448[0xd] == ' ');
    auVar196[9] = -(local_448[0xe] == ' ');
    auVar196[10] = -(local_448[0xf] == ' ');
    auVar196[0xb] = -(local_438[0] == ' ');
    auVar196[0xc] = -(local_438[1] == '7');
    auVar196[0xd] = -(local_438[2] == '7');
    auVar196[0xe] = -(local_438[3] == '7');
    auVar196[0xf] = -(local_438[4] == '\0');
    auVar24 = auVar24 & auVar196;
    if ((ushort)((ushort)(SUB161(auVar24 >> 7,0) & 1) | (ushort)(SUB161(auVar24 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar24 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar24 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar24 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar24 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar24 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar24 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar24 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar24 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar24 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar24 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar24 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar24 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar24 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar24[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011cb5a;
  }
  else {
LAB_0011cb5a:
    main_cold_438();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%20o",0xfffffe01);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_439();
  }
  local_238 = 0x3737373320202020;
  uStack_230 = 0;
  local_348 = 0x31303037373737;
  uStack_340 = 0;
  local_248 = 0x3737373737373320;
  uStack_240 = 0;
  if (iVar3 == 0x14) {
    auVar25[0] = -(local_3d8 == local_448[0]);
    auVar25[1] = -(cStack_3d7 == local_448[1]);
    auVar25[2] = -(cStack_3d6 == local_448[2]);
    auVar25[3] = -(cStack_3d5 == local_448[3]);
    auVar25[4] = -(cStack_3d4 == local_448[4]);
    auVar25[5] = -(cStack_3d3 == local_448[5]);
    auVar25[6] = -(cStack_3d2 == local_448[6]);
    auVar25[7] = -(cStack_3d1 == local_448[7]);
    auVar25[8] = -(local_448[8] == ' ');
    auVar25[9] = -(local_448[9] == '3');
    auVar25[10] = -(local_448[10] == '7');
    auVar25[0xb] = -(local_448[0xb] == '7');
    auVar25[0xc] = -(local_448[0xc] == '7');
    auVar25[0xd] = -(local_448[0xd] == '7');
    auVar25[0xe] = -(local_448[0xe] == '7');
    auVar25[0xf] = -(local_448[0xf] == '7');
    auVar197[0] = -(local_448[5] == ' ');
    auVar197[1] = -(local_448[6] == ' ');
    auVar197[2] = -(local_448[7] == ' ');
    auVar197[3] = -(local_448[8] == ' ');
    auVar197[4] = -(local_448[9] == '3');
    auVar197[5] = -(local_448[10] == '7');
    auVar197[6] = -(local_448[0xb] == '7');
    auVar197[7] = -(local_448[0xc] == '7');
    auVar197[8] = -(local_448[0xd] == '7');
    auVar197[9] = -(local_448[0xe] == '7');
    auVar197[10] = -(local_448[0xf] == '7');
    auVar197[0xb] = -(local_438[0] == '7');
    auVar197[0xc] = -(local_438[1] == '0');
    auVar197[0xd] = -(local_438[2] == '0');
    auVar197[0xe] = -(local_438[3] == '1');
    auVar197[0xf] = -(local_438[4] == '\0');
    auVar25 = auVar25 & auVar197;
    if ((ushort)((ushort)(SUB161(auVar25 >> 7,0) & 1) | (ushort)(SUB161(auVar25 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar25 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar25 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar25 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar25 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar25 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar25 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar25 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar25 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar25 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar25 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar25 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar25 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar25 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar25[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011cb6b;
  }
  else {
LAB_0011cb6b:
    main_cold_440();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%20x",0x1234abcd);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_441();
  }
  local_398 = 0x3120202020202020;
  uStack_390 = 0;
  local_388 = 0x3433323120202020;
  uStack_380 = 0;
  local_328 = 0x64636261343332;
  uStack_320 = 0;
  if (iVar3 == 0x14) {
    auVar26[0] = -(local_3d8 == local_448[0]);
    auVar26[1] = -(cStack_3d7 == local_448[1]);
    auVar26[2] = -(cStack_3d6 == local_448[2]);
    auVar26[3] = -(cStack_3d5 == local_448[3]);
    auVar26[4] = -(cStack_3d4 == local_448[4]);
    auVar26[5] = -(cStack_3d3 == local_448[5]);
    auVar26[6] = -(cStack_3d2 == local_448[6]);
    auVar26[7] = -(cStack_3d1 == local_448[7]);
    auVar26[8] = -(local_448[8] == ' ');
    auVar26[9] = -(local_448[9] == ' ');
    auVar26[10] = -(local_448[10] == ' ');
    auVar26[0xb] = -(local_448[0xb] == ' ');
    auVar26[0xc] = -(local_448[0xc] == '1');
    auVar26[0xd] = -(local_448[0xd] == '2');
    auVar26[0xe] = -(local_448[0xe] == '3');
    auVar26[0xf] = -(local_448[0xf] == '4');
    auVar198[0] = -(local_448[5] == ' ');
    auVar198[1] = -(local_448[6] == ' ');
    auVar198[2] = -(local_448[7] == ' ');
    auVar198[3] = -(local_448[8] == ' ');
    auVar198[4] = -(local_448[9] == ' ');
    auVar198[5] = -(local_448[10] == ' ');
    auVar198[6] = -(local_448[0xb] == ' ');
    auVar198[7] = -(local_448[0xc] == '1');
    auVar198[8] = -(local_448[0xd] == '2');
    auVar198[9] = -(local_448[0xe] == '3');
    auVar198[10] = -(local_448[0xf] == '4');
    auVar198[0xb] = -(local_438[0] == 'a');
    auVar198[0xc] = -(local_438[1] == 'b');
    auVar198[0xd] = -(local_438[2] == 'c');
    auVar198[0xe] = -(local_438[3] == 'd');
    auVar198[0xf] = -(local_438[4] == '\0');
    auVar26 = auVar26 & auVar198;
    if ((ushort)((ushort)(SUB161(auVar26 >> 7,0) & 1) | (ushort)(SUB161(auVar26 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar26 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar26 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar26 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar26 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar26 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar26 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar26 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar26 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar26 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar26 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar26 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar26 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar26 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar26[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011cb7c;
  }
  else {
LAB_0011cb7c:
    main_cold_442();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%20x",0xedcb5433);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_443();
  }
  local_1a8 = 0x6520202020202020;
  uStack_1a0 = 0;
  local_338 = 0x33333435626364;
  uStack_330 = 0;
  local_1b8 = 0x6263646520202020;
  uStack_1b0 = 0;
  if (iVar3 == 0x14) {
    auVar27[0] = -(local_3d8 == local_448[0]);
    auVar27[1] = -(cStack_3d7 == local_448[1]);
    auVar27[2] = -(cStack_3d6 == local_448[2]);
    auVar27[3] = -(cStack_3d5 == local_448[3]);
    auVar27[4] = -(cStack_3d4 == local_448[4]);
    auVar27[5] = -(cStack_3d3 == local_448[5]);
    auVar27[6] = -(cStack_3d2 == local_448[6]);
    auVar27[7] = -(cStack_3d1 == local_448[7]);
    auVar27[8] = -(local_448[8] == ' ');
    auVar27[9] = -(local_448[9] == ' ');
    auVar27[10] = -(local_448[10] == ' ');
    auVar27[0xb] = -(local_448[0xb] == ' ');
    auVar27[0xc] = -(local_448[0xc] == 'e');
    auVar27[0xd] = -(local_448[0xd] == 'd');
    auVar27[0xe] = -(local_448[0xe] == 'c');
    auVar27[0xf] = -(local_448[0xf] == 'b');
    auVar199[0] = -(local_448[5] == ' ');
    auVar199[1] = -(local_448[6] == ' ');
    auVar199[2] = -(local_448[7] == ' ');
    auVar199[3] = -(local_448[8] == ' ');
    auVar199[4] = -(local_448[9] == ' ');
    auVar199[5] = -(local_448[10] == ' ');
    auVar199[6] = -(local_448[0xb] == ' ');
    auVar199[7] = -(local_448[0xc] == 'e');
    auVar199[8] = -(local_448[0xd] == 'd');
    auVar199[9] = -(local_448[0xe] == 'c');
    auVar199[10] = -(local_448[0xf] == 'b');
    auVar199[0xb] = -(local_438[0] == '5');
    auVar199[0xc] = -(local_438[1] == '4');
    auVar199[0xd] = -(local_438[2] == '3');
    auVar199[0xe] = -(local_438[3] == '3');
    auVar199[0xf] = -(local_438[4] == '\0');
    auVar27 = auVar27 & auVar199;
    if ((ushort)((ushort)(SUB161(auVar27 >> 7,0) & 1) | (ushort)(SUB161(auVar27 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar27 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar27 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar27 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar27 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar27 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar27 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar27 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar27 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar27 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar27 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar27 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar27 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar27 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar27[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011cb8d;
  }
  else {
LAB_0011cb8d:
    main_cold_444();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%20X",0x1234abcd);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_445();
  }
  local_308 = 0x44434241343332;
  uStack_300 = 0;
  if (iVar3 == 0x14) {
    auVar28[0] = -(local_3d8 == local_448[0]);
    auVar28[1] = -(cStack_3d7 == local_448[1]);
    auVar28[2] = -(cStack_3d6 == local_448[2]);
    auVar28[3] = -(cStack_3d5 == local_448[3]);
    auVar28[4] = -(cStack_3d4 == local_448[4]);
    auVar28[5] = -(cStack_3d3 == local_448[5]);
    auVar28[6] = -(cStack_3d2 == local_448[6]);
    auVar28[7] = -(cStack_3d1 == local_448[7]);
    auVar28[8] = -((char)local_388 == local_448[8]);
    auVar28[9] = -((char)((ulong)local_388 >> 8) == local_448[9]);
    auVar28[10] = -((char)((ulong)local_388 >> 0x10) == local_448[10]);
    auVar28[0xb] = -((char)((ulong)local_388 >> 0x18) == local_448[0xb]);
    auVar28[0xc] = -((char)((ulong)local_388 >> 0x20) == local_448[0xc]);
    auVar28[0xd] = -((char)((ulong)local_388 >> 0x28) == local_448[0xd]);
    auVar28[0xe] = -((char)((ulong)local_388 >> 0x30) == local_448[0xe]);
    auVar28[0xf] = -((char)((ulong)local_388 >> 0x38) == local_448[0xf]);
    auVar200[0] = -((char)local_398 == local_448[5]);
    auVar200[1] = -(local_398._1_1_ == local_448[6]);
    auVar200[2] = -(local_398._2_1_ == local_448[7]);
    auVar200[3] = -(local_398._3_1_ == local_448[8]);
    auVar200[4] = -(local_398._4_1_ == local_448[9]);
    auVar200[5] = -(local_398._5_1_ == local_448[10]);
    auVar200[6] = -(local_398._6_1_ == local_448[0xb]);
    auVar200[7] = -(local_398._7_1_ == local_448[0xc]);
    auVar200[8] = -(local_448[0xd] == '2');
    auVar200[9] = -(local_448[0xe] == '3');
    auVar200[10] = -(local_448[0xf] == '4');
    auVar200[0xb] = -(local_438[0] == 'A');
    auVar200[0xc] = -(local_438[1] == 'B');
    auVar200[0xd] = -(local_438[2] == 'C');
    auVar200[0xe] = -(local_438[3] == 'D');
    auVar200[0xf] = -(local_438[4] == '\0');
    auVar28 = auVar28 & auVar200;
    if ((ushort)((ushort)(SUB161(auVar28 >> 7,0) & 1) | (ushort)(SUB161(auVar28 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar28 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar28 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar28 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar28 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar28 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar28 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar28 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar28 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar28 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar28 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar28 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar28 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar28 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar28[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011cb9e;
  }
  else {
LAB_0011cb9e:
    main_cold_446();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%20X",0xedcb5433);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_447();
  }
  local_e8 = 0x4520202020202020;
  uStack_e0 = 0;
  local_318 = 0x33333435424344;
  uStack_310 = 0;
  local_168 = 0x4243444520202020;
  uStack_160 = 0;
  if (iVar3 == 0x14) {
    auVar29[0] = -(local_3d8 == local_448[0]);
    auVar29[1] = -(cStack_3d7 == local_448[1]);
    auVar29[2] = -(cStack_3d6 == local_448[2]);
    auVar29[3] = -(cStack_3d5 == local_448[3]);
    auVar29[4] = -(cStack_3d4 == local_448[4]);
    auVar29[5] = -(cStack_3d3 == local_448[5]);
    auVar29[6] = -(cStack_3d2 == local_448[6]);
    auVar29[7] = -(cStack_3d1 == local_448[7]);
    auVar29[8] = -(local_448[8] == ' ');
    auVar29[9] = -(local_448[9] == ' ');
    auVar29[10] = -(local_448[10] == ' ');
    auVar29[0xb] = -(local_448[0xb] == ' ');
    auVar29[0xc] = -(local_448[0xc] == 'E');
    auVar29[0xd] = -(local_448[0xd] == 'D');
    auVar29[0xe] = -(local_448[0xe] == 'C');
    auVar29[0xf] = -(local_448[0xf] == 'B');
    auVar201[0] = -(local_448[5] == ' ');
    auVar201[1] = -(local_448[6] == ' ');
    auVar201[2] = -(local_448[7] == ' ');
    auVar201[3] = -(local_448[8] == ' ');
    auVar201[4] = -(local_448[9] == ' ');
    auVar201[5] = -(local_448[10] == ' ');
    auVar201[6] = -(local_448[0xb] == ' ');
    auVar201[7] = -(local_448[0xc] == 'E');
    auVar201[8] = -(local_448[0xd] == 'D');
    auVar201[9] = -(local_448[0xe] == 'C');
    auVar201[10] = -(local_448[0xf] == 'B');
    auVar201[0xb] = -(local_438[0] == '5');
    auVar201[0xc] = -(local_438[1] == '4');
    auVar201[0xd] = -(local_438[2] == '3');
    auVar201[0xe] = -(local_438[3] == '3');
    auVar201[0xf] = -(local_438[4] == '\0');
    auVar29 = auVar29 & auVar201;
    if ((ushort)((ushort)(SUB161(auVar29 >> 7,0) & 1) | (ushort)(SUB161(auVar29 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar29 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar29 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar29 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar29 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar29 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar29 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar29 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar29 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar29 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar29 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar29 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar29 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar29 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar29[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011cbaf;
  }
  else {
LAB_0011cbaf:
    main_cold_448();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%20c",0x78);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_449();
  }
  local_48 = 0x78202020202020;
  uStack_40 = 0;
  if (iVar3 == 0x14) {
    auVar30[0] = -(local_3d8 == local_448[0]);
    auVar30[1] = -(cStack_3d7 == local_448[1]);
    auVar30[2] = -(cStack_3d6 == local_448[2]);
    auVar30[3] = -(cStack_3d5 == local_448[3]);
    auVar30[4] = -(cStack_3d4 == local_448[4]);
    auVar30[5] = -(cStack_3d3 == local_448[5]);
    auVar30[6] = -(cStack_3d2 == local_448[6]);
    auVar30[7] = -(cStack_3d1 == local_448[7]);
    auVar30[8] = -(local_3d8 == local_448[8]);
    auVar30[9] = -(cStack_3d7 == local_448[9]);
    auVar30[10] = -(cStack_3d6 == local_448[10]);
    auVar30[0xb] = -(cStack_3d5 == local_448[0xb]);
    auVar30[0xc] = -(cStack_3d4 == local_448[0xc]);
    auVar30[0xd] = -(cStack_3d3 == local_448[0xd]);
    auVar30[0xe] = -(cStack_3d2 == local_448[0xe]);
    auVar30[0xf] = -(cStack_3d1 == local_448[0xf]);
    auVar202[0] = -(local_3d8 == local_448[5]);
    auVar202[1] = -(cStack_3d7 == local_448[6]);
    auVar202[2] = -(cStack_3d6 == local_448[7]);
    auVar202[3] = -(cStack_3d5 == local_448[8]);
    auVar202[4] = -(cStack_3d4 == local_448[9]);
    auVar202[5] = -(cStack_3d3 == local_448[10]);
    auVar202[6] = -(cStack_3d2 == local_448[0xb]);
    auVar202[7] = -(cStack_3d1 == local_448[0xc]);
    auVar202[8] = -(local_448[0xd] == ' ');
    auVar202[9] = -(local_448[0xe] == ' ');
    auVar202[10] = -(local_448[0xf] == ' ');
    auVar202[0xb] = -(local_438[0] == ' ');
    auVar202[0xc] = -(local_438[1] == ' ');
    auVar202[0xd] = -(local_438[2] == ' ');
    auVar202[0xe] = -(local_438[3] == 'x');
    auVar202[0xf] = -(local_438[4] == '\0');
    auVar30 = auVar30 & auVar202;
    if ((ushort)((ushort)(SUB161(auVar30 >> 7,0) & 1) | (ushort)(SUB161(auVar30 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar30 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar30 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar30 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar30 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar30 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar30 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar30 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar30 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar30 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar30 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar30 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar30 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar30 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar30[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011cbc0;
  }
  else {
LAB_0011cbc0:
    main_cold_450();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%-20s","Hallo");
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_451();
  }
  local_118 = 0x2020206f6c6c6148;
  uStack_110 = 0;
  local_3c8 = 0x20202020202020;
  uStack_3c0 = 0;
  if (iVar3 == 0x14) {
    auVar31[0] = -(local_448[0] == 'H');
    auVar31[1] = -(local_448[1] == 'a');
    auVar31[2] = -(local_448[2] == 'l');
    auVar31[3] = -(local_448[3] == 'l');
    auVar31[4] = -(local_448[4] == 'o');
    auVar31[5] = -(local_448[5] == ' ');
    auVar31[6] = -(local_448[6] == ' ');
    auVar31[7] = -(local_448[7] == ' ');
    auVar31[8] = -(local_3d8 == local_448[8]);
    auVar31[9] = -(cStack_3d7 == local_448[9]);
    auVar31[10] = -(cStack_3d6 == local_448[10]);
    auVar31[0xb] = -(cStack_3d5 == local_448[0xb]);
    auVar31[0xc] = -(cStack_3d4 == local_448[0xc]);
    auVar31[0xd] = -(cStack_3d3 == local_448[0xd]);
    auVar31[0xe] = -(cStack_3d2 == local_448[0xe]);
    auVar31[0xf] = -(cStack_3d1 == local_448[0xf]);
    auVar203[0] = -(local_3d8 == local_448[5]);
    auVar203[1] = -(cStack_3d7 == local_448[6]);
    auVar203[2] = -(cStack_3d6 == local_448[7]);
    auVar203[3] = -(cStack_3d5 == local_448[8]);
    auVar203[4] = -(cStack_3d4 == local_448[9]);
    auVar203[5] = -(cStack_3d3 == local_448[10]);
    auVar203[6] = -(cStack_3d2 == local_448[0xb]);
    auVar203[7] = -(cStack_3d1 == local_448[0xc]);
    auVar203[8] = -(local_448[0xd] == ' ');
    auVar203[9] = -(local_448[0xe] == ' ');
    auVar203[10] = -(local_448[0xf] == ' ');
    auVar203[0xb] = -(local_438[0] == ' ');
    auVar203[0xc] = -(local_438[1] == ' ');
    auVar203[0xd] = -(local_438[2] == ' ');
    auVar203[0xe] = -(local_438[3] == ' ');
    auVar203[0xf] = -(local_438[4] == '\0');
    auVar31 = auVar31 & auVar203;
    if ((ushort)((ushort)(SUB161(auVar31 >> 7,0) & 1) | (ushort)(SUB161(auVar31 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar31 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar31 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar31 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar31 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar31 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar31 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar31 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar31 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar31 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar31 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar31 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar31 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar31 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar31[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011cbd1;
  }
  else {
LAB_0011cbd1:
    main_cold_452();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%-20d",0x400);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_453();
  }
  local_378 = 0x2020202034323031;
  uStack_370 = 0;
  if (iVar3 == 0x14) {
    auVar32[0] = -(local_448[0] == '1');
    auVar32[1] = -(local_448[1] == '0');
    auVar32[2] = -(local_448[2] == '2');
    auVar32[3] = -(local_448[3] == '4');
    auVar32[4] = -(local_448[4] == ' ');
    auVar32[5] = -(local_448[5] == ' ');
    auVar32[6] = -(local_448[6] == ' ');
    auVar32[7] = -(local_448[7] == ' ');
    auVar32[8] = -(local_3d8 == local_448[8]);
    auVar32[9] = -(cStack_3d7 == local_448[9]);
    auVar32[10] = -(cStack_3d6 == local_448[10]);
    auVar32[0xb] = -(cStack_3d5 == local_448[0xb]);
    auVar32[0xc] = -(cStack_3d4 == local_448[0xc]);
    auVar32[0xd] = -(cStack_3d3 == local_448[0xd]);
    auVar32[0xe] = -(cStack_3d2 == local_448[0xe]);
    auVar32[0xf] = -(cStack_3d1 == local_448[0xf]);
    auVar204[0] = -(local_3d8 == local_448[5]);
    auVar204[1] = -(cStack_3d7 == local_448[6]);
    auVar204[2] = -(cStack_3d6 == local_448[7]);
    auVar204[3] = -(cStack_3d5 == local_448[8]);
    auVar204[4] = -(cStack_3d4 == local_448[9]);
    auVar204[5] = -(cStack_3d3 == local_448[10]);
    auVar204[6] = -(cStack_3d2 == local_448[0xb]);
    auVar204[7] = -(cStack_3d1 == local_448[0xc]);
    auVar204[8] = -((char)local_3c8 == local_448[0xd]);
    auVar204[9] = -((char)((ulong)local_3c8 >> 8) == local_448[0xe]);
    auVar204[10] = -((char)((ulong)local_3c8 >> 0x10) == local_448[0xf]);
    auVar204[0xb] = -((char)((ulong)local_3c8 >> 0x18) == local_438[0]);
    auVar204[0xc] = -((char)((ulong)local_3c8 >> 0x20) == local_438[1]);
    auVar204[0xd] = -((char)((ulong)local_3c8 >> 0x28) == local_438[2]);
    auVar204[0xe] = -((char)((ulong)local_3c8 >> 0x30) == local_438[3]);
    auVar204[0xf] = -((char)((ulong)local_3c8 >> 0x38) == local_438[4]);
    auVar32 = auVar32 & auVar204;
    if ((ushort)((ushort)(SUB161(auVar32 >> 7,0) & 1) | (ushort)(SUB161(auVar32 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar32 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar32 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar32 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar32 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar32 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar32 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar32 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar32 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar32 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar32 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar32 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar32 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar32 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar32[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011cbe2;
  }
  else {
LAB_0011cbe2:
    main_cold_454();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%-20d",0xfffffc00);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_455();
  }
  local_2c8 = 0x202020343230312d;
  uStack_2c0 = 0;
  if (iVar3 == 0x14) {
    auVar33[0] = -(local_448[0] == '-');
    auVar33[1] = -(local_448[1] == '1');
    auVar33[2] = -(local_448[2] == '0');
    auVar33[3] = -(local_448[3] == '2');
    auVar33[4] = -(local_448[4] == '4');
    auVar33[5] = -(local_448[5] == ' ');
    auVar33[6] = -(local_448[6] == ' ');
    auVar33[7] = -(local_448[7] == ' ');
    auVar33[8] = -(local_3d8 == local_448[8]);
    auVar33[9] = -(cStack_3d7 == local_448[9]);
    auVar33[10] = -(cStack_3d6 == local_448[10]);
    auVar33[0xb] = -(cStack_3d5 == local_448[0xb]);
    auVar33[0xc] = -(cStack_3d4 == local_448[0xc]);
    auVar33[0xd] = -(cStack_3d3 == local_448[0xd]);
    auVar33[0xe] = -(cStack_3d2 == local_448[0xe]);
    auVar33[0xf] = -(cStack_3d1 == local_448[0xf]);
    auVar205[0] = -(local_3d8 == local_448[5]);
    auVar205[1] = -(cStack_3d7 == local_448[6]);
    auVar205[2] = -(cStack_3d6 == local_448[7]);
    auVar205[3] = -(cStack_3d5 == local_448[8]);
    auVar205[4] = -(cStack_3d4 == local_448[9]);
    auVar205[5] = -(cStack_3d3 == local_448[10]);
    auVar205[6] = -(cStack_3d2 == local_448[0xb]);
    auVar205[7] = -(cStack_3d1 == local_448[0xc]);
    auVar205[8] = -((char)local_3c8 == local_448[0xd]);
    auVar205[9] = -((char)((ulong)local_3c8 >> 8) == local_448[0xe]);
    auVar205[10] = -((char)((ulong)local_3c8 >> 0x10) == local_448[0xf]);
    auVar205[0xb] = -((char)((ulong)local_3c8 >> 0x18) == local_438[0]);
    auVar205[0xc] = -((char)((ulong)local_3c8 >> 0x20) == local_438[1]);
    auVar205[0xd] = -((char)((ulong)local_3c8 >> 0x28) == local_438[2]);
    auVar205[0xe] = -((char)((ulong)local_3c8 >> 0x30) == local_438[3]);
    auVar205[0xf] = -((char)((ulong)local_3c8 >> 0x38) == local_438[4]);
    auVar33 = auVar33 & auVar205;
    if ((ushort)((ushort)(SUB161(auVar33 >> 7,0) & 1) | (ushort)(SUB161(auVar33 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar33 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar33 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar33 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar33 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar33 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar33 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar33 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar33 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar33 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar33 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar33 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar33 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar33 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar33[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011cbf3;
  }
  else {
LAB_0011cbf3:
    main_cold_456();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%-20i",0x400);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_457();
  }
  if (iVar3 == 0x14) {
    auVar34[0] = -((char)local_378 == local_448[0]);
    auVar34[1] = -(local_378._1_1_ == local_448[1]);
    auVar34[2] = -(local_378._2_1_ == local_448[2]);
    auVar34[3] = -(local_378._3_1_ == local_448[3]);
    auVar34[4] = -(local_378._4_1_ == local_448[4]);
    auVar34[5] = -(local_378._5_1_ == local_448[5]);
    auVar34[6] = -(local_378._6_1_ == local_448[6]);
    auVar34[7] = -(local_378._7_1_ == local_448[7]);
    auVar34[8] = -(local_3d8 == local_448[8]);
    auVar34[9] = -(cStack_3d7 == local_448[9]);
    auVar34[10] = -(cStack_3d6 == local_448[10]);
    auVar34[0xb] = -(cStack_3d5 == local_448[0xb]);
    auVar34[0xc] = -(cStack_3d4 == local_448[0xc]);
    auVar34[0xd] = -(cStack_3d3 == local_448[0xd]);
    auVar34[0xe] = -(cStack_3d2 == local_448[0xe]);
    auVar34[0xf] = -(cStack_3d1 == local_448[0xf]);
    auVar206[0] = -(local_3d8 == local_448[5]);
    auVar206[1] = -(cStack_3d7 == local_448[6]);
    auVar206[2] = -(cStack_3d6 == local_448[7]);
    auVar206[3] = -(cStack_3d5 == local_448[8]);
    auVar206[4] = -(cStack_3d4 == local_448[9]);
    auVar206[5] = -(cStack_3d3 == local_448[10]);
    auVar206[6] = -(cStack_3d2 == local_448[0xb]);
    auVar206[7] = -(cStack_3d1 == local_448[0xc]);
    auVar206[8] = -((char)local_3c8 == local_448[0xd]);
    auVar206[9] = -((char)((ulong)local_3c8 >> 8) == local_448[0xe]);
    auVar206[10] = -((char)((ulong)local_3c8 >> 0x10) == local_448[0xf]);
    auVar206[0xb] = -((char)((ulong)local_3c8 >> 0x18) == local_438[0]);
    auVar206[0xc] = -((char)((ulong)local_3c8 >> 0x20) == local_438[1]);
    auVar206[0xd] = -((char)((ulong)local_3c8 >> 0x28) == local_438[2]);
    auVar206[0xe] = -((char)((ulong)local_3c8 >> 0x30) == local_438[3]);
    auVar206[0xf] = -((char)((ulong)local_3c8 >> 0x38) == local_438[4]);
    auVar34 = auVar34 & auVar206;
    if ((ushort)((ushort)(SUB161(auVar34 >> 7,0) & 1) | (ushort)(SUB161(auVar34 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar34 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar34 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar34 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar34 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar34 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar34 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar34 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar34 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar34 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar34 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar34 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar34 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar34 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar34[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011cc04;
  }
  else {
LAB_0011cc04:
    main_cold_458();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%-20i",0xfffffc00);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_459();
  }
  if (iVar3 == 0x14) {
    auVar35[0] = -((char)local_2c8 == local_448[0]);
    auVar35[1] = -(local_2c8._1_1_ == local_448[1]);
    auVar35[2] = -(local_2c8._2_1_ == local_448[2]);
    auVar35[3] = -(local_2c8._3_1_ == local_448[3]);
    auVar35[4] = -(local_2c8._4_1_ == local_448[4]);
    auVar35[5] = -(local_2c8._5_1_ == local_448[5]);
    auVar35[6] = -(local_2c8._6_1_ == local_448[6]);
    auVar35[7] = -(local_2c8._7_1_ == local_448[7]);
    auVar35[8] = -(local_3d8 == local_448[8]);
    auVar35[9] = -(cStack_3d7 == local_448[9]);
    auVar35[10] = -(cStack_3d6 == local_448[10]);
    auVar35[0xb] = -(cStack_3d5 == local_448[0xb]);
    auVar35[0xc] = -(cStack_3d4 == local_448[0xc]);
    auVar35[0xd] = -(cStack_3d3 == local_448[0xd]);
    auVar35[0xe] = -(cStack_3d2 == local_448[0xe]);
    auVar35[0xf] = -(cStack_3d1 == local_448[0xf]);
    auVar207[0] = -(local_3d8 == local_448[5]);
    auVar207[1] = -(cStack_3d7 == local_448[6]);
    auVar207[2] = -(cStack_3d6 == local_448[7]);
    auVar207[3] = -(cStack_3d5 == local_448[8]);
    auVar207[4] = -(cStack_3d4 == local_448[9]);
    auVar207[5] = -(cStack_3d3 == local_448[10]);
    auVar207[6] = -(cStack_3d2 == local_448[0xb]);
    auVar207[7] = -(cStack_3d1 == local_448[0xc]);
    auVar207[8] = -((char)local_3c8 == local_448[0xd]);
    auVar207[9] = -((char)((ulong)local_3c8 >> 8) == local_448[0xe]);
    auVar207[10] = -((char)((ulong)local_3c8 >> 0x10) == local_448[0xf]);
    auVar207[0xb] = -((char)((ulong)local_3c8 >> 0x18) == local_438[0]);
    auVar207[0xc] = -((char)((ulong)local_3c8 >> 0x20) == local_438[1]);
    auVar207[0xd] = -((char)((ulong)local_3c8 >> 0x28) == local_438[2]);
    auVar207[0xe] = -((char)((ulong)local_3c8 >> 0x30) == local_438[3]);
    auVar207[0xf] = -((char)((ulong)local_3c8 >> 0x38) == local_438[4]);
    auVar35 = auVar35 & auVar207;
    if ((ushort)((ushort)(SUB161(auVar35 >> 7,0) & 1) | (ushort)(SUB161(auVar35 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar35 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar35 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar35 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar35 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar35 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar35 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar35 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar35 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar35 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar35 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar35 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar35 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar35 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar35[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011cc15;
  }
  else {
LAB_0011cc15:
    main_cold_460();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%-20u",0x400);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_461();
  }
  if (iVar3 == 0x14) {
    auVar36[0] = -((char)local_378 == local_448[0]);
    auVar36[1] = -(local_378._1_1_ == local_448[1]);
    auVar36[2] = -(local_378._2_1_ == local_448[2]);
    auVar36[3] = -(local_378._3_1_ == local_448[3]);
    auVar36[4] = -(local_378._4_1_ == local_448[4]);
    auVar36[5] = -(local_378._5_1_ == local_448[5]);
    auVar36[6] = -(local_378._6_1_ == local_448[6]);
    auVar36[7] = -(local_378._7_1_ == local_448[7]);
    auVar36[8] = -(local_3d8 == local_448[8]);
    auVar36[9] = -(cStack_3d7 == local_448[9]);
    auVar36[10] = -(cStack_3d6 == local_448[10]);
    auVar36[0xb] = -(cStack_3d5 == local_448[0xb]);
    auVar36[0xc] = -(cStack_3d4 == local_448[0xc]);
    auVar36[0xd] = -(cStack_3d3 == local_448[0xd]);
    auVar36[0xe] = -(cStack_3d2 == local_448[0xe]);
    auVar36[0xf] = -(cStack_3d1 == local_448[0xf]);
    auVar208[0] = -(local_3d8 == local_448[5]);
    auVar208[1] = -(cStack_3d7 == local_448[6]);
    auVar208[2] = -(cStack_3d6 == local_448[7]);
    auVar208[3] = -(cStack_3d5 == local_448[8]);
    auVar208[4] = -(cStack_3d4 == local_448[9]);
    auVar208[5] = -(cStack_3d3 == local_448[10]);
    auVar208[6] = -(cStack_3d2 == local_448[0xb]);
    auVar208[7] = -(cStack_3d1 == local_448[0xc]);
    auVar208[8] = -((char)local_3c8 == local_448[0xd]);
    auVar208[9] = -((char)((ulong)local_3c8 >> 8) == local_448[0xe]);
    auVar208[10] = -((char)((ulong)local_3c8 >> 0x10) == local_448[0xf]);
    auVar208[0xb] = -((char)((ulong)local_3c8 >> 0x18) == local_438[0]);
    auVar208[0xc] = -((char)((ulong)local_3c8 >> 0x20) == local_438[1]);
    auVar208[0xd] = -((char)((ulong)local_3c8 >> 0x28) == local_438[2]);
    auVar208[0xe] = -((char)((ulong)local_3c8 >> 0x30) == local_438[3]);
    auVar208[0xf] = -((char)((ulong)local_3c8 >> 0x38) == local_438[4]);
    auVar36 = auVar36 & auVar208;
    if ((ushort)((ushort)(SUB161(auVar36 >> 7,0) & 1) | (ushort)(SUB161(auVar36 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar36 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar36 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar36 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar36 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar36 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar36 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar36 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar36 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar36 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar36 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar36 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar36 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar36 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar36[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011cc26;
  }
  else {
LAB_0011cc26:
    main_cold_462();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%-20u",0xfffffc00);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_463();
  }
  local_d8 = 0x3236363934393234;
  uStack_d0 = 0;
  local_f8 = 0x2020203237323636;
  uStack_f0 = 0;
  local_158 = 0x2020202020203237;
  uStack_150 = 0;
  if (iVar3 == 0x14) {
    auVar37[0] = -(local_448[0] == '4');
    auVar37[1] = -(local_448[1] == '2');
    auVar37[2] = -(local_448[2] == '9');
    auVar37[3] = -(local_448[3] == '4');
    auVar37[4] = -(local_448[4] == '9');
    auVar37[5] = -(local_448[5] == '6');
    auVar37[6] = -(local_448[6] == '6');
    auVar37[7] = -(local_448[7] == '2');
    auVar37[8] = -(local_448[8] == '7');
    auVar37[9] = -(local_448[9] == '2');
    auVar37[10] = -(local_448[10] == ' ');
    auVar37[0xb] = -(local_448[0xb] == ' ');
    auVar37[0xc] = -(local_448[0xc] == ' ');
    auVar37[0xd] = -(local_448[0xd] == ' ');
    auVar37[0xe] = -(local_448[0xe] == ' ');
    auVar37[0xf] = -(local_448[0xf] == ' ');
    auVar209[0] = -(local_448[5] == '6');
    auVar209[1] = -(local_448[6] == '6');
    auVar209[2] = -(local_448[7] == '2');
    auVar209[3] = -(local_448[8] == '7');
    auVar209[4] = -(local_448[9] == '2');
    auVar209[5] = -(local_448[10] == ' ');
    auVar209[6] = -(local_448[0xb] == ' ');
    auVar209[7] = -(local_448[0xc] == ' ');
    auVar209[8] = -((char)local_3c8 == local_448[0xd]);
    auVar209[9] = -((char)((ulong)local_3c8 >> 8) == local_448[0xe]);
    auVar209[10] = -((char)((ulong)local_3c8 >> 0x10) == local_448[0xf]);
    auVar209[0xb] = -((char)((ulong)local_3c8 >> 0x18) == local_438[0]);
    auVar209[0xc] = -((char)((ulong)local_3c8 >> 0x20) == local_438[1]);
    auVar209[0xd] = -((char)((ulong)local_3c8 >> 0x28) == local_438[2]);
    auVar209[0xe] = -((char)((ulong)local_3c8 >> 0x30) == local_438[3]);
    auVar209[0xf] = -((char)((ulong)local_3c8 >> 0x38) == local_438[4]);
    auVar37 = auVar37 & auVar209;
    if ((ushort)((ushort)(SUB161(auVar37 >> 7,0) & 1) | (ushort)(SUB161(auVar37 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar37 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar37 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar37 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar37 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar37 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar37 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar37 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar37 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar37 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar37 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar37 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar37 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar37 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar37[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011cc37;
  }
  else {
LAB_0011cc37:
    main_cold_464();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%-20o",0x1ff);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_465();
  }
  local_98 = 0x2020202020373737;
  uStack_90 = 0;
  if (iVar3 == 0x14) {
    auVar38[0] = -(local_448[0] == '7');
    auVar38[1] = -(local_448[1] == '7');
    auVar38[2] = -(local_448[2] == '7');
    auVar38[3] = -(local_448[3] == ' ');
    auVar38[4] = -(local_448[4] == ' ');
    auVar38[5] = -(local_448[5] == ' ');
    auVar38[6] = -(local_448[6] == ' ');
    auVar38[7] = -(local_448[7] == ' ');
    auVar38[8] = -(local_3d8 == local_448[8]);
    auVar38[9] = -(cStack_3d7 == local_448[9]);
    auVar38[10] = -(cStack_3d6 == local_448[10]);
    auVar38[0xb] = -(cStack_3d5 == local_448[0xb]);
    auVar38[0xc] = -(cStack_3d4 == local_448[0xc]);
    auVar38[0xd] = -(cStack_3d3 == local_448[0xd]);
    auVar38[0xe] = -(cStack_3d2 == local_448[0xe]);
    auVar38[0xf] = -(cStack_3d1 == local_448[0xf]);
    auVar210[0] = -(local_3d8 == local_448[5]);
    auVar210[1] = -(cStack_3d7 == local_448[6]);
    auVar210[2] = -(cStack_3d6 == local_448[7]);
    auVar210[3] = -(cStack_3d5 == local_448[8]);
    auVar210[4] = -(cStack_3d4 == local_448[9]);
    auVar210[5] = -(cStack_3d3 == local_448[10]);
    auVar210[6] = -(cStack_3d2 == local_448[0xb]);
    auVar210[7] = -(cStack_3d1 == local_448[0xc]);
    auVar210[8] = -((char)local_3c8 == local_448[0xd]);
    auVar210[9] = -((char)((ulong)local_3c8 >> 8) == local_448[0xe]);
    auVar210[10] = -((char)((ulong)local_3c8 >> 0x10) == local_448[0xf]);
    auVar210[0xb] = -((char)((ulong)local_3c8 >> 0x18) == local_438[0]);
    auVar210[0xc] = -((char)((ulong)local_3c8 >> 0x20) == local_438[1]);
    auVar210[0xd] = -((char)((ulong)local_3c8 >> 0x28) == local_438[2]);
    auVar210[0xe] = -((char)((ulong)local_3c8 >> 0x30) == local_438[3]);
    auVar210[0xf] = -((char)((ulong)local_3c8 >> 0x38) == local_438[4]);
    auVar38 = auVar38 & auVar210;
    if ((ushort)((ushort)(SUB161(auVar38 >> 7,0) & 1) | (ushort)(SUB161(auVar38 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar38 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar38 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar38 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar38 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar38 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar38 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar38 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar38 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar38 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar38 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar38 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar38 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar38 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar38[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011cc48;
  }
  else {
LAB_0011cc48:
    main_cold_466();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%-20o",0xfffffe01);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_467();
  }
  local_108 = 0x3737373737373733;
  uStack_100 = 0;
  local_128 = 0x2020313030373737;
  uStack_120 = 0;
  local_188 = 0x2020202020313030;
  uStack_180 = 0;
  if (iVar3 == 0x14) {
    auVar39[0] = -(local_448[0] == '3');
    auVar39[1] = -(local_448[1] == '7');
    auVar39[2] = -(local_448[2] == '7');
    auVar39[3] = -(local_448[3] == '7');
    auVar39[4] = -(local_448[4] == '7');
    auVar39[5] = -(local_448[5] == '7');
    auVar39[6] = -(local_448[6] == '7');
    auVar39[7] = -(local_448[7] == '7');
    auVar39[8] = -(local_448[8] == '0');
    auVar39[9] = -(local_448[9] == '0');
    auVar39[10] = -(local_448[10] == '1');
    auVar39[0xb] = -(local_448[0xb] == ' ');
    auVar39[0xc] = -(local_448[0xc] == ' ');
    auVar39[0xd] = -(local_448[0xd] == ' ');
    auVar39[0xe] = -(local_448[0xe] == ' ');
    auVar39[0xf] = -(local_448[0xf] == ' ');
    auVar211[0] = -(local_448[5] == '7');
    auVar211[1] = -(local_448[6] == '7');
    auVar211[2] = -(local_448[7] == '7');
    auVar211[3] = -(local_448[8] == '0');
    auVar211[4] = -(local_448[9] == '0');
    auVar211[5] = -(local_448[10] == '1');
    auVar211[6] = -(local_448[0xb] == ' ');
    auVar211[7] = -(local_448[0xc] == ' ');
    auVar211[8] = -((char)local_3c8 == local_448[0xd]);
    auVar211[9] = -((char)((ulong)local_3c8 >> 8) == local_448[0xe]);
    auVar211[10] = -((char)((ulong)local_3c8 >> 0x10) == local_448[0xf]);
    auVar211[0xb] = -((char)((ulong)local_3c8 >> 0x18) == local_438[0]);
    auVar211[0xc] = -((char)((ulong)local_3c8 >> 0x20) == local_438[1]);
    auVar211[0xd] = -((char)((ulong)local_3c8 >> 0x28) == local_438[2]);
    auVar211[0xe] = -((char)((ulong)local_3c8 >> 0x30) == local_438[3]);
    auVar211[0xf] = -((char)((ulong)local_3c8 >> 0x38) == local_438[4]);
    auVar39 = auVar39 & auVar211;
    if ((ushort)((ushort)(SUB161(auVar39 >> 7,0) & 1) | (ushort)(SUB161(auVar39 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar39 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar39 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar39 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar39 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar39 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar39 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar39 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar39 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar39 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar39 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar39 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar39 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar39 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar39[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011cc59;
  }
  else {
LAB_0011cc59:
    main_cold_468();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%-20x",0x1234abcd);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_469();
  }
  local_138 = 0x6463626134333231;
  uStack_130 = 0;
  local_148 = 0x2020202020646362;
  uStack_140 = 0;
  if (iVar3 == 0x14) {
    auVar40[0] = -(local_448[0] == '1');
    auVar40[1] = -(local_448[1] == '2');
    auVar40[2] = -(local_448[2] == '3');
    auVar40[3] = -(local_448[3] == '4');
    auVar40[4] = -(local_448[4] == 'a');
    auVar40[5] = -(local_448[5] == 'b');
    auVar40[6] = -(local_448[6] == 'c');
    auVar40[7] = -(local_448[7] == 'd');
    auVar40[8] = -(local_3d8 == local_448[8]);
    auVar40[9] = -(cStack_3d7 == local_448[9]);
    auVar40[10] = -(cStack_3d6 == local_448[10]);
    auVar40[0xb] = -(cStack_3d5 == local_448[0xb]);
    auVar40[0xc] = -(cStack_3d4 == local_448[0xc]);
    auVar40[0xd] = -(cStack_3d3 == local_448[0xd]);
    auVar40[0xe] = -(cStack_3d2 == local_448[0xe]);
    auVar40[0xf] = -(cStack_3d1 == local_448[0xf]);
    auVar212[0] = -(local_448[5] == 'b');
    auVar212[1] = -(local_448[6] == 'c');
    auVar212[2] = -(local_448[7] == 'd');
    auVar212[3] = -(local_448[8] == ' ');
    auVar212[4] = -(local_448[9] == ' ');
    auVar212[5] = -(local_448[10] == ' ');
    auVar212[6] = -(local_448[0xb] == ' ');
    auVar212[7] = -(local_448[0xc] == ' ');
    auVar212[8] = -((char)local_3c8 == local_448[0xd]);
    auVar212[9] = -((char)((ulong)local_3c8 >> 8) == local_448[0xe]);
    auVar212[10] = -((char)((ulong)local_3c8 >> 0x10) == local_448[0xf]);
    auVar212[0xb] = -((char)((ulong)local_3c8 >> 0x18) == local_438[0]);
    auVar212[0xc] = -((char)((ulong)local_3c8 >> 0x20) == local_438[1]);
    auVar212[0xd] = -((char)((ulong)local_3c8 >> 0x28) == local_438[2]);
    auVar212[0xe] = -((char)((ulong)local_3c8 >> 0x30) == local_438[3]);
    auVar212[0xf] = -((char)((ulong)local_3c8 >> 0x38) == local_438[4]);
    auVar40 = auVar40 & auVar212;
    if ((ushort)((ushort)(SUB161(auVar40 >> 7,0) & 1) | (ushort)(SUB161(auVar40 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar40 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar40 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar40 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar40 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar40 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar40 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar40 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar40 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar40 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar40 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar40 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar40 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar40 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar40[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011cc6a;
  }
  else {
LAB_0011cc6a:
    main_cold_470();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%-20x",0xedcb5433);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_471();
  }
  local_2d8 = 0x2020202020333334;
  uStack_2d0 = 0;
  local_a8 = 0x3333343562636465;
  uStack_a0 = 0;
  if (iVar3 == 0x14) {
    auVar41[0] = -(local_448[0] == 'e');
    auVar41[1] = -(local_448[1] == 'd');
    auVar41[2] = -(local_448[2] == 'c');
    auVar41[3] = -(local_448[3] == 'b');
    auVar41[4] = -(local_448[4] == '5');
    auVar41[5] = -(local_448[5] == '4');
    auVar41[6] = -(local_448[6] == '3');
    auVar41[7] = -(local_448[7] == '3');
    auVar41[8] = -(local_3d8 == local_448[8]);
    auVar41[9] = -(cStack_3d7 == local_448[9]);
    auVar41[10] = -(cStack_3d6 == local_448[10]);
    auVar41[0xb] = -(cStack_3d5 == local_448[0xb]);
    auVar41[0xc] = -(cStack_3d4 == local_448[0xc]);
    auVar41[0xd] = -(cStack_3d3 == local_448[0xd]);
    auVar41[0xe] = -(cStack_3d2 == local_448[0xe]);
    auVar41[0xf] = -(cStack_3d1 == local_448[0xf]);
    auVar213[0] = -(local_448[5] == '4');
    auVar213[1] = -(local_448[6] == '3');
    auVar213[2] = -(local_448[7] == '3');
    auVar213[3] = -(local_448[8] == ' ');
    auVar213[4] = -(local_448[9] == ' ');
    auVar213[5] = -(local_448[10] == ' ');
    auVar213[6] = -(local_448[0xb] == ' ');
    auVar213[7] = -(local_448[0xc] == ' ');
    auVar213[8] = -((char)local_3c8 == local_448[0xd]);
    auVar213[9] = -((char)((ulong)local_3c8 >> 8) == local_448[0xe]);
    auVar213[10] = -((char)((ulong)local_3c8 >> 0x10) == local_448[0xf]);
    auVar213[0xb] = -((char)((ulong)local_3c8 >> 0x18) == local_438[0]);
    auVar213[0xc] = -((char)((ulong)local_3c8 >> 0x20) == local_438[1]);
    auVar213[0xd] = -((char)((ulong)local_3c8 >> 0x28) == local_438[2]);
    auVar213[0xe] = -((char)((ulong)local_3c8 >> 0x30) == local_438[3]);
    auVar213[0xf] = -((char)((ulong)local_3c8 >> 0x38) == local_438[4]);
    auVar41 = auVar41 & auVar213;
    if ((ushort)((ushort)(SUB161(auVar41 >> 7,0) & 1) | (ushort)(SUB161(auVar41 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar41 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar41 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar41 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar41 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar41 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar41 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar41 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar41 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar41 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar41 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar41 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar41 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar41 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar41[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011cc7b;
  }
  else {
LAB_0011cc7b:
    main_cold_472();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%-20X",0x1234abcd);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_473();
  }
  local_178 = 0x4443424134333231;
  uStack_170 = 0;
  local_198 = 0x2020202020444342;
  uStack_190 = 0;
  if (iVar3 == 0x14) {
    auVar42[0] = -(local_448[0] == '1');
    auVar42[1] = -(local_448[1] == '2');
    auVar42[2] = -(local_448[2] == '3');
    auVar42[3] = -(local_448[3] == '4');
    auVar42[4] = -(local_448[4] == 'A');
    auVar42[5] = -(local_448[5] == 'B');
    auVar42[6] = -(local_448[6] == 'C');
    auVar42[7] = -(local_448[7] == 'D');
    auVar42[8] = -(local_3d8 == local_448[8]);
    auVar42[9] = -(cStack_3d7 == local_448[9]);
    auVar42[10] = -(cStack_3d6 == local_448[10]);
    auVar42[0xb] = -(cStack_3d5 == local_448[0xb]);
    auVar42[0xc] = -(cStack_3d4 == local_448[0xc]);
    auVar42[0xd] = -(cStack_3d3 == local_448[0xd]);
    auVar42[0xe] = -(cStack_3d2 == local_448[0xe]);
    auVar42[0xf] = -(cStack_3d1 == local_448[0xf]);
    auVar214[0] = -(local_448[5] == 'B');
    auVar214[1] = -(local_448[6] == 'C');
    auVar214[2] = -(local_448[7] == 'D');
    auVar214[3] = -(local_448[8] == ' ');
    auVar214[4] = -(local_448[9] == ' ');
    auVar214[5] = -(local_448[10] == ' ');
    auVar214[6] = -(local_448[0xb] == ' ');
    auVar214[7] = -(local_448[0xc] == ' ');
    auVar214[8] = -((char)local_3c8 == local_448[0xd]);
    auVar214[9] = -((char)((ulong)local_3c8 >> 8) == local_448[0xe]);
    auVar214[10] = -((char)((ulong)local_3c8 >> 0x10) == local_448[0xf]);
    auVar214[0xb] = -((char)((ulong)local_3c8 >> 0x18) == local_438[0]);
    auVar214[0xc] = -((char)((ulong)local_3c8 >> 0x20) == local_438[1]);
    auVar214[0xd] = -((char)((ulong)local_3c8 >> 0x28) == local_438[2]);
    auVar214[0xe] = -((char)((ulong)local_3c8 >> 0x30) == local_438[3]);
    auVar214[0xf] = -((char)((ulong)local_3c8 >> 0x38) == local_438[4]);
    auVar42 = auVar42 & auVar214;
    if ((ushort)((ushort)(SUB161(auVar42 >> 7,0) & 1) | (ushort)(SUB161(auVar42 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar42 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar42 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar42 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar42 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar42 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar42 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar42 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar42 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar42 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar42 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar42 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar42 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar42 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar42[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011cc8c;
  }
  else {
LAB_0011cc8c:
    main_cold_474();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%-20X",0xedcb5433);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_475();
  }
  local_b8 = 0x3333343542434445;
  uStack_b0 = 0;
  if (iVar3 == 0x14) {
    auVar43[0] = -(local_448[0] == 'E');
    auVar43[1] = -(local_448[1] == 'D');
    auVar43[2] = -(local_448[2] == 'C');
    auVar43[3] = -(local_448[3] == 'B');
    auVar43[4] = -(local_448[4] == '5');
    auVar43[5] = -(local_448[5] == '4');
    auVar43[6] = -(local_448[6] == '3');
    auVar43[7] = -(local_448[7] == '3');
    auVar43[8] = -(local_3d8 == local_448[8]);
    auVar43[9] = -(cStack_3d7 == local_448[9]);
    auVar43[10] = -(cStack_3d6 == local_448[10]);
    auVar43[0xb] = -(cStack_3d5 == local_448[0xb]);
    auVar43[0xc] = -(cStack_3d4 == local_448[0xc]);
    auVar43[0xd] = -(cStack_3d3 == local_448[0xd]);
    auVar43[0xe] = -(cStack_3d2 == local_448[0xe]);
    auVar43[0xf] = -(cStack_3d1 == local_448[0xf]);
    auVar215[0] = -((char)local_2d8 == local_448[5]);
    auVar215[1] = -(local_2d8._1_1_ == local_448[6]);
    auVar215[2] = -(local_2d8._2_1_ == local_448[7]);
    auVar215[3] = -(local_2d8._3_1_ == local_448[8]);
    auVar215[4] = -(local_2d8._4_1_ == local_448[9]);
    auVar215[5] = -(local_2d8._5_1_ == local_448[10]);
    auVar215[6] = -(local_2d8._6_1_ == local_448[0xb]);
    auVar215[7] = -(local_2d8._7_1_ == local_448[0xc]);
    auVar215[8] = -((char)local_3c8 == local_448[0xd]);
    auVar215[9] = -((char)((ulong)local_3c8 >> 8) == local_448[0xe]);
    auVar215[10] = -((char)((ulong)local_3c8 >> 0x10) == local_448[0xf]);
    auVar215[0xb] = -((char)((ulong)local_3c8 >> 0x18) == local_438[0]);
    auVar215[0xc] = -((char)((ulong)local_3c8 >> 0x20) == local_438[1]);
    auVar215[0xd] = -((char)((ulong)local_3c8 >> 0x28) == local_438[2]);
    auVar215[0xe] = -((char)((ulong)local_3c8 >> 0x30) == local_438[3]);
    auVar215[0xf] = -((char)((ulong)local_3c8 >> 0x38) == local_438[4]);
    auVar43 = auVar43 & auVar215;
    if ((ushort)((ushort)(SUB161(auVar43 >> 7,0) & 1) | (ushort)(SUB161(auVar43 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar43 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar43 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar43 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar43 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar43 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar43 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar43 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar43 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar43 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar43 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar43 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar43 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar43 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar43[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011cc9d;
  }
  else {
LAB_0011cc9d:
    main_cold_476();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%-20c",0x78);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_477();
  }
  local_c8 = 0x2020202020202078;
  uStack_c0 = 0;
  if (iVar3 == 0x14) {
    auVar44[0] = -(local_448[0] == 'x');
    auVar44[1] = -(local_448[1] == ' ');
    auVar44[2] = -(local_448[2] == ' ');
    auVar44[3] = -(local_448[3] == ' ');
    auVar44[4] = -(local_448[4] == ' ');
    auVar44[5] = -(local_448[5] == ' ');
    auVar44[6] = -(local_448[6] == ' ');
    auVar44[7] = -(local_448[7] == ' ');
    auVar44[8] = -(local_3d8 == local_448[8]);
    auVar44[9] = -(cStack_3d7 == local_448[9]);
    auVar44[10] = -(cStack_3d6 == local_448[10]);
    auVar44[0xb] = -(cStack_3d5 == local_448[0xb]);
    auVar44[0xc] = -(cStack_3d4 == local_448[0xc]);
    auVar44[0xd] = -(cStack_3d3 == local_448[0xd]);
    auVar44[0xe] = -(cStack_3d2 == local_448[0xe]);
    auVar44[0xf] = -(cStack_3d1 == local_448[0xf]);
    auVar216[0] = -(local_3d8 == local_448[5]);
    auVar216[1] = -(cStack_3d7 == local_448[6]);
    auVar216[2] = -(cStack_3d6 == local_448[7]);
    auVar216[3] = -(cStack_3d5 == local_448[8]);
    auVar216[4] = -(cStack_3d4 == local_448[9]);
    auVar216[5] = -(cStack_3d3 == local_448[10]);
    auVar216[6] = -(cStack_3d2 == local_448[0xb]);
    auVar216[7] = -(cStack_3d1 == local_448[0xc]);
    auVar216[8] = -((char)local_3c8 == local_448[0xd]);
    auVar216[9] = -((char)((ulong)local_3c8 >> 8) == local_448[0xe]);
    auVar216[10] = -((char)((ulong)local_3c8 >> 0x10) == local_448[0xf]);
    auVar216[0xb] = -((char)((ulong)local_3c8 >> 0x18) == local_438[0]);
    auVar216[0xc] = -((char)((ulong)local_3c8 >> 0x20) == local_438[1]);
    auVar216[0xd] = -((char)((ulong)local_3c8 >> 0x28) == local_438[2]);
    auVar216[0xe] = -((char)((ulong)local_3c8 >> 0x30) == local_438[3]);
    auVar216[0xf] = -((char)((ulong)local_3c8 >> 0x38) == local_438[4]);
    auVar44 = auVar44 & auVar216;
    if ((ushort)((ushort)(SUB161(auVar44 >> 7,0) & 1) | (ushort)(SUB161(auVar44 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar44 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar44 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar44 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar44 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar44 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar44 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar44 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar44 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar44 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar44 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar44 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar44 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar44 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar44[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011ccae;
  }
  else {
LAB_0011ccae:
    main_cold_478();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%020d",0x400);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_479();
  }
  local_3a8 = 0x34323031303030;
  uStack_3a0 = 0;
  local_3b8 = 0x3030303030303030;
  uStack_3b0 = 0;
  if (iVar3 == 0x14) {
    auVar45[0] = -(local_448[0] == '0');
    auVar45[1] = -(local_448[1] == '0');
    auVar45[2] = -(local_448[2] == '0');
    auVar45[3] = -(local_448[3] == '0');
    auVar45[4] = -(local_448[4] == '0');
    auVar45[5] = -(local_448[5] == '0');
    auVar45[6] = -(local_448[6] == '0');
    auVar45[7] = -(local_448[7] == '0');
    auVar45[8] = -(local_448[8] == '0');
    auVar45[9] = -(local_448[9] == '0');
    auVar45[10] = -(local_448[10] == '0');
    auVar45[0xb] = -(local_448[0xb] == '0');
    auVar45[0xc] = -(local_448[0xc] == '0');
    auVar45[0xd] = -(local_448[0xd] == '0');
    auVar45[0xe] = -(local_448[0xe] == '0');
    auVar45[0xf] = -(local_448[0xf] == '0');
    auVar217[0] = -(local_448[5] == '0');
    auVar217[1] = -(local_448[6] == '0');
    auVar217[2] = -(local_448[7] == '0');
    auVar217[3] = -(local_448[8] == '0');
    auVar217[4] = -(local_448[9] == '0');
    auVar217[5] = -(local_448[10] == '0');
    auVar217[6] = -(local_448[0xb] == '0');
    auVar217[7] = -(local_448[0xc] == '0');
    auVar217[8] = -(local_448[0xd] == '0');
    auVar217[9] = -(local_448[0xe] == '0');
    auVar217[10] = -(local_448[0xf] == '0');
    auVar217[0xb] = -(local_438[0] == '1');
    auVar217[0xc] = -(local_438[1] == '0');
    auVar217[0xd] = -(local_438[2] == '2');
    auVar217[0xe] = -(local_438[3] == '4');
    auVar217[0xf] = -(local_438[4] == '\0');
    auVar45 = auVar45 & auVar217;
    if ((ushort)((ushort)(SUB161(auVar45 >> 7,0) & 1) | (ushort)(SUB161(auVar45 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar45 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar45 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar45 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar45 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar45 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar45 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar45 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar45 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar45 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar45 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar45 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar45 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar45 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar45[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011ccbf;
  }
  else {
LAB_0011ccbf:
    main_cold_480();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%020d",0xfffffc00);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_481();
  }
  local_2a8 = 0x303030303030302d;
  uStack_2a0 = 0;
  if (iVar3 == 0x14) {
    auVar46[0] = -(local_448[0] == '-');
    auVar46[1] = -(local_448[1] == '0');
    auVar46[2] = -(local_448[2] == '0');
    auVar46[3] = -(local_448[3] == '0');
    auVar46[4] = -(local_448[4] == '0');
    auVar46[5] = -(local_448[5] == '0');
    auVar46[6] = -(local_448[6] == '0');
    auVar46[7] = -(local_448[7] == '0');
    auVar46[8] = -((char)local_3b8 == local_448[8]);
    auVar46[9] = -(local_3b8._1_1_ == local_448[9]);
    auVar46[10] = -(local_3b8._2_1_ == local_448[10]);
    auVar46[0xb] = -(local_3b8._3_1_ == local_448[0xb]);
    auVar46[0xc] = -(local_3b8._4_1_ == local_448[0xc]);
    auVar46[0xd] = -(local_3b8._5_1_ == local_448[0xd]);
    auVar46[0xe] = -(local_3b8._6_1_ == local_448[0xe]);
    auVar46[0xf] = -(local_3b8._7_1_ == local_448[0xf]);
    auVar218[0] = -((char)local_3b8 == local_448[5]);
    auVar218[1] = -(local_3b8._1_1_ == local_448[6]);
    auVar218[2] = -(local_3b8._2_1_ == local_448[7]);
    auVar218[3] = -(local_3b8._3_1_ == local_448[8]);
    auVar218[4] = -(local_3b8._4_1_ == local_448[9]);
    auVar218[5] = -(local_3b8._5_1_ == local_448[10]);
    auVar218[6] = -(local_3b8._6_1_ == local_448[0xb]);
    auVar218[7] = -(local_3b8._7_1_ == local_448[0xc]);
    auVar218[8] = -((char)local_3a8 == local_448[0xd]);
    auVar218[9] = -(local_3a8._1_1_ == local_448[0xe]);
    auVar218[10] = -(local_3a8._2_1_ == local_448[0xf]);
    auVar218[0xb] = -(local_3a8._3_1_ == local_438[0]);
    auVar218[0xc] = -(local_3a8._4_1_ == local_438[1]);
    auVar218[0xd] = -(local_3a8._5_1_ == local_438[2]);
    auVar218[0xe] = -(local_3a8._6_1_ == local_438[3]);
    auVar218[0xf] = -(local_3a8._7_1_ == local_438[4]);
    auVar46 = auVar46 & auVar218;
    if ((ushort)((ushort)(SUB161(auVar46 >> 7,0) & 1) | (ushort)(SUB161(auVar46 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar46 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar46 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar46 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar46 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar46 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar46 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar46 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar46 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar46 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar46 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar46 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar46 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar46 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar46[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011ccd0;
  }
  else {
LAB_0011ccd0:
    main_cold_482();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%020i",0x400);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_483();
  }
  if (iVar3 == 0x14) {
    auVar47[0] = -((char)local_3b8 == local_448[0]);
    auVar47[1] = -(local_3b8._1_1_ == local_448[1]);
    auVar47[2] = -(local_3b8._2_1_ == local_448[2]);
    auVar47[3] = -(local_3b8._3_1_ == local_448[3]);
    auVar47[4] = -(local_3b8._4_1_ == local_448[4]);
    auVar47[5] = -(local_3b8._5_1_ == local_448[5]);
    auVar47[6] = -(local_3b8._6_1_ == local_448[6]);
    auVar47[7] = -(local_3b8._7_1_ == local_448[7]);
    auVar47[8] = -((char)local_3b8 == local_448[8]);
    auVar47[9] = -(local_3b8._1_1_ == local_448[9]);
    auVar47[10] = -(local_3b8._2_1_ == local_448[10]);
    auVar47[0xb] = -(local_3b8._3_1_ == local_448[0xb]);
    auVar47[0xc] = -(local_3b8._4_1_ == local_448[0xc]);
    auVar47[0xd] = -(local_3b8._5_1_ == local_448[0xd]);
    auVar47[0xe] = -(local_3b8._6_1_ == local_448[0xe]);
    auVar47[0xf] = -(local_3b8._7_1_ == local_448[0xf]);
    auVar219[0] = -((char)local_3b8 == local_448[5]);
    auVar219[1] = -(local_3b8._1_1_ == local_448[6]);
    auVar219[2] = -(local_3b8._2_1_ == local_448[7]);
    auVar219[3] = -(local_3b8._3_1_ == local_448[8]);
    auVar219[4] = -(local_3b8._4_1_ == local_448[9]);
    auVar219[5] = -(local_3b8._5_1_ == local_448[10]);
    auVar219[6] = -(local_3b8._6_1_ == local_448[0xb]);
    auVar219[7] = -(local_3b8._7_1_ == local_448[0xc]);
    auVar219[8] = -((char)local_3a8 == local_448[0xd]);
    auVar219[9] = -(local_3a8._1_1_ == local_448[0xe]);
    auVar219[10] = -(local_3a8._2_1_ == local_448[0xf]);
    auVar219[0xb] = -(local_3a8._3_1_ == local_438[0]);
    auVar219[0xc] = -(local_3a8._4_1_ == local_438[1]);
    auVar219[0xd] = -(local_3a8._5_1_ == local_438[2]);
    auVar219[0xe] = -(local_3a8._6_1_ == local_438[3]);
    auVar219[0xf] = -(local_3a8._7_1_ == local_438[4]);
    auVar47 = auVar47 & auVar219;
    if ((ushort)((ushort)(SUB161(auVar47 >> 7,0) & 1) | (ushort)(SUB161(auVar47 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar47 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar47 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar47 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar47 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar47 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar47 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar47 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar47 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar47 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar47 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar47 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar47 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar47 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar47[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011cce1;
  }
  else {
LAB_0011cce1:
    main_cold_484();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%020i",0xfffffc00);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_485();
  }
  if (iVar3 == 0x14) {
    auVar48[0] = -((char)local_2a8 == local_448[0]);
    auVar48[1] = -(local_2a8._1_1_ == local_448[1]);
    auVar48[2] = -(local_2a8._2_1_ == local_448[2]);
    auVar48[3] = -(local_2a8._3_1_ == local_448[3]);
    auVar48[4] = -(local_2a8._4_1_ == local_448[4]);
    auVar48[5] = -(local_2a8._5_1_ == local_448[5]);
    auVar48[6] = -(local_2a8._6_1_ == local_448[6]);
    auVar48[7] = -(local_2a8._7_1_ == local_448[7]);
    auVar48[8] = -((char)local_3b8 == local_448[8]);
    auVar48[9] = -(local_3b8._1_1_ == local_448[9]);
    auVar48[10] = -(local_3b8._2_1_ == local_448[10]);
    auVar48[0xb] = -(local_3b8._3_1_ == local_448[0xb]);
    auVar48[0xc] = -(local_3b8._4_1_ == local_448[0xc]);
    auVar48[0xd] = -(local_3b8._5_1_ == local_448[0xd]);
    auVar48[0xe] = -(local_3b8._6_1_ == local_448[0xe]);
    auVar48[0xf] = -(local_3b8._7_1_ == local_448[0xf]);
    auVar220[0] = -((char)local_3b8 == local_448[5]);
    auVar220[1] = -(local_3b8._1_1_ == local_448[6]);
    auVar220[2] = -(local_3b8._2_1_ == local_448[7]);
    auVar220[3] = -(local_3b8._3_1_ == local_448[8]);
    auVar220[4] = -(local_3b8._4_1_ == local_448[9]);
    auVar220[5] = -(local_3b8._5_1_ == local_448[10]);
    auVar220[6] = -(local_3b8._6_1_ == local_448[0xb]);
    auVar220[7] = -(local_3b8._7_1_ == local_448[0xc]);
    auVar220[8] = -((char)local_3a8 == local_448[0xd]);
    auVar220[9] = -(local_3a8._1_1_ == local_448[0xe]);
    auVar220[10] = -(local_3a8._2_1_ == local_448[0xf]);
    auVar220[0xb] = -(local_3a8._3_1_ == local_438[0]);
    auVar220[0xc] = -(local_3a8._4_1_ == local_438[1]);
    auVar220[0xd] = -(local_3a8._5_1_ == local_438[2]);
    auVar220[0xe] = -(local_3a8._6_1_ == local_438[3]);
    auVar220[0xf] = -(local_3a8._7_1_ == local_438[4]);
    auVar48 = auVar48 & auVar220;
    if ((ushort)((ushort)(SUB161(auVar48 >> 7,0) & 1) | (ushort)(SUB161(auVar48 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar48 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar48 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar48 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar48 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar48 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar48 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar48 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar48 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar48 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar48 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar48 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar48 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar48 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar48[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011ccf2;
  }
  else {
LAB_0011ccf2:
    main_cold_486();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%020u",0x400);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_487();
  }
  if (iVar3 == 0x14) {
    auVar49[0] = -((char)local_3b8 == local_448[0]);
    auVar49[1] = -(local_3b8._1_1_ == local_448[1]);
    auVar49[2] = -(local_3b8._2_1_ == local_448[2]);
    auVar49[3] = -(local_3b8._3_1_ == local_448[3]);
    auVar49[4] = -(local_3b8._4_1_ == local_448[4]);
    auVar49[5] = -(local_3b8._5_1_ == local_448[5]);
    auVar49[6] = -(local_3b8._6_1_ == local_448[6]);
    auVar49[7] = -(local_3b8._7_1_ == local_448[7]);
    auVar49[8] = -((char)local_3b8 == local_448[8]);
    auVar49[9] = -(local_3b8._1_1_ == local_448[9]);
    auVar49[10] = -(local_3b8._2_1_ == local_448[10]);
    auVar49[0xb] = -(local_3b8._3_1_ == local_448[0xb]);
    auVar49[0xc] = -(local_3b8._4_1_ == local_448[0xc]);
    auVar49[0xd] = -(local_3b8._5_1_ == local_448[0xd]);
    auVar49[0xe] = -(local_3b8._6_1_ == local_448[0xe]);
    auVar49[0xf] = -(local_3b8._7_1_ == local_448[0xf]);
    auVar221[0] = -((char)local_3b8 == local_448[5]);
    auVar221[1] = -(local_3b8._1_1_ == local_448[6]);
    auVar221[2] = -(local_3b8._2_1_ == local_448[7]);
    auVar221[3] = -(local_3b8._3_1_ == local_448[8]);
    auVar221[4] = -(local_3b8._4_1_ == local_448[9]);
    auVar221[5] = -(local_3b8._5_1_ == local_448[10]);
    auVar221[6] = -(local_3b8._6_1_ == local_448[0xb]);
    auVar221[7] = -(local_3b8._7_1_ == local_448[0xc]);
    auVar221[8] = -((char)local_3a8 == local_448[0xd]);
    auVar221[9] = -(local_3a8._1_1_ == local_448[0xe]);
    auVar221[10] = -(local_3a8._2_1_ == local_448[0xf]);
    auVar221[0xb] = -(local_3a8._3_1_ == local_438[0]);
    auVar221[0xc] = -(local_3a8._4_1_ == local_438[1]);
    auVar221[0xd] = -(local_3a8._5_1_ == local_438[2]);
    auVar221[0xe] = -(local_3a8._6_1_ == local_438[3]);
    auVar221[0xf] = -(local_3a8._7_1_ == local_438[4]);
    auVar49 = auVar49 & auVar221;
    if ((ushort)((ushort)(SUB161(auVar49 >> 7,0) & 1) | (ushort)(SUB161(auVar49 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar49 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar49 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar49 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar49 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar49 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar49 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar49 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar49 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar49 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar49 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar49 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar49 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar49 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar49[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011cd03;
  }
  else {
LAB_0011cd03:
    main_cold_488();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%020u",0xfffffc00);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_489();
  }
  local_58 = 0x3932343030303030;
  uStack_50 = 0;
  local_68 = 0x3639343932343030;
  uStack_60 = 0;
  if (iVar3 == 0x14) {
    auVar50[0] = -((char)local_3b8 == local_448[0]);
    auVar50[1] = -(local_3b8._1_1_ == local_448[1]);
    auVar50[2] = -(local_3b8._2_1_ == local_448[2]);
    auVar50[3] = -(local_3b8._3_1_ == local_448[3]);
    auVar50[4] = -(local_3b8._4_1_ == local_448[4]);
    auVar50[5] = -(local_3b8._5_1_ == local_448[5]);
    auVar50[6] = -(local_3b8._6_1_ == local_448[6]);
    auVar50[7] = -(local_3b8._7_1_ == local_448[7]);
    auVar50[8] = -(local_448[8] == '0');
    auVar50[9] = -(local_448[9] == '0');
    auVar50[10] = -(local_448[10] == '4');
    auVar50[0xb] = -(local_448[0xb] == '2');
    auVar50[0xc] = -(local_448[0xc] == '9');
    auVar50[0xd] = -(local_448[0xd] == '4');
    auVar50[0xe] = -(local_448[0xe] == '9');
    auVar50[0xf] = -(local_448[0xf] == '6');
    auVar222[0] = -(local_448[5] == '0');
    auVar222[1] = -(local_448[6] == '0');
    auVar222[2] = -(local_448[7] == '0');
    auVar222[3] = -(local_448[8] == '0');
    auVar222[4] = -(local_448[9] == '0');
    auVar222[5] = -(local_448[10] == '4');
    auVar222[6] = -(local_448[0xb] == '2');
    auVar222[7] = -(local_448[0xc] == '9');
    auVar222[8] = -((char)local_2ec._4_8_ == local_448[0xd]);
    auVar222[9] = -(SUB81(local_2ec._4_8_,1) == local_448[0xe]);
    auVar222[10] = -(SUB81(local_2ec._4_8_,2) == local_448[0xf]);
    auVar222[0xb] = -(SUB81(local_2ec._4_8_,3) == local_438[0]);
    auVar222[0xc] = -(SUB81(local_2ec._4_8_,4) == local_438[1]);
    auVar222[0xd] = -(SUB81(local_2ec._4_8_,5) == local_438[2]);
    auVar222[0xe] = -(SUB81(local_2ec._4_8_,6) == local_438[3]);
    auVar222[0xf] = -(SUB81(local_2ec._4_8_,7) == local_438[4]);
    auVar50 = auVar50 & auVar222;
    if ((ushort)((ushort)(SUB161(auVar50 >> 7,0) & 1) | (ushort)(SUB161(auVar50 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar50 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar50 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar50 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar50 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar50 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar50 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar50 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar50 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar50 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar50 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar50 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar50 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar50 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar50[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011cd14;
  }
  else {
LAB_0011cd14:
    main_cold_490();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%020o",0x1ff);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_491();
  }
  local_1f8 = 0x37373730303030;
  uStack_1f0 = 0;
  if (iVar3 == 0x14) {
    auVar51[0] = -((char)local_3b8 == local_448[0]);
    auVar51[1] = -(local_3b8._1_1_ == local_448[1]);
    auVar51[2] = -(local_3b8._2_1_ == local_448[2]);
    auVar51[3] = -(local_3b8._3_1_ == local_448[3]);
    auVar51[4] = -(local_3b8._4_1_ == local_448[4]);
    auVar51[5] = -(local_3b8._5_1_ == local_448[5]);
    auVar51[6] = -(local_3b8._6_1_ == local_448[6]);
    auVar51[7] = -(local_3b8._7_1_ == local_448[7]);
    auVar51[8] = -((char)local_3b8 == local_448[8]);
    auVar51[9] = -(local_3b8._1_1_ == local_448[9]);
    auVar51[10] = -(local_3b8._2_1_ == local_448[10]);
    auVar51[0xb] = -(local_3b8._3_1_ == local_448[0xb]);
    auVar51[0xc] = -(local_3b8._4_1_ == local_448[0xc]);
    auVar51[0xd] = -(local_3b8._5_1_ == local_448[0xd]);
    auVar51[0xe] = -(local_3b8._6_1_ == local_448[0xe]);
    auVar51[0xf] = -(local_3b8._7_1_ == local_448[0xf]);
    auVar223[0] = -((char)local_3b8 == local_448[5]);
    auVar223[1] = -(local_3b8._1_1_ == local_448[6]);
    auVar223[2] = -(local_3b8._2_1_ == local_448[7]);
    auVar223[3] = -(local_3b8._3_1_ == local_448[8]);
    auVar223[4] = -(local_3b8._4_1_ == local_448[9]);
    auVar223[5] = -(local_3b8._5_1_ == local_448[10]);
    auVar223[6] = -(local_3b8._6_1_ == local_448[0xb]);
    auVar223[7] = -(local_3b8._7_1_ == local_448[0xc]);
    auVar223[8] = -(local_448[0xd] == '0');
    auVar223[9] = -(local_448[0xe] == '0');
    auVar223[10] = -(local_448[0xf] == '0');
    auVar223[0xb] = -(local_438[0] == '0');
    auVar223[0xc] = -(local_438[1] == '7');
    auVar223[0xd] = -(local_438[2] == '7');
    auVar223[0xe] = -(local_438[3] == '7');
    auVar223[0xf] = -(local_438[4] == '\0');
    auVar51 = auVar51 & auVar223;
    if ((ushort)((ushort)(SUB161(auVar51 >> 7,0) & 1) | (ushort)(SUB161(auVar51 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar51 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar51 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar51 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar51 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar51 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar51 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar51 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar51 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar51 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar51 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar51 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar51 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar51 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar51[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011cd25;
  }
  else {
LAB_0011cd25:
    main_cold_492();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%020o",0xfffffe01);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_493();
  }
  local_1e8 = 0x3737373330303030;
  uStack_1e0 = 0;
  local_208 = 0x3737373737373330;
  uStack_200 = 0;
  if (iVar3 == 0x14) {
    auVar52[0] = -((char)local_3b8 == local_448[0]);
    auVar52[1] = -(local_3b8._1_1_ == local_448[1]);
    auVar52[2] = -(local_3b8._2_1_ == local_448[2]);
    auVar52[3] = -(local_3b8._3_1_ == local_448[3]);
    auVar52[4] = -(local_3b8._4_1_ == local_448[4]);
    auVar52[5] = -(local_3b8._5_1_ == local_448[5]);
    auVar52[6] = -(local_3b8._6_1_ == local_448[6]);
    auVar52[7] = -(local_3b8._7_1_ == local_448[7]);
    auVar52[8] = -(local_448[8] == '0');
    auVar52[9] = -(local_448[9] == '3');
    auVar52[10] = -(local_448[10] == '7');
    auVar52[0xb] = -(local_448[0xb] == '7');
    auVar52[0xc] = -(local_448[0xc] == '7');
    auVar52[0xd] = -(local_448[0xd] == '7');
    auVar52[0xe] = -(local_448[0xe] == '7');
    auVar52[0xf] = -(local_448[0xf] == '7');
    auVar224[0] = -(local_448[5] == '0');
    auVar224[1] = -(local_448[6] == '0');
    auVar224[2] = -(local_448[7] == '0');
    auVar224[3] = -(local_448[8] == '0');
    auVar224[4] = -(local_448[9] == '3');
    auVar224[5] = -(local_448[10] == '7');
    auVar224[6] = -(local_448[0xb] == '7');
    auVar224[7] = -(local_448[0xc] == '7');
    auVar224[8] = -((char)local_348 == local_448[0xd]);
    auVar224[9] = -((char)((ulong)local_348 >> 8) == local_448[0xe]);
    auVar224[10] = -((char)((ulong)local_348 >> 0x10) == local_448[0xf]);
    auVar224[0xb] = -((char)((ulong)local_348 >> 0x18) == local_438[0]);
    auVar224[0xc] = -((char)((ulong)local_348 >> 0x20) == local_438[1]);
    auVar224[0xd] = -((char)((ulong)local_348 >> 0x28) == local_438[2]);
    auVar224[0xe] = -((char)((ulong)local_348 >> 0x30) == local_438[3]);
    auVar224[0xf] = -((char)((ulong)local_348 >> 0x38) == local_438[4]);
    auVar52 = auVar52 & auVar224;
    if ((ushort)((ushort)(SUB161(auVar52 >> 7,0) & 1) | (ushort)(SUB161(auVar52 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar52 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar52 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar52 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar52 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar52 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar52 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar52 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar52 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar52 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar52 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar52 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar52 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar52 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar52[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011cd36;
  }
  else {
LAB_0011cd36:
    main_cold_494();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%020x",0x1234abcd);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_495();
  }
  local_368 = 0x3130303030303030;
  uStack_360 = 0;
  local_2b8 = 0x3433323130303030;
  uStack_2b0 = 0;
  if (iVar3 == 0x14) {
    auVar53[0] = -((char)local_3b8 == local_448[0]);
    auVar53[1] = -(local_3b8._1_1_ == local_448[1]);
    auVar53[2] = -(local_3b8._2_1_ == local_448[2]);
    auVar53[3] = -(local_3b8._3_1_ == local_448[3]);
    auVar53[4] = -(local_3b8._4_1_ == local_448[4]);
    auVar53[5] = -(local_3b8._5_1_ == local_448[5]);
    auVar53[6] = -(local_3b8._6_1_ == local_448[6]);
    auVar53[7] = -(local_3b8._7_1_ == local_448[7]);
    auVar53[8] = -(local_448[8] == '0');
    auVar53[9] = -(local_448[9] == '0');
    auVar53[10] = -(local_448[10] == '0');
    auVar53[0xb] = -(local_448[0xb] == '0');
    auVar53[0xc] = -(local_448[0xc] == '1');
    auVar53[0xd] = -(local_448[0xd] == '2');
    auVar53[0xe] = -(local_448[0xe] == '3');
    auVar53[0xf] = -(local_448[0xf] == '4');
    auVar225[0] = -(local_448[5] == '0');
    auVar225[1] = -(local_448[6] == '0');
    auVar225[2] = -(local_448[7] == '0');
    auVar225[3] = -(local_448[8] == '0');
    auVar225[4] = -(local_448[9] == '0');
    auVar225[5] = -(local_448[10] == '0');
    auVar225[6] = -(local_448[0xb] == '0');
    auVar225[7] = -(local_448[0xc] == '1');
    auVar225[8] = -((char)local_328 == local_448[0xd]);
    auVar225[9] = -((char)((ulong)local_328 >> 8) == local_448[0xe]);
    auVar225[10] = -((char)((ulong)local_328 >> 0x10) == local_448[0xf]);
    auVar225[0xb] = -((char)((ulong)local_328 >> 0x18) == local_438[0]);
    auVar225[0xc] = -((char)((ulong)local_328 >> 0x20) == local_438[1]);
    auVar225[0xd] = -((char)((ulong)local_328 >> 0x28) == local_438[2]);
    auVar225[0xe] = -((char)((ulong)local_328 >> 0x30) == local_438[3]);
    auVar225[0xf] = -((char)((ulong)local_328 >> 0x38) == local_438[4]);
    auVar53 = auVar53 & auVar225;
    if ((ushort)((ushort)(SUB161(auVar53 >> 7,0) & 1) | (ushort)(SUB161(auVar53 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar53 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar53 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar53 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar53 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar53 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar53 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar53 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar53 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar53 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar53 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar53 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar53 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar53 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar53[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011cd47;
  }
  else {
LAB_0011cd47:
    main_cold_496();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%020x",0xedcb5433);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_497();
  }
  local_218 = 0x6530303030303030;
  uStack_210 = 0;
  local_78 = 0x6263646530303030;
  uStack_70 = 0;
  if (iVar3 == 0x14) {
    auVar54[0] = -((char)local_3b8 == local_448[0]);
    auVar54[1] = -(local_3b8._1_1_ == local_448[1]);
    auVar54[2] = -(local_3b8._2_1_ == local_448[2]);
    auVar54[3] = -(local_3b8._3_1_ == local_448[3]);
    auVar54[4] = -(local_3b8._4_1_ == local_448[4]);
    auVar54[5] = -(local_3b8._5_1_ == local_448[5]);
    auVar54[6] = -(local_3b8._6_1_ == local_448[6]);
    auVar54[7] = -(local_3b8._7_1_ == local_448[7]);
    auVar54[8] = -(local_448[8] == '0');
    auVar54[9] = -(local_448[9] == '0');
    auVar54[10] = -(local_448[10] == '0');
    auVar54[0xb] = -(local_448[0xb] == '0');
    auVar54[0xc] = -(local_448[0xc] == 'e');
    auVar54[0xd] = -(local_448[0xd] == 'd');
    auVar54[0xe] = -(local_448[0xe] == 'c');
    auVar54[0xf] = -(local_448[0xf] == 'b');
    auVar226[0] = -(local_448[5] == '0');
    auVar226[1] = -(local_448[6] == '0');
    auVar226[2] = -(local_448[7] == '0');
    auVar226[3] = -(local_448[8] == '0');
    auVar226[4] = -(local_448[9] == '0');
    auVar226[5] = -(local_448[10] == '0');
    auVar226[6] = -(local_448[0xb] == '0');
    auVar226[7] = -(local_448[0xc] == 'e');
    auVar226[8] = -((char)local_338 == local_448[0xd]);
    auVar226[9] = -((char)((ulong)local_338 >> 8) == local_448[0xe]);
    auVar226[10] = -((char)((ulong)local_338 >> 0x10) == local_448[0xf]);
    auVar226[0xb] = -((char)((ulong)local_338 >> 0x18) == local_438[0]);
    auVar226[0xc] = -((char)((ulong)local_338 >> 0x20) == local_438[1]);
    auVar226[0xd] = -((char)((ulong)local_338 >> 0x28) == local_438[2]);
    auVar226[0xe] = -((char)((ulong)local_338 >> 0x30) == local_438[3]);
    auVar226[0xf] = -((char)((ulong)local_338 >> 0x38) == local_438[4]);
    auVar54 = auVar54 & auVar226;
    if ((ushort)((ushort)(SUB161(auVar54 >> 7,0) & 1) | (ushort)(SUB161(auVar54 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar54 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar54 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar54 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar54 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar54 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar54 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar54 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar54 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar54 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar54 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar54 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar54 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar54 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar54[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011cd58;
  }
  else {
LAB_0011cd58:
    main_cold_498();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%020X",0x1234abcd);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_499();
  }
  if (iVar3 == 0x14) {
    auVar55[0] = -((char)local_3b8 == local_448[0]);
    auVar55[1] = -(local_3b8._1_1_ == local_448[1]);
    auVar55[2] = -(local_3b8._2_1_ == local_448[2]);
    auVar55[3] = -(local_3b8._3_1_ == local_448[3]);
    auVar55[4] = -(local_3b8._4_1_ == local_448[4]);
    auVar55[5] = -(local_3b8._5_1_ == local_448[5]);
    auVar55[6] = -(local_3b8._6_1_ == local_448[6]);
    auVar55[7] = -(local_3b8._7_1_ == local_448[7]);
    auVar55[8] = -((char)local_2b8 == local_448[8]);
    auVar55[9] = -((char)((ulong)local_2b8 >> 8) == local_448[9]);
    auVar55[10] = -((char)((ulong)local_2b8 >> 0x10) == local_448[10]);
    auVar55[0xb] = -((char)((ulong)local_2b8 >> 0x18) == local_448[0xb]);
    auVar55[0xc] = -((char)((ulong)local_2b8 >> 0x20) == local_448[0xc]);
    auVar55[0xd] = -((char)((ulong)local_2b8 >> 0x28) == local_448[0xd]);
    auVar55[0xe] = -((char)((ulong)local_2b8 >> 0x30) == local_448[0xe]);
    auVar55[0xf] = -((char)((ulong)local_2b8 >> 0x38) == local_448[0xf]);
    auVar227[0] = -((char)local_368 == local_448[5]);
    auVar227[1] = -(local_368._1_1_ == local_448[6]);
    auVar227[2] = -(local_368._2_1_ == local_448[7]);
    auVar227[3] = -(local_368._3_1_ == local_448[8]);
    auVar227[4] = -(local_368._4_1_ == local_448[9]);
    auVar227[5] = -(local_368._5_1_ == local_448[10]);
    auVar227[6] = -(local_368._6_1_ == local_448[0xb]);
    auVar227[7] = -(local_368._7_1_ == local_448[0xc]);
    auVar227[8] = -((char)local_308 == local_448[0xd]);
    auVar227[9] = -((char)((ulong)local_308 >> 8) == local_448[0xe]);
    auVar227[10] = -((char)((ulong)local_308 >> 0x10) == local_448[0xf]);
    auVar227[0xb] = -((char)((ulong)local_308 >> 0x18) == local_438[0]);
    auVar227[0xc] = -((char)((ulong)local_308 >> 0x20) == local_438[1]);
    auVar227[0xd] = -((char)((ulong)local_308 >> 0x28) == local_438[2]);
    auVar227[0xe] = -((char)((ulong)local_308 >> 0x30) == local_438[3]);
    auVar227[0xf] = -((char)((ulong)local_308 >> 0x38) == local_438[4]);
    auVar55 = auVar55 & auVar227;
    if ((ushort)((ushort)(SUB161(auVar55 >> 7,0) & 1) | (ushort)(SUB161(auVar55 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar55 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar55 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar55 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar55 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar55 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar55 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar55 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar55 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar55 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar55 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar55 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar55 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar55 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar55[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011cd69;
  }
  else {
LAB_0011cd69:
    main_cold_500();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%020X",0xedcb5433);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_501();
  }
  local_228 = 0x4530303030303030;
  uStack_220 = 0;
  local_88 = 0x4243444530303030;
  uStack_80 = 0;
  if (iVar3 == 0x14) {
    auVar56[0] = -((char)local_3b8 == local_448[0]);
    auVar56[1] = -(local_3b8._1_1_ == local_448[1]);
    auVar56[2] = -(local_3b8._2_1_ == local_448[2]);
    auVar56[3] = -(local_3b8._3_1_ == local_448[3]);
    auVar56[4] = -(local_3b8._4_1_ == local_448[4]);
    auVar56[5] = -(local_3b8._5_1_ == local_448[5]);
    auVar56[6] = -(local_3b8._6_1_ == local_448[6]);
    auVar56[7] = -(local_3b8._7_1_ == local_448[7]);
    auVar56[8] = -(local_448[8] == '0');
    auVar56[9] = -(local_448[9] == '0');
    auVar56[10] = -(local_448[10] == '0');
    auVar56[0xb] = -(local_448[0xb] == '0');
    auVar56[0xc] = -(local_448[0xc] == 'E');
    auVar56[0xd] = -(local_448[0xd] == 'D');
    auVar56[0xe] = -(local_448[0xe] == 'C');
    auVar56[0xf] = -(local_448[0xf] == 'B');
    auVar228[0] = -(local_448[5] == '0');
    auVar228[1] = -(local_448[6] == '0');
    auVar228[2] = -(local_448[7] == '0');
    auVar228[3] = -(local_448[8] == '0');
    auVar228[4] = -(local_448[9] == '0');
    auVar228[5] = -(local_448[10] == '0');
    auVar228[6] = -(local_448[0xb] == '0');
    auVar228[7] = -(local_448[0xc] == 'E');
    auVar228[8] = -((char)local_318 == local_448[0xd]);
    auVar228[9] = -((char)((ulong)local_318 >> 8) == local_448[0xe]);
    auVar228[10] = -((char)((ulong)local_318 >> 0x10) == local_448[0xf]);
    auVar228[0xb] = -((char)((ulong)local_318 >> 0x18) == local_438[0]);
    auVar228[0xc] = -((char)((ulong)local_318 >> 0x20) == local_438[1]);
    auVar228[0xd] = -((char)((ulong)local_318 >> 0x28) == local_438[2]);
    auVar228[0xe] = -((char)((ulong)local_318 >> 0x30) == local_438[3]);
    auVar228[0xf] = -((char)((ulong)local_318 >> 0x38) == local_438[4]);
    auVar56 = auVar56 & auVar228;
    if ((ushort)((ushort)(SUB161(auVar56 >> 7,0) & 1) | (ushort)(SUB161(auVar56 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar56 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar56 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar56 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar56 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar56 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar56 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar56 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar56 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar56 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar56 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar56 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar56 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar56 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar56[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011cd7a;
  }
  else {
LAB_0011cd7a:
    main_cold_502();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%#20o",0x1ff);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_503();
  }
  if (iVar3 == 0x14) {
    auVar57[0] = -(local_3d8 == local_448[0]);
    auVar57[1] = -(cStack_3d7 == local_448[1]);
    auVar57[2] = -(cStack_3d6 == local_448[2]);
    auVar57[3] = -(cStack_3d5 == local_448[3]);
    auVar57[4] = -(cStack_3d4 == local_448[4]);
    auVar57[5] = -(cStack_3d3 == local_448[5]);
    auVar57[6] = -(cStack_3d2 == local_448[6]);
    auVar57[7] = -(cStack_3d1 == local_448[7]);
    auVar57[8] = -(local_3d8 == local_448[8]);
    auVar57[9] = -(cStack_3d7 == local_448[9]);
    auVar57[10] = -(cStack_3d6 == local_448[10]);
    auVar57[0xb] = -(cStack_3d5 == local_448[0xb]);
    auVar57[0xc] = -(cStack_3d4 == local_448[0xc]);
    auVar57[0xd] = -(cStack_3d3 == local_448[0xd]);
    auVar57[0xe] = -(cStack_3d2 == local_448[0xe]);
    auVar57[0xf] = -(cStack_3d1 == local_448[0xf]);
    auVar161[0] = -(local_448[5] == ' ');
    auVar161[1] = -(local_448[6] == ' ');
    auVar161[2] = -(local_448[7] == ' ');
    auVar161[3] = -(local_448[8] == ' ');
    auVar161[4] = -(local_448[9] == ' ');
    auVar161[5] = -(local_448[10] == ' ');
    auVar161[6] = -(local_448[0xb] == ' ');
    auVar161[7] = -(local_448[0xc] == ' ');
    auVar161[8] = -(local_448[0xd] == ' ');
    auVar161[9] = -(local_448[0xe] == ' ');
    auVar161[10] = -(local_448[0xf] == ' ');
    auVar161[0xb] = -(local_438[0] == '0');
    auVar161[0xc] = -(local_438[1] == '7');
    auVar161[0xd] = -(local_438[2] == '7');
    auVar161[0xe] = -(local_438[3] == '7');
    auVar161[0xf] = -(local_438[4] == '\0');
    auVar161 = auVar161 & auVar57;
    if ((ushort)((ushort)(SUB161(auVar161 >> 7,0) & 1) |
                 (ushort)(SUB161(auVar161 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar161 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar161 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar161 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar161 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar161 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar161 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar161 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar161 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar161 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar161 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar161 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar161 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar161 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar161[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011cd8b;
  }
  else {
LAB_0011cd8b:
    main_cold_504();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%#20o",0xfffffe01);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_505();
  }
  if (iVar3 == 0x14) {
    auVar162[0] = -(local_448[5] == ' ');
    auVar162[1] = -(local_448[6] == ' ');
    auVar162[2] = -(local_448[7] == ' ');
    auVar162[3] = -(local_448[8] == '0');
    auVar162[4] = -(local_448[9] == '3');
    auVar162[5] = -(local_448[10] == '7');
    auVar162[6] = -(local_448[0xb] == '7');
    auVar162[7] = -(local_448[0xc] == '7');
    auVar162[8] = -(local_448[0xd] == '7');
    auVar162[9] = -(local_448[0xe] == '7');
    auVar162[10] = -(local_448[0xf] == '7');
    auVar162[0xb] = -(local_438[0] == '7');
    auVar162[0xc] = -(local_438[1] == '0');
    auVar162[0xd] = -(local_438[2] == '0');
    auVar162[0xe] = -(local_438[3] == '1');
    auVar162[0xf] = -(local_438[4] == '\0');
    auVar58[0] = -(local_448[0] == ' ');
    auVar58[1] = -(local_448[1] == ' ');
    auVar58[2] = -(local_448[2] == ' ');
    auVar58[3] = -(local_448[3] == ' ');
    auVar58[4] = -(local_448[4] == ' ');
    auVar58[5] = -(local_448[5] == ' ');
    auVar58[6] = -(local_448[6] == ' ');
    auVar58[7] = -(local_448[7] == ' ');
    auVar58[8] = -(local_448[8] == '0');
    auVar58[9] = -(local_448[9] == '3');
    auVar58[10] = -(local_448[10] == '7');
    auVar58[0xb] = -(local_448[0xb] == '7');
    auVar58[0xc] = -(local_448[0xc] == '7');
    auVar58[0xd] = -(local_448[0xd] == '7');
    auVar58[0xe] = -(local_448[0xe] == '7');
    auVar58[0xf] = -(local_448[0xf] == '7');
    auVar58 = auVar58 & auVar162;
    if ((ushort)((ushort)(SUB161(auVar58 >> 7,0) & 1) | (ushort)(SUB161(auVar58 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar58 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar58 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar58 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar58 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar58 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar58 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar58 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar58 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar58 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar58 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar58 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar58 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar58 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar58[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011cd9c;
  }
  else {
LAB_0011cd9c:
    main_cold_506();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%#20x",0x1234abcd);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_507();
  }
  if (iVar3 == 0x14) {
    auVar163[0] = -(local_448[5] == ' ');
    auVar163[1] = -(local_448[6] == ' ');
    auVar163[2] = -(local_448[7] == ' ');
    auVar163[3] = -(local_448[8] == ' ');
    auVar163[4] = -(local_448[9] == ' ');
    auVar163[5] = -(local_448[10] == '0');
    auVar163[6] = -(local_448[0xb] == 'x');
    auVar163[7] = -(local_448[0xc] == '1');
    auVar163[8] = -(local_448[0xd] == '2');
    auVar163[9] = -(local_448[0xe] == '3');
    auVar163[10] = -(local_448[0xf] == '4');
    auVar163[0xb] = -(local_438[0] == 'a');
    auVar163[0xc] = -(local_438[1] == 'b');
    auVar163[0xd] = -(local_438[2] == 'c');
    auVar163[0xe] = -(local_438[3] == 'd');
    auVar163[0xf] = -(local_438[4] == '\0');
    auVar59[0] = -(local_448[0] == ' ');
    auVar59[1] = -(local_448[1] == ' ');
    auVar59[2] = -(local_448[2] == ' ');
    auVar59[3] = -(local_448[3] == ' ');
    auVar59[4] = -(local_448[4] == ' ');
    auVar59[5] = -(local_448[5] == ' ');
    auVar59[6] = -(local_448[6] == ' ');
    auVar59[7] = -(local_448[7] == ' ');
    auVar59[8] = -(local_448[8] == ' ');
    auVar59[9] = -(local_448[9] == ' ');
    auVar59[10] = -(local_448[10] == '0');
    auVar59[0xb] = -(local_448[0xb] == 'x');
    auVar59[0xc] = -(local_448[0xc] == '1');
    auVar59[0xd] = -(local_448[0xd] == '2');
    auVar59[0xe] = -(local_448[0xe] == '3');
    auVar59[0xf] = -(local_448[0xf] == '4');
    auVar59 = auVar59 & auVar163;
    if ((ushort)((ushort)(SUB161(auVar59 >> 7,0) & 1) | (ushort)(SUB161(auVar59 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar59 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar59 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar59 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar59 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar59 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar59 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar59 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar59 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar59 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar59 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar59 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar59 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar59 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar59[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011cdad;
  }
  else {
LAB_0011cdad:
    main_cold_508();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%#20x",0xedcb5433);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_509();
  }
  if (iVar3 == 0x14) {
    auVar164[0] = -(local_448[5] == ' ');
    auVar164[1] = -(local_448[6] == ' ');
    auVar164[2] = -(local_448[7] == ' ');
    auVar164[3] = -(local_448[8] == ' ');
    auVar164[4] = -(local_448[9] == ' ');
    auVar164[5] = -(local_448[10] == '0');
    auVar164[6] = -(local_448[0xb] == 'x');
    auVar164[7] = -(local_448[0xc] == 'e');
    auVar164[8] = -(local_448[0xd] == 'd');
    auVar164[9] = -(local_448[0xe] == 'c');
    auVar164[10] = -(local_448[0xf] == 'b');
    auVar164[0xb] = -(local_438[0] == '5');
    auVar164[0xc] = -(local_438[1] == '4');
    auVar164[0xd] = -(local_438[2] == '3');
    auVar164[0xe] = -(local_438[3] == '3');
    auVar164[0xf] = -(local_438[4] == '\0');
    auVar60[0] = -(local_448[0] == ' ');
    auVar60[1] = -(local_448[1] == ' ');
    auVar60[2] = -(local_448[2] == ' ');
    auVar60[3] = -(local_448[3] == ' ');
    auVar60[4] = -(local_448[4] == ' ');
    auVar60[5] = -(local_448[5] == ' ');
    auVar60[6] = -(local_448[6] == ' ');
    auVar60[7] = -(local_448[7] == ' ');
    auVar60[8] = -(local_448[8] == ' ');
    auVar60[9] = -(local_448[9] == ' ');
    auVar60[10] = -(local_448[10] == '0');
    auVar60[0xb] = -(local_448[0xb] == 'x');
    auVar60[0xc] = -(local_448[0xc] == 'e');
    auVar60[0xd] = -(local_448[0xd] == 'd');
    auVar60[0xe] = -(local_448[0xe] == 'c');
    auVar60[0xf] = -(local_448[0xf] == 'b');
    auVar60 = auVar60 & auVar164;
    if ((ushort)((ushort)(SUB161(auVar60 >> 7,0) & 1) | (ushort)(SUB161(auVar60 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar60 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar60 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar60 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar60 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar60 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar60 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar60 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar60 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar60 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar60 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar60 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar60 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar60 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar60[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011cdbe;
  }
  else {
LAB_0011cdbe:
    main_cold_510();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%#20X",0x1234abcd);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_511();
  }
  if (iVar3 == 0x14) {
    auVar165[0] = -(local_448[5] == ' ');
    auVar165[1] = -(local_448[6] == ' ');
    auVar165[2] = -(local_448[7] == ' ');
    auVar165[3] = -(local_448[8] == ' ');
    auVar165[4] = -(local_448[9] == ' ');
    auVar165[5] = -(local_448[10] == '0');
    auVar165[6] = -(local_448[0xb] == 'X');
    auVar165[7] = -(local_448[0xc] == '1');
    auVar165[8] = -(local_448[0xd] == '2');
    auVar165[9] = -(local_448[0xe] == '3');
    auVar165[10] = -(local_448[0xf] == '4');
    auVar165[0xb] = -(local_438[0] == 'A');
    auVar165[0xc] = -(local_438[1] == 'B');
    auVar165[0xd] = -(local_438[2] == 'C');
    auVar165[0xe] = -(local_438[3] == 'D');
    auVar165[0xf] = -(local_438[4] == '\0');
    auVar61[0] = -(local_448[0] == ' ');
    auVar61[1] = -(local_448[1] == ' ');
    auVar61[2] = -(local_448[2] == ' ');
    auVar61[3] = -(local_448[3] == ' ');
    auVar61[4] = -(local_448[4] == ' ');
    auVar61[5] = -(local_448[5] == ' ');
    auVar61[6] = -(local_448[6] == ' ');
    auVar61[7] = -(local_448[7] == ' ');
    auVar61[8] = -(local_448[8] == ' ');
    auVar61[9] = -(local_448[9] == ' ');
    auVar61[10] = -(local_448[10] == '0');
    auVar61[0xb] = -(local_448[0xb] == 'X');
    auVar61[0xc] = -(local_448[0xc] == '1');
    auVar61[0xd] = -(local_448[0xd] == '2');
    auVar61[0xe] = -(local_448[0xe] == '3');
    auVar61[0xf] = -(local_448[0xf] == '4');
    auVar61 = auVar61 & auVar165;
    if ((ushort)((ushort)(SUB161(auVar61 >> 7,0) & 1) | (ushort)(SUB161(auVar61 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar61 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar61 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar61 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar61 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar61 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar61 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar61 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar61 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar61 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar61 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar61 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar61 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar61 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar61[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011cdcf;
  }
  else {
LAB_0011cdcf:
    main_cold_512();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%#20X",0xedcb5433);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_513();
  }
  if (iVar3 == 0x14) {
    auVar166[0] = -(local_448[5] == ' ');
    auVar166[1] = -(local_448[6] == ' ');
    auVar166[2] = -(local_448[7] == ' ');
    auVar166[3] = -(local_448[8] == ' ');
    auVar166[4] = -(local_448[9] == ' ');
    auVar166[5] = -(local_448[10] == '0');
    auVar166[6] = -(local_448[0xb] == 'X');
    auVar166[7] = -(local_448[0xc] == 'E');
    auVar166[8] = -(local_448[0xd] == 'D');
    auVar166[9] = -(local_448[0xe] == 'C');
    auVar166[10] = -(local_448[0xf] == 'B');
    auVar166[0xb] = -(local_438[0] == '5');
    auVar166[0xc] = -(local_438[1] == '4');
    auVar166[0xd] = -(local_438[2] == '3');
    auVar166[0xe] = -(local_438[3] == '3');
    auVar166[0xf] = -(local_438[4] == '\0');
    auVar62[0] = -(local_448[0] == ' ');
    auVar62[1] = -(local_448[1] == ' ');
    auVar62[2] = -(local_448[2] == ' ');
    auVar62[3] = -(local_448[3] == ' ');
    auVar62[4] = -(local_448[4] == ' ');
    auVar62[5] = -(local_448[5] == ' ');
    auVar62[6] = -(local_448[6] == ' ');
    auVar62[7] = -(local_448[7] == ' ');
    auVar62[8] = -(local_448[8] == ' ');
    auVar62[9] = -(local_448[9] == ' ');
    auVar62[10] = -(local_448[10] == '0');
    auVar62[0xb] = -(local_448[0xb] == 'X');
    auVar62[0xc] = -(local_448[0xc] == 'E');
    auVar62[0xd] = -(local_448[0xd] == 'D');
    auVar62[0xe] = -(local_448[0xe] == 'C');
    auVar62[0xf] = -(local_448[0xf] == 'B');
    auVar62 = auVar62 & auVar166;
    if ((ushort)((ushort)(SUB161(auVar62 >> 7,0) & 1) | (ushort)(SUB161(auVar62 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar62 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar62 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar62 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar62 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar62 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar62 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar62 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar62 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar62 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar62 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar62 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar62 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar62 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar62[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011cde0;
  }
  else {
LAB_0011cde0:
    main_cold_514();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%#020o",0x1ff);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_515();
  }
  if (iVar3 == 0x14) {
    auVar63[0] = -((char)local_3b8 == local_448[0]);
    auVar63[1] = -(local_3b8._1_1_ == local_448[1]);
    auVar63[2] = -(local_3b8._2_1_ == local_448[2]);
    auVar63[3] = -(local_3b8._3_1_ == local_448[3]);
    auVar63[4] = -(local_3b8._4_1_ == local_448[4]);
    auVar63[5] = -(local_3b8._5_1_ == local_448[5]);
    auVar63[6] = -(local_3b8._6_1_ == local_448[6]);
    auVar63[7] = -(local_3b8._7_1_ == local_448[7]);
    auVar63[8] = -((char)local_3b8 == local_448[8]);
    auVar63[9] = -(local_3b8._1_1_ == local_448[9]);
    auVar63[10] = -(local_3b8._2_1_ == local_448[10]);
    auVar63[0xb] = -(local_3b8._3_1_ == local_448[0xb]);
    auVar63[0xc] = -(local_3b8._4_1_ == local_448[0xc]);
    auVar63[0xd] = -(local_3b8._5_1_ == local_448[0xd]);
    auVar63[0xe] = -(local_3b8._6_1_ == local_448[0xe]);
    auVar63[0xf] = -(local_3b8._7_1_ == local_448[0xf]);
    auVar229[0] = -((char)local_3b8 == local_448[5]);
    auVar229[1] = -(local_3b8._1_1_ == local_448[6]);
    auVar229[2] = -(local_3b8._2_1_ == local_448[7]);
    auVar229[3] = -(local_3b8._3_1_ == local_448[8]);
    auVar229[4] = -(local_3b8._4_1_ == local_448[9]);
    auVar229[5] = -(local_3b8._5_1_ == local_448[10]);
    auVar229[6] = -(local_3b8._6_1_ == local_448[0xb]);
    auVar229[7] = -(local_3b8._7_1_ == local_448[0xc]);
    auVar229[8] = -((char)local_1f8 == local_448[0xd]);
    auVar229[9] = -((char)((ulong)local_1f8 >> 8) == local_448[0xe]);
    auVar229[10] = -((char)((ulong)local_1f8 >> 0x10) == local_448[0xf]);
    auVar229[0xb] = -((char)((ulong)local_1f8 >> 0x18) == local_438[0]);
    auVar229[0xc] = -((char)((ulong)local_1f8 >> 0x20) == local_438[1]);
    auVar229[0xd] = -((char)((ulong)local_1f8 >> 0x28) == local_438[2]);
    auVar229[0xe] = -((char)((ulong)local_1f8 >> 0x30) == local_438[3]);
    auVar229[0xf] = -((char)((ulong)local_1f8 >> 0x38) == local_438[4]);
    auVar63 = auVar63 & auVar229;
    if ((ushort)((ushort)(SUB161(auVar63 >> 7,0) & 1) | (ushort)(SUB161(auVar63 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar63 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar63 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar63 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar63 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar63 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar63 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar63 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar63 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar63 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar63 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar63 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar63 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar63 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar63[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011cdf1;
  }
  else {
LAB_0011cdf1:
    main_cold_516();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%#020o",0xfffffe01);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_517();
  }
  if (iVar3 == 0x14) {
    auVar64[0] = -((char)local_3b8 == local_448[0]);
    auVar64[1] = -(local_3b8._1_1_ == local_448[1]);
    auVar64[2] = -(local_3b8._2_1_ == local_448[2]);
    auVar64[3] = -(local_3b8._3_1_ == local_448[3]);
    auVar64[4] = -(local_3b8._4_1_ == local_448[4]);
    auVar64[5] = -(local_3b8._5_1_ == local_448[5]);
    auVar64[6] = -(local_3b8._6_1_ == local_448[6]);
    auVar64[7] = -(local_3b8._7_1_ == local_448[7]);
    auVar64[8] = -((char)local_208 == local_448[8]);
    auVar64[9] = -((char)((ulong)local_208 >> 8) == local_448[9]);
    auVar64[10] = -((char)((ulong)local_208 >> 0x10) == local_448[10]);
    auVar64[0xb] = -((char)((ulong)local_208 >> 0x18) == local_448[0xb]);
    auVar64[0xc] = -((char)((ulong)local_208 >> 0x20) == local_448[0xc]);
    auVar64[0xd] = -((char)((ulong)local_208 >> 0x28) == local_448[0xd]);
    auVar64[0xe] = -((char)((ulong)local_208 >> 0x30) == local_448[0xe]);
    auVar64[0xf] = -((char)((ulong)local_208 >> 0x38) == local_448[0xf]);
    auVar230[0] = -((char)local_1e8 == local_448[5]);
    auVar230[1] = -(local_1e8._1_1_ == local_448[6]);
    auVar230[2] = -(local_1e8._2_1_ == local_448[7]);
    auVar230[3] = -(local_1e8._3_1_ == local_448[8]);
    auVar230[4] = -(local_1e8._4_1_ == local_448[9]);
    auVar230[5] = -(local_1e8._5_1_ == local_448[10]);
    auVar230[6] = -(local_1e8._6_1_ == local_448[0xb]);
    auVar230[7] = -(local_1e8._7_1_ == local_448[0xc]);
    auVar230[8] = -((char)local_348 == local_448[0xd]);
    auVar230[9] = -((char)((ulong)local_348 >> 8) == local_448[0xe]);
    auVar230[10] = -((char)((ulong)local_348 >> 0x10) == local_448[0xf]);
    auVar230[0xb] = -((char)((ulong)local_348 >> 0x18) == local_438[0]);
    auVar230[0xc] = -((char)((ulong)local_348 >> 0x20) == local_438[1]);
    auVar230[0xd] = -((char)((ulong)local_348 >> 0x28) == local_438[2]);
    auVar230[0xe] = -((char)((ulong)local_348 >> 0x30) == local_438[3]);
    auVar230[0xf] = -((char)((ulong)local_348 >> 0x38) == local_438[4]);
    auVar64 = auVar64 & auVar230;
    if ((ushort)((ushort)(SUB161(auVar64 >> 7,0) & 1) | (ushort)(SUB161(auVar64 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar64 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar64 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar64 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar64 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar64 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar64 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar64 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar64 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar64 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar64 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar64 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar64 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar64 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar64[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011ce02;
  }
  else {
LAB_0011ce02:
    main_cold_518();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%#020x",0x1234abcd);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_519();
  }
  if (iVar3 == 0x14) {
    auVar65[0] = -(local_448[0] == '0');
    auVar65[1] = -(local_448[1] == 'x');
    auVar65[2] = -(local_448[2] == '0');
    auVar65[3] = -(local_448[3] == '0');
    auVar65[4] = -(local_448[4] == '0');
    auVar65[5] = -(local_448[5] == '0');
    auVar65[6] = -(local_448[6] == '0');
    auVar65[7] = -(local_448[7] == '0');
    auVar65[8] = -(local_448[8] == '0');
    auVar65[9] = -(local_448[9] == '0');
    auVar65[10] = -(local_448[10] == '0');
    auVar65[0xb] = -(local_448[0xb] == '0');
    auVar65[0xc] = -(local_448[0xc] == '1');
    auVar65[0xd] = -(local_448[0xd] == '2');
    auVar65[0xe] = -(local_448[0xe] == '3');
    auVar65[0xf] = -(local_448[0xf] == '4');
    auVar231[0] = -((char)local_368 == local_448[5]);
    auVar231[1] = -(local_368._1_1_ == local_448[6]);
    auVar231[2] = -(local_368._2_1_ == local_448[7]);
    auVar231[3] = -(local_368._3_1_ == local_448[8]);
    auVar231[4] = -(local_368._4_1_ == local_448[9]);
    auVar231[5] = -(local_368._5_1_ == local_448[10]);
    auVar231[6] = -(local_368._6_1_ == local_448[0xb]);
    auVar231[7] = -(local_368._7_1_ == local_448[0xc]);
    auVar231[8] = -((char)local_328 == local_448[0xd]);
    auVar231[9] = -((char)((ulong)local_328 >> 8) == local_448[0xe]);
    auVar231[10] = -((char)((ulong)local_328 >> 0x10) == local_448[0xf]);
    auVar231[0xb] = -((char)((ulong)local_328 >> 0x18) == local_438[0]);
    auVar231[0xc] = -((char)((ulong)local_328 >> 0x20) == local_438[1]);
    auVar231[0xd] = -((char)((ulong)local_328 >> 0x28) == local_438[2]);
    auVar231[0xe] = -((char)((ulong)local_328 >> 0x30) == local_438[3]);
    auVar231[0xf] = -((char)((ulong)local_328 >> 0x38) == local_438[4]);
    auVar65 = auVar65 & auVar231;
    if ((ushort)((ushort)(SUB161(auVar65 >> 7,0) & 1) | (ushort)(SUB161(auVar65 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar65 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar65 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar65 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar65 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar65 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar65 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar65 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar65 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar65 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar65 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar65 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar65 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar65 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar65[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011ce13;
  }
  else {
LAB_0011ce13:
    main_cold_520();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%#020x",0xedcb5433);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_521();
  }
  if (iVar3 == 0x14) {
    auVar66[0] = -(local_448[0] == '0');
    auVar66[1] = -(local_448[1] == 'x');
    auVar66[2] = -(local_448[2] == '0');
    auVar66[3] = -(local_448[3] == '0');
    auVar66[4] = -(local_448[4] == '0');
    auVar66[5] = -(local_448[5] == '0');
    auVar66[6] = -(local_448[6] == '0');
    auVar66[7] = -(local_448[7] == '0');
    auVar66[8] = -(local_448[8] == '0');
    auVar66[9] = -(local_448[9] == '0');
    auVar66[10] = -(local_448[10] == '0');
    auVar66[0xb] = -(local_448[0xb] == '0');
    auVar66[0xc] = -(local_448[0xc] == 'e');
    auVar66[0xd] = -(local_448[0xd] == 'd');
    auVar66[0xe] = -(local_448[0xe] == 'c');
    auVar66[0xf] = -(local_448[0xf] == 'b');
    auVar232[0] = -((char)local_218 == local_448[5]);
    auVar232[1] = -(local_218._1_1_ == local_448[6]);
    auVar232[2] = -(local_218._2_1_ == local_448[7]);
    auVar232[3] = -(local_218._3_1_ == local_448[8]);
    auVar232[4] = -(local_218._4_1_ == local_448[9]);
    auVar232[5] = -(local_218._5_1_ == local_448[10]);
    auVar232[6] = -(local_218._6_1_ == local_448[0xb]);
    auVar232[7] = -(local_218._7_1_ == local_448[0xc]);
    auVar232[8] = -((char)local_338 == local_448[0xd]);
    auVar232[9] = -((char)((ulong)local_338 >> 8) == local_448[0xe]);
    auVar232[10] = -((char)((ulong)local_338 >> 0x10) == local_448[0xf]);
    auVar232[0xb] = -((char)((ulong)local_338 >> 0x18) == local_438[0]);
    auVar232[0xc] = -((char)((ulong)local_338 >> 0x20) == local_438[1]);
    auVar232[0xd] = -((char)((ulong)local_338 >> 0x28) == local_438[2]);
    auVar232[0xe] = -((char)((ulong)local_338 >> 0x30) == local_438[3]);
    auVar232[0xf] = -((char)((ulong)local_338 >> 0x38) == local_438[4]);
    auVar66 = auVar66 & auVar232;
    if ((ushort)((ushort)(SUB161(auVar66 >> 7,0) & 1) | (ushort)(SUB161(auVar66 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar66 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar66 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar66 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar66 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar66 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar66 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar66 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar66 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar66 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar66 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar66 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar66 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar66 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar66[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011ce24;
  }
  else {
LAB_0011ce24:
    main_cold_522();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%#020X",0x1234abcd);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_523();
  }
  if (iVar3 == 0x14) {
    auVar67[0] = -(local_448[0] == '0');
    auVar67[1] = -(local_448[1] == 'X');
    auVar67[2] = -(local_448[2] == '0');
    auVar67[3] = -(local_448[3] == '0');
    auVar67[4] = -(local_448[4] == '0');
    auVar67[5] = -(local_448[5] == '0');
    auVar67[6] = -(local_448[6] == '0');
    auVar67[7] = -(local_448[7] == '0');
    auVar67[8] = -(local_448[8] == '0');
    auVar67[9] = -(local_448[9] == '0');
    auVar67[10] = -(local_448[10] == '0');
    auVar67[0xb] = -(local_448[0xb] == '0');
    auVar67[0xc] = -(local_448[0xc] == '1');
    auVar67[0xd] = -(local_448[0xd] == '2');
    auVar67[0xe] = -(local_448[0xe] == '3');
    auVar67[0xf] = -(local_448[0xf] == '4');
    auVar233[0] = -((char)local_368 == local_448[5]);
    auVar233[1] = -(local_368._1_1_ == local_448[6]);
    auVar233[2] = -(local_368._2_1_ == local_448[7]);
    auVar233[3] = -(local_368._3_1_ == local_448[8]);
    auVar233[4] = -(local_368._4_1_ == local_448[9]);
    auVar233[5] = -(local_368._5_1_ == local_448[10]);
    auVar233[6] = -(local_368._6_1_ == local_448[0xb]);
    auVar233[7] = -(local_368._7_1_ == local_448[0xc]);
    auVar233[8] = -((char)local_308 == local_448[0xd]);
    auVar233[9] = -((char)((ulong)local_308 >> 8) == local_448[0xe]);
    auVar233[10] = -((char)((ulong)local_308 >> 0x10) == local_448[0xf]);
    auVar233[0xb] = -((char)((ulong)local_308 >> 0x18) == local_438[0]);
    auVar233[0xc] = -((char)((ulong)local_308 >> 0x20) == local_438[1]);
    auVar233[0xd] = -((char)((ulong)local_308 >> 0x28) == local_438[2]);
    auVar233[0xe] = -((char)((ulong)local_308 >> 0x30) == local_438[3]);
    auVar233[0xf] = -((char)((ulong)local_308 >> 0x38) == local_438[4]);
    auVar67 = auVar67 & auVar233;
    if ((ushort)((ushort)(SUB161(auVar67 >> 7,0) & 1) | (ushort)(SUB161(auVar67 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar67 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar67 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar67 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar67 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar67 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar67 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar67 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar67 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar67 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar67 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar67 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar67 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar67 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar67[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011ce35;
  }
  else {
LAB_0011ce35:
    main_cold_524();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%#020X",0xedcb5433);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_525();
  }
  if (iVar3 == 0x14) {
    auVar68[0] = -(local_448[0] == '0');
    auVar68[1] = -(local_448[1] == 'X');
    auVar68[2] = -(local_448[2] == '0');
    auVar68[3] = -(local_448[3] == '0');
    auVar68[4] = -(local_448[4] == '0');
    auVar68[5] = -(local_448[5] == '0');
    auVar68[6] = -(local_448[6] == '0');
    auVar68[7] = -(local_448[7] == '0');
    auVar68[8] = -(local_448[8] == '0');
    auVar68[9] = -(local_448[9] == '0');
    auVar68[10] = -(local_448[10] == '0');
    auVar68[0xb] = -(local_448[0xb] == '0');
    auVar68[0xc] = -(local_448[0xc] == 'E');
    auVar68[0xd] = -(local_448[0xd] == 'D');
    auVar68[0xe] = -(local_448[0xe] == 'C');
    auVar68[0xf] = -(local_448[0xf] == 'B');
    auVar234[0] = -((char)local_228 == local_448[5]);
    auVar234[1] = -(local_228._1_1_ == local_448[6]);
    auVar234[2] = -(local_228._2_1_ == local_448[7]);
    auVar234[3] = -(local_228._3_1_ == local_448[8]);
    auVar234[4] = -(local_228._4_1_ == local_448[9]);
    auVar234[5] = -(local_228._5_1_ == local_448[10]);
    auVar234[6] = -(local_228._6_1_ == local_448[0xb]);
    auVar234[7] = -(local_228._7_1_ == local_448[0xc]);
    auVar234[8] = -((char)local_318 == local_448[0xd]);
    auVar234[9] = -((char)((ulong)local_318 >> 8) == local_448[0xe]);
    auVar234[10] = -((char)((ulong)local_318 >> 0x10) == local_448[0xf]);
    auVar234[0xb] = -((char)((ulong)local_318 >> 0x18) == local_438[0]);
    auVar234[0xc] = -((char)((ulong)local_318 >> 0x20) == local_438[1]);
    auVar234[0xd] = -((char)((ulong)local_318 >> 0x28) == local_438[2]);
    auVar234[0xe] = -((char)((ulong)local_318 >> 0x30) == local_438[3]);
    auVar234[0xf] = -((char)((ulong)local_318 >> 0x38) == local_438[4]);
    auVar68 = auVar68 & auVar234;
    if ((ushort)((ushort)(SUB161(auVar68 >> 7,0) & 1) | (ushort)(SUB161(auVar68 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar68 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar68 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar68 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar68 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar68 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar68 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar68 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar68 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar68 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar68 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar68 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar68 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar68 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar68[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011ce46;
  }
  else {
LAB_0011ce46:
    main_cold_526();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%0-20s","Hallo");
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_527();
  }
  if (iVar3 == 0x14) {
    auVar69[0] = -((char)local_118 == local_448[0]);
    auVar69[1] = -(local_118._1_1_ == local_448[1]);
    auVar69[2] = -(local_118._2_1_ == local_448[2]);
    auVar69[3] = -(local_118._3_1_ == local_448[3]);
    auVar69[4] = -(local_118._4_1_ == local_448[4]);
    auVar69[5] = -(local_118._5_1_ == local_448[5]);
    auVar69[6] = -(local_118._6_1_ == local_448[6]);
    auVar69[7] = -(local_118._7_1_ == local_448[7]);
    auVar69[8] = -(local_3d8 == local_448[8]);
    auVar69[9] = -(cStack_3d7 == local_448[9]);
    auVar69[10] = -(cStack_3d6 == local_448[10]);
    auVar69[0xb] = -(cStack_3d5 == local_448[0xb]);
    auVar69[0xc] = -(cStack_3d4 == local_448[0xc]);
    auVar69[0xd] = -(cStack_3d3 == local_448[0xd]);
    auVar69[0xe] = -(cStack_3d2 == local_448[0xe]);
    auVar69[0xf] = -(cStack_3d1 == local_448[0xf]);
    auVar235[0] = -(local_3d8 == local_448[5]);
    auVar235[1] = -(cStack_3d7 == local_448[6]);
    auVar235[2] = -(cStack_3d6 == local_448[7]);
    auVar235[3] = -(cStack_3d5 == local_448[8]);
    auVar235[4] = -(cStack_3d4 == local_448[9]);
    auVar235[5] = -(cStack_3d3 == local_448[10]);
    auVar235[6] = -(cStack_3d2 == local_448[0xb]);
    auVar235[7] = -(cStack_3d1 == local_448[0xc]);
    auVar235[8] = -((char)local_3c8 == local_448[0xd]);
    auVar235[9] = -((char)((ulong)local_3c8 >> 8) == local_448[0xe]);
    auVar235[10] = -((char)((ulong)local_3c8 >> 0x10) == local_448[0xf]);
    auVar235[0xb] = -((char)((ulong)local_3c8 >> 0x18) == local_438[0]);
    auVar235[0xc] = -((char)((ulong)local_3c8 >> 0x20) == local_438[1]);
    auVar235[0xd] = -((char)((ulong)local_3c8 >> 0x28) == local_438[2]);
    auVar235[0xe] = -((char)((ulong)local_3c8 >> 0x30) == local_438[3]);
    auVar235[0xf] = -((char)((ulong)local_3c8 >> 0x38) == local_438[4]);
    auVar69 = auVar69 & auVar235;
    if ((ushort)((ushort)(SUB161(auVar69 >> 7,0) & 1) | (ushort)(SUB161(auVar69 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar69 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar69 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar69 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar69 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar69 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar69 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar69 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar69 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar69 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar69 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar69 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar69 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar69 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar69[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011ce57;
  }
  else {
LAB_0011ce57:
    main_cold_528();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%0-20d",0x400);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_529();
  }
  if (iVar3 == 0x14) {
    auVar70[0] = -((char)local_378 == local_448[0]);
    auVar70[1] = -(local_378._1_1_ == local_448[1]);
    auVar70[2] = -(local_378._2_1_ == local_448[2]);
    auVar70[3] = -(local_378._3_1_ == local_448[3]);
    auVar70[4] = -(local_378._4_1_ == local_448[4]);
    auVar70[5] = -(local_378._5_1_ == local_448[5]);
    auVar70[6] = -(local_378._6_1_ == local_448[6]);
    auVar70[7] = -(local_378._7_1_ == local_448[7]);
    auVar70[8] = -(local_3d8 == local_448[8]);
    auVar70[9] = -(cStack_3d7 == local_448[9]);
    auVar70[10] = -(cStack_3d6 == local_448[10]);
    auVar70[0xb] = -(cStack_3d5 == local_448[0xb]);
    auVar70[0xc] = -(cStack_3d4 == local_448[0xc]);
    auVar70[0xd] = -(cStack_3d3 == local_448[0xd]);
    auVar70[0xe] = -(cStack_3d2 == local_448[0xe]);
    auVar70[0xf] = -(cStack_3d1 == local_448[0xf]);
    auVar236[0] = -(local_3d8 == local_448[5]);
    auVar236[1] = -(cStack_3d7 == local_448[6]);
    auVar236[2] = -(cStack_3d6 == local_448[7]);
    auVar236[3] = -(cStack_3d5 == local_448[8]);
    auVar236[4] = -(cStack_3d4 == local_448[9]);
    auVar236[5] = -(cStack_3d3 == local_448[10]);
    auVar236[6] = -(cStack_3d2 == local_448[0xb]);
    auVar236[7] = -(cStack_3d1 == local_448[0xc]);
    auVar236[8] = -((char)local_3c8 == local_448[0xd]);
    auVar236[9] = -((char)((ulong)local_3c8 >> 8) == local_448[0xe]);
    auVar236[10] = -((char)((ulong)local_3c8 >> 0x10) == local_448[0xf]);
    auVar236[0xb] = -((char)((ulong)local_3c8 >> 0x18) == local_438[0]);
    auVar236[0xc] = -((char)((ulong)local_3c8 >> 0x20) == local_438[1]);
    auVar236[0xd] = -((char)((ulong)local_3c8 >> 0x28) == local_438[2]);
    auVar236[0xe] = -((char)((ulong)local_3c8 >> 0x30) == local_438[3]);
    auVar236[0xf] = -((char)((ulong)local_3c8 >> 0x38) == local_438[4]);
    auVar70 = auVar70 & auVar236;
    if ((ushort)((ushort)(SUB161(auVar70 >> 7,0) & 1) | (ushort)(SUB161(auVar70 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar70 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar70 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar70 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar70 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar70 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar70 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar70 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar70 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar70 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar70 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar70 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar70 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar70 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar70[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011ce68;
  }
  else {
LAB_0011ce68:
    main_cold_530();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%0-20d",0xfffffc00);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_531();
  }
  if (iVar3 == 0x14) {
    auVar71[0] = -((char)local_2c8 == local_448[0]);
    auVar71[1] = -(local_2c8._1_1_ == local_448[1]);
    auVar71[2] = -(local_2c8._2_1_ == local_448[2]);
    auVar71[3] = -(local_2c8._3_1_ == local_448[3]);
    auVar71[4] = -(local_2c8._4_1_ == local_448[4]);
    auVar71[5] = -(local_2c8._5_1_ == local_448[5]);
    auVar71[6] = -(local_2c8._6_1_ == local_448[6]);
    auVar71[7] = -(local_2c8._7_1_ == local_448[7]);
    auVar71[8] = -(local_3d8 == local_448[8]);
    auVar71[9] = -(cStack_3d7 == local_448[9]);
    auVar71[10] = -(cStack_3d6 == local_448[10]);
    auVar71[0xb] = -(cStack_3d5 == local_448[0xb]);
    auVar71[0xc] = -(cStack_3d4 == local_448[0xc]);
    auVar71[0xd] = -(cStack_3d3 == local_448[0xd]);
    auVar71[0xe] = -(cStack_3d2 == local_448[0xe]);
    auVar71[0xf] = -(cStack_3d1 == local_448[0xf]);
    auVar237[0] = -(local_3d8 == local_448[5]);
    auVar237[1] = -(cStack_3d7 == local_448[6]);
    auVar237[2] = -(cStack_3d6 == local_448[7]);
    auVar237[3] = -(cStack_3d5 == local_448[8]);
    auVar237[4] = -(cStack_3d4 == local_448[9]);
    auVar237[5] = -(cStack_3d3 == local_448[10]);
    auVar237[6] = -(cStack_3d2 == local_448[0xb]);
    auVar237[7] = -(cStack_3d1 == local_448[0xc]);
    auVar237[8] = -((char)local_3c8 == local_448[0xd]);
    auVar237[9] = -((char)((ulong)local_3c8 >> 8) == local_448[0xe]);
    auVar237[10] = -((char)((ulong)local_3c8 >> 0x10) == local_448[0xf]);
    auVar237[0xb] = -((char)((ulong)local_3c8 >> 0x18) == local_438[0]);
    auVar237[0xc] = -((char)((ulong)local_3c8 >> 0x20) == local_438[1]);
    auVar237[0xd] = -((char)((ulong)local_3c8 >> 0x28) == local_438[2]);
    auVar237[0xe] = -((char)((ulong)local_3c8 >> 0x30) == local_438[3]);
    auVar237[0xf] = -((char)((ulong)local_3c8 >> 0x38) == local_438[4]);
    auVar71 = auVar71 & auVar237;
    if ((ushort)((ushort)(SUB161(auVar71 >> 7,0) & 1) | (ushort)(SUB161(auVar71 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar71 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar71 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar71 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar71 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar71 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar71 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar71 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar71 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar71 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar71 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar71 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar71 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar71 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar71[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011ce79;
  }
  else {
LAB_0011ce79:
    main_cold_532();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%0-20i",0x400);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_533();
  }
  if (iVar3 == 0x14) {
    auVar72[0] = -((char)local_378 == local_448[0]);
    auVar72[1] = -(local_378._1_1_ == local_448[1]);
    auVar72[2] = -(local_378._2_1_ == local_448[2]);
    auVar72[3] = -(local_378._3_1_ == local_448[3]);
    auVar72[4] = -(local_378._4_1_ == local_448[4]);
    auVar72[5] = -(local_378._5_1_ == local_448[5]);
    auVar72[6] = -(local_378._6_1_ == local_448[6]);
    auVar72[7] = -(local_378._7_1_ == local_448[7]);
    auVar72[8] = -(local_3d8 == local_448[8]);
    auVar72[9] = -(cStack_3d7 == local_448[9]);
    auVar72[10] = -(cStack_3d6 == local_448[10]);
    auVar72[0xb] = -(cStack_3d5 == local_448[0xb]);
    auVar72[0xc] = -(cStack_3d4 == local_448[0xc]);
    auVar72[0xd] = -(cStack_3d3 == local_448[0xd]);
    auVar72[0xe] = -(cStack_3d2 == local_448[0xe]);
    auVar72[0xf] = -(cStack_3d1 == local_448[0xf]);
    auVar238[0] = -(local_3d8 == local_448[5]);
    auVar238[1] = -(cStack_3d7 == local_448[6]);
    auVar238[2] = -(cStack_3d6 == local_448[7]);
    auVar238[3] = -(cStack_3d5 == local_448[8]);
    auVar238[4] = -(cStack_3d4 == local_448[9]);
    auVar238[5] = -(cStack_3d3 == local_448[10]);
    auVar238[6] = -(cStack_3d2 == local_448[0xb]);
    auVar238[7] = -(cStack_3d1 == local_448[0xc]);
    auVar238[8] = -((char)local_3c8 == local_448[0xd]);
    auVar238[9] = -((char)((ulong)local_3c8 >> 8) == local_448[0xe]);
    auVar238[10] = -((char)((ulong)local_3c8 >> 0x10) == local_448[0xf]);
    auVar238[0xb] = -((char)((ulong)local_3c8 >> 0x18) == local_438[0]);
    auVar238[0xc] = -((char)((ulong)local_3c8 >> 0x20) == local_438[1]);
    auVar238[0xd] = -((char)((ulong)local_3c8 >> 0x28) == local_438[2]);
    auVar238[0xe] = -((char)((ulong)local_3c8 >> 0x30) == local_438[3]);
    auVar238[0xf] = -((char)((ulong)local_3c8 >> 0x38) == local_438[4]);
    auVar72 = auVar72 & auVar238;
    if ((ushort)((ushort)(SUB161(auVar72 >> 7,0) & 1) | (ushort)(SUB161(auVar72 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar72 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar72 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar72 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar72 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar72 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar72 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar72 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar72 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar72 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar72 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar72 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar72 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar72 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar72[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011ce8a;
  }
  else {
LAB_0011ce8a:
    main_cold_534();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%0-20i",0xfffffc00);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_535();
  }
  if (iVar3 == 0x14) {
    auVar239[0] = -((char)local_2c8 == local_448[0]);
    auVar239[1] = -(local_2c8._1_1_ == local_448[1]);
    auVar239[2] = -(local_2c8._2_1_ == local_448[2]);
    auVar239[3] = -(local_2c8._3_1_ == local_448[3]);
    auVar239[4] = -(local_2c8._4_1_ == local_448[4]);
    auVar239[5] = -(local_2c8._5_1_ == local_448[5]);
    auVar239[6] = -(local_2c8._6_1_ == local_448[6]);
    auVar239[7] = -(local_2c8._7_1_ == local_448[7]);
    auVar239[8] = -(local_3d8 == local_448[8]);
    auVar239[9] = -(cStack_3d7 == local_448[9]);
    auVar239[10] = -(cStack_3d6 == local_448[10]);
    auVar239[0xb] = -(cStack_3d5 == local_448[0xb]);
    auVar239[0xc] = -(cStack_3d4 == local_448[0xc]);
    auVar239[0xd] = -(cStack_3d3 == local_448[0xd]);
    auVar239[0xe] = -(cStack_3d2 == local_448[0xe]);
    auVar239[0xf] = -(cStack_3d1 == local_448[0xf]);
    auVar167[0] = -(local_3d8 == local_448[5]);
    auVar167[1] = -(cStack_3d7 == local_448[6]);
    auVar167[2] = -(cStack_3d6 == local_448[7]);
    auVar167[3] = -(cStack_3d5 == local_448[8]);
    auVar167[4] = -(cStack_3d4 == local_448[9]);
    auVar167[5] = -(cStack_3d3 == local_448[10]);
    auVar167[6] = -(cStack_3d2 == local_448[0xb]);
    auVar167[7] = -(cStack_3d1 == local_448[0xc]);
    auVar167[8] = -((char)local_3c8 == local_448[0xd]);
    auVar167[9] = -((char)((ulong)local_3c8 >> 8) == local_448[0xe]);
    auVar167[10] = -((char)((ulong)local_3c8 >> 0x10) == local_448[0xf]);
    auVar167[0xb] = -((char)((ulong)local_3c8 >> 0x18) == local_438[0]);
    auVar167[0xc] = -((char)((ulong)local_3c8 >> 0x20) == local_438[1]);
    auVar167[0xd] = -((char)((ulong)local_3c8 >> 0x28) == local_438[2]);
    auVar167[0xe] = -((char)((ulong)local_3c8 >> 0x30) == local_438[3]);
    auVar167[0xf] = -((char)((ulong)local_3c8 >> 0x38) == local_438[4]);
    auVar239 = auVar239 & auVar167;
    if ((ushort)((ushort)(SUB161(auVar239 >> 7,0) & 1) |
                 (ushort)(SUB161(auVar239 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar239 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar239 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar239 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar239 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar239 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar239 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar239 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar239 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar239 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar239 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar239 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar239 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar239 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar239[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011ce9b;
  }
  else {
LAB_0011ce9b:
    main_cold_536();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%0-20u",0x400);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_537();
  }
  if (iVar3 == 0x14) {
    auVar240[0] = -((char)local_378 == local_448[0]);
    auVar240[1] = -(local_378._1_1_ == local_448[1]);
    auVar240[2] = -(local_378._2_1_ == local_448[2]);
    auVar240[3] = -(local_378._3_1_ == local_448[3]);
    auVar240[4] = -(local_378._4_1_ == local_448[4]);
    auVar240[5] = -(local_378._5_1_ == local_448[5]);
    auVar240[6] = -(local_378._6_1_ == local_448[6]);
    auVar240[7] = -(local_378._7_1_ == local_448[7]);
    auVar240[8] = -(local_3d8 == local_448[8]);
    auVar240[9] = -(cStack_3d7 == local_448[9]);
    auVar240[10] = -(cStack_3d6 == local_448[10]);
    auVar240[0xb] = -(cStack_3d5 == local_448[0xb]);
    auVar240[0xc] = -(cStack_3d4 == local_448[0xc]);
    auVar240[0xd] = -(cStack_3d3 == local_448[0xd]);
    auVar240[0xe] = -(cStack_3d2 == local_448[0xe]);
    auVar240[0xf] = -(cStack_3d1 == local_448[0xf]);
    auVar168[0] = -(local_3d8 == local_448[5]);
    auVar168[1] = -(cStack_3d7 == local_448[6]);
    auVar168[2] = -(cStack_3d6 == local_448[7]);
    auVar168[3] = -(cStack_3d5 == local_448[8]);
    auVar168[4] = -(cStack_3d4 == local_448[9]);
    auVar168[5] = -(cStack_3d3 == local_448[10]);
    auVar168[6] = -(cStack_3d2 == local_448[0xb]);
    auVar168[7] = -(cStack_3d1 == local_448[0xc]);
    auVar168[8] = -((char)local_3c8 == local_448[0xd]);
    auVar168[9] = -((char)((ulong)local_3c8 >> 8) == local_448[0xe]);
    auVar168[10] = -((char)((ulong)local_3c8 >> 0x10) == local_448[0xf]);
    auVar168[0xb] = -((char)((ulong)local_3c8 >> 0x18) == local_438[0]);
    auVar168[0xc] = -((char)((ulong)local_3c8 >> 0x20) == local_438[1]);
    auVar168[0xd] = -((char)((ulong)local_3c8 >> 0x28) == local_438[2]);
    auVar168[0xe] = -((char)((ulong)local_3c8 >> 0x30) == local_438[3]);
    auVar168[0xf] = -((char)((ulong)local_3c8 >> 0x38) == local_438[4]);
    auVar240 = auVar240 & auVar168;
    if ((ushort)((ushort)(SUB161(auVar240 >> 7,0) & 1) |
                 (ushort)(SUB161(auVar240 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar240 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar240 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar240 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar240 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar240 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar240 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar240 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar240 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar240 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar240 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar240 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar240 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar240 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar240[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011ceac;
  }
  else {
LAB_0011ceac:
    main_cold_538();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%0-20u",0xfffffc00);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_539();
  }
  if (iVar3 == 0x14) {
    auVar73[0] = -((char)local_d8 == local_448[0]);
    auVar73[1] = -(local_d8._1_1_ == local_448[1]);
    auVar73[2] = -(local_d8._2_1_ == local_448[2]);
    auVar73[3] = -(local_d8._3_1_ == local_448[3]);
    auVar73[4] = -(local_d8._4_1_ == local_448[4]);
    auVar73[5] = -(local_d8._5_1_ == local_448[5]);
    auVar73[6] = -(local_d8._6_1_ == local_448[6]);
    auVar73[7] = -(local_d8._7_1_ == local_448[7]);
    auVar73[8] = -((char)local_158 == local_448[8]);
    auVar73[9] = -((char)((ulong)local_158 >> 8) == local_448[9]);
    auVar73[10] = -((char)((ulong)local_158 >> 0x10) == local_448[10]);
    auVar73[0xb] = -((char)((ulong)local_158 >> 0x18) == local_448[0xb]);
    auVar73[0xc] = -((char)((ulong)local_158 >> 0x20) == local_448[0xc]);
    auVar73[0xd] = -((char)((ulong)local_158 >> 0x28) == local_448[0xd]);
    auVar73[0xe] = -((char)((ulong)local_158 >> 0x30) == local_448[0xe]);
    auVar73[0xf] = -((char)((ulong)local_158 >> 0x38) == local_448[0xf]);
    auVar241[0] = -((char)local_f8 == local_448[5]);
    auVar241[1] = -(local_f8._1_1_ == local_448[6]);
    auVar241[2] = -(local_f8._2_1_ == local_448[7]);
    auVar241[3] = -(local_f8._3_1_ == local_448[8]);
    auVar241[4] = -(local_f8._4_1_ == local_448[9]);
    auVar241[5] = -(local_f8._5_1_ == local_448[10]);
    auVar241[6] = -(local_f8._6_1_ == local_448[0xb]);
    auVar241[7] = -(local_f8._7_1_ == local_448[0xc]);
    auVar241[8] = -((char)local_3c8 == local_448[0xd]);
    auVar241[9] = -((char)((ulong)local_3c8 >> 8) == local_448[0xe]);
    auVar241[10] = -((char)((ulong)local_3c8 >> 0x10) == local_448[0xf]);
    auVar241[0xb] = -((char)((ulong)local_3c8 >> 0x18) == local_438[0]);
    auVar241[0xc] = -((char)((ulong)local_3c8 >> 0x20) == local_438[1]);
    auVar241[0xd] = -((char)((ulong)local_3c8 >> 0x28) == local_438[2]);
    auVar241[0xe] = -((char)((ulong)local_3c8 >> 0x30) == local_438[3]);
    auVar241[0xf] = -((char)((ulong)local_3c8 >> 0x38) == local_438[4]);
    auVar73 = auVar73 & auVar241;
    if ((ushort)((ushort)(SUB161(auVar73 >> 7,0) & 1) | (ushort)(SUB161(auVar73 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar73 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar73 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar73 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar73 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar73 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar73 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar73 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar73 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar73 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar73 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar73 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar73 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar73 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar73[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011cebd;
  }
  else {
LAB_0011cebd:
    main_cold_540();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%-020o",0x1ff);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_541();
  }
  if (iVar3 == 0x14) {
    auVar242[0] = -((char)local_98 == local_448[0]);
    auVar242[1] = -(local_98._1_1_ == local_448[1]);
    auVar242[2] = -(local_98._2_1_ == local_448[2]);
    auVar242[3] = -(local_98._3_1_ == local_448[3]);
    auVar242[4] = -(local_98._4_1_ == local_448[4]);
    auVar242[5] = -(local_98._5_1_ == local_448[5]);
    auVar242[6] = -(local_98._6_1_ == local_448[6]);
    auVar242[7] = -(local_98._7_1_ == local_448[7]);
    auVar242[8] = -(local_3d8 == local_448[8]);
    auVar242[9] = -(cStack_3d7 == local_448[9]);
    auVar242[10] = -(cStack_3d6 == local_448[10]);
    auVar242[0xb] = -(cStack_3d5 == local_448[0xb]);
    auVar242[0xc] = -(cStack_3d4 == local_448[0xc]);
    auVar242[0xd] = -(cStack_3d3 == local_448[0xd]);
    auVar242[0xe] = -(cStack_3d2 == local_448[0xe]);
    auVar242[0xf] = -(cStack_3d1 == local_448[0xf]);
    auVar169[0] = -(local_3d8 == local_448[5]);
    auVar169[1] = -(cStack_3d7 == local_448[6]);
    auVar169[2] = -(cStack_3d6 == local_448[7]);
    auVar169[3] = -(cStack_3d5 == local_448[8]);
    auVar169[4] = -(cStack_3d4 == local_448[9]);
    auVar169[5] = -(cStack_3d3 == local_448[10]);
    auVar169[6] = -(cStack_3d2 == local_448[0xb]);
    auVar169[7] = -(cStack_3d1 == local_448[0xc]);
    auVar169[8] = -((char)local_3c8 == local_448[0xd]);
    auVar169[9] = -((char)((ulong)local_3c8 >> 8) == local_448[0xe]);
    auVar169[10] = -((char)((ulong)local_3c8 >> 0x10) == local_448[0xf]);
    auVar169[0xb] = -((char)((ulong)local_3c8 >> 0x18) == local_438[0]);
    auVar169[0xc] = -((char)((ulong)local_3c8 >> 0x20) == local_438[1]);
    auVar169[0xd] = -((char)((ulong)local_3c8 >> 0x28) == local_438[2]);
    auVar169[0xe] = -((char)((ulong)local_3c8 >> 0x30) == local_438[3]);
    auVar169[0xf] = -((char)((ulong)local_3c8 >> 0x38) == local_438[4]);
    auVar242 = auVar242 & auVar169;
    if ((ushort)((ushort)(SUB161(auVar242 >> 7,0) & 1) |
                 (ushort)(SUB161(auVar242 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar242 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar242 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar242 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar242 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar242 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar242 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar242 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar242 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar242 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar242 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar242 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar242 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar242 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar242[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011cece;
  }
  else {
LAB_0011cece:
    main_cold_542();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%-020o",0xfffffe01);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_543();
  }
  if (iVar3 == 0x14) {
    auVar74[0] = -((char)local_108 == local_448[0]);
    auVar74[1] = -(local_108._1_1_ == local_448[1]);
    auVar74[2] = -(local_108._2_1_ == local_448[2]);
    auVar74[3] = -(local_108._3_1_ == local_448[3]);
    auVar74[4] = -(local_108._4_1_ == local_448[4]);
    auVar74[5] = -(local_108._5_1_ == local_448[5]);
    auVar74[6] = -(local_108._6_1_ == local_448[6]);
    auVar74[7] = -(local_108._7_1_ == local_448[7]);
    auVar74[8] = -((char)local_188 == local_448[8]);
    auVar74[9] = -((char)((ulong)local_188 >> 8) == local_448[9]);
    auVar74[10] = -((char)((ulong)local_188 >> 0x10) == local_448[10]);
    auVar74[0xb] = -((char)((ulong)local_188 >> 0x18) == local_448[0xb]);
    auVar74[0xc] = -((char)((ulong)local_188 >> 0x20) == local_448[0xc]);
    auVar74[0xd] = -((char)((ulong)local_188 >> 0x28) == local_448[0xd]);
    auVar74[0xe] = -((char)((ulong)local_188 >> 0x30) == local_448[0xe]);
    auVar74[0xf] = -((char)((ulong)local_188 >> 0x38) == local_448[0xf]);
    auVar243[0] = -((char)local_128 == local_448[5]);
    auVar243[1] = -(local_128._1_1_ == local_448[6]);
    auVar243[2] = -(local_128._2_1_ == local_448[7]);
    auVar243[3] = -(local_128._3_1_ == local_448[8]);
    auVar243[4] = -(local_128._4_1_ == local_448[9]);
    auVar243[5] = -(local_128._5_1_ == local_448[10]);
    auVar243[6] = -(local_128._6_1_ == local_448[0xb]);
    auVar243[7] = -(local_128._7_1_ == local_448[0xc]);
    auVar243[8] = -((char)local_3c8 == local_448[0xd]);
    auVar243[9] = -((char)((ulong)local_3c8 >> 8) == local_448[0xe]);
    auVar243[10] = -((char)((ulong)local_3c8 >> 0x10) == local_448[0xf]);
    auVar243[0xb] = -((char)((ulong)local_3c8 >> 0x18) == local_438[0]);
    auVar243[0xc] = -((char)((ulong)local_3c8 >> 0x20) == local_438[1]);
    auVar243[0xd] = -((char)((ulong)local_3c8 >> 0x28) == local_438[2]);
    auVar243[0xe] = -((char)((ulong)local_3c8 >> 0x30) == local_438[3]);
    auVar243[0xf] = -((char)((ulong)local_3c8 >> 0x38) == local_438[4]);
    auVar74 = auVar74 & auVar243;
    if ((ushort)((ushort)(SUB161(auVar74 >> 7,0) & 1) | (ushort)(SUB161(auVar74 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar74 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar74 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar74 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar74 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar74 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar74 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar74 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar74 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar74 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar74 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar74 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar74 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar74 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar74[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011cedf;
  }
  else {
LAB_0011cedf:
    main_cold_544();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%-020x",0x1234abcd);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_545();
  }
  if (iVar3 == 0x14) {
    auVar75[0] = -((char)local_138 == local_448[0]);
    auVar75[1] = -(local_138._1_1_ == local_448[1]);
    auVar75[2] = -(local_138._2_1_ == local_448[2]);
    auVar75[3] = -(local_138._3_1_ == local_448[3]);
    auVar75[4] = -(local_138._4_1_ == local_448[4]);
    auVar75[5] = -(local_138._5_1_ == local_448[5]);
    auVar75[6] = -(local_138._6_1_ == local_448[6]);
    auVar75[7] = -(local_138._7_1_ == local_448[7]);
    auVar75[8] = -(local_3d8 == local_448[8]);
    auVar75[9] = -(cStack_3d7 == local_448[9]);
    auVar75[10] = -(cStack_3d6 == local_448[10]);
    auVar75[0xb] = -(cStack_3d5 == local_448[0xb]);
    auVar75[0xc] = -(cStack_3d4 == local_448[0xc]);
    auVar75[0xd] = -(cStack_3d3 == local_448[0xd]);
    auVar75[0xe] = -(cStack_3d2 == local_448[0xe]);
    auVar75[0xf] = -(cStack_3d1 == local_448[0xf]);
    auVar244[0] = -((char)local_148 == local_448[5]);
    auVar244[1] = -(local_148._1_1_ == local_448[6]);
    auVar244[2] = -(local_148._2_1_ == local_448[7]);
    auVar244[3] = -(local_148._3_1_ == local_448[8]);
    auVar244[4] = -(local_148._4_1_ == local_448[9]);
    auVar244[5] = -(local_148._5_1_ == local_448[10]);
    auVar244[6] = -(local_148._6_1_ == local_448[0xb]);
    auVar244[7] = -(local_148._7_1_ == local_448[0xc]);
    auVar244[8] = -((char)local_3c8 == local_448[0xd]);
    auVar244[9] = -((char)((ulong)local_3c8 >> 8) == local_448[0xe]);
    auVar244[10] = -((char)((ulong)local_3c8 >> 0x10) == local_448[0xf]);
    auVar244[0xb] = -((char)((ulong)local_3c8 >> 0x18) == local_438[0]);
    auVar244[0xc] = -((char)((ulong)local_3c8 >> 0x20) == local_438[1]);
    auVar244[0xd] = -((char)((ulong)local_3c8 >> 0x28) == local_438[2]);
    auVar244[0xe] = -((char)((ulong)local_3c8 >> 0x30) == local_438[3]);
    auVar244[0xf] = -((char)((ulong)local_3c8 >> 0x38) == local_438[4]);
    auVar75 = auVar75 & auVar244;
    if ((ushort)((ushort)(SUB161(auVar75 >> 7,0) & 1) | (ushort)(SUB161(auVar75 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar75 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar75 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar75 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar75 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar75 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar75 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar75 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar75 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar75 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar75 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar75 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar75 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar75 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar75[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011cef0;
  }
  else {
LAB_0011cef0:
    main_cold_546();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%-020x",0xedcb5433);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_547();
  }
  if (iVar3 == 0x14) {
    auVar245[0] = -((char)local_a8 == local_448[0]);
    auVar245[1] = -(local_a8._1_1_ == local_448[1]);
    auVar245[2] = -(local_a8._2_1_ == local_448[2]);
    auVar245[3] = -(local_a8._3_1_ == local_448[3]);
    auVar245[4] = -(local_a8._4_1_ == local_448[4]);
    auVar245[5] = -(local_a8._5_1_ == local_448[5]);
    auVar245[6] = -(local_a8._6_1_ == local_448[6]);
    auVar245[7] = -(local_a8._7_1_ == local_448[7]);
    auVar245[8] = -(local_3d8 == local_448[8]);
    auVar245[9] = -(cStack_3d7 == local_448[9]);
    auVar245[10] = -(cStack_3d6 == local_448[10]);
    auVar245[0xb] = -(cStack_3d5 == local_448[0xb]);
    auVar245[0xc] = -(cStack_3d4 == local_448[0xc]);
    auVar245[0xd] = -(cStack_3d3 == local_448[0xd]);
    auVar245[0xe] = -(cStack_3d2 == local_448[0xe]);
    auVar245[0xf] = -(cStack_3d1 == local_448[0xf]);
    auVar170[0] = -((char)local_2d8 == local_448[5]);
    auVar170[1] = -(local_2d8._1_1_ == local_448[6]);
    auVar170[2] = -(local_2d8._2_1_ == local_448[7]);
    auVar170[3] = -(local_2d8._3_1_ == local_448[8]);
    auVar170[4] = -(local_2d8._4_1_ == local_448[9]);
    auVar170[5] = -(local_2d8._5_1_ == local_448[10]);
    auVar170[6] = -(local_2d8._6_1_ == local_448[0xb]);
    auVar170[7] = -(local_2d8._7_1_ == local_448[0xc]);
    auVar170[8] = -((char)local_3c8 == local_448[0xd]);
    auVar170[9] = -((char)((ulong)local_3c8 >> 8) == local_448[0xe]);
    auVar170[10] = -((char)((ulong)local_3c8 >> 0x10) == local_448[0xf]);
    auVar170[0xb] = -((char)((ulong)local_3c8 >> 0x18) == local_438[0]);
    auVar170[0xc] = -((char)((ulong)local_3c8 >> 0x20) == local_438[1]);
    auVar170[0xd] = -((char)((ulong)local_3c8 >> 0x28) == local_438[2]);
    auVar170[0xe] = -((char)((ulong)local_3c8 >> 0x30) == local_438[3]);
    auVar170[0xf] = -((char)((ulong)local_3c8 >> 0x38) == local_438[4]);
    auVar245 = auVar245 & auVar170;
    if ((ushort)((ushort)(SUB161(auVar245 >> 7,0) & 1) |
                 (ushort)(SUB161(auVar245 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar245 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar245 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar245 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar245 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar245 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar245 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar245 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar245 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar245 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar245 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar245 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar245 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar245 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar245[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011cf01;
  }
  else {
LAB_0011cf01:
    main_cold_548();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%-020X",0x1234abcd);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_549();
  }
  if (iVar3 == 0x14) {
    auVar76[0] = -((char)local_178 == local_448[0]);
    auVar76[1] = -(local_178._1_1_ == local_448[1]);
    auVar76[2] = -(local_178._2_1_ == local_448[2]);
    auVar76[3] = -(local_178._3_1_ == local_448[3]);
    auVar76[4] = -(local_178._4_1_ == local_448[4]);
    auVar76[5] = -(local_178._5_1_ == local_448[5]);
    auVar76[6] = -(local_178._6_1_ == local_448[6]);
    auVar76[7] = -(local_178._7_1_ == local_448[7]);
    auVar76[8] = -(local_3d8 == local_448[8]);
    auVar76[9] = -(cStack_3d7 == local_448[9]);
    auVar76[10] = -(cStack_3d6 == local_448[10]);
    auVar76[0xb] = -(cStack_3d5 == local_448[0xb]);
    auVar76[0xc] = -(cStack_3d4 == local_448[0xc]);
    auVar76[0xd] = -(cStack_3d3 == local_448[0xd]);
    auVar76[0xe] = -(cStack_3d2 == local_448[0xe]);
    auVar76[0xf] = -(cStack_3d1 == local_448[0xf]);
    auVar246[0] = -((char)local_198 == local_448[5]);
    auVar246[1] = -(local_198._1_1_ == local_448[6]);
    auVar246[2] = -(local_198._2_1_ == local_448[7]);
    auVar246[3] = -(local_198._3_1_ == local_448[8]);
    auVar246[4] = -(local_198._4_1_ == local_448[9]);
    auVar246[5] = -(local_198._5_1_ == local_448[10]);
    auVar246[6] = -(local_198._6_1_ == local_448[0xb]);
    auVar246[7] = -(local_198._7_1_ == local_448[0xc]);
    auVar246[8] = -((char)local_3c8 == local_448[0xd]);
    auVar246[9] = -((char)((ulong)local_3c8 >> 8) == local_448[0xe]);
    auVar246[10] = -((char)((ulong)local_3c8 >> 0x10) == local_448[0xf]);
    auVar246[0xb] = -((char)((ulong)local_3c8 >> 0x18) == local_438[0]);
    auVar246[0xc] = -((char)((ulong)local_3c8 >> 0x20) == local_438[1]);
    auVar246[0xd] = -((char)((ulong)local_3c8 >> 0x28) == local_438[2]);
    auVar246[0xe] = -((char)((ulong)local_3c8 >> 0x30) == local_438[3]);
    auVar246[0xf] = -((char)((ulong)local_3c8 >> 0x38) == local_438[4]);
    auVar76 = auVar76 & auVar246;
    if ((ushort)((ushort)(SUB161(auVar76 >> 7,0) & 1) | (ushort)(SUB161(auVar76 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar76 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar76 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar76 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar76 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar76 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar76 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar76 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar76 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar76 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar76 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar76 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar76 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar76 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar76[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011cf12;
  }
  else {
LAB_0011cf12:
    main_cold_550();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%-020X",0xedcb5433);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_551();
  }
  if (iVar3 == 0x14) {
    auVar247[0] = -((char)local_b8 == local_448[0]);
    auVar247[1] = -(local_b8._1_1_ == local_448[1]);
    auVar247[2] = -(local_b8._2_1_ == local_448[2]);
    auVar247[3] = -(local_b8._3_1_ == local_448[3]);
    auVar247[4] = -(local_b8._4_1_ == local_448[4]);
    auVar247[5] = -(local_b8._5_1_ == local_448[5]);
    auVar247[6] = -(local_b8._6_1_ == local_448[6]);
    auVar247[7] = -(local_b8._7_1_ == local_448[7]);
    auVar247[8] = -(local_3d8 == local_448[8]);
    auVar247[9] = -(cStack_3d7 == local_448[9]);
    auVar247[10] = -(cStack_3d6 == local_448[10]);
    auVar247[0xb] = -(cStack_3d5 == local_448[0xb]);
    auVar247[0xc] = -(cStack_3d4 == local_448[0xc]);
    auVar247[0xd] = -(cStack_3d3 == local_448[0xd]);
    auVar247[0xe] = -(cStack_3d2 == local_448[0xe]);
    auVar247[0xf] = -(cStack_3d1 == local_448[0xf]);
    auVar171[0] = -((char)local_2d8 == local_448[5]);
    auVar171[1] = -(local_2d8._1_1_ == local_448[6]);
    auVar171[2] = -(local_2d8._2_1_ == local_448[7]);
    auVar171[3] = -(local_2d8._3_1_ == local_448[8]);
    auVar171[4] = -(local_2d8._4_1_ == local_448[9]);
    auVar171[5] = -(local_2d8._5_1_ == local_448[10]);
    auVar171[6] = -(local_2d8._6_1_ == local_448[0xb]);
    auVar171[7] = -(local_2d8._7_1_ == local_448[0xc]);
    auVar171[8] = -((char)local_3c8 == local_448[0xd]);
    auVar171[9] = -((char)((ulong)local_3c8 >> 8) == local_448[0xe]);
    auVar171[10] = -((char)((ulong)local_3c8 >> 0x10) == local_448[0xf]);
    auVar171[0xb] = -((char)((ulong)local_3c8 >> 0x18) == local_438[0]);
    auVar171[0xc] = -((char)((ulong)local_3c8 >> 0x20) == local_438[1]);
    auVar171[0xd] = -((char)((ulong)local_3c8 >> 0x28) == local_438[2]);
    auVar171[0xe] = -((char)((ulong)local_3c8 >> 0x30) == local_438[3]);
    auVar171[0xf] = -((char)((ulong)local_3c8 >> 0x38) == local_438[4]);
    auVar247 = auVar247 & auVar171;
    if ((ushort)((ushort)(SUB161(auVar247 >> 7,0) & 1) |
                 (ushort)(SUB161(auVar247 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar247 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar247 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar247 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar247 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar247 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar247 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar247 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar247 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar247 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar247 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar247 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar247 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar247 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar247[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011cf23;
  }
  else {
LAB_0011cf23:
    main_cold_552();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%-020c",0x78);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_553();
  }
  if (iVar3 == 0x14) {
    auVar248[0] = -((char)local_c8 == local_448[0]);
    auVar248[1] = -(local_c8._1_1_ == local_448[1]);
    auVar248[2] = -(local_c8._2_1_ == local_448[2]);
    auVar248[3] = -(local_c8._3_1_ == local_448[3]);
    auVar248[4] = -(local_c8._4_1_ == local_448[4]);
    auVar248[5] = -(local_c8._5_1_ == local_448[5]);
    auVar248[6] = -(local_c8._6_1_ == local_448[6]);
    auVar248[7] = -(local_c8._7_1_ == local_448[7]);
    auVar248[8] = -(local_3d8 == local_448[8]);
    auVar248[9] = -(cStack_3d7 == local_448[9]);
    auVar248[10] = -(cStack_3d6 == local_448[10]);
    auVar248[0xb] = -(cStack_3d5 == local_448[0xb]);
    auVar248[0xc] = -(cStack_3d4 == local_448[0xc]);
    auVar248[0xd] = -(cStack_3d3 == local_448[0xd]);
    auVar248[0xe] = -(cStack_3d2 == local_448[0xe]);
    auVar248[0xf] = -(cStack_3d1 == local_448[0xf]);
    auVar172[0] = -(local_3d8 == local_448[5]);
    auVar172[1] = -(cStack_3d7 == local_448[6]);
    auVar172[2] = -(cStack_3d6 == local_448[7]);
    auVar172[3] = -(cStack_3d5 == local_448[8]);
    auVar172[4] = -(cStack_3d4 == local_448[9]);
    auVar172[5] = -(cStack_3d3 == local_448[10]);
    auVar172[6] = -(cStack_3d2 == local_448[0xb]);
    auVar172[7] = -(cStack_3d1 == local_448[0xc]);
    auVar172[8] = -((char)local_3c8 == local_448[0xd]);
    auVar172[9] = -((char)((ulong)local_3c8 >> 8) == local_448[0xe]);
    auVar172[10] = -((char)((ulong)local_3c8 >> 0x10) == local_448[0xf]);
    auVar172[0xb] = -((char)((ulong)local_3c8 >> 0x18) == local_438[0]);
    auVar172[0xc] = -((char)((ulong)local_3c8 >> 0x20) == local_438[1]);
    auVar172[0xd] = -((char)((ulong)local_3c8 >> 0x28) == local_438[2]);
    auVar172[0xe] = -((char)((ulong)local_3c8 >> 0x30) == local_438[3]);
    auVar172[0xf] = -((char)((ulong)local_3c8 >> 0x38) == local_438[4]);
    auVar248 = auVar248 & auVar172;
    if ((ushort)((ushort)(SUB161(auVar248 >> 7,0) & 1) |
                 (ushort)(SUB161(auVar248 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar248 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar248 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar248 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar248 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar248 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar248 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar248 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar248 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar248 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar248 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar248 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar248 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar248 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar248[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011cf34;
  }
  else {
LAB_0011cf34:
    main_cold_554();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%*s",0x14,"Hallo");
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_555();
  }
  if (iVar3 == 0x14) {
    auVar77[0] = -(local_3d8 == local_448[0]);
    auVar77[1] = -(cStack_3d7 == local_448[1]);
    auVar77[2] = -(cStack_3d6 == local_448[2]);
    auVar77[3] = -(cStack_3d5 == local_448[3]);
    auVar77[4] = -(cStack_3d4 == local_448[4]);
    auVar77[5] = -(cStack_3d3 == local_448[5]);
    auVar77[6] = -(cStack_3d2 == local_448[6]);
    auVar77[7] = -(cStack_3d1 == local_448[7]);
    auVar77[8] = -((char)local_1d8 == local_448[8]);
    auVar77[9] = -((char)((ulong)local_1d8 >> 8) == local_448[9]);
    auVar77[10] = -((char)((ulong)local_1d8 >> 0x10) == local_448[10]);
    auVar77[0xb] = -((char)((ulong)local_1d8 >> 0x18) == local_448[0xb]);
    auVar77[0xc] = -((char)((ulong)local_1d8 >> 0x20) == local_448[0xc]);
    auVar77[0xd] = -((char)((ulong)local_1d8 >> 0x28) == local_448[0xd]);
    auVar77[0xe] = -((char)((ulong)local_1d8 >> 0x30) == local_448[0xe]);
    auVar77[0xf] = -((char)((ulong)local_1d8 >> 0x38) == local_448[0xf]);
    auVar249[0] = -(local_3d8 == local_448[5]);
    auVar249[1] = -(cStack_3d7 == local_448[6]);
    auVar249[2] = -(cStack_3d6 == local_448[7]);
    auVar249[3] = -(cStack_3d5 == local_448[8]);
    auVar249[4] = -(cStack_3d4 == local_448[9]);
    auVar249[5] = -(cStack_3d3 == local_448[10]);
    auVar249[6] = -(cStack_3d2 == local_448[0xb]);
    auVar249[7] = -(cStack_3d1 == local_448[0xc]);
    auVar249[8] = -((char)local_278 == local_448[0xd]);
    auVar249[9] = -((char)((ulong)local_278 >> 8) == local_448[0xe]);
    auVar249[10] = -((char)((ulong)local_278 >> 0x10) == local_448[0xf]);
    auVar249[0xb] = -((char)((ulong)local_278 >> 0x18) == local_438[0]);
    auVar249[0xc] = -((char)((ulong)local_278 >> 0x20) == local_438[1]);
    auVar249[0xd] = -((char)((ulong)local_278 >> 0x28) == local_438[2]);
    auVar249[0xe] = -((char)((ulong)local_278 >> 0x30) == local_438[3]);
    auVar249[0xf] = -((char)((ulong)local_278 >> 0x38) == local_438[4]);
    auVar77 = auVar77 & auVar249;
    if ((ushort)((ushort)(SUB161(auVar77 >> 7,0) & 1) | (ushort)(SUB161(auVar77 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar77 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar77 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar77 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar77 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar77 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar77 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar77 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar77 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar77 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar77 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar77 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar77 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar77 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar77[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011cf45;
  }
  else {
LAB_0011cf45:
    main_cold_556();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%*d",0x14,0x400);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_557();
  }
  if (iVar3 == 0x14) {
    auVar78[0] = -(local_3d8 == local_448[0]);
    auVar78[1] = -(cStack_3d7 == local_448[1]);
    auVar78[2] = -(cStack_3d6 == local_448[2]);
    auVar78[3] = -(cStack_3d5 == local_448[3]);
    auVar78[4] = -(cStack_3d4 == local_448[4]);
    auVar78[5] = -(cStack_3d3 == local_448[5]);
    auVar78[6] = -(cStack_3d2 == local_448[6]);
    auVar78[7] = -(cStack_3d1 == local_448[7]);
    auVar78[8] = -(local_3d8 == local_448[8]);
    auVar78[9] = -(cStack_3d7 == local_448[9]);
    auVar78[10] = -(cStack_3d6 == local_448[10]);
    auVar78[0xb] = -(cStack_3d5 == local_448[0xb]);
    auVar78[0xc] = -(cStack_3d4 == local_448[0xc]);
    auVar78[0xd] = -(cStack_3d3 == local_448[0xd]);
    auVar78[0xe] = -(cStack_3d2 == local_448[0xe]);
    auVar78[0xf] = -(cStack_3d1 == local_448[0xf]);
    auVar250[0] = -(local_3d8 == local_448[5]);
    auVar250[1] = -(cStack_3d7 == local_448[6]);
    auVar250[2] = -(cStack_3d6 == local_448[7]);
    auVar250[3] = -(cStack_3d5 == local_448[8]);
    auVar250[4] = -(cStack_3d4 == local_448[9]);
    auVar250[5] = -(cStack_3d3 == local_448[10]);
    auVar250[6] = -(cStack_3d2 == local_448[0xb]);
    auVar250[7] = -(cStack_3d1 == local_448[0xc]);
    auVar250[8] = -((char)local_358 == local_448[0xd]);
    auVar250[9] = -((char)((ulong)local_358 >> 8) == local_448[0xe]);
    auVar250[10] = -((char)((ulong)local_358 >> 0x10) == local_448[0xf]);
    auVar250[0xb] = -((char)((ulong)local_358 >> 0x18) == local_438[0]);
    auVar250[0xc] = -((char)((ulong)local_358 >> 0x20) == local_438[1]);
    auVar250[0xd] = -((char)((ulong)local_358 >> 0x28) == local_438[2]);
    auVar250[0xe] = -((char)((ulong)local_358 >> 0x30) == local_438[3]);
    auVar250[0xf] = -((char)((ulong)local_358 >> 0x38) == local_438[4]);
    auVar78 = auVar78 & auVar250;
    if ((ushort)((ushort)(SUB161(auVar78 >> 7,0) & 1) | (ushort)(SUB161(auVar78 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar78 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar78 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar78 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar78 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar78 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar78 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar78 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar78 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar78 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar78 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar78 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar78 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar78 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar78[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011cf56;
  }
  else {
LAB_0011cf56:
    main_cold_558();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%*d",0x14,0xfffffc00);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_559();
  }
  if (iVar3 == 0x14) {
    auVar79[0] = -(local_3d8 == local_448[0]);
    auVar79[1] = -(cStack_3d7 == local_448[1]);
    auVar79[2] = -(cStack_3d6 == local_448[2]);
    auVar79[3] = -(cStack_3d5 == local_448[3]);
    auVar79[4] = -(cStack_3d4 == local_448[4]);
    auVar79[5] = -(cStack_3d3 == local_448[5]);
    auVar79[6] = -(cStack_3d2 == local_448[6]);
    auVar79[7] = -(cStack_3d1 == local_448[7]);
    auVar79[8] = -((char)local_298 == local_448[8]);
    auVar79[9] = -((char)((ulong)local_298 >> 8) == local_448[9]);
    auVar79[10] = -((char)((ulong)local_298 >> 0x10) == local_448[10]);
    auVar79[0xb] = -((char)((ulong)local_298 >> 0x18) == local_448[0xb]);
    auVar79[0xc] = -((char)((ulong)local_298 >> 0x20) == local_448[0xc]);
    auVar79[0xd] = -((char)((ulong)local_298 >> 0x28) == local_448[0xd]);
    auVar79[0xe] = -((char)((ulong)local_298 >> 0x30) == local_448[0xe]);
    auVar79[0xf] = -((char)((ulong)local_298 >> 0x38) == local_448[0xf]);
    auVar251[0] = -(local_3d8 == local_448[5]);
    auVar251[1] = -(cStack_3d7 == local_448[6]);
    auVar251[2] = -(cStack_3d6 == local_448[7]);
    auVar251[3] = -(cStack_3d5 == local_448[8]);
    auVar251[4] = -(cStack_3d4 == local_448[9]);
    auVar251[5] = -(cStack_3d3 == local_448[10]);
    auVar251[6] = -(cStack_3d2 == local_448[0xb]);
    auVar251[7] = -(cStack_3d1 == local_448[0xc]);
    auVar251[8] = -((char)local_288 == local_448[0xd]);
    auVar251[9] = -((char)((ulong)local_288 >> 8) == local_448[0xe]);
    auVar251[10] = -((char)((ulong)local_288 >> 0x10) == local_448[0xf]);
    auVar251[0xb] = -((char)((ulong)local_288 >> 0x18) == local_438[0]);
    auVar251[0xc] = -((char)((ulong)local_288 >> 0x20) == local_438[1]);
    auVar251[0xd] = -((char)((ulong)local_288 >> 0x28) == local_438[2]);
    auVar251[0xe] = -((char)((ulong)local_288 >> 0x30) == local_438[3]);
    auVar251[0xf] = -((char)((ulong)local_288 >> 0x38) == local_438[4]);
    auVar79 = auVar79 & auVar251;
    if ((ushort)((ushort)(SUB161(auVar79 >> 7,0) & 1) | (ushort)(SUB161(auVar79 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar79 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar79 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar79 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar79 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar79 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar79 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar79 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar79 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar79 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar79 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar79 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar79 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar79 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar79[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011cf67;
  }
  else {
LAB_0011cf67:
    main_cold_560();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%*i",0x14,0x400);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_561();
  }
  if (iVar3 == 0x14) {
    auVar80[0] = -(local_3d8 == local_448[0]);
    auVar80[1] = -(cStack_3d7 == local_448[1]);
    auVar80[2] = -(cStack_3d6 == local_448[2]);
    auVar80[3] = -(cStack_3d5 == local_448[3]);
    auVar80[4] = -(cStack_3d4 == local_448[4]);
    auVar80[5] = -(cStack_3d3 == local_448[5]);
    auVar80[6] = -(cStack_3d2 == local_448[6]);
    auVar80[7] = -(cStack_3d1 == local_448[7]);
    auVar80[8] = -(local_3d8 == local_448[8]);
    auVar80[9] = -(cStack_3d7 == local_448[9]);
    auVar80[10] = -(cStack_3d6 == local_448[10]);
    auVar80[0xb] = -(cStack_3d5 == local_448[0xb]);
    auVar80[0xc] = -(cStack_3d4 == local_448[0xc]);
    auVar80[0xd] = -(cStack_3d3 == local_448[0xd]);
    auVar80[0xe] = -(cStack_3d2 == local_448[0xe]);
    auVar80[0xf] = -(cStack_3d1 == local_448[0xf]);
    auVar252[0] = -(local_3d8 == local_448[5]);
    auVar252[1] = -(cStack_3d7 == local_448[6]);
    auVar252[2] = -(cStack_3d6 == local_448[7]);
    auVar252[3] = -(cStack_3d5 == local_448[8]);
    auVar252[4] = -(cStack_3d4 == local_448[9]);
    auVar252[5] = -(cStack_3d3 == local_448[10]);
    auVar252[6] = -(cStack_3d2 == local_448[0xb]);
    auVar252[7] = -(cStack_3d1 == local_448[0xc]);
    auVar252[8] = -((char)local_358 == local_448[0xd]);
    auVar252[9] = -((char)((ulong)local_358 >> 8) == local_448[0xe]);
    auVar252[10] = -((char)((ulong)local_358 >> 0x10) == local_448[0xf]);
    auVar252[0xb] = -((char)((ulong)local_358 >> 0x18) == local_438[0]);
    auVar252[0xc] = -((char)((ulong)local_358 >> 0x20) == local_438[1]);
    auVar252[0xd] = -((char)((ulong)local_358 >> 0x28) == local_438[2]);
    auVar252[0xe] = -((char)((ulong)local_358 >> 0x30) == local_438[3]);
    auVar252[0xf] = -((char)((ulong)local_358 >> 0x38) == local_438[4]);
    auVar80 = auVar80 & auVar252;
    if ((ushort)((ushort)(SUB161(auVar80 >> 7,0) & 1) | (ushort)(SUB161(auVar80 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar80 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar80 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar80 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar80 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar80 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar80 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar80 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar80 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar80 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar80 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar80 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar80 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar80 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar80[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011cf78;
  }
  else {
LAB_0011cf78:
    main_cold_562();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%*i",0x14,0xfffffc00);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_563();
  }
  if (iVar3 == 0x14) {
    auVar81[0] = -(local_3d8 == local_448[0]);
    auVar81[1] = -(cStack_3d7 == local_448[1]);
    auVar81[2] = -(cStack_3d6 == local_448[2]);
    auVar81[3] = -(cStack_3d5 == local_448[3]);
    auVar81[4] = -(cStack_3d4 == local_448[4]);
    auVar81[5] = -(cStack_3d3 == local_448[5]);
    auVar81[6] = -(cStack_3d2 == local_448[6]);
    auVar81[7] = -(cStack_3d1 == local_448[7]);
    auVar81[8] = -((char)local_298 == local_448[8]);
    auVar81[9] = -((char)((ulong)local_298 >> 8) == local_448[9]);
    auVar81[10] = -((char)((ulong)local_298 >> 0x10) == local_448[10]);
    auVar81[0xb] = -((char)((ulong)local_298 >> 0x18) == local_448[0xb]);
    auVar81[0xc] = -((char)((ulong)local_298 >> 0x20) == local_448[0xc]);
    auVar81[0xd] = -((char)((ulong)local_298 >> 0x28) == local_448[0xd]);
    auVar81[0xe] = -((char)((ulong)local_298 >> 0x30) == local_448[0xe]);
    auVar81[0xf] = -((char)((ulong)local_298 >> 0x38) == local_448[0xf]);
    auVar253[0] = -(local_3d8 == local_448[5]);
    auVar253[1] = -(cStack_3d7 == local_448[6]);
    auVar253[2] = -(cStack_3d6 == local_448[7]);
    auVar253[3] = -(cStack_3d5 == local_448[8]);
    auVar253[4] = -(cStack_3d4 == local_448[9]);
    auVar253[5] = -(cStack_3d3 == local_448[10]);
    auVar253[6] = -(cStack_3d2 == local_448[0xb]);
    auVar253[7] = -(cStack_3d1 == local_448[0xc]);
    auVar253[8] = -((char)local_288 == local_448[0xd]);
    auVar253[9] = -((char)((ulong)local_288 >> 8) == local_448[0xe]);
    auVar253[10] = -((char)((ulong)local_288 >> 0x10) == local_448[0xf]);
    auVar253[0xb] = -((char)((ulong)local_288 >> 0x18) == local_438[0]);
    auVar253[0xc] = -((char)((ulong)local_288 >> 0x20) == local_438[1]);
    auVar253[0xd] = -((char)((ulong)local_288 >> 0x28) == local_438[2]);
    auVar253[0xe] = -((char)((ulong)local_288 >> 0x30) == local_438[3]);
    auVar253[0xf] = -((char)((ulong)local_288 >> 0x38) == local_438[4]);
    auVar81 = auVar81 & auVar253;
    if ((ushort)((ushort)(SUB161(auVar81 >> 7,0) & 1) | (ushort)(SUB161(auVar81 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar81 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar81 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar81 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar81 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar81 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar81 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar81 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar81 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar81 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar81 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar81 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar81 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar81 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar81[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011cf89;
  }
  else {
LAB_0011cf89:
    main_cold_564();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%*u",0x14,0x400);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_565();
  }
  if (iVar3 == 0x14) {
    auVar82[0] = -(local_3d8 == local_448[0]);
    auVar82[1] = -(cStack_3d7 == local_448[1]);
    auVar82[2] = -(cStack_3d6 == local_448[2]);
    auVar82[3] = -(cStack_3d5 == local_448[3]);
    auVar82[4] = -(cStack_3d4 == local_448[4]);
    auVar82[5] = -(cStack_3d3 == local_448[5]);
    auVar82[6] = -(cStack_3d2 == local_448[6]);
    auVar82[7] = -(cStack_3d1 == local_448[7]);
    auVar82[8] = -(local_3d8 == local_448[8]);
    auVar82[9] = -(cStack_3d7 == local_448[9]);
    auVar82[10] = -(cStack_3d6 == local_448[10]);
    auVar82[0xb] = -(cStack_3d5 == local_448[0xb]);
    auVar82[0xc] = -(cStack_3d4 == local_448[0xc]);
    auVar82[0xd] = -(cStack_3d3 == local_448[0xd]);
    auVar82[0xe] = -(cStack_3d2 == local_448[0xe]);
    auVar82[0xf] = -(cStack_3d1 == local_448[0xf]);
    auVar254[0] = -(local_3d8 == local_448[5]);
    auVar254[1] = -(cStack_3d7 == local_448[6]);
    auVar254[2] = -(cStack_3d6 == local_448[7]);
    auVar254[3] = -(cStack_3d5 == local_448[8]);
    auVar254[4] = -(cStack_3d4 == local_448[9]);
    auVar254[5] = -(cStack_3d3 == local_448[10]);
    auVar254[6] = -(cStack_3d2 == local_448[0xb]);
    auVar254[7] = -(cStack_3d1 == local_448[0xc]);
    auVar254[8] = -((char)local_358 == local_448[0xd]);
    auVar254[9] = -((char)((ulong)local_358 >> 8) == local_448[0xe]);
    auVar254[10] = -((char)((ulong)local_358 >> 0x10) == local_448[0xf]);
    auVar254[0xb] = -((char)((ulong)local_358 >> 0x18) == local_438[0]);
    auVar254[0xc] = -((char)((ulong)local_358 >> 0x20) == local_438[1]);
    auVar254[0xd] = -((char)((ulong)local_358 >> 0x28) == local_438[2]);
    auVar254[0xe] = -((char)((ulong)local_358 >> 0x30) == local_438[3]);
    auVar254[0xf] = -((char)((ulong)local_358 >> 0x38) == local_438[4]);
    auVar82 = auVar82 & auVar254;
    if ((ushort)((ushort)(SUB161(auVar82 >> 7,0) & 1) | (ushort)(SUB161(auVar82 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar82 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar82 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar82 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar82 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar82 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar82 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar82 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar82 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar82 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar82 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar82 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar82 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar82 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar82[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011cf9a;
  }
  else {
LAB_0011cf9a:
    main_cold_566();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%*u",0x14,0xfffffc00);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_567();
  }
  if (iVar3 == 0x14) {
    auVar83[0] = -(local_3d8 == local_448[0]);
    auVar83[1] = -(cStack_3d7 == local_448[1]);
    auVar83[2] = -(cStack_3d6 == local_448[2]);
    auVar83[3] = -(cStack_3d5 == local_448[3]);
    auVar83[4] = -(cStack_3d4 == local_448[4]);
    auVar83[5] = -(cStack_3d3 == local_448[5]);
    auVar83[6] = -(cStack_3d2 == local_448[6]);
    auVar83[7] = -(cStack_3d1 == local_448[7]);
    auVar83[8] = -((char)local_268 == local_448[8]);
    auVar83[9] = -((char)((ulong)local_268 >> 8) == local_448[9]);
    auVar83[10] = -((char)((ulong)local_268 >> 0x10) == local_448[10]);
    auVar83[0xb] = -((char)((ulong)local_268 >> 0x18) == local_448[0xb]);
    auVar83[0xc] = -((char)((ulong)local_268 >> 0x20) == local_448[0xc]);
    auVar83[0xd] = -((char)((ulong)local_268 >> 0x28) == local_448[0xd]);
    auVar83[0xe] = -((char)((ulong)local_268 >> 0x30) == local_448[0xe]);
    auVar83[0xf] = -((char)((ulong)local_268 >> 0x38) == local_448[0xf]);
    auVar255[0] = -((char)local_258 == local_448[5]);
    auVar255[1] = -(local_258._1_1_ == local_448[6]);
    auVar255[2] = -(local_258._2_1_ == local_448[7]);
    auVar255[3] = -(local_258._3_1_ == local_448[8]);
    auVar255[4] = -(local_258._4_1_ == local_448[9]);
    auVar255[5] = -(local_258._5_1_ == local_448[10]);
    auVar255[6] = -(local_258._6_1_ == local_448[0xb]);
    auVar255[7] = -(local_258._7_1_ == local_448[0xc]);
    auVar255[8] = -((char)local_2ec._4_8_ == local_448[0xd]);
    auVar255[9] = -(SUB81(local_2ec._4_8_,1) == local_448[0xe]);
    auVar255[10] = -(SUB81(local_2ec._4_8_,2) == local_448[0xf]);
    auVar255[0xb] = -(SUB81(local_2ec._4_8_,3) == local_438[0]);
    auVar255[0xc] = -(SUB81(local_2ec._4_8_,4) == local_438[1]);
    auVar255[0xd] = -(SUB81(local_2ec._4_8_,5) == local_438[2]);
    auVar255[0xe] = -(SUB81(local_2ec._4_8_,6) == local_438[3]);
    auVar255[0xf] = -(SUB81(local_2ec._4_8_,7) == local_438[4]);
    auVar83 = auVar83 & auVar255;
    if ((ushort)((ushort)(SUB161(auVar83 >> 7,0) & 1) | (ushort)(SUB161(auVar83 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar83 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar83 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar83 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar83 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar83 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar83 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar83 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar83 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar83 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar83 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar83 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar83 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar83 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar83[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011cfab;
  }
  else {
LAB_0011cfab:
    main_cold_568();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%*o",0x14,0x1ff);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_569();
  }
  if (iVar3 == 0x14) {
    auVar84[0] = -(local_3d8 == local_448[0]);
    auVar84[1] = -(cStack_3d7 == local_448[1]);
    auVar84[2] = -(cStack_3d6 == local_448[2]);
    auVar84[3] = -(cStack_3d5 == local_448[3]);
    auVar84[4] = -(cStack_3d4 == local_448[4]);
    auVar84[5] = -(cStack_3d3 == local_448[5]);
    auVar84[6] = -(cStack_3d2 == local_448[6]);
    auVar84[7] = -(cStack_3d1 == local_448[7]);
    auVar84[8] = -(local_3d8 == local_448[8]);
    auVar84[9] = -(cStack_3d7 == local_448[9]);
    auVar84[10] = -(cStack_3d6 == local_448[10]);
    auVar84[0xb] = -(cStack_3d5 == local_448[0xb]);
    auVar84[0xc] = -(cStack_3d4 == local_448[0xc]);
    auVar84[0xd] = -(cStack_3d3 == local_448[0xd]);
    auVar84[0xe] = -(cStack_3d2 == local_448[0xe]);
    auVar84[0xf] = -(cStack_3d1 == local_448[0xf]);
    auVar256[0] = -(local_3d8 == local_448[5]);
    auVar256[1] = -(cStack_3d7 == local_448[6]);
    auVar256[2] = -(cStack_3d6 == local_448[7]);
    auVar256[3] = -(cStack_3d5 == local_448[8]);
    auVar256[4] = -(cStack_3d4 == local_448[9]);
    auVar256[5] = -(cStack_3d3 == local_448[10]);
    auVar256[6] = -(cStack_3d2 == local_448[0xb]);
    auVar256[7] = -(cStack_3d1 == local_448[0xc]);
    auVar256[8] = -((char)local_1c8 == local_448[0xd]);
    auVar256[9] = -((char)((ulong)local_1c8 >> 8) == local_448[0xe]);
    auVar256[10] = -((char)((ulong)local_1c8 >> 0x10) == local_448[0xf]);
    auVar256[0xb] = -((char)((ulong)local_1c8 >> 0x18) == local_438[0]);
    auVar256[0xc] = -((char)((ulong)local_1c8 >> 0x20) == local_438[1]);
    auVar256[0xd] = -((char)((ulong)local_1c8 >> 0x28) == local_438[2]);
    auVar256[0xe] = -((char)((ulong)local_1c8 >> 0x30) == local_438[3]);
    auVar256[0xf] = -((char)((ulong)local_1c8 >> 0x38) == local_438[4]);
    auVar84 = auVar84 & auVar256;
    if ((ushort)((ushort)(SUB161(auVar84 >> 7,0) & 1) | (ushort)(SUB161(auVar84 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar84 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar84 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar84 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar84 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar84 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar84 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar84 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar84 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar84 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar84 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar84 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar84 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar84 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar84[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011cfbc;
  }
  else {
LAB_0011cfbc:
    main_cold_570();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%*o",0x14,0xfffffe01);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_571();
  }
  if (iVar3 == 0x14) {
    auVar85[0] = -(local_3d8 == local_448[0]);
    auVar85[1] = -(cStack_3d7 == local_448[1]);
    auVar85[2] = -(cStack_3d6 == local_448[2]);
    auVar85[3] = -(cStack_3d5 == local_448[3]);
    auVar85[4] = -(cStack_3d4 == local_448[4]);
    auVar85[5] = -(cStack_3d3 == local_448[5]);
    auVar85[6] = -(cStack_3d2 == local_448[6]);
    auVar85[7] = -(cStack_3d1 == local_448[7]);
    auVar85[8] = -((char)local_248 == local_448[8]);
    auVar85[9] = -((char)((ulong)local_248 >> 8) == local_448[9]);
    auVar85[10] = -((char)((ulong)local_248 >> 0x10) == local_448[10]);
    auVar85[0xb] = -((char)((ulong)local_248 >> 0x18) == local_448[0xb]);
    auVar85[0xc] = -((char)((ulong)local_248 >> 0x20) == local_448[0xc]);
    auVar85[0xd] = -((char)((ulong)local_248 >> 0x28) == local_448[0xd]);
    auVar85[0xe] = -((char)((ulong)local_248 >> 0x30) == local_448[0xe]);
    auVar85[0xf] = -((char)((ulong)local_248 >> 0x38) == local_448[0xf]);
    auVar257[0] = -((char)local_238 == local_448[5]);
    auVar257[1] = -(local_238._1_1_ == local_448[6]);
    auVar257[2] = -(local_238._2_1_ == local_448[7]);
    auVar257[3] = -(local_238._3_1_ == local_448[8]);
    auVar257[4] = -(local_238._4_1_ == local_448[9]);
    auVar257[5] = -(local_238._5_1_ == local_448[10]);
    auVar257[6] = -(local_238._6_1_ == local_448[0xb]);
    auVar257[7] = -(local_238._7_1_ == local_448[0xc]);
    auVar257[8] = -((char)local_348 == local_448[0xd]);
    auVar257[9] = -((char)((ulong)local_348 >> 8) == local_448[0xe]);
    auVar257[10] = -((char)((ulong)local_348 >> 0x10) == local_448[0xf]);
    auVar257[0xb] = -((char)((ulong)local_348 >> 0x18) == local_438[0]);
    auVar257[0xc] = -((char)((ulong)local_348 >> 0x20) == local_438[1]);
    auVar257[0xd] = -((char)((ulong)local_348 >> 0x28) == local_438[2]);
    auVar257[0xe] = -((char)((ulong)local_348 >> 0x30) == local_438[3]);
    auVar257[0xf] = -((char)((ulong)local_348 >> 0x38) == local_438[4]);
    auVar85 = auVar85 & auVar257;
    if ((ushort)((ushort)(SUB161(auVar85 >> 7,0) & 1) | (ushort)(SUB161(auVar85 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar85 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar85 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar85 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar85 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar85 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar85 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar85 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar85 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar85 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar85 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar85 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar85 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar85 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar85[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011cfcd;
  }
  else {
LAB_0011cfcd:
    main_cold_572();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%*x",0x14,0x1234abcd);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_573();
  }
  if (iVar3 == 0x14) {
    auVar86[0] = -(local_3d8 == local_448[0]);
    auVar86[1] = -(cStack_3d7 == local_448[1]);
    auVar86[2] = -(cStack_3d6 == local_448[2]);
    auVar86[3] = -(cStack_3d5 == local_448[3]);
    auVar86[4] = -(cStack_3d4 == local_448[4]);
    auVar86[5] = -(cStack_3d3 == local_448[5]);
    auVar86[6] = -(cStack_3d2 == local_448[6]);
    auVar86[7] = -(cStack_3d1 == local_448[7]);
    auVar86[8] = -((char)local_388 == local_448[8]);
    auVar86[9] = -((char)((ulong)local_388 >> 8) == local_448[9]);
    auVar86[10] = -((char)((ulong)local_388 >> 0x10) == local_448[10]);
    auVar86[0xb] = -((char)((ulong)local_388 >> 0x18) == local_448[0xb]);
    auVar86[0xc] = -((char)((ulong)local_388 >> 0x20) == local_448[0xc]);
    auVar86[0xd] = -((char)((ulong)local_388 >> 0x28) == local_448[0xd]);
    auVar86[0xe] = -((char)((ulong)local_388 >> 0x30) == local_448[0xe]);
    auVar86[0xf] = -((char)((ulong)local_388 >> 0x38) == local_448[0xf]);
    auVar258[0] = -((char)local_398 == local_448[5]);
    auVar258[1] = -(local_398._1_1_ == local_448[6]);
    auVar258[2] = -(local_398._2_1_ == local_448[7]);
    auVar258[3] = -(local_398._3_1_ == local_448[8]);
    auVar258[4] = -(local_398._4_1_ == local_448[9]);
    auVar258[5] = -(local_398._5_1_ == local_448[10]);
    auVar258[6] = -(local_398._6_1_ == local_448[0xb]);
    auVar258[7] = -(local_398._7_1_ == local_448[0xc]);
    auVar258[8] = -((char)local_328 == local_448[0xd]);
    auVar258[9] = -((char)((ulong)local_328 >> 8) == local_448[0xe]);
    auVar258[10] = -((char)((ulong)local_328 >> 0x10) == local_448[0xf]);
    auVar258[0xb] = -((char)((ulong)local_328 >> 0x18) == local_438[0]);
    auVar258[0xc] = -((char)((ulong)local_328 >> 0x20) == local_438[1]);
    auVar258[0xd] = -((char)((ulong)local_328 >> 0x28) == local_438[2]);
    auVar258[0xe] = -((char)((ulong)local_328 >> 0x30) == local_438[3]);
    auVar258[0xf] = -((char)((ulong)local_328 >> 0x38) == local_438[4]);
    auVar86 = auVar86 & auVar258;
    if ((ushort)((ushort)(SUB161(auVar86 >> 7,0) & 1) | (ushort)(SUB161(auVar86 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar86 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar86 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar86 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar86 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar86 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar86 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar86 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar86 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar86 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar86 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar86 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar86 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar86 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar86[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011cfde;
  }
  else {
LAB_0011cfde:
    main_cold_574();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%*x",0x14,0xedcb5433);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_575();
  }
  if (iVar3 == 0x14) {
    auVar87[0] = -(local_3d8 == local_448[0]);
    auVar87[1] = -(cStack_3d7 == local_448[1]);
    auVar87[2] = -(cStack_3d6 == local_448[2]);
    auVar87[3] = -(cStack_3d5 == local_448[3]);
    auVar87[4] = -(cStack_3d4 == local_448[4]);
    auVar87[5] = -(cStack_3d3 == local_448[5]);
    auVar87[6] = -(cStack_3d2 == local_448[6]);
    auVar87[7] = -(cStack_3d1 == local_448[7]);
    auVar87[8] = -((char)local_1b8 == local_448[8]);
    auVar87[9] = -((char)((ulong)local_1b8 >> 8) == local_448[9]);
    auVar87[10] = -((char)((ulong)local_1b8 >> 0x10) == local_448[10]);
    auVar87[0xb] = -((char)((ulong)local_1b8 >> 0x18) == local_448[0xb]);
    auVar87[0xc] = -((char)((ulong)local_1b8 >> 0x20) == local_448[0xc]);
    auVar87[0xd] = -((char)((ulong)local_1b8 >> 0x28) == local_448[0xd]);
    auVar87[0xe] = -((char)((ulong)local_1b8 >> 0x30) == local_448[0xe]);
    auVar87[0xf] = -((char)((ulong)local_1b8 >> 0x38) == local_448[0xf]);
    auVar259[0] = -((char)local_1a8 == local_448[5]);
    auVar259[1] = -(local_1a8._1_1_ == local_448[6]);
    auVar259[2] = -(local_1a8._2_1_ == local_448[7]);
    auVar259[3] = -(local_1a8._3_1_ == local_448[8]);
    auVar259[4] = -(local_1a8._4_1_ == local_448[9]);
    auVar259[5] = -(local_1a8._5_1_ == local_448[10]);
    auVar259[6] = -(local_1a8._6_1_ == local_448[0xb]);
    auVar259[7] = -(local_1a8._7_1_ == local_448[0xc]);
    auVar259[8] = -((char)local_338 == local_448[0xd]);
    auVar259[9] = -((char)((ulong)local_338 >> 8) == local_448[0xe]);
    auVar259[10] = -((char)((ulong)local_338 >> 0x10) == local_448[0xf]);
    auVar259[0xb] = -((char)((ulong)local_338 >> 0x18) == local_438[0]);
    auVar259[0xc] = -((char)((ulong)local_338 >> 0x20) == local_438[1]);
    auVar259[0xd] = -((char)((ulong)local_338 >> 0x28) == local_438[2]);
    auVar259[0xe] = -((char)((ulong)local_338 >> 0x30) == local_438[3]);
    auVar259[0xf] = -((char)((ulong)local_338 >> 0x38) == local_438[4]);
    auVar87 = auVar87 & auVar259;
    if ((ushort)((ushort)(SUB161(auVar87 >> 7,0) & 1) | (ushort)(SUB161(auVar87 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar87 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar87 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar87 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar87 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar87 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar87 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar87 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar87 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar87 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar87 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar87 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar87 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar87 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar87[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011cfef;
  }
  else {
LAB_0011cfef:
    main_cold_576();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%*X",0x14,0x1234abcd);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_577();
  }
  if (iVar3 == 0x14) {
    auVar88[0] = -(local_3d8 == local_448[0]);
    auVar88[1] = -(cStack_3d7 == local_448[1]);
    auVar88[2] = -(cStack_3d6 == local_448[2]);
    auVar88[3] = -(cStack_3d5 == local_448[3]);
    auVar88[4] = -(cStack_3d4 == local_448[4]);
    auVar88[5] = -(cStack_3d3 == local_448[5]);
    auVar88[6] = -(cStack_3d2 == local_448[6]);
    auVar88[7] = -(cStack_3d1 == local_448[7]);
    auVar88[8] = -((char)local_388 == local_448[8]);
    auVar88[9] = -((char)((ulong)local_388 >> 8) == local_448[9]);
    auVar88[10] = -((char)((ulong)local_388 >> 0x10) == local_448[10]);
    auVar88[0xb] = -((char)((ulong)local_388 >> 0x18) == local_448[0xb]);
    auVar88[0xc] = -((char)((ulong)local_388 >> 0x20) == local_448[0xc]);
    auVar88[0xd] = -((char)((ulong)local_388 >> 0x28) == local_448[0xd]);
    auVar88[0xe] = -((char)((ulong)local_388 >> 0x30) == local_448[0xe]);
    auVar88[0xf] = -((char)((ulong)local_388 >> 0x38) == local_448[0xf]);
    auVar260[0] = -((char)local_398 == local_448[5]);
    auVar260[1] = -(local_398._1_1_ == local_448[6]);
    auVar260[2] = -(local_398._2_1_ == local_448[7]);
    auVar260[3] = -(local_398._3_1_ == local_448[8]);
    auVar260[4] = -(local_398._4_1_ == local_448[9]);
    auVar260[5] = -(local_398._5_1_ == local_448[10]);
    auVar260[6] = -(local_398._6_1_ == local_448[0xb]);
    auVar260[7] = -(local_398._7_1_ == local_448[0xc]);
    auVar260[8] = -((char)local_308 == local_448[0xd]);
    auVar260[9] = -((char)((ulong)local_308 >> 8) == local_448[0xe]);
    auVar260[10] = -((char)((ulong)local_308 >> 0x10) == local_448[0xf]);
    auVar260[0xb] = -((char)((ulong)local_308 >> 0x18) == local_438[0]);
    auVar260[0xc] = -((char)((ulong)local_308 >> 0x20) == local_438[1]);
    auVar260[0xd] = -((char)((ulong)local_308 >> 0x28) == local_438[2]);
    auVar260[0xe] = -((char)((ulong)local_308 >> 0x30) == local_438[3]);
    auVar260[0xf] = -((char)((ulong)local_308 >> 0x38) == local_438[4]);
    auVar88 = auVar88 & auVar260;
    if ((ushort)((ushort)(SUB161(auVar88 >> 7,0) & 1) | (ushort)(SUB161(auVar88 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar88 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar88 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar88 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar88 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar88 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar88 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar88 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar88 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar88 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar88 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar88 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar88 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar88 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar88[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011d000;
  }
  else {
LAB_0011d000:
    main_cold_578();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%*X",0x14,0xedcb5433);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_579();
  }
  if (iVar3 == 0x14) {
    auVar89[0] = -(local_3d8 == local_448[0]);
    auVar89[1] = -(cStack_3d7 == local_448[1]);
    auVar89[2] = -(cStack_3d6 == local_448[2]);
    auVar89[3] = -(cStack_3d5 == local_448[3]);
    auVar89[4] = -(cStack_3d4 == local_448[4]);
    auVar89[5] = -(cStack_3d3 == local_448[5]);
    auVar89[6] = -(cStack_3d2 == local_448[6]);
    auVar89[7] = -(cStack_3d1 == local_448[7]);
    auVar89[8] = -((char)local_168 == local_448[8]);
    auVar89[9] = -((char)((ulong)local_168 >> 8) == local_448[9]);
    auVar89[10] = -((char)((ulong)local_168 >> 0x10) == local_448[10]);
    auVar89[0xb] = -((char)((ulong)local_168 >> 0x18) == local_448[0xb]);
    auVar89[0xc] = -((char)((ulong)local_168 >> 0x20) == local_448[0xc]);
    auVar89[0xd] = -((char)((ulong)local_168 >> 0x28) == local_448[0xd]);
    auVar89[0xe] = -((char)((ulong)local_168 >> 0x30) == local_448[0xe]);
    auVar89[0xf] = -((char)((ulong)local_168 >> 0x38) == local_448[0xf]);
    auVar261[0] = -((char)local_e8 == local_448[5]);
    auVar261[1] = -(local_e8._1_1_ == local_448[6]);
    auVar261[2] = -(local_e8._2_1_ == local_448[7]);
    auVar261[3] = -(local_e8._3_1_ == local_448[8]);
    auVar261[4] = -(local_e8._4_1_ == local_448[9]);
    auVar261[5] = -(local_e8._5_1_ == local_448[10]);
    auVar261[6] = -(local_e8._6_1_ == local_448[0xb]);
    auVar261[7] = -(local_e8._7_1_ == local_448[0xc]);
    auVar261[8] = -((char)local_318 == local_448[0xd]);
    auVar261[9] = -((char)((ulong)local_318 >> 8) == local_448[0xe]);
    auVar261[10] = -((char)((ulong)local_318 >> 0x10) == local_448[0xf]);
    auVar261[0xb] = -((char)((ulong)local_318 >> 0x18) == local_438[0]);
    auVar261[0xc] = -((char)((ulong)local_318 >> 0x20) == local_438[1]);
    auVar261[0xd] = -((char)((ulong)local_318 >> 0x28) == local_438[2]);
    auVar261[0xe] = -((char)((ulong)local_318 >> 0x30) == local_438[3]);
    auVar261[0xf] = -((char)((ulong)local_318 >> 0x38) == local_438[4]);
    auVar89 = auVar89 & auVar261;
    if ((ushort)((ushort)(SUB161(auVar89 >> 7,0) & 1) | (ushort)(SUB161(auVar89 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar89 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar89 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar89 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar89 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar89 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar89 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar89 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar89 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar89 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar89 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar89 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar89 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar89 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar89[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011d011;
  }
  else {
LAB_0011d011:
    main_cold_580();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%*c",0x14,0x78);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_581();
  }
  if (iVar3 == 0x14) {
    auVar90[0] = -(local_3d8 == local_448[0]);
    auVar90[1] = -(cStack_3d7 == local_448[1]);
    auVar90[2] = -(cStack_3d6 == local_448[2]);
    auVar90[3] = -(cStack_3d5 == local_448[3]);
    auVar90[4] = -(cStack_3d4 == local_448[4]);
    auVar90[5] = -(cStack_3d3 == local_448[5]);
    auVar90[6] = -(cStack_3d2 == local_448[6]);
    auVar90[7] = -(cStack_3d1 == local_448[7]);
    auVar90[8] = -(local_3d8 == local_448[8]);
    auVar90[9] = -(cStack_3d7 == local_448[9]);
    auVar90[10] = -(cStack_3d6 == local_448[10]);
    auVar90[0xb] = -(cStack_3d5 == local_448[0xb]);
    auVar90[0xc] = -(cStack_3d4 == local_448[0xc]);
    auVar90[0xd] = -(cStack_3d3 == local_448[0xd]);
    auVar90[0xe] = -(cStack_3d2 == local_448[0xe]);
    auVar90[0xf] = -(cStack_3d1 == local_448[0xf]);
    auVar262[0] = -(local_3d8 == local_448[5]);
    auVar262[1] = -(cStack_3d7 == local_448[6]);
    auVar262[2] = -(cStack_3d6 == local_448[7]);
    auVar262[3] = -(cStack_3d5 == local_448[8]);
    auVar262[4] = -(cStack_3d4 == local_448[9]);
    auVar262[5] = -(cStack_3d3 == local_448[10]);
    auVar262[6] = -(cStack_3d2 == local_448[0xb]);
    auVar262[7] = -(cStack_3d1 == local_448[0xc]);
    auVar262[8] = -((char)local_48 == local_448[0xd]);
    auVar262[9] = -((char)((ulong)local_48 >> 8) == local_448[0xe]);
    auVar262[10] = -((char)((ulong)local_48 >> 0x10) == local_448[0xf]);
    auVar262[0xb] = -((char)((ulong)local_48 >> 0x18) == local_438[0]);
    auVar262[0xc] = -((char)((ulong)local_48 >> 0x20) == local_438[1]);
    auVar262[0xd] = -((char)((ulong)local_48 >> 0x28) == local_438[2]);
    auVar262[0xe] = -((char)((ulong)local_48 >> 0x30) == local_438[3]);
    auVar262[0xf] = -((char)((ulong)local_48 >> 0x38) == local_438[4]);
    auVar90 = auVar90 & auVar262;
    if ((ushort)((ushort)(SUB161(auVar90 >> 7,0) & 1) | (ushort)(SUB161(auVar90 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar90 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar90 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar90 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar90 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar90 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar90 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar90 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar90 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar90 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar90 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar90 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar90 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar90 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar90[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011d022;
  }
  else {
LAB_0011d022:
    main_cold_582();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%.20s","Hallo heimur");
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_583();
  }
  if (iVar3 == 0xc) {
    uVar2 = local_448._0_8_;
    if (local_448._5_8_ != 0x72756d69656820 || uVar2 != 0x6568206f6c6c6148) goto LAB_0011d033;
  }
  else {
LAB_0011d033:
    main_cold_584();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%.20d",0x400);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_585();
  }
  if (iVar3 == 0x14) {
    auVar91[0] = -((char)local_3b8 == local_448[0]);
    auVar91[1] = -(local_3b8._1_1_ == local_448[1]);
    auVar91[2] = -(local_3b8._2_1_ == local_448[2]);
    auVar91[3] = -(local_3b8._3_1_ == local_448[3]);
    auVar91[4] = -(local_3b8._4_1_ == local_448[4]);
    auVar91[5] = -(local_3b8._5_1_ == local_448[5]);
    auVar91[6] = -(local_3b8._6_1_ == local_448[6]);
    auVar91[7] = -(local_3b8._7_1_ == local_448[7]);
    auVar91[8] = -((char)local_3b8 == local_448[8]);
    auVar91[9] = -(local_3b8._1_1_ == local_448[9]);
    auVar91[10] = -(local_3b8._2_1_ == local_448[10]);
    auVar91[0xb] = -(local_3b8._3_1_ == local_448[0xb]);
    auVar91[0xc] = -(local_3b8._4_1_ == local_448[0xc]);
    auVar91[0xd] = -(local_3b8._5_1_ == local_448[0xd]);
    auVar91[0xe] = -(local_3b8._6_1_ == local_448[0xe]);
    auVar91[0xf] = -(local_3b8._7_1_ == local_448[0xf]);
    auVar263[0] = -((char)local_3b8 == local_448[5]);
    auVar263[1] = -(local_3b8._1_1_ == local_448[6]);
    auVar263[2] = -(local_3b8._2_1_ == local_448[7]);
    auVar263[3] = -(local_3b8._3_1_ == local_448[8]);
    auVar263[4] = -(local_3b8._4_1_ == local_448[9]);
    auVar263[5] = -(local_3b8._5_1_ == local_448[10]);
    auVar263[6] = -(local_3b8._6_1_ == local_448[0xb]);
    auVar263[7] = -(local_3b8._7_1_ == local_448[0xc]);
    auVar263[8] = -((char)local_3a8 == local_448[0xd]);
    auVar263[9] = -((char)((ulong)local_3a8 >> 8) == local_448[0xe]);
    auVar263[10] = -((char)((ulong)local_3a8 >> 0x10) == local_448[0xf]);
    auVar263[0xb] = -((char)((ulong)local_3a8 >> 0x18) == local_438[0]);
    auVar263[0xc] = -((char)((ulong)local_3a8 >> 0x20) == local_438[1]);
    auVar263[0xd] = -((char)((ulong)local_3a8 >> 0x28) == local_438[2]);
    auVar263[0xe] = -((char)((ulong)local_3a8 >> 0x30) == local_438[3]);
    auVar263[0xf] = -((char)((ulong)local_3a8 >> 0x38) == local_438[4]);
    auVar91 = auVar91 & auVar263;
    if ((ushort)((ushort)(SUB161(auVar91 >> 7,0) & 1) | (ushort)(SUB161(auVar91 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar91 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar91 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar91 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar91 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar91 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar91 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar91 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar91 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar91 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar91 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar91 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar91 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar91 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar91[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011d044;
  }
  else {
LAB_0011d044:
    main_cold_586();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%.20d",0xfffffc00);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_587();
  }
  if (iVar3 == 0x15) {
    auVar92[0] = -((char)local_2a8 == local_448[0]);
    auVar92[1] = -(local_2a8._1_1_ == local_448[1]);
    auVar92[2] = -(local_2a8._2_1_ == local_448[2]);
    auVar92[3] = -(local_2a8._3_1_ == local_448[3]);
    auVar92[4] = -(local_2a8._4_1_ == local_448[4]);
    auVar92[5] = -(local_2a8._5_1_ == local_448[5]);
    auVar92[6] = -(local_2a8._6_1_ == local_448[6]);
    auVar92[7] = -(local_2a8._7_1_ == local_448[7]);
    auVar92[8] = -((char)local_3b8 == local_448[8]);
    auVar92[9] = -(local_3b8._1_1_ == local_448[9]);
    auVar92[10] = -(local_3b8._2_1_ == local_448[10]);
    auVar92[0xb] = -(local_3b8._3_1_ == local_448[0xb]);
    auVar92[0xc] = -(local_3b8._4_1_ == local_448[0xc]);
    auVar92[0xd] = -(local_3b8._5_1_ == local_448[0xd]);
    auVar92[0xe] = -(local_3b8._6_1_ == local_448[0xe]);
    auVar92[0xf] = -(local_3b8._7_1_ == local_448[0xf]);
    auVar264[0] = -((char)local_3b8 == local_448[6]);
    auVar264[1] = -(local_3b8._1_1_ == local_448[7]);
    auVar264[2] = -(local_3b8._2_1_ == local_448[8]);
    auVar264[3] = -(local_3b8._3_1_ == local_448[9]);
    auVar264[4] = -(local_3b8._4_1_ == local_448[10]);
    auVar264[5] = -(local_3b8._5_1_ == local_448[0xb]);
    auVar264[6] = -(local_3b8._6_1_ == local_448[0xc]);
    auVar264[7] = -(local_3b8._7_1_ == local_448[0xd]);
    auVar264[8] = -((char)local_3a8 == local_448[0xe]);
    auVar264[9] = -(local_3a8._1_1_ == local_448[0xf]);
    auVar264[10] = -(local_3a8._2_1_ == local_438[0]);
    auVar264[0xb] = -(local_3a8._3_1_ == local_438[1]);
    auVar264[0xc] = -(local_3a8._4_1_ == local_438[2]);
    auVar264[0xd] = -(local_3a8._5_1_ == local_438[3]);
    auVar264[0xe] = -(local_3a8._6_1_ == local_438[4]);
    auVar264[0xf] = -(local_3a8._7_1_ == local_438[5]);
    auVar92 = auVar92 & auVar264;
    if ((ushort)((ushort)(SUB161(auVar92 >> 7,0) & 1) | (ushort)(SUB161(auVar92 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar92 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar92 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar92 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar92 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar92 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar92 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar92 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar92 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar92 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar92 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar92 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar92 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar92 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar92[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011d055;
  }
  else {
LAB_0011d055:
    main_cold_588();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%.20i",0x400);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_589();
  }
  if (iVar3 == 0x14) {
    auVar93[0] = -((char)local_3b8 == local_448[0]);
    auVar93[1] = -(local_3b8._1_1_ == local_448[1]);
    auVar93[2] = -(local_3b8._2_1_ == local_448[2]);
    auVar93[3] = -(local_3b8._3_1_ == local_448[3]);
    auVar93[4] = -(local_3b8._4_1_ == local_448[4]);
    auVar93[5] = -(local_3b8._5_1_ == local_448[5]);
    auVar93[6] = -(local_3b8._6_1_ == local_448[6]);
    auVar93[7] = -(local_3b8._7_1_ == local_448[7]);
    auVar93[8] = -((char)local_3b8 == local_448[8]);
    auVar93[9] = -(local_3b8._1_1_ == local_448[9]);
    auVar93[10] = -(local_3b8._2_1_ == local_448[10]);
    auVar93[0xb] = -(local_3b8._3_1_ == local_448[0xb]);
    auVar93[0xc] = -(local_3b8._4_1_ == local_448[0xc]);
    auVar93[0xd] = -(local_3b8._5_1_ == local_448[0xd]);
    auVar93[0xe] = -(local_3b8._6_1_ == local_448[0xe]);
    auVar93[0xf] = -(local_3b8._7_1_ == local_448[0xf]);
    auVar265[0] = -((char)local_3b8 == local_448[5]);
    auVar265[1] = -(local_3b8._1_1_ == local_448[6]);
    auVar265[2] = -(local_3b8._2_1_ == local_448[7]);
    auVar265[3] = -(local_3b8._3_1_ == local_448[8]);
    auVar265[4] = -(local_3b8._4_1_ == local_448[9]);
    auVar265[5] = -(local_3b8._5_1_ == local_448[10]);
    auVar265[6] = -(local_3b8._6_1_ == local_448[0xb]);
    auVar265[7] = -(local_3b8._7_1_ == local_448[0xc]);
    auVar265[8] = -((char)local_3a8 == local_448[0xd]);
    auVar265[9] = -(local_3a8._1_1_ == local_448[0xe]);
    auVar265[10] = -(local_3a8._2_1_ == local_448[0xf]);
    auVar265[0xb] = -(local_3a8._3_1_ == local_438[0]);
    auVar265[0xc] = -(local_3a8._4_1_ == local_438[1]);
    auVar265[0xd] = -(local_3a8._5_1_ == local_438[2]);
    auVar265[0xe] = -(local_3a8._6_1_ == local_438[3]);
    auVar265[0xf] = -(local_3a8._7_1_ == local_438[4]);
    auVar93 = auVar93 & auVar265;
    if ((ushort)((ushort)(SUB161(auVar93 >> 7,0) & 1) | (ushort)(SUB161(auVar93 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar93 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar93 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar93 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar93 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar93 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar93 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar93 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar93 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar93 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar93 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar93 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar93 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar93 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar93[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011d066;
  }
  else {
LAB_0011d066:
    main_cold_590();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%.20i",0xfffffc00);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_591();
  }
  if (iVar3 == 0x15) {
    auVar330[0] = -((char)local_2a8 == local_448[0]);
    auVar330[1] = -(local_2a8._1_1_ == local_448[1]);
    auVar330[2] = -(local_2a8._2_1_ == local_448[2]);
    auVar330[3] = -(local_2a8._3_1_ == local_448[3]);
    auVar330[4] = -(local_2a8._4_1_ == local_448[4]);
    auVar330[5] = -(local_2a8._5_1_ == local_448[5]);
    auVar330[6] = -(local_2a8._6_1_ == local_448[6]);
    auVar330[7] = -(local_2a8._7_1_ == local_448[7]);
    auVar330[8] = -((char)local_3b8 == local_448[8]);
    auVar330[9] = -(local_3b8._1_1_ == local_448[9]);
    auVar330[10] = -(local_3b8._2_1_ == local_448[10]);
    auVar330[0xb] = -(local_3b8._3_1_ == local_448[0xb]);
    auVar330[0xc] = -(local_3b8._4_1_ == local_448[0xc]);
    auVar330[0xd] = -(local_3b8._5_1_ == local_448[0xd]);
    auVar330[0xe] = -(local_3b8._6_1_ == local_448[0xe]);
    auVar330[0xf] = -(local_3b8._7_1_ == local_448[0xf]);
    auVar173[0] = -((char)local_3b8 == local_448[6]);
    auVar173[1] = -(local_3b8._1_1_ == local_448[7]);
    auVar173[2] = -(local_3b8._2_1_ == local_448[8]);
    auVar173[3] = -(local_3b8._3_1_ == local_448[9]);
    auVar173[4] = -(local_3b8._4_1_ == local_448[10]);
    auVar173[5] = -(local_3b8._5_1_ == local_448[0xb]);
    auVar173[6] = -(local_3b8._6_1_ == local_448[0xc]);
    auVar173[7] = -(local_3b8._7_1_ == local_448[0xd]);
    auVar173[8] = -((char)local_3a8 == local_448[0xe]);
    auVar173[9] = -(local_3a8._1_1_ == local_448[0xf]);
    auVar173[10] = -(local_3a8._2_1_ == local_438[0]);
    auVar173[0xb] = -(local_3a8._3_1_ == local_438[1]);
    auVar173[0xc] = -(local_3a8._4_1_ == local_438[2]);
    auVar173[0xd] = -(local_3a8._5_1_ == local_438[3]);
    auVar173[0xe] = -(local_3a8._6_1_ == local_438[4]);
    auVar173[0xf] = -(local_3a8._7_1_ == local_438[5]);
    auVar330 = auVar330 & auVar173;
    if ((ushort)((ushort)(SUB161(auVar330 >> 7,0) & 1) |
                 (ushort)(SUB161(auVar330 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar330 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar330 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar330 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar330 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar330 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar330 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar330 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar330 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar330 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar330 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar330 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar330 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar330 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar330[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011d077;
  }
  else {
LAB_0011d077:
    main_cold_592();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%.20u",0x400);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_593();
  }
  if (iVar3 == 0x14) {
    auVar94[0] = -((char)local_3b8 == local_448[0]);
    auVar94[1] = -(local_3b8._1_1_ == local_448[1]);
    auVar94[2] = -(local_3b8._2_1_ == local_448[2]);
    auVar94[3] = -(local_3b8._3_1_ == local_448[3]);
    auVar94[4] = -(local_3b8._4_1_ == local_448[4]);
    auVar94[5] = -(local_3b8._5_1_ == local_448[5]);
    auVar94[6] = -(local_3b8._6_1_ == local_448[6]);
    auVar94[7] = -(local_3b8._7_1_ == local_448[7]);
    auVar94[8] = -((char)local_3b8 == local_448[8]);
    auVar94[9] = -(local_3b8._1_1_ == local_448[9]);
    auVar94[10] = -(local_3b8._2_1_ == local_448[10]);
    auVar94[0xb] = -(local_3b8._3_1_ == local_448[0xb]);
    auVar94[0xc] = -(local_3b8._4_1_ == local_448[0xc]);
    auVar94[0xd] = -(local_3b8._5_1_ == local_448[0xd]);
    auVar94[0xe] = -(local_3b8._6_1_ == local_448[0xe]);
    auVar94[0xf] = -(local_3b8._7_1_ == local_448[0xf]);
    auVar266[0] = -((char)local_3b8 == local_448[5]);
    auVar266[1] = -(local_3b8._1_1_ == local_448[6]);
    auVar266[2] = -(local_3b8._2_1_ == local_448[7]);
    auVar266[3] = -(local_3b8._3_1_ == local_448[8]);
    auVar266[4] = -(local_3b8._4_1_ == local_448[9]);
    auVar266[5] = -(local_3b8._5_1_ == local_448[10]);
    auVar266[6] = -(local_3b8._6_1_ == local_448[0xb]);
    auVar266[7] = -(local_3b8._7_1_ == local_448[0xc]);
    auVar266[8] = -((char)local_3a8 == local_448[0xd]);
    auVar266[9] = -(local_3a8._1_1_ == local_448[0xe]);
    auVar266[10] = -(local_3a8._2_1_ == local_448[0xf]);
    auVar266[0xb] = -(local_3a8._3_1_ == local_438[0]);
    auVar266[0xc] = -(local_3a8._4_1_ == local_438[1]);
    auVar266[0xd] = -(local_3a8._5_1_ == local_438[2]);
    auVar266[0xe] = -(local_3a8._6_1_ == local_438[3]);
    auVar266[0xf] = -(local_3a8._7_1_ == local_438[4]);
    auVar94 = auVar94 & auVar266;
    if ((ushort)((ushort)(SUB161(auVar94 >> 7,0) & 1) | (ushort)(SUB161(auVar94 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar94 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar94 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar94 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar94 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar94 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar94 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar94 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar94 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar94 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar94 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar94 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar94 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar94 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar94[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011d088;
  }
  else {
LAB_0011d088:
    main_cold_594();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%.20u",0xfffffc00);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_595();
  }
  if (iVar3 == 0x14) {
    auVar95[0] = -((char)local_3b8 == local_448[0]);
    auVar95[1] = -(local_3b8._1_1_ == local_448[1]);
    auVar95[2] = -(local_3b8._2_1_ == local_448[2]);
    auVar95[3] = -(local_3b8._3_1_ == local_448[3]);
    auVar95[4] = -(local_3b8._4_1_ == local_448[4]);
    auVar95[5] = -(local_3b8._5_1_ == local_448[5]);
    auVar95[6] = -(local_3b8._6_1_ == local_448[6]);
    auVar95[7] = -(local_3b8._7_1_ == local_448[7]);
    auVar95[8] = -((char)local_68 == local_448[8]);
    auVar95[9] = -((char)((ulong)local_68 >> 8) == local_448[9]);
    auVar95[10] = -((char)((ulong)local_68 >> 0x10) == local_448[10]);
    auVar95[0xb] = -((char)((ulong)local_68 >> 0x18) == local_448[0xb]);
    auVar95[0xc] = -((char)((ulong)local_68 >> 0x20) == local_448[0xc]);
    auVar95[0xd] = -((char)((ulong)local_68 >> 0x28) == local_448[0xd]);
    auVar95[0xe] = -((char)((ulong)local_68 >> 0x30) == local_448[0xe]);
    auVar95[0xf] = -((char)((ulong)local_68 >> 0x38) == local_448[0xf]);
    auVar267[0] = -((char)local_58 == local_448[5]);
    auVar267[1] = -(local_58._1_1_ == local_448[6]);
    auVar267[2] = -(local_58._2_1_ == local_448[7]);
    auVar267[3] = -(local_58._3_1_ == local_448[8]);
    auVar267[4] = -(local_58._4_1_ == local_448[9]);
    auVar267[5] = -(local_58._5_1_ == local_448[10]);
    auVar267[6] = -(local_58._6_1_ == local_448[0xb]);
    auVar267[7] = -(local_58._7_1_ == local_448[0xc]);
    auVar267[8] = -((char)local_2ec._4_8_ == local_448[0xd]);
    auVar267[9] = -(SUB81(local_2ec._4_8_,1) == local_448[0xe]);
    auVar267[10] = -(SUB81(local_2ec._4_8_,2) == local_448[0xf]);
    auVar267[0xb] = -(SUB81(local_2ec._4_8_,3) == local_438[0]);
    auVar267[0xc] = -(SUB81(local_2ec._4_8_,4) == local_438[1]);
    auVar267[0xd] = -(SUB81(local_2ec._4_8_,5) == local_438[2]);
    auVar267[0xe] = -(SUB81(local_2ec._4_8_,6) == local_438[3]);
    auVar267[0xf] = -(SUB81(local_2ec._4_8_,7) == local_438[4]);
    auVar95 = auVar95 & auVar267;
    if ((ushort)((ushort)(SUB161(auVar95 >> 7,0) & 1) | (ushort)(SUB161(auVar95 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar95 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar95 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar95 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar95 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar95 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar95 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar95 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar95 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar95 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar95 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar95 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar95 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar95 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar95[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011d099;
  }
  else {
LAB_0011d099:
    main_cold_596();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%.20o",0x1ff);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_597();
  }
  if (iVar3 == 0x14) {
    auVar96[0] = -((char)local_3b8 == local_448[0]);
    auVar96[1] = -(local_3b8._1_1_ == local_448[1]);
    auVar96[2] = -(local_3b8._2_1_ == local_448[2]);
    auVar96[3] = -(local_3b8._3_1_ == local_448[3]);
    auVar96[4] = -(local_3b8._4_1_ == local_448[4]);
    auVar96[5] = -(local_3b8._5_1_ == local_448[5]);
    auVar96[6] = -(local_3b8._6_1_ == local_448[6]);
    auVar96[7] = -(local_3b8._7_1_ == local_448[7]);
    auVar96[8] = -((char)local_3b8 == local_448[8]);
    auVar96[9] = -(local_3b8._1_1_ == local_448[9]);
    auVar96[10] = -(local_3b8._2_1_ == local_448[10]);
    auVar96[0xb] = -(local_3b8._3_1_ == local_448[0xb]);
    auVar96[0xc] = -(local_3b8._4_1_ == local_448[0xc]);
    auVar96[0xd] = -(local_3b8._5_1_ == local_448[0xd]);
    auVar96[0xe] = -(local_3b8._6_1_ == local_448[0xe]);
    auVar96[0xf] = -(local_3b8._7_1_ == local_448[0xf]);
    auVar268[0] = -((char)local_3b8 == local_448[5]);
    auVar268[1] = -(local_3b8._1_1_ == local_448[6]);
    auVar268[2] = -(local_3b8._2_1_ == local_448[7]);
    auVar268[3] = -(local_3b8._3_1_ == local_448[8]);
    auVar268[4] = -(local_3b8._4_1_ == local_448[9]);
    auVar268[5] = -(local_3b8._5_1_ == local_448[10]);
    auVar268[6] = -(local_3b8._6_1_ == local_448[0xb]);
    auVar268[7] = -(local_3b8._7_1_ == local_448[0xc]);
    auVar268[8] = -((char)local_1f8 == local_448[0xd]);
    auVar268[9] = -((char)((ulong)local_1f8 >> 8) == local_448[0xe]);
    auVar268[10] = -((char)((ulong)local_1f8 >> 0x10) == local_448[0xf]);
    auVar268[0xb] = -((char)((ulong)local_1f8 >> 0x18) == local_438[0]);
    auVar268[0xc] = -((char)((ulong)local_1f8 >> 0x20) == local_438[1]);
    auVar268[0xd] = -((char)((ulong)local_1f8 >> 0x28) == local_438[2]);
    auVar268[0xe] = -((char)((ulong)local_1f8 >> 0x30) == local_438[3]);
    auVar268[0xf] = -((char)((ulong)local_1f8 >> 0x38) == local_438[4]);
    auVar96 = auVar96 & auVar268;
    if ((ushort)((ushort)(SUB161(auVar96 >> 7,0) & 1) | (ushort)(SUB161(auVar96 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar96 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar96 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar96 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar96 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar96 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar96 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar96 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar96 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar96 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar96 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar96 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar96 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar96 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar96[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011d0aa;
  }
  else {
LAB_0011d0aa:
    main_cold_598();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%.20o",0xfffffe01);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_599();
  }
  if (iVar3 == 0x14) {
    auVar97[0] = -((char)local_3b8 == local_448[0]);
    auVar97[1] = -(local_3b8._1_1_ == local_448[1]);
    auVar97[2] = -(local_3b8._2_1_ == local_448[2]);
    auVar97[3] = -(local_3b8._3_1_ == local_448[3]);
    auVar97[4] = -(local_3b8._4_1_ == local_448[4]);
    auVar97[5] = -(local_3b8._5_1_ == local_448[5]);
    auVar97[6] = -(local_3b8._6_1_ == local_448[6]);
    auVar97[7] = -(local_3b8._7_1_ == local_448[7]);
    auVar97[8] = -((char)local_208 == local_448[8]);
    auVar97[9] = -((char)((ulong)local_208 >> 8) == local_448[9]);
    auVar97[10] = -((char)((ulong)local_208 >> 0x10) == local_448[10]);
    auVar97[0xb] = -((char)((ulong)local_208 >> 0x18) == local_448[0xb]);
    auVar97[0xc] = -((char)((ulong)local_208 >> 0x20) == local_448[0xc]);
    auVar97[0xd] = -((char)((ulong)local_208 >> 0x28) == local_448[0xd]);
    auVar97[0xe] = -((char)((ulong)local_208 >> 0x30) == local_448[0xe]);
    auVar97[0xf] = -((char)((ulong)local_208 >> 0x38) == local_448[0xf]);
    auVar269[0] = -((char)local_1e8 == local_448[5]);
    auVar269[1] = -(local_1e8._1_1_ == local_448[6]);
    auVar269[2] = -(local_1e8._2_1_ == local_448[7]);
    auVar269[3] = -(local_1e8._3_1_ == local_448[8]);
    auVar269[4] = -(local_1e8._4_1_ == local_448[9]);
    auVar269[5] = -(local_1e8._5_1_ == local_448[10]);
    auVar269[6] = -(local_1e8._6_1_ == local_448[0xb]);
    auVar269[7] = -(local_1e8._7_1_ == local_448[0xc]);
    auVar269[8] = -((char)local_348 == local_448[0xd]);
    auVar269[9] = -((char)((ulong)local_348 >> 8) == local_448[0xe]);
    auVar269[10] = -((char)((ulong)local_348 >> 0x10) == local_448[0xf]);
    auVar269[0xb] = -((char)((ulong)local_348 >> 0x18) == local_438[0]);
    auVar269[0xc] = -((char)((ulong)local_348 >> 0x20) == local_438[1]);
    auVar269[0xd] = -((char)((ulong)local_348 >> 0x28) == local_438[2]);
    auVar269[0xe] = -((char)((ulong)local_348 >> 0x30) == local_438[3]);
    auVar269[0xf] = -((char)((ulong)local_348 >> 0x38) == local_438[4]);
    auVar97 = auVar97 & auVar269;
    if ((ushort)((ushort)(SUB161(auVar97 >> 7,0) & 1) | (ushort)(SUB161(auVar97 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar97 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar97 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar97 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar97 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar97 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar97 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar97 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar97 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar97 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar97 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar97 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar97 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar97 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar97[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011d0bb;
  }
  else {
LAB_0011d0bb:
    main_cold_600();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%.20x",0x1234abcd);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_601();
  }
  if (iVar3 == 0x14) {
    auVar98[0] = -((char)local_3b8 == local_448[0]);
    auVar98[1] = -(local_3b8._1_1_ == local_448[1]);
    auVar98[2] = -(local_3b8._2_1_ == local_448[2]);
    auVar98[3] = -(local_3b8._3_1_ == local_448[3]);
    auVar98[4] = -(local_3b8._4_1_ == local_448[4]);
    auVar98[5] = -(local_3b8._5_1_ == local_448[5]);
    auVar98[6] = -(local_3b8._6_1_ == local_448[6]);
    auVar98[7] = -(local_3b8._7_1_ == local_448[7]);
    auVar98[8] = -((char)local_2b8 == local_448[8]);
    auVar98[9] = -((char)((ulong)local_2b8 >> 8) == local_448[9]);
    auVar98[10] = -((char)((ulong)local_2b8 >> 0x10) == local_448[10]);
    auVar98[0xb] = -((char)((ulong)local_2b8 >> 0x18) == local_448[0xb]);
    auVar98[0xc] = -((char)((ulong)local_2b8 >> 0x20) == local_448[0xc]);
    auVar98[0xd] = -((char)((ulong)local_2b8 >> 0x28) == local_448[0xd]);
    auVar98[0xe] = -((char)((ulong)local_2b8 >> 0x30) == local_448[0xe]);
    auVar98[0xf] = -((char)((ulong)local_2b8 >> 0x38) == local_448[0xf]);
    auVar270[0] = -((char)local_368 == local_448[5]);
    auVar270[1] = -(local_368._1_1_ == local_448[6]);
    auVar270[2] = -(local_368._2_1_ == local_448[7]);
    auVar270[3] = -(local_368._3_1_ == local_448[8]);
    auVar270[4] = -(local_368._4_1_ == local_448[9]);
    auVar270[5] = -(local_368._5_1_ == local_448[10]);
    auVar270[6] = -(local_368._6_1_ == local_448[0xb]);
    auVar270[7] = -(local_368._7_1_ == local_448[0xc]);
    auVar270[8] = -((char)local_328 == local_448[0xd]);
    auVar270[9] = -((char)((ulong)local_328 >> 8) == local_448[0xe]);
    auVar270[10] = -((char)((ulong)local_328 >> 0x10) == local_448[0xf]);
    auVar270[0xb] = -((char)((ulong)local_328 >> 0x18) == local_438[0]);
    auVar270[0xc] = -((char)((ulong)local_328 >> 0x20) == local_438[1]);
    auVar270[0xd] = -((char)((ulong)local_328 >> 0x28) == local_438[2]);
    auVar270[0xe] = -((char)((ulong)local_328 >> 0x30) == local_438[3]);
    auVar270[0xf] = -((char)((ulong)local_328 >> 0x38) == local_438[4]);
    auVar98 = auVar98 & auVar270;
    if ((ushort)((ushort)(SUB161(auVar98 >> 7,0) & 1) | (ushort)(SUB161(auVar98 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar98 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar98 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar98 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar98 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar98 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar98 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar98 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar98 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar98 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar98 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar98 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar98 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar98 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar98[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011d0cc;
  }
  else {
LAB_0011d0cc:
    main_cold_602();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%.20x",0xedcb5433);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_603();
  }
  if (iVar3 == 0x14) {
    auVar99[0] = -((char)local_3b8 == local_448[0]);
    auVar99[1] = -(local_3b8._1_1_ == local_448[1]);
    auVar99[2] = -(local_3b8._2_1_ == local_448[2]);
    auVar99[3] = -(local_3b8._3_1_ == local_448[3]);
    auVar99[4] = -(local_3b8._4_1_ == local_448[4]);
    auVar99[5] = -(local_3b8._5_1_ == local_448[5]);
    auVar99[6] = -(local_3b8._6_1_ == local_448[6]);
    auVar99[7] = -(local_3b8._7_1_ == local_448[7]);
    auVar99[8] = -((char)local_78 == local_448[8]);
    auVar99[9] = -((char)((ulong)local_78 >> 8) == local_448[9]);
    auVar99[10] = -((char)((ulong)local_78 >> 0x10) == local_448[10]);
    auVar99[0xb] = -((char)((ulong)local_78 >> 0x18) == local_448[0xb]);
    auVar99[0xc] = -((char)((ulong)local_78 >> 0x20) == local_448[0xc]);
    auVar99[0xd] = -((char)((ulong)local_78 >> 0x28) == local_448[0xd]);
    auVar99[0xe] = -((char)((ulong)local_78 >> 0x30) == local_448[0xe]);
    auVar99[0xf] = -((char)((ulong)local_78 >> 0x38) == local_448[0xf]);
    auVar271[0] = -((char)local_218 == local_448[5]);
    auVar271[1] = -(local_218._1_1_ == local_448[6]);
    auVar271[2] = -(local_218._2_1_ == local_448[7]);
    auVar271[3] = -(local_218._3_1_ == local_448[8]);
    auVar271[4] = -(local_218._4_1_ == local_448[9]);
    auVar271[5] = -(local_218._5_1_ == local_448[10]);
    auVar271[6] = -(local_218._6_1_ == local_448[0xb]);
    auVar271[7] = -(local_218._7_1_ == local_448[0xc]);
    auVar271[8] = -((char)local_338 == local_448[0xd]);
    auVar271[9] = -((char)((ulong)local_338 >> 8) == local_448[0xe]);
    auVar271[10] = -((char)((ulong)local_338 >> 0x10) == local_448[0xf]);
    auVar271[0xb] = -((char)((ulong)local_338 >> 0x18) == local_438[0]);
    auVar271[0xc] = -((char)((ulong)local_338 >> 0x20) == local_438[1]);
    auVar271[0xd] = -((char)((ulong)local_338 >> 0x28) == local_438[2]);
    auVar271[0xe] = -((char)((ulong)local_338 >> 0x30) == local_438[3]);
    auVar271[0xf] = -((char)((ulong)local_338 >> 0x38) == local_438[4]);
    auVar99 = auVar99 & auVar271;
    if ((ushort)((ushort)(SUB161(auVar99 >> 7,0) & 1) | (ushort)(SUB161(auVar99 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar99 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar99 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar99 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar99 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar99 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar99 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar99 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar99 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar99 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar99 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar99 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar99 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar99 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar99[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011d0dd;
  }
  else {
LAB_0011d0dd:
    main_cold_604();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%.20X",0x1234abcd);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_605();
  }
  if (iVar3 == 0x14) {
    auVar100[0] = -((char)local_3b8 == local_448[0]);
    auVar100[1] = -(local_3b8._1_1_ == local_448[1]);
    auVar100[2] = -(local_3b8._2_1_ == local_448[2]);
    auVar100[3] = -(local_3b8._3_1_ == local_448[3]);
    auVar100[4] = -(local_3b8._4_1_ == local_448[4]);
    auVar100[5] = -(local_3b8._5_1_ == local_448[5]);
    auVar100[6] = -(local_3b8._6_1_ == local_448[6]);
    auVar100[7] = -(local_3b8._7_1_ == local_448[7]);
    auVar100[8] = -((char)local_2b8 == local_448[8]);
    auVar100[9] = -((char)((ulong)local_2b8 >> 8) == local_448[9]);
    auVar100[10] = -((char)((ulong)local_2b8 >> 0x10) == local_448[10]);
    auVar100[0xb] = -((char)((ulong)local_2b8 >> 0x18) == local_448[0xb]);
    auVar100[0xc] = -((char)((ulong)local_2b8 >> 0x20) == local_448[0xc]);
    auVar100[0xd] = -((char)((ulong)local_2b8 >> 0x28) == local_448[0xd]);
    auVar100[0xe] = -((char)((ulong)local_2b8 >> 0x30) == local_448[0xe]);
    auVar100[0xf] = -((char)((ulong)local_2b8 >> 0x38) == local_448[0xf]);
    auVar272[0] = -((char)local_368 == local_448[5]);
    auVar272[1] = -(local_368._1_1_ == local_448[6]);
    auVar272[2] = -(local_368._2_1_ == local_448[7]);
    auVar272[3] = -(local_368._3_1_ == local_448[8]);
    auVar272[4] = -(local_368._4_1_ == local_448[9]);
    auVar272[5] = -(local_368._5_1_ == local_448[10]);
    auVar272[6] = -(local_368._6_1_ == local_448[0xb]);
    auVar272[7] = -(local_368._7_1_ == local_448[0xc]);
    auVar272[8] = -((char)local_308 == local_448[0xd]);
    auVar272[9] = -((char)((ulong)local_308 >> 8) == local_448[0xe]);
    auVar272[10] = -((char)((ulong)local_308 >> 0x10) == local_448[0xf]);
    auVar272[0xb] = -((char)((ulong)local_308 >> 0x18) == local_438[0]);
    auVar272[0xc] = -((char)((ulong)local_308 >> 0x20) == local_438[1]);
    auVar272[0xd] = -((char)((ulong)local_308 >> 0x28) == local_438[2]);
    auVar272[0xe] = -((char)((ulong)local_308 >> 0x30) == local_438[3]);
    auVar272[0xf] = -((char)((ulong)local_308 >> 0x38) == local_438[4]);
    auVar100 = auVar100 & auVar272;
    if ((ushort)((ushort)(SUB161(auVar100 >> 7,0) & 1) |
                 (ushort)(SUB161(auVar100 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar100 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar100 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar100 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar100 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar100 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar100 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar100 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar100 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar100 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar100 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar100 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar100 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar100 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar100[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011d0ee;
  }
  else {
LAB_0011d0ee:
    main_cold_606();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%.20X",0xedcb5433);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_607();
  }
  if (iVar3 == 0x14) {
    auVar174[0] = -((char)local_3b8 == local_448[0]);
    auVar174[1] = -(local_3b8._1_1_ == local_448[1]);
    auVar174[2] = -(local_3b8._2_1_ == local_448[2]);
    auVar174[3] = -(local_3b8._3_1_ == local_448[3]);
    auVar174[4] = -(local_3b8._4_1_ == local_448[4]);
    auVar174[5] = -(local_3b8._5_1_ == local_448[5]);
    auVar174[6] = -(local_3b8._6_1_ == local_448[6]);
    auVar174[7] = -(local_3b8._7_1_ == local_448[7]);
    auVar174[8] = -((char)local_88 == local_448[8]);
    auVar174[9] = -((char)((ulong)local_88 >> 8) == local_448[9]);
    auVar174[10] = -((char)((ulong)local_88 >> 0x10) == local_448[10]);
    auVar174[0xb] = -((char)((ulong)local_88 >> 0x18) == local_448[0xb]);
    auVar174[0xc] = -((char)((ulong)local_88 >> 0x20) == local_448[0xc]);
    auVar174[0xd] = -((char)((ulong)local_88 >> 0x28) == local_448[0xd]);
    auVar174[0xe] = -((char)((ulong)local_88 >> 0x30) == local_448[0xe]);
    auVar174[0xf] = -((char)((ulong)local_88 >> 0x38) == local_448[0xf]);
    auVar273[0] = -((char)local_228 == local_448[5]);
    auVar273[1] = -(local_228._1_1_ == local_448[6]);
    auVar273[2] = -(local_228._2_1_ == local_448[7]);
    auVar273[3] = -(local_228._3_1_ == local_448[8]);
    auVar273[4] = -(local_228._4_1_ == local_448[9]);
    auVar273[5] = -(local_228._5_1_ == local_448[10]);
    auVar273[6] = -(local_228._6_1_ == local_448[0xb]);
    auVar273[7] = -(local_228._7_1_ == local_448[0xc]);
    auVar273[8] = -((char)local_318 == local_448[0xd]);
    auVar273[9] = -((char)((ulong)local_318 >> 8) == local_448[0xe]);
    auVar273[10] = -((char)((ulong)local_318 >> 0x10) == local_448[0xf]);
    auVar273[0xb] = -((char)((ulong)local_318 >> 0x18) == local_438[0]);
    auVar273[0xc] = -((char)((ulong)local_318 >> 0x20) == local_438[1]);
    auVar273[0xd] = -((char)((ulong)local_318 >> 0x28) == local_438[2]);
    auVar273[0xe] = -((char)((ulong)local_318 >> 0x30) == local_438[3]);
    auVar273[0xf] = -((char)((ulong)local_318 >> 0x38) == local_438[4]);
    auVar174 = auVar174 & auVar273;
    if ((ushort)((ushort)(SUB161(auVar174 >> 7,0) & 1) |
                 (ushort)(SUB161(auVar174 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar174 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar174 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar174 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar174 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar174 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar174 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar174 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar174 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar174 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar174 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar174 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar174 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar174 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar174[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011d0ff;
  }
  else {
LAB_0011d0ff:
    main_cold_608();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%20.5s","Hallo heimur");
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_609();
  }
  if (iVar3 == 0x14) {
    auVar101[0] = -(local_3d8 == local_448[0]);
    auVar101[1] = -(cStack_3d7 == local_448[1]);
    auVar101[2] = -(cStack_3d6 == local_448[2]);
    auVar101[3] = -(cStack_3d5 == local_448[3]);
    auVar101[4] = -(cStack_3d4 == local_448[4]);
    auVar101[5] = -(cStack_3d3 == local_448[5]);
    auVar101[6] = -(cStack_3d2 == local_448[6]);
    auVar101[7] = -(cStack_3d1 == local_448[7]);
    auVar101[8] = -((char)local_1d8 == local_448[8]);
    auVar101[9] = -((char)((ulong)local_1d8 >> 8) == local_448[9]);
    auVar101[10] = -((char)((ulong)local_1d8 >> 0x10) == local_448[10]);
    auVar101[0xb] = -((char)((ulong)local_1d8 >> 0x18) == local_448[0xb]);
    auVar101[0xc] = -((char)((ulong)local_1d8 >> 0x20) == local_448[0xc]);
    auVar101[0xd] = -((char)((ulong)local_1d8 >> 0x28) == local_448[0xd]);
    auVar101[0xe] = -((char)((ulong)local_1d8 >> 0x30) == local_448[0xe]);
    auVar101[0xf] = -((char)((ulong)local_1d8 >> 0x38) == local_448[0xf]);
    auVar274[0] = -(local_3d8 == local_448[5]);
    auVar274[1] = -(cStack_3d7 == local_448[6]);
    auVar274[2] = -(cStack_3d6 == local_448[7]);
    auVar274[3] = -(cStack_3d5 == local_448[8]);
    auVar274[4] = -(cStack_3d4 == local_448[9]);
    auVar274[5] = -(cStack_3d3 == local_448[10]);
    auVar274[6] = -(cStack_3d2 == local_448[0xb]);
    auVar274[7] = -(cStack_3d1 == local_448[0xc]);
    auVar274[8] = -((char)local_278 == local_448[0xd]);
    auVar274[9] = -((char)((ulong)local_278 >> 8) == local_448[0xe]);
    auVar274[10] = -((char)((ulong)local_278 >> 0x10) == local_448[0xf]);
    auVar274[0xb] = -((char)((ulong)local_278 >> 0x18) == local_438[0]);
    auVar274[0xc] = -((char)((ulong)local_278 >> 0x20) == local_438[1]);
    auVar274[0xd] = -((char)((ulong)local_278 >> 0x28) == local_438[2]);
    auVar274[0xe] = -((char)((ulong)local_278 >> 0x30) == local_438[3]);
    auVar274[0xf] = -((char)((ulong)local_278 >> 0x38) == local_438[4]);
    auVar101 = auVar101 & auVar274;
    if ((ushort)((ushort)(SUB161(auVar101 >> 7,0) & 1) |
                 (ushort)(SUB161(auVar101 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar101 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar101 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar101 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar101 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar101 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar101 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar101 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar101 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar101 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar101 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar101 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar101 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar101 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar101[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011d110;
  }
  else {
LAB_0011d110:
    main_cold_610();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%20.5d",0x400);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_611();
  }
  local_3b8 = 0x3020202020202020;
  uStack_3b0 = 0;
  local_3a8 = 0x34323031302020;
  uStack_3a0 = 0;
  if (iVar3 == 0x14) {
    auVar102[0] = -(local_3d8 == local_448[0]);
    auVar102[1] = -(cStack_3d7 == local_448[1]);
    auVar102[2] = -(cStack_3d6 == local_448[2]);
    auVar102[3] = -(cStack_3d5 == local_448[3]);
    auVar102[4] = -(cStack_3d4 == local_448[4]);
    auVar102[5] = -(cStack_3d3 == local_448[5]);
    auVar102[6] = -(cStack_3d2 == local_448[6]);
    auVar102[7] = -(cStack_3d1 == local_448[7]);
    auVar102[8] = -(local_448[8] == ' ');
    auVar102[9] = -(local_448[9] == ' ');
    auVar102[10] = -(local_448[10] == ' ');
    auVar102[0xb] = -(local_448[0xb] == ' ');
    auVar102[0xc] = -(local_448[0xc] == ' ');
    auVar102[0xd] = -(local_448[0xd] == ' ');
    auVar102[0xe] = -(local_448[0xe] == ' ');
    auVar102[0xf] = -(local_448[0xf] == '0');
    auVar275[0] = -(local_3d8 == local_448[5]);
    auVar275[1] = -(cStack_3d7 == local_448[6]);
    auVar275[2] = -(cStack_3d6 == local_448[7]);
    auVar275[3] = -(cStack_3d5 == local_448[8]);
    auVar275[4] = -(cStack_3d4 == local_448[9]);
    auVar275[5] = -(cStack_3d3 == local_448[10]);
    auVar275[6] = -(cStack_3d2 == local_448[0xb]);
    auVar275[7] = -(cStack_3d1 == local_448[0xc]);
    auVar275[8] = -(local_448[0xd] == ' ');
    auVar275[9] = -(local_448[0xe] == ' ');
    auVar275[10] = -(local_448[0xf] == '0');
    auVar275[0xb] = -(local_438[0] == '1');
    auVar275[0xc] = -(local_438[1] == '0');
    auVar275[0xd] = -(local_438[2] == '2');
    auVar275[0xe] = -(local_438[3] == '4');
    auVar275[0xf] = -(local_438[4] == '\0');
    auVar102 = auVar102 & auVar275;
    if ((ushort)((ushort)(SUB161(auVar102 >> 7,0) & 1) |
                 (ushort)(SUB161(auVar102 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar102 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar102 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar102 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar102 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar102 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar102 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar102 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar102 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar102 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar102 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar102 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar102 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar102 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar102[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011d121;
  }
  else {
LAB_0011d121:
    main_cold_612();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%20.5d",0xfffffc00);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_613();
  }
  local_368 = 0x34323031302d20;
  uStack_360 = 0;
  local_378 = 0x302d202020202020;
  uStack_370 = 0;
  if (iVar3 == 0x14) {
    auVar103[0] = -(local_3d8 == local_448[0]);
    auVar103[1] = -(cStack_3d7 == local_448[1]);
    auVar103[2] = -(cStack_3d6 == local_448[2]);
    auVar103[3] = -(cStack_3d5 == local_448[3]);
    auVar103[4] = -(cStack_3d4 == local_448[4]);
    auVar103[5] = -(cStack_3d3 == local_448[5]);
    auVar103[6] = -(cStack_3d2 == local_448[6]);
    auVar103[7] = -(cStack_3d1 == local_448[7]);
    auVar103[8] = -(local_448[8] == ' ');
    auVar103[9] = -(local_448[9] == ' ');
    auVar103[10] = -(local_448[10] == ' ');
    auVar103[0xb] = -(local_448[0xb] == ' ');
    auVar103[0xc] = -(local_448[0xc] == ' ');
    auVar103[0xd] = -(local_448[0xd] == ' ');
    auVar103[0xe] = -(local_448[0xe] == '-');
    auVar103[0xf] = -(local_448[0xf] == '0');
    auVar276[0] = -(local_3d8 == local_448[5]);
    auVar276[1] = -(cStack_3d7 == local_448[6]);
    auVar276[2] = -(cStack_3d6 == local_448[7]);
    auVar276[3] = -(cStack_3d5 == local_448[8]);
    auVar276[4] = -(cStack_3d4 == local_448[9]);
    auVar276[5] = -(cStack_3d3 == local_448[10]);
    auVar276[6] = -(cStack_3d2 == local_448[0xb]);
    auVar276[7] = -(cStack_3d1 == local_448[0xc]);
    auVar276[8] = -(local_448[0xd] == ' ');
    auVar276[9] = -(local_448[0xe] == '-');
    auVar276[10] = -(local_448[0xf] == '0');
    auVar276[0xb] = -(local_438[0] == '1');
    auVar276[0xc] = -(local_438[1] == '0');
    auVar276[0xd] = -(local_438[2] == '2');
    auVar276[0xe] = -(local_438[3] == '4');
    auVar276[0xf] = -(local_438[4] == '\0');
    auVar103 = auVar103 & auVar276;
    if ((ushort)((ushort)(SUB161(auVar103 >> 7,0) & 1) |
                 (ushort)(SUB161(auVar103 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar103 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar103 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar103 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar103 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar103 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar103 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar103 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar103 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar103 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar103 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar103 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar103 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar103 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar103[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011d132;
  }
  else {
LAB_0011d132:
    main_cold_614();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%20.5i",0x400);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_615();
  }
  if (iVar3 == 0x14) {
    auVar104[0] = -(local_3d8 == local_448[0]);
    auVar104[1] = -(cStack_3d7 == local_448[1]);
    auVar104[2] = -(cStack_3d6 == local_448[2]);
    auVar104[3] = -(cStack_3d5 == local_448[3]);
    auVar104[4] = -(cStack_3d4 == local_448[4]);
    auVar104[5] = -(cStack_3d3 == local_448[5]);
    auVar104[6] = -(cStack_3d2 == local_448[6]);
    auVar104[7] = -(cStack_3d1 == local_448[7]);
    auVar104[8] = -((char)local_3b8 == local_448[8]);
    auVar104[9] = -((char)((ulong)local_3b8 >> 8) == local_448[9]);
    auVar104[10] = -((char)((ulong)local_3b8 >> 0x10) == local_448[10]);
    auVar104[0xb] = -((char)((ulong)local_3b8 >> 0x18) == local_448[0xb]);
    auVar104[0xc] = -((char)((ulong)local_3b8 >> 0x20) == local_448[0xc]);
    auVar104[0xd] = -((char)((ulong)local_3b8 >> 0x28) == local_448[0xd]);
    auVar104[0xe] = -((char)((ulong)local_3b8 >> 0x30) == local_448[0xe]);
    auVar104[0xf] = -((char)((ulong)local_3b8 >> 0x38) == local_448[0xf]);
    auVar277[0] = -(local_3d8 == local_448[5]);
    auVar277[1] = -(cStack_3d7 == local_448[6]);
    auVar277[2] = -(cStack_3d6 == local_448[7]);
    auVar277[3] = -(cStack_3d5 == local_448[8]);
    auVar277[4] = -(cStack_3d4 == local_448[9]);
    auVar277[5] = -(cStack_3d3 == local_448[10]);
    auVar277[6] = -(cStack_3d2 == local_448[0xb]);
    auVar277[7] = -(cStack_3d1 == local_448[0xc]);
    auVar277[8] = -((char)local_3a8 == local_448[0xd]);
    auVar277[9] = -((char)((ulong)local_3a8 >> 8) == local_448[0xe]);
    auVar277[10] = -((char)((ulong)local_3a8 >> 0x10) == local_448[0xf]);
    auVar277[0xb] = -((char)((ulong)local_3a8 >> 0x18) == local_438[0]);
    auVar277[0xc] = -((char)((ulong)local_3a8 >> 0x20) == local_438[1]);
    auVar277[0xd] = -((char)((ulong)local_3a8 >> 0x28) == local_438[2]);
    auVar277[0xe] = -((char)((ulong)local_3a8 >> 0x30) == local_438[3]);
    auVar277[0xf] = -((char)((ulong)local_3a8 >> 0x38) == local_438[4]);
    auVar104 = auVar104 & auVar277;
    if ((ushort)((ushort)(SUB161(auVar104 >> 7,0) & 1) |
                 (ushort)(SUB161(auVar104 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar104 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar104 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar104 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar104 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar104 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar104 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar104 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar104 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar104 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar104 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar104 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar104 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar104 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar104[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011d143;
  }
  else {
LAB_0011d143:
    main_cold_616();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%20.5i",0xfffffc00);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_617();
  }
  if (iVar3 == 0x14) {
    auVar105[0] = -(local_3d8 == local_448[0]);
    auVar105[1] = -(cStack_3d7 == local_448[1]);
    auVar105[2] = -(cStack_3d6 == local_448[2]);
    auVar105[3] = -(cStack_3d5 == local_448[3]);
    auVar105[4] = -(cStack_3d4 == local_448[4]);
    auVar105[5] = -(cStack_3d3 == local_448[5]);
    auVar105[6] = -(cStack_3d2 == local_448[6]);
    auVar105[7] = -(cStack_3d1 == local_448[7]);
    auVar105[8] = -((char)local_378 == local_448[8]);
    auVar105[9] = -((char)((ulong)local_378 >> 8) == local_448[9]);
    auVar105[10] = -((char)((ulong)local_378 >> 0x10) == local_448[10]);
    auVar105[0xb] = -((char)((ulong)local_378 >> 0x18) == local_448[0xb]);
    auVar105[0xc] = -((char)((ulong)local_378 >> 0x20) == local_448[0xc]);
    auVar105[0xd] = -((char)((ulong)local_378 >> 0x28) == local_448[0xd]);
    auVar105[0xe] = -((char)((ulong)local_378 >> 0x30) == local_448[0xe]);
    auVar105[0xf] = -((char)((ulong)local_378 >> 0x38) == local_448[0xf]);
    auVar278[0] = -(local_3d8 == local_448[5]);
    auVar278[1] = -(cStack_3d7 == local_448[6]);
    auVar278[2] = -(cStack_3d6 == local_448[7]);
    auVar278[3] = -(cStack_3d5 == local_448[8]);
    auVar278[4] = -(cStack_3d4 == local_448[9]);
    auVar278[5] = -(cStack_3d3 == local_448[10]);
    auVar278[6] = -(cStack_3d2 == local_448[0xb]);
    auVar278[7] = -(cStack_3d1 == local_448[0xc]);
    auVar278[8] = -((char)local_368 == local_448[0xd]);
    auVar278[9] = -((char)((ulong)local_368 >> 8) == local_448[0xe]);
    auVar278[10] = -((char)((ulong)local_368 >> 0x10) == local_448[0xf]);
    auVar278[0xb] = -((char)((ulong)local_368 >> 0x18) == local_438[0]);
    auVar278[0xc] = -((char)((ulong)local_368 >> 0x20) == local_438[1]);
    auVar278[0xd] = -((char)((ulong)local_368 >> 0x28) == local_438[2]);
    auVar278[0xe] = -((char)((ulong)local_368 >> 0x30) == local_438[3]);
    auVar278[0xf] = -((char)((ulong)local_368 >> 0x38) == local_438[4]);
    auVar105 = auVar105 & auVar278;
    if ((ushort)((ushort)(SUB161(auVar105 >> 7,0) & 1) |
                 (ushort)(SUB161(auVar105 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar105 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar105 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar105 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar105 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar105 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar105 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar105 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar105 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar105 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar105 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar105 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar105 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar105 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar105[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011d154;
  }
  else {
LAB_0011d154:
    main_cold_618();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%20.5u",0x400);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_619();
  }
  if (iVar3 == 0x14) {
    auVar106[0] = -(local_3d8 == local_448[0]);
    auVar106[1] = -(cStack_3d7 == local_448[1]);
    auVar106[2] = -(cStack_3d6 == local_448[2]);
    auVar106[3] = -(cStack_3d5 == local_448[3]);
    auVar106[4] = -(cStack_3d4 == local_448[4]);
    auVar106[5] = -(cStack_3d3 == local_448[5]);
    auVar106[6] = -(cStack_3d2 == local_448[6]);
    auVar106[7] = -(cStack_3d1 == local_448[7]);
    auVar106[8] = -((char)local_3b8 == local_448[8]);
    auVar106[9] = -((char)((ulong)local_3b8 >> 8) == local_448[9]);
    auVar106[10] = -((char)((ulong)local_3b8 >> 0x10) == local_448[10]);
    auVar106[0xb] = -((char)((ulong)local_3b8 >> 0x18) == local_448[0xb]);
    auVar106[0xc] = -((char)((ulong)local_3b8 >> 0x20) == local_448[0xc]);
    auVar106[0xd] = -((char)((ulong)local_3b8 >> 0x28) == local_448[0xd]);
    auVar106[0xe] = -((char)((ulong)local_3b8 >> 0x30) == local_448[0xe]);
    auVar106[0xf] = -((char)((ulong)local_3b8 >> 0x38) == local_448[0xf]);
    auVar279[0] = -(local_3d8 == local_448[5]);
    auVar279[1] = -(cStack_3d7 == local_448[6]);
    auVar279[2] = -(cStack_3d6 == local_448[7]);
    auVar279[3] = -(cStack_3d5 == local_448[8]);
    auVar279[4] = -(cStack_3d4 == local_448[9]);
    auVar279[5] = -(cStack_3d3 == local_448[10]);
    auVar279[6] = -(cStack_3d2 == local_448[0xb]);
    auVar279[7] = -(cStack_3d1 == local_448[0xc]);
    auVar279[8] = -((char)local_3a8 == local_448[0xd]);
    auVar279[9] = -((char)((ulong)local_3a8 >> 8) == local_448[0xe]);
    auVar279[10] = -((char)((ulong)local_3a8 >> 0x10) == local_448[0xf]);
    auVar279[0xb] = -((char)((ulong)local_3a8 >> 0x18) == local_438[0]);
    auVar279[0xc] = -((char)((ulong)local_3a8 >> 0x20) == local_438[1]);
    auVar279[0xd] = -((char)((ulong)local_3a8 >> 0x28) == local_438[2]);
    auVar279[0xe] = -((char)((ulong)local_3a8 >> 0x30) == local_438[3]);
    auVar279[0xf] = -((char)((ulong)local_3a8 >> 0x38) == local_438[4]);
    auVar106 = auVar106 & auVar279;
    if ((ushort)((ushort)(SUB161(auVar106 >> 7,0) & 1) |
                 (ushort)(SUB161(auVar106 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar106 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar106 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar106 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar106 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar106 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar106 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar106 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar106 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar106 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar106 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar106 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar106 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar106 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar106[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011d165;
  }
  else {
LAB_0011d165:
    main_cold_620();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%20.5u",0xfffffc00);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_621();
  }
  if (iVar3 == 0x14) {
    auVar107[0] = -(local_3d8 == local_448[0]);
    auVar107[1] = -(cStack_3d7 == local_448[1]);
    auVar107[2] = -(cStack_3d6 == local_448[2]);
    auVar107[3] = -(cStack_3d5 == local_448[3]);
    auVar107[4] = -(cStack_3d4 == local_448[4]);
    auVar107[5] = -(cStack_3d3 == local_448[5]);
    auVar107[6] = -(cStack_3d2 == local_448[6]);
    auVar107[7] = -(cStack_3d1 == local_448[7]);
    auVar107[8] = -((char)local_268 == local_448[8]);
    auVar107[9] = -((char)((ulong)local_268 >> 8) == local_448[9]);
    auVar107[10] = -((char)((ulong)local_268 >> 0x10) == local_448[10]);
    auVar107[0xb] = -((char)((ulong)local_268 >> 0x18) == local_448[0xb]);
    auVar107[0xc] = -((char)((ulong)local_268 >> 0x20) == local_448[0xc]);
    auVar107[0xd] = -((char)((ulong)local_268 >> 0x28) == local_448[0xd]);
    auVar107[0xe] = -((char)((ulong)local_268 >> 0x30) == local_448[0xe]);
    auVar107[0xf] = -((char)((ulong)local_268 >> 0x38) == local_448[0xf]);
    auVar280[0] = -((char)local_258 == local_448[5]);
    auVar280[1] = -(local_258._1_1_ == local_448[6]);
    auVar280[2] = -(local_258._2_1_ == local_448[7]);
    auVar280[3] = -(local_258._3_1_ == local_448[8]);
    auVar280[4] = -(local_258._4_1_ == local_448[9]);
    auVar280[5] = -(local_258._5_1_ == local_448[10]);
    auVar280[6] = -(local_258._6_1_ == local_448[0xb]);
    auVar280[7] = -(local_258._7_1_ == local_448[0xc]);
    auVar280[8] = -((char)local_2ec._4_8_ == local_448[0xd]);
    auVar280[9] = -(SUB81(local_2ec._4_8_,1) == local_448[0xe]);
    auVar280[10] = -(SUB81(local_2ec._4_8_,2) == local_448[0xf]);
    auVar280[0xb] = -(SUB81(local_2ec._4_8_,3) == local_438[0]);
    auVar280[0xc] = -(SUB81(local_2ec._4_8_,4) == local_438[1]);
    auVar280[0xd] = -(SUB81(local_2ec._4_8_,5) == local_438[2]);
    auVar280[0xe] = -(SUB81(local_2ec._4_8_,6) == local_438[3]);
    auVar280[0xf] = -(SUB81(local_2ec._4_8_,7) == local_438[4]);
    auVar107 = auVar107 & auVar280;
    if ((ushort)((ushort)(SUB161(auVar107 >> 7,0) & 1) |
                 (ushort)(SUB161(auVar107 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar107 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar107 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar107 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar107 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar107 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar107 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar107 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar107 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar107 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar107 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar107 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar107 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar107 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar107[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011d176;
  }
  else {
LAB_0011d176:
    main_cold_622();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%20.5o",0x1ff);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_623();
  }
  local_2b8 = 0x37373730302020;
  uStack_2b0 = 0;
  if (iVar3 == 0x14) {
    auVar108[0] = -(local_3d8 == local_448[0]);
    auVar108[1] = -(cStack_3d7 == local_448[1]);
    auVar108[2] = -(cStack_3d6 == local_448[2]);
    auVar108[3] = -(cStack_3d5 == local_448[3]);
    auVar108[4] = -(cStack_3d4 == local_448[4]);
    auVar108[5] = -(cStack_3d3 == local_448[5]);
    auVar108[6] = -(cStack_3d2 == local_448[6]);
    auVar108[7] = -(cStack_3d1 == local_448[7]);
    auVar108[8] = -((char)local_3b8 == local_448[8]);
    auVar108[9] = -((char)((ulong)local_3b8 >> 8) == local_448[9]);
    auVar108[10] = -((char)((ulong)local_3b8 >> 0x10) == local_448[10]);
    auVar108[0xb] = -((char)((ulong)local_3b8 >> 0x18) == local_448[0xb]);
    auVar108[0xc] = -((char)((ulong)local_3b8 >> 0x20) == local_448[0xc]);
    auVar108[0xd] = -((char)((ulong)local_3b8 >> 0x28) == local_448[0xd]);
    auVar108[0xe] = -((char)((ulong)local_3b8 >> 0x30) == local_448[0xe]);
    auVar108[0xf] = -((char)((ulong)local_3b8 >> 0x38) == local_448[0xf]);
    auVar281[0] = -(local_3d8 == local_448[5]);
    auVar281[1] = -(cStack_3d7 == local_448[6]);
    auVar281[2] = -(cStack_3d6 == local_448[7]);
    auVar281[3] = -(cStack_3d5 == local_448[8]);
    auVar281[4] = -(cStack_3d4 == local_448[9]);
    auVar281[5] = -(cStack_3d3 == local_448[10]);
    auVar281[6] = -(cStack_3d2 == local_448[0xb]);
    auVar281[7] = -(cStack_3d1 == local_448[0xc]);
    auVar281[8] = -(local_448[0xd] == ' ');
    auVar281[9] = -(local_448[0xe] == ' ');
    auVar281[10] = -(local_448[0xf] == '0');
    auVar281[0xb] = -(local_438[0] == '0');
    auVar281[0xc] = -(local_438[1] == '7');
    auVar281[0xd] = -(local_438[2] == '7');
    auVar281[0xe] = -(local_438[3] == '7');
    auVar281[0xf] = -(local_438[4] == '\0');
    auVar108 = auVar108 & auVar281;
    if ((ushort)((ushort)(SUB161(auVar108 >> 7,0) & 1) |
                 (ushort)(SUB161(auVar108 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar108 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar108 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar108 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar108 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar108 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar108 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar108 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar108 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar108 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar108 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar108 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar108 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar108 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar108[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011d187;
  }
  else {
LAB_0011d187:
    main_cold_624();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%20.5o",0xfffffe01);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_625();
  }
  if (iVar3 == 0x14) {
    auVar109[0] = -(local_3d8 == local_448[0]);
    auVar109[1] = -(cStack_3d7 == local_448[1]);
    auVar109[2] = -(cStack_3d6 == local_448[2]);
    auVar109[3] = -(cStack_3d5 == local_448[3]);
    auVar109[4] = -(cStack_3d4 == local_448[4]);
    auVar109[5] = -(cStack_3d3 == local_448[5]);
    auVar109[6] = -(cStack_3d2 == local_448[6]);
    auVar109[7] = -(cStack_3d1 == local_448[7]);
    auVar109[8] = -((char)local_248 == local_448[8]);
    auVar109[9] = -((char)((ulong)local_248 >> 8) == local_448[9]);
    auVar109[10] = -((char)((ulong)local_248 >> 0x10) == local_448[10]);
    auVar109[0xb] = -((char)((ulong)local_248 >> 0x18) == local_448[0xb]);
    auVar109[0xc] = -((char)((ulong)local_248 >> 0x20) == local_448[0xc]);
    auVar109[0xd] = -((char)((ulong)local_248 >> 0x28) == local_448[0xd]);
    auVar109[0xe] = -((char)((ulong)local_248 >> 0x30) == local_448[0xe]);
    auVar109[0xf] = -((char)((ulong)local_248 >> 0x38) == local_448[0xf]);
    auVar282[0] = -((char)local_238 == local_448[5]);
    auVar282[1] = -(local_238._1_1_ == local_448[6]);
    auVar282[2] = -(local_238._2_1_ == local_448[7]);
    auVar282[3] = -(local_238._3_1_ == local_448[8]);
    auVar282[4] = -(local_238._4_1_ == local_448[9]);
    auVar282[5] = -(local_238._5_1_ == local_448[10]);
    auVar282[6] = -(local_238._6_1_ == local_448[0xb]);
    auVar282[7] = -(local_238._7_1_ == local_448[0xc]);
    auVar282[8] = -((char)local_348 == local_448[0xd]);
    auVar282[9] = -((char)((ulong)local_348 >> 8) == local_448[0xe]);
    auVar282[10] = -((char)((ulong)local_348 >> 0x10) == local_448[0xf]);
    auVar282[0xb] = -((char)((ulong)local_348 >> 0x18) == local_438[0]);
    auVar282[0xc] = -((char)((ulong)local_348 >> 0x20) == local_438[1]);
    auVar282[0xd] = -((char)((ulong)local_348 >> 0x28) == local_438[2]);
    auVar282[0xe] = -((char)((ulong)local_348 >> 0x30) == local_438[3]);
    auVar282[0xf] = -((char)((ulong)local_348 >> 0x38) == local_438[4]);
    auVar109 = auVar109 & auVar282;
    if ((ushort)((ushort)(SUB161(auVar109 >> 7,0) & 1) |
                 (ushort)(SUB161(auVar109 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar109 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar109 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar109 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar109 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar109 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar109 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar109 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar109 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar109 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar109 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar109 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar109 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar109 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar109[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011d198;
  }
  else {
LAB_0011d198:
    main_cold_626();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%20.5x",0x1234abcd);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_627();
  }
  if (iVar3 == 0x14) {
    auVar110[0] = -(local_3d8 == local_448[0]);
    auVar110[1] = -(cStack_3d7 == local_448[1]);
    auVar110[2] = -(cStack_3d6 == local_448[2]);
    auVar110[3] = -(cStack_3d5 == local_448[3]);
    auVar110[4] = -(cStack_3d4 == local_448[4]);
    auVar110[5] = -(cStack_3d3 == local_448[5]);
    auVar110[6] = -(cStack_3d2 == local_448[6]);
    auVar110[7] = -(cStack_3d1 == local_448[7]);
    auVar110[8] = -((char)local_388 == local_448[8]);
    auVar110[9] = -((char)((ulong)local_388 >> 8) == local_448[9]);
    auVar110[10] = -((char)((ulong)local_388 >> 0x10) == local_448[10]);
    auVar110[0xb] = -((char)((ulong)local_388 >> 0x18) == local_448[0xb]);
    auVar110[0xc] = -((char)((ulong)local_388 >> 0x20) == local_448[0xc]);
    auVar110[0xd] = -((char)((ulong)local_388 >> 0x28) == local_448[0xd]);
    auVar110[0xe] = -((char)((ulong)local_388 >> 0x30) == local_448[0xe]);
    auVar110[0xf] = -((char)((ulong)local_388 >> 0x38) == local_448[0xf]);
    auVar283[0] = -((char)local_398 == local_448[5]);
    auVar283[1] = -(local_398._1_1_ == local_448[6]);
    auVar283[2] = -(local_398._2_1_ == local_448[7]);
    auVar283[3] = -(local_398._3_1_ == local_448[8]);
    auVar283[4] = -(local_398._4_1_ == local_448[9]);
    auVar283[5] = -(local_398._5_1_ == local_448[10]);
    auVar283[6] = -(local_398._6_1_ == local_448[0xb]);
    auVar283[7] = -(local_398._7_1_ == local_448[0xc]);
    auVar283[8] = -((char)local_328 == local_448[0xd]);
    auVar283[9] = -((char)((ulong)local_328 >> 8) == local_448[0xe]);
    auVar283[10] = -((char)((ulong)local_328 >> 0x10) == local_448[0xf]);
    auVar283[0xb] = -((char)((ulong)local_328 >> 0x18) == local_438[0]);
    auVar283[0xc] = -((char)((ulong)local_328 >> 0x20) == local_438[1]);
    auVar283[0xd] = -((char)((ulong)local_328 >> 0x28) == local_438[2]);
    auVar283[0xe] = -((char)((ulong)local_328 >> 0x30) == local_438[3]);
    auVar283[0xf] = -((char)((ulong)local_328 >> 0x38) == local_438[4]);
    auVar110 = auVar110 & auVar283;
    if ((ushort)((ushort)(SUB161(auVar110 >> 7,0) & 1) |
                 (ushort)(SUB161(auVar110 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar110 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar110 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar110 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar110 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar110 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar110 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar110 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar110 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar110 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar110 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar110 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar110 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar110 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar110[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011d1a9;
  }
  else {
LAB_0011d1a9:
    main_cold_628();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%20.10x",0xedcb5433);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_629();
  }
  local_2a8 = 0x6530302020202020;
  uStack_2a0 = 0;
  local_2d8 = 0x6263646530302020;
  uStack_2d0 = 0;
  if (iVar3 == 0x14) {
    auVar111[0] = -(local_3d8 == local_448[0]);
    auVar111[1] = -(cStack_3d7 == local_448[1]);
    auVar111[2] = -(cStack_3d6 == local_448[2]);
    auVar111[3] = -(cStack_3d5 == local_448[3]);
    auVar111[4] = -(cStack_3d4 == local_448[4]);
    auVar111[5] = -(cStack_3d3 == local_448[5]);
    auVar111[6] = -(cStack_3d2 == local_448[6]);
    auVar111[7] = -(cStack_3d1 == local_448[7]);
    auVar111[8] = -(local_448[8] == ' ');
    auVar111[9] = -(local_448[9] == ' ');
    auVar111[10] = -(local_448[10] == '0');
    auVar111[0xb] = -(local_448[0xb] == '0');
    auVar111[0xc] = -(local_448[0xc] == 'e');
    auVar111[0xd] = -(local_448[0xd] == 'd');
    auVar111[0xe] = -(local_448[0xe] == 'c');
    auVar111[0xf] = -(local_448[0xf] == 'b');
    auVar284[0] = -(local_448[5] == ' ');
    auVar284[1] = -(local_448[6] == ' ');
    auVar284[2] = -(local_448[7] == ' ');
    auVar284[3] = -(local_448[8] == ' ');
    auVar284[4] = -(local_448[9] == ' ');
    auVar284[5] = -(local_448[10] == '0');
    auVar284[6] = -(local_448[0xb] == '0');
    auVar284[7] = -(local_448[0xc] == 'e');
    auVar284[8] = -((char)local_338 == local_448[0xd]);
    auVar284[9] = -((char)((ulong)local_338 >> 8) == local_448[0xe]);
    auVar284[10] = -((char)((ulong)local_338 >> 0x10) == local_448[0xf]);
    auVar284[0xb] = -((char)((ulong)local_338 >> 0x18) == local_438[0]);
    auVar284[0xc] = -((char)((ulong)local_338 >> 0x20) == local_438[1]);
    auVar284[0xd] = -((char)((ulong)local_338 >> 0x28) == local_438[2]);
    auVar284[0xe] = -((char)((ulong)local_338 >> 0x30) == local_438[3]);
    auVar284[0xf] = -((char)((ulong)local_338 >> 0x38) == local_438[4]);
    auVar111 = auVar111 & auVar284;
    if ((ushort)((ushort)(SUB161(auVar111 >> 7,0) & 1) |
                 (ushort)(SUB161(auVar111 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar111 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar111 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar111 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar111 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar111 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar111 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar111 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar111 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar111 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar111 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar111 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar111 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar111 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar111[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011d1ba;
  }
  else {
LAB_0011d1ba:
    main_cold_630();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%20.5X",0x1234abcd);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_631();
  }
  if (iVar3 == 0x14) {
    auVar112[0] = -(local_3d8 == local_448[0]);
    auVar112[1] = -(cStack_3d7 == local_448[1]);
    auVar112[2] = -(cStack_3d6 == local_448[2]);
    auVar112[3] = -(cStack_3d5 == local_448[3]);
    auVar112[4] = -(cStack_3d4 == local_448[4]);
    auVar112[5] = -(cStack_3d3 == local_448[5]);
    auVar112[6] = -(cStack_3d2 == local_448[6]);
    auVar112[7] = -(cStack_3d1 == local_448[7]);
    auVar112[8] = -((char)local_388 == local_448[8]);
    auVar112[9] = -((char)((ulong)local_388 >> 8) == local_448[9]);
    auVar112[10] = -((char)((ulong)local_388 >> 0x10) == local_448[10]);
    auVar112[0xb] = -((char)((ulong)local_388 >> 0x18) == local_448[0xb]);
    auVar112[0xc] = -((char)((ulong)local_388 >> 0x20) == local_448[0xc]);
    auVar112[0xd] = -((char)((ulong)local_388 >> 0x28) == local_448[0xd]);
    auVar112[0xe] = -((char)((ulong)local_388 >> 0x30) == local_448[0xe]);
    auVar112[0xf] = -((char)((ulong)local_388 >> 0x38) == local_448[0xf]);
    auVar285[0] = -((char)local_398 == local_448[5]);
    auVar285[1] = -(local_398._1_1_ == local_448[6]);
    auVar285[2] = -(local_398._2_1_ == local_448[7]);
    auVar285[3] = -(local_398._3_1_ == local_448[8]);
    auVar285[4] = -(local_398._4_1_ == local_448[9]);
    auVar285[5] = -(local_398._5_1_ == local_448[10]);
    auVar285[6] = -(local_398._6_1_ == local_448[0xb]);
    auVar285[7] = -(local_398._7_1_ == local_448[0xc]);
    auVar285[8] = -((char)local_308 == local_448[0xd]);
    auVar285[9] = -((char)((ulong)local_308 >> 8) == local_448[0xe]);
    auVar285[10] = -((char)((ulong)local_308 >> 0x10) == local_448[0xf]);
    auVar285[0xb] = -((char)((ulong)local_308 >> 0x18) == local_438[0]);
    auVar285[0xc] = -((char)((ulong)local_308 >> 0x20) == local_438[1]);
    auVar285[0xd] = -((char)((ulong)local_308 >> 0x28) == local_438[2]);
    auVar285[0xe] = -((char)((ulong)local_308 >> 0x30) == local_438[3]);
    auVar285[0xf] = -((char)((ulong)local_308 >> 0x38) == local_438[4]);
    auVar112 = auVar112 & auVar285;
    if ((ushort)((ushort)(SUB161(auVar112 >> 7,0) & 1) |
                 (ushort)(SUB161(auVar112 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar112 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar112 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar112 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar112 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar112 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar112 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar112 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar112 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar112 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar112 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar112 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar112 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar112 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar112[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011d1cb;
  }
  else {
LAB_0011d1cb:
    main_cold_632();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%20.10X",0xedcb5433);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_633();
  }
  local_2c8 = 0x4530302020202020;
  uStack_2c0 = 0;
  local_278 = 0x4243444530302020;
  uStack_270 = 0;
  if (iVar3 == 0x14) {
    auVar113[0] = -(local_3d8 == local_448[0]);
    auVar113[1] = -(cStack_3d7 == local_448[1]);
    auVar113[2] = -(cStack_3d6 == local_448[2]);
    auVar113[3] = -(cStack_3d5 == local_448[3]);
    auVar113[4] = -(cStack_3d4 == local_448[4]);
    auVar113[5] = -(cStack_3d3 == local_448[5]);
    auVar113[6] = -(cStack_3d2 == local_448[6]);
    auVar113[7] = -(cStack_3d1 == local_448[7]);
    auVar113[8] = -(local_448[8] == ' ');
    auVar113[9] = -(local_448[9] == ' ');
    auVar113[10] = -(local_448[10] == '0');
    auVar113[0xb] = -(local_448[0xb] == '0');
    auVar113[0xc] = -(local_448[0xc] == 'E');
    auVar113[0xd] = -(local_448[0xd] == 'D');
    auVar113[0xe] = -(local_448[0xe] == 'C');
    auVar113[0xf] = -(local_448[0xf] == 'B');
    auVar286[0] = -(local_448[5] == ' ');
    auVar286[1] = -(local_448[6] == ' ');
    auVar286[2] = -(local_448[7] == ' ');
    auVar286[3] = -(local_448[8] == ' ');
    auVar286[4] = -(local_448[9] == ' ');
    auVar286[5] = -(local_448[10] == '0');
    auVar286[6] = -(local_448[0xb] == '0');
    auVar286[7] = -(local_448[0xc] == 'E');
    auVar286[8] = -((char)local_318 == local_448[0xd]);
    auVar286[9] = -((char)((ulong)local_318 >> 8) == local_448[0xe]);
    auVar286[10] = -((char)((ulong)local_318 >> 0x10) == local_448[0xf]);
    auVar286[0xb] = -((char)((ulong)local_318 >> 0x18) == local_438[0]);
    auVar286[0xc] = -((char)((ulong)local_318 >> 0x20) == local_438[1]);
    auVar286[0xd] = -((char)((ulong)local_318 >> 0x28) == local_438[2]);
    auVar286[0xe] = -((char)((ulong)local_318 >> 0x30) == local_438[3]);
    auVar286[0xf] = -((char)((ulong)local_318 >> 0x38) == local_438[4]);
    auVar113 = auVar113 & auVar286;
    if ((ushort)((ushort)(SUB161(auVar113 >> 7,0) & 1) |
                 (ushort)(SUB161(auVar113 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar113 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar113 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar113 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar113 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar113 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar113 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar113 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar113 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar113 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar113 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar113 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar113 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar113 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar113[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011d1dc;
  }
  else {
LAB_0011d1dc:
    main_cold_634();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%020.5d",0x400);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_635();
  }
  if (iVar3 == 0x14) {
    auVar114[0] = -(local_3d8 == local_448[0]);
    auVar114[1] = -(cStack_3d7 == local_448[1]);
    auVar114[2] = -(cStack_3d6 == local_448[2]);
    auVar114[3] = -(cStack_3d5 == local_448[3]);
    auVar114[4] = -(cStack_3d4 == local_448[4]);
    auVar114[5] = -(cStack_3d3 == local_448[5]);
    auVar114[6] = -(cStack_3d2 == local_448[6]);
    auVar114[7] = -(cStack_3d1 == local_448[7]);
    auVar114[8] = -((char)local_3b8 == local_448[8]);
    auVar114[9] = -((char)((ulong)local_3b8 >> 8) == local_448[9]);
    auVar114[10] = -((char)((ulong)local_3b8 >> 0x10) == local_448[10]);
    auVar114[0xb] = -((char)((ulong)local_3b8 >> 0x18) == local_448[0xb]);
    auVar114[0xc] = -((char)((ulong)local_3b8 >> 0x20) == local_448[0xc]);
    auVar114[0xd] = -((char)((ulong)local_3b8 >> 0x28) == local_448[0xd]);
    auVar114[0xe] = -((char)((ulong)local_3b8 >> 0x30) == local_448[0xe]);
    auVar114[0xf] = -((char)((ulong)local_3b8 >> 0x38) == local_448[0xf]);
    auVar287[0] = -(local_3d8 == local_448[5]);
    auVar287[1] = -(cStack_3d7 == local_448[6]);
    auVar287[2] = -(cStack_3d6 == local_448[7]);
    auVar287[3] = -(cStack_3d5 == local_448[8]);
    auVar287[4] = -(cStack_3d4 == local_448[9]);
    auVar287[5] = -(cStack_3d3 == local_448[10]);
    auVar287[6] = -(cStack_3d2 == local_448[0xb]);
    auVar287[7] = -(cStack_3d1 == local_448[0xc]);
    auVar287[8] = -((char)local_3a8 == local_448[0xd]);
    auVar287[9] = -((char)((ulong)local_3a8 >> 8) == local_448[0xe]);
    auVar287[10] = -((char)((ulong)local_3a8 >> 0x10) == local_448[0xf]);
    auVar287[0xb] = -((char)((ulong)local_3a8 >> 0x18) == local_438[0]);
    auVar287[0xc] = -((char)((ulong)local_3a8 >> 0x20) == local_438[1]);
    auVar287[0xd] = -((char)((ulong)local_3a8 >> 0x28) == local_438[2]);
    auVar287[0xe] = -((char)((ulong)local_3a8 >> 0x30) == local_438[3]);
    auVar287[0xf] = -((char)((ulong)local_3a8 >> 0x38) == local_438[4]);
    auVar114 = auVar114 & auVar287;
    if ((ushort)((ushort)(SUB161(auVar114 >> 7,0) & 1) |
                 (ushort)(SUB161(auVar114 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar114 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar114 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar114 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar114 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar114 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar114 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar114 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar114 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar114 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar114 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar114 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar114 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar114 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar114[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011d1ed;
  }
  else {
LAB_0011d1ed:
    main_cold_636();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%020.5d",0xfffffc00);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_637();
  }
  if (iVar3 == 0x14) {
    auVar115[0] = -(local_3d8 == local_448[0]);
    auVar115[1] = -(cStack_3d7 == local_448[1]);
    auVar115[2] = -(cStack_3d6 == local_448[2]);
    auVar115[3] = -(cStack_3d5 == local_448[3]);
    auVar115[4] = -(cStack_3d4 == local_448[4]);
    auVar115[5] = -(cStack_3d3 == local_448[5]);
    auVar115[6] = -(cStack_3d2 == local_448[6]);
    auVar115[7] = -(cStack_3d1 == local_448[7]);
    auVar115[8] = -((char)local_378 == local_448[8]);
    auVar115[9] = -((char)((ulong)local_378 >> 8) == local_448[9]);
    auVar115[10] = -((char)((ulong)local_378 >> 0x10) == local_448[10]);
    auVar115[0xb] = -((char)((ulong)local_378 >> 0x18) == local_448[0xb]);
    auVar115[0xc] = -((char)((ulong)local_378 >> 0x20) == local_448[0xc]);
    auVar115[0xd] = -((char)((ulong)local_378 >> 0x28) == local_448[0xd]);
    auVar115[0xe] = -((char)((ulong)local_378 >> 0x30) == local_448[0xe]);
    auVar115[0xf] = -((char)((ulong)local_378 >> 0x38) == local_448[0xf]);
    auVar288[0] = -(local_3d8 == local_448[5]);
    auVar288[1] = -(cStack_3d7 == local_448[6]);
    auVar288[2] = -(cStack_3d6 == local_448[7]);
    auVar288[3] = -(cStack_3d5 == local_448[8]);
    auVar288[4] = -(cStack_3d4 == local_448[9]);
    auVar288[5] = -(cStack_3d3 == local_448[10]);
    auVar288[6] = -(cStack_3d2 == local_448[0xb]);
    auVar288[7] = -(cStack_3d1 == local_448[0xc]);
    auVar288[8] = -((char)local_368 == local_448[0xd]);
    auVar288[9] = -((char)((ulong)local_368 >> 8) == local_448[0xe]);
    auVar288[10] = -((char)((ulong)local_368 >> 0x10) == local_448[0xf]);
    auVar288[0xb] = -((char)((ulong)local_368 >> 0x18) == local_438[0]);
    auVar288[0xc] = -((char)((ulong)local_368 >> 0x20) == local_438[1]);
    auVar288[0xd] = -((char)((ulong)local_368 >> 0x28) == local_438[2]);
    auVar288[0xe] = -((char)((ulong)local_368 >> 0x30) == local_438[3]);
    auVar288[0xf] = -((char)((ulong)local_368 >> 0x38) == local_438[4]);
    auVar115 = auVar115 & auVar288;
    if ((ushort)((ushort)(SUB161(auVar115 >> 7,0) & 1) |
                 (ushort)(SUB161(auVar115 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar115 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar115 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar115 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar115 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar115 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar115 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar115 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar115 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar115 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar115 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar115 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar115 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar115 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar115[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011d1fe;
  }
  else {
LAB_0011d1fe:
    main_cold_638();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%020.5i",0x400);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_639();
  }
  if (iVar3 == 0x14) {
    auVar116[0] = -(local_3d8 == local_448[0]);
    auVar116[1] = -(cStack_3d7 == local_448[1]);
    auVar116[2] = -(cStack_3d6 == local_448[2]);
    auVar116[3] = -(cStack_3d5 == local_448[3]);
    auVar116[4] = -(cStack_3d4 == local_448[4]);
    auVar116[5] = -(cStack_3d3 == local_448[5]);
    auVar116[6] = -(cStack_3d2 == local_448[6]);
    auVar116[7] = -(cStack_3d1 == local_448[7]);
    auVar116[8] = -((char)local_3b8 == local_448[8]);
    auVar116[9] = -((char)((ulong)local_3b8 >> 8) == local_448[9]);
    auVar116[10] = -((char)((ulong)local_3b8 >> 0x10) == local_448[10]);
    auVar116[0xb] = -((char)((ulong)local_3b8 >> 0x18) == local_448[0xb]);
    auVar116[0xc] = -((char)((ulong)local_3b8 >> 0x20) == local_448[0xc]);
    auVar116[0xd] = -((char)((ulong)local_3b8 >> 0x28) == local_448[0xd]);
    auVar116[0xe] = -((char)((ulong)local_3b8 >> 0x30) == local_448[0xe]);
    auVar116[0xf] = -((char)((ulong)local_3b8 >> 0x38) == local_448[0xf]);
    auVar289[0] = -(local_3d8 == local_448[5]);
    auVar289[1] = -(cStack_3d7 == local_448[6]);
    auVar289[2] = -(cStack_3d6 == local_448[7]);
    auVar289[3] = -(cStack_3d5 == local_448[8]);
    auVar289[4] = -(cStack_3d4 == local_448[9]);
    auVar289[5] = -(cStack_3d3 == local_448[10]);
    auVar289[6] = -(cStack_3d2 == local_448[0xb]);
    auVar289[7] = -(cStack_3d1 == local_448[0xc]);
    auVar289[8] = -((char)local_3a8 == local_448[0xd]);
    auVar289[9] = -((char)((ulong)local_3a8 >> 8) == local_448[0xe]);
    auVar289[10] = -((char)((ulong)local_3a8 >> 0x10) == local_448[0xf]);
    auVar289[0xb] = -((char)((ulong)local_3a8 >> 0x18) == local_438[0]);
    auVar289[0xc] = -((char)((ulong)local_3a8 >> 0x20) == local_438[1]);
    auVar289[0xd] = -((char)((ulong)local_3a8 >> 0x28) == local_438[2]);
    auVar289[0xe] = -((char)((ulong)local_3a8 >> 0x30) == local_438[3]);
    auVar289[0xf] = -((char)((ulong)local_3a8 >> 0x38) == local_438[4]);
    auVar116 = auVar116 & auVar289;
    if ((ushort)((ushort)(SUB161(auVar116 >> 7,0) & 1) |
                 (ushort)(SUB161(auVar116 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar116 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar116 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar116 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar116 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar116 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar116 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar116 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar116 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar116 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar116 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar116 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar116 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar116 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar116[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011d20f;
  }
  else {
LAB_0011d20f:
    main_cold_640();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%020.5i",0xfffffc00);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_641();
  }
  if (iVar3 == 0x14) {
    auVar117[0] = -(local_3d8 == local_448[0]);
    auVar117[1] = -(cStack_3d7 == local_448[1]);
    auVar117[2] = -(cStack_3d6 == local_448[2]);
    auVar117[3] = -(cStack_3d5 == local_448[3]);
    auVar117[4] = -(cStack_3d4 == local_448[4]);
    auVar117[5] = -(cStack_3d3 == local_448[5]);
    auVar117[6] = -(cStack_3d2 == local_448[6]);
    auVar117[7] = -(cStack_3d1 == local_448[7]);
    auVar117[8] = -((char)local_378 == local_448[8]);
    auVar117[9] = -((char)((ulong)local_378 >> 8) == local_448[9]);
    auVar117[10] = -((char)((ulong)local_378 >> 0x10) == local_448[10]);
    auVar117[0xb] = -((char)((ulong)local_378 >> 0x18) == local_448[0xb]);
    auVar117[0xc] = -((char)((ulong)local_378 >> 0x20) == local_448[0xc]);
    auVar117[0xd] = -((char)((ulong)local_378 >> 0x28) == local_448[0xd]);
    auVar117[0xe] = -((char)((ulong)local_378 >> 0x30) == local_448[0xe]);
    auVar117[0xf] = -((char)((ulong)local_378 >> 0x38) == local_448[0xf]);
    auVar290[0] = -(local_3d8 == local_448[5]);
    auVar290[1] = -(cStack_3d7 == local_448[6]);
    auVar290[2] = -(cStack_3d6 == local_448[7]);
    auVar290[3] = -(cStack_3d5 == local_448[8]);
    auVar290[4] = -(cStack_3d4 == local_448[9]);
    auVar290[5] = -(cStack_3d3 == local_448[10]);
    auVar290[6] = -(cStack_3d2 == local_448[0xb]);
    auVar290[7] = -(cStack_3d1 == local_448[0xc]);
    auVar290[8] = -((char)local_368 == local_448[0xd]);
    auVar290[9] = -((char)((ulong)local_368 >> 8) == local_448[0xe]);
    auVar290[10] = -((char)((ulong)local_368 >> 0x10) == local_448[0xf]);
    auVar290[0xb] = -((char)((ulong)local_368 >> 0x18) == local_438[0]);
    auVar290[0xc] = -((char)((ulong)local_368 >> 0x20) == local_438[1]);
    auVar290[0xd] = -((char)((ulong)local_368 >> 0x28) == local_438[2]);
    auVar290[0xe] = -((char)((ulong)local_368 >> 0x30) == local_438[3]);
    auVar290[0xf] = -((char)((ulong)local_368 >> 0x38) == local_438[4]);
    auVar117 = auVar117 & auVar290;
    if ((ushort)((ushort)(SUB161(auVar117 >> 7,0) & 1) |
                 (ushort)(SUB161(auVar117 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar117 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar117 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar117 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar117 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar117 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar117 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar117 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar117 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar117 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar117 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar117 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar117 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar117 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar117[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011d220;
  }
  else {
LAB_0011d220:
    main_cold_642();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%020.5u",0x400);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_643();
  }
  if (iVar3 == 0x14) {
    auVar118[0] = -(local_3d8 == local_448[0]);
    auVar118[1] = -(cStack_3d7 == local_448[1]);
    auVar118[2] = -(cStack_3d6 == local_448[2]);
    auVar118[3] = -(cStack_3d5 == local_448[3]);
    auVar118[4] = -(cStack_3d4 == local_448[4]);
    auVar118[5] = -(cStack_3d3 == local_448[5]);
    auVar118[6] = -(cStack_3d2 == local_448[6]);
    auVar118[7] = -(cStack_3d1 == local_448[7]);
    auVar118[8] = -((char)local_3b8 == local_448[8]);
    auVar118[9] = -((char)((ulong)local_3b8 >> 8) == local_448[9]);
    auVar118[10] = -((char)((ulong)local_3b8 >> 0x10) == local_448[10]);
    auVar118[0xb] = -((char)((ulong)local_3b8 >> 0x18) == local_448[0xb]);
    auVar118[0xc] = -((char)((ulong)local_3b8 >> 0x20) == local_448[0xc]);
    auVar118[0xd] = -((char)((ulong)local_3b8 >> 0x28) == local_448[0xd]);
    auVar118[0xe] = -((char)((ulong)local_3b8 >> 0x30) == local_448[0xe]);
    auVar118[0xf] = -((char)((ulong)local_3b8 >> 0x38) == local_448[0xf]);
    auVar291[0] = -(local_3d8 == local_448[5]);
    auVar291[1] = -(cStack_3d7 == local_448[6]);
    auVar291[2] = -(cStack_3d6 == local_448[7]);
    auVar291[3] = -(cStack_3d5 == local_448[8]);
    auVar291[4] = -(cStack_3d4 == local_448[9]);
    auVar291[5] = -(cStack_3d3 == local_448[10]);
    auVar291[6] = -(cStack_3d2 == local_448[0xb]);
    auVar291[7] = -(cStack_3d1 == local_448[0xc]);
    auVar291[8] = -((char)local_3a8 == local_448[0xd]);
    auVar291[9] = -((char)((ulong)local_3a8 >> 8) == local_448[0xe]);
    auVar291[10] = -((char)((ulong)local_3a8 >> 0x10) == local_448[0xf]);
    auVar291[0xb] = -((char)((ulong)local_3a8 >> 0x18) == local_438[0]);
    auVar291[0xc] = -((char)((ulong)local_3a8 >> 0x20) == local_438[1]);
    auVar291[0xd] = -((char)((ulong)local_3a8 >> 0x28) == local_438[2]);
    auVar291[0xe] = -((char)((ulong)local_3a8 >> 0x30) == local_438[3]);
    auVar291[0xf] = -((char)((ulong)local_3a8 >> 0x38) == local_438[4]);
    auVar118 = auVar118 & auVar291;
    if ((ushort)((ushort)(SUB161(auVar118 >> 7,0) & 1) |
                 (ushort)(SUB161(auVar118 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar118 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar118 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar118 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar118 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar118 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar118 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar118 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar118 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar118 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar118 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar118 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar118 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar118 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar118[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011d231;
  }
  else {
LAB_0011d231:
    main_cold_644();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%020.5u",0xfffffc00);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_645();
  }
  if (iVar3 == 0x14) {
    auVar119[0] = -(local_3d8 == local_448[0]);
    auVar119[1] = -(cStack_3d7 == local_448[1]);
    auVar119[2] = -(cStack_3d6 == local_448[2]);
    auVar119[3] = -(cStack_3d5 == local_448[3]);
    auVar119[4] = -(cStack_3d4 == local_448[4]);
    auVar119[5] = -(cStack_3d3 == local_448[5]);
    auVar119[6] = -(cStack_3d2 == local_448[6]);
    auVar119[7] = -(cStack_3d1 == local_448[7]);
    auVar119[8] = -((char)local_268 == local_448[8]);
    auVar119[9] = -((char)((ulong)local_268 >> 8) == local_448[9]);
    auVar119[10] = -((char)((ulong)local_268 >> 0x10) == local_448[10]);
    auVar119[0xb] = -((char)((ulong)local_268 >> 0x18) == local_448[0xb]);
    auVar119[0xc] = -((char)((ulong)local_268 >> 0x20) == local_448[0xc]);
    auVar119[0xd] = -((char)((ulong)local_268 >> 0x28) == local_448[0xd]);
    auVar119[0xe] = -((char)((ulong)local_268 >> 0x30) == local_448[0xe]);
    auVar119[0xf] = -((char)((ulong)local_268 >> 0x38) == local_448[0xf]);
    auVar292[0] = -((char)local_258 == local_448[5]);
    auVar292[1] = -(local_258._1_1_ == local_448[6]);
    auVar292[2] = -(local_258._2_1_ == local_448[7]);
    auVar292[3] = -(local_258._3_1_ == local_448[8]);
    auVar292[4] = -(local_258._4_1_ == local_448[9]);
    auVar292[5] = -(local_258._5_1_ == local_448[10]);
    auVar292[6] = -(local_258._6_1_ == local_448[0xb]);
    auVar292[7] = -(local_258._7_1_ == local_448[0xc]);
    auVar292[8] = -((char)local_2ec._4_8_ == local_448[0xd]);
    auVar292[9] = -(SUB81(local_2ec._4_8_,1) == local_448[0xe]);
    auVar292[10] = -(SUB81(local_2ec._4_8_,2) == local_448[0xf]);
    auVar292[0xb] = -(SUB81(local_2ec._4_8_,3) == local_438[0]);
    auVar292[0xc] = -(SUB81(local_2ec._4_8_,4) == local_438[1]);
    auVar292[0xd] = -(SUB81(local_2ec._4_8_,5) == local_438[2]);
    auVar292[0xe] = -(SUB81(local_2ec._4_8_,6) == local_438[3]);
    auVar292[0xf] = -(SUB81(local_2ec._4_8_,7) == local_438[4]);
    auVar119 = auVar119 & auVar292;
    if ((ushort)((ushort)(SUB161(auVar119 >> 7,0) & 1) |
                 (ushort)(SUB161(auVar119 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar119 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar119 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar119 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar119 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar119 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar119 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar119 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar119 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar119 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar119 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar119 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar119 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar119 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar119[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011d242;
  }
  else {
LAB_0011d242:
    main_cold_646();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%020.5o",0x1ff);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_647();
  }
  if (iVar3 == 0x14) {
    auVar120[0] = -(local_3d8 == local_448[0]);
    auVar120[1] = -(cStack_3d7 == local_448[1]);
    auVar120[2] = -(cStack_3d6 == local_448[2]);
    auVar120[3] = -(cStack_3d5 == local_448[3]);
    auVar120[4] = -(cStack_3d4 == local_448[4]);
    auVar120[5] = -(cStack_3d3 == local_448[5]);
    auVar120[6] = -(cStack_3d2 == local_448[6]);
    auVar120[7] = -(cStack_3d1 == local_448[7]);
    auVar120[8] = -((char)local_3b8 == local_448[8]);
    auVar120[9] = -((char)((ulong)local_3b8 >> 8) == local_448[9]);
    auVar120[10] = -((char)((ulong)local_3b8 >> 0x10) == local_448[10]);
    auVar120[0xb] = -((char)((ulong)local_3b8 >> 0x18) == local_448[0xb]);
    auVar120[0xc] = -((char)((ulong)local_3b8 >> 0x20) == local_448[0xc]);
    auVar120[0xd] = -((char)((ulong)local_3b8 >> 0x28) == local_448[0xd]);
    auVar120[0xe] = -((char)((ulong)local_3b8 >> 0x30) == local_448[0xe]);
    auVar120[0xf] = -((char)((ulong)local_3b8 >> 0x38) == local_448[0xf]);
    auVar293[0] = -(local_3d8 == local_448[5]);
    auVar293[1] = -(cStack_3d7 == local_448[6]);
    auVar293[2] = -(cStack_3d6 == local_448[7]);
    auVar293[3] = -(cStack_3d5 == local_448[8]);
    auVar293[4] = -(cStack_3d4 == local_448[9]);
    auVar293[5] = -(cStack_3d3 == local_448[10]);
    auVar293[6] = -(cStack_3d2 == local_448[0xb]);
    auVar293[7] = -(cStack_3d1 == local_448[0xc]);
    auVar293[8] = -((char)local_2b8 == local_448[0xd]);
    auVar293[9] = -((char)((ulong)local_2b8 >> 8) == local_448[0xe]);
    auVar293[10] = -((char)((ulong)local_2b8 >> 0x10) == local_448[0xf]);
    auVar293[0xb] = -((char)((ulong)local_2b8 >> 0x18) == local_438[0]);
    auVar293[0xc] = -((char)((ulong)local_2b8 >> 0x20) == local_438[1]);
    auVar293[0xd] = -((char)((ulong)local_2b8 >> 0x28) == local_438[2]);
    auVar293[0xe] = -((char)((ulong)local_2b8 >> 0x30) == local_438[3]);
    auVar293[0xf] = -((char)((ulong)local_2b8 >> 0x38) == local_438[4]);
    auVar120 = auVar120 & auVar293;
    if ((ushort)((ushort)(SUB161(auVar120 >> 7,0) & 1) |
                 (ushort)(SUB161(auVar120 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar120 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar120 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar120 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar120 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar120 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar120 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar120 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar120 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar120 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar120 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar120 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar120 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar120 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar120[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011d253;
  }
  else {
LAB_0011d253:
    main_cold_648();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%020.5o",0xfffffe01);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_649();
  }
  if (iVar3 == 0x14) {
    auVar121[0] = -(local_3d8 == local_448[0]);
    auVar121[1] = -(cStack_3d7 == local_448[1]);
    auVar121[2] = -(cStack_3d6 == local_448[2]);
    auVar121[3] = -(cStack_3d5 == local_448[3]);
    auVar121[4] = -(cStack_3d4 == local_448[4]);
    auVar121[5] = -(cStack_3d3 == local_448[5]);
    auVar121[6] = -(cStack_3d2 == local_448[6]);
    auVar121[7] = -(cStack_3d1 == local_448[7]);
    auVar121[8] = -((char)local_248 == local_448[8]);
    auVar121[9] = -((char)((ulong)local_248 >> 8) == local_448[9]);
    auVar121[10] = -((char)((ulong)local_248 >> 0x10) == local_448[10]);
    auVar121[0xb] = -((char)((ulong)local_248 >> 0x18) == local_448[0xb]);
    auVar121[0xc] = -((char)((ulong)local_248 >> 0x20) == local_448[0xc]);
    auVar121[0xd] = -((char)((ulong)local_248 >> 0x28) == local_448[0xd]);
    auVar121[0xe] = -((char)((ulong)local_248 >> 0x30) == local_448[0xe]);
    auVar121[0xf] = -((char)((ulong)local_248 >> 0x38) == local_448[0xf]);
    auVar294[0] = -((char)local_238 == local_448[5]);
    auVar294[1] = -(local_238._1_1_ == local_448[6]);
    auVar294[2] = -(local_238._2_1_ == local_448[7]);
    auVar294[3] = -(local_238._3_1_ == local_448[8]);
    auVar294[4] = -(local_238._4_1_ == local_448[9]);
    auVar294[5] = -(local_238._5_1_ == local_448[10]);
    auVar294[6] = -(local_238._6_1_ == local_448[0xb]);
    auVar294[7] = -(local_238._7_1_ == local_448[0xc]);
    auVar294[8] = -((char)local_348 == local_448[0xd]);
    auVar294[9] = -((char)((ulong)local_348 >> 8) == local_448[0xe]);
    auVar294[10] = -((char)((ulong)local_348 >> 0x10) == local_448[0xf]);
    auVar294[0xb] = -((char)((ulong)local_348 >> 0x18) == local_438[0]);
    auVar294[0xc] = -((char)((ulong)local_348 >> 0x20) == local_438[1]);
    auVar294[0xd] = -((char)((ulong)local_348 >> 0x28) == local_438[2]);
    auVar294[0xe] = -((char)((ulong)local_348 >> 0x30) == local_438[3]);
    auVar294[0xf] = -((char)((ulong)local_348 >> 0x38) == local_438[4]);
    auVar121 = auVar121 & auVar294;
    if ((ushort)((ushort)(SUB161(auVar121 >> 7,0) & 1) |
                 (ushort)(SUB161(auVar121 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar121 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar121 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar121 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar121 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar121 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar121 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar121 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar121 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar121 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar121 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar121 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar121 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar121 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar121[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011d264;
  }
  else {
LAB_0011d264:
    main_cold_650();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%020.5x",0x1234abcd);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_651();
  }
  if (iVar3 == 0x14) {
    auVar122[0] = -(local_3d8 == local_448[0]);
    auVar122[1] = -(cStack_3d7 == local_448[1]);
    auVar122[2] = -(cStack_3d6 == local_448[2]);
    auVar122[3] = -(cStack_3d5 == local_448[3]);
    auVar122[4] = -(cStack_3d4 == local_448[4]);
    auVar122[5] = -(cStack_3d3 == local_448[5]);
    auVar122[6] = -(cStack_3d2 == local_448[6]);
    auVar122[7] = -(cStack_3d1 == local_448[7]);
    auVar122[8] = -((char)local_388 == local_448[8]);
    auVar122[9] = -((char)((ulong)local_388 >> 8) == local_448[9]);
    auVar122[10] = -((char)((ulong)local_388 >> 0x10) == local_448[10]);
    auVar122[0xb] = -((char)((ulong)local_388 >> 0x18) == local_448[0xb]);
    auVar122[0xc] = -((char)((ulong)local_388 >> 0x20) == local_448[0xc]);
    auVar122[0xd] = -((char)((ulong)local_388 >> 0x28) == local_448[0xd]);
    auVar122[0xe] = -((char)((ulong)local_388 >> 0x30) == local_448[0xe]);
    auVar122[0xf] = -((char)((ulong)local_388 >> 0x38) == local_448[0xf]);
    auVar295[0] = -((char)local_398 == local_448[5]);
    auVar295[1] = -(local_398._1_1_ == local_448[6]);
    auVar295[2] = -(local_398._2_1_ == local_448[7]);
    auVar295[3] = -(local_398._3_1_ == local_448[8]);
    auVar295[4] = -(local_398._4_1_ == local_448[9]);
    auVar295[5] = -(local_398._5_1_ == local_448[10]);
    auVar295[6] = -(local_398._6_1_ == local_448[0xb]);
    auVar295[7] = -(local_398._7_1_ == local_448[0xc]);
    auVar295[8] = -((char)local_328 == local_448[0xd]);
    auVar295[9] = -((char)((ulong)local_328 >> 8) == local_448[0xe]);
    auVar295[10] = -((char)((ulong)local_328 >> 0x10) == local_448[0xf]);
    auVar295[0xb] = -((char)((ulong)local_328 >> 0x18) == local_438[0]);
    auVar295[0xc] = -((char)((ulong)local_328 >> 0x20) == local_438[1]);
    auVar295[0xd] = -((char)((ulong)local_328 >> 0x28) == local_438[2]);
    auVar295[0xe] = -((char)((ulong)local_328 >> 0x30) == local_438[3]);
    auVar295[0xf] = -((char)((ulong)local_328 >> 0x38) == local_438[4]);
    auVar122 = auVar122 & auVar295;
    if ((ushort)((ushort)(SUB161(auVar122 >> 7,0) & 1) |
                 (ushort)(SUB161(auVar122 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar122 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar122 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar122 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar122 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar122 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar122 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar122 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar122 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar122 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar122 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar122 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar122 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar122 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar122[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011d275;
  }
  else {
LAB_0011d275:
    main_cold_652();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%020.10x",0xedcb5433);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_653();
  }
  if (iVar3 == 0x14) {
    auVar123[0] = -(local_3d8 == local_448[0]);
    auVar123[1] = -(cStack_3d7 == local_448[1]);
    auVar123[2] = -(cStack_3d6 == local_448[2]);
    auVar123[3] = -(cStack_3d5 == local_448[3]);
    auVar123[4] = -(cStack_3d4 == local_448[4]);
    auVar123[5] = -(cStack_3d3 == local_448[5]);
    auVar123[6] = -(cStack_3d2 == local_448[6]);
    auVar123[7] = -(cStack_3d1 == local_448[7]);
    auVar123[8] = -((char)local_2d8 == local_448[8]);
    auVar123[9] = -((char)((ulong)local_2d8 >> 8) == local_448[9]);
    auVar123[10] = -((char)((ulong)local_2d8 >> 0x10) == local_448[10]);
    auVar123[0xb] = -((char)((ulong)local_2d8 >> 0x18) == local_448[0xb]);
    auVar123[0xc] = -((char)((ulong)local_2d8 >> 0x20) == local_448[0xc]);
    auVar123[0xd] = -((char)((ulong)local_2d8 >> 0x28) == local_448[0xd]);
    auVar123[0xe] = -((char)((ulong)local_2d8 >> 0x30) == local_448[0xe]);
    auVar123[0xf] = -((char)((ulong)local_2d8 >> 0x38) == local_448[0xf]);
    auVar296[0] = -((char)local_2a8 == local_448[5]);
    auVar296[1] = -(local_2a8._1_1_ == local_448[6]);
    auVar296[2] = -(local_2a8._2_1_ == local_448[7]);
    auVar296[3] = -(local_2a8._3_1_ == local_448[8]);
    auVar296[4] = -(local_2a8._4_1_ == local_448[9]);
    auVar296[5] = -(local_2a8._5_1_ == local_448[10]);
    auVar296[6] = -(local_2a8._6_1_ == local_448[0xb]);
    auVar296[7] = -(local_2a8._7_1_ == local_448[0xc]);
    auVar296[8] = -((char)local_338 == local_448[0xd]);
    auVar296[9] = -((char)((ulong)local_338 >> 8) == local_448[0xe]);
    auVar296[10] = -((char)((ulong)local_338 >> 0x10) == local_448[0xf]);
    auVar296[0xb] = -((char)((ulong)local_338 >> 0x18) == local_438[0]);
    auVar296[0xc] = -((char)((ulong)local_338 >> 0x20) == local_438[1]);
    auVar296[0xd] = -((char)((ulong)local_338 >> 0x28) == local_438[2]);
    auVar296[0xe] = -((char)((ulong)local_338 >> 0x30) == local_438[3]);
    auVar296[0xf] = -((char)((ulong)local_338 >> 0x38) == local_438[4]);
    auVar123 = auVar123 & auVar296;
    if ((ushort)((ushort)(SUB161(auVar123 >> 7,0) & 1) |
                 (ushort)(SUB161(auVar123 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar123 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar123 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar123 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar123 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar123 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar123 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar123 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar123 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar123 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar123 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar123 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar123 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar123 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar123[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011d286;
  }
  else {
LAB_0011d286:
    main_cold_654();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%020.5X",0x1234abcd);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_655();
  }
  if (iVar3 == 0x14) {
    auVar124[0] = -(local_3d8 == local_448[0]);
    auVar124[1] = -(cStack_3d7 == local_448[1]);
    auVar124[2] = -(cStack_3d6 == local_448[2]);
    auVar124[3] = -(cStack_3d5 == local_448[3]);
    auVar124[4] = -(cStack_3d4 == local_448[4]);
    auVar124[5] = -(cStack_3d3 == local_448[5]);
    auVar124[6] = -(cStack_3d2 == local_448[6]);
    auVar124[7] = -(cStack_3d1 == local_448[7]);
    auVar124[8] = -((char)local_388 == local_448[8]);
    auVar124[9] = -((char)((ulong)local_388 >> 8) == local_448[9]);
    auVar124[10] = -((char)((ulong)local_388 >> 0x10) == local_448[10]);
    auVar124[0xb] = -((char)((ulong)local_388 >> 0x18) == local_448[0xb]);
    auVar124[0xc] = -((char)((ulong)local_388 >> 0x20) == local_448[0xc]);
    auVar124[0xd] = -((char)((ulong)local_388 >> 0x28) == local_448[0xd]);
    auVar124[0xe] = -((char)((ulong)local_388 >> 0x30) == local_448[0xe]);
    auVar124[0xf] = -((char)((ulong)local_388 >> 0x38) == local_448[0xf]);
    auVar297[0] = -((char)local_398 == local_448[5]);
    auVar297[1] = -(local_398._1_1_ == local_448[6]);
    auVar297[2] = -(local_398._2_1_ == local_448[7]);
    auVar297[3] = -(local_398._3_1_ == local_448[8]);
    auVar297[4] = -(local_398._4_1_ == local_448[9]);
    auVar297[5] = -(local_398._5_1_ == local_448[10]);
    auVar297[6] = -(local_398._6_1_ == local_448[0xb]);
    auVar297[7] = -(local_398._7_1_ == local_448[0xc]);
    auVar297[8] = -((char)local_308 == local_448[0xd]);
    auVar297[9] = -((char)((ulong)local_308 >> 8) == local_448[0xe]);
    auVar297[10] = -((char)((ulong)local_308 >> 0x10) == local_448[0xf]);
    auVar297[0xb] = -((char)((ulong)local_308 >> 0x18) == local_438[0]);
    auVar297[0xc] = -((char)((ulong)local_308 >> 0x20) == local_438[1]);
    auVar297[0xd] = -((char)((ulong)local_308 >> 0x28) == local_438[2]);
    auVar297[0xe] = -((char)((ulong)local_308 >> 0x30) == local_438[3]);
    auVar297[0xf] = -((char)((ulong)local_308 >> 0x38) == local_438[4]);
    auVar124 = auVar124 & auVar297;
    if ((ushort)((ushort)(SUB161(auVar124 >> 7,0) & 1) |
                 (ushort)(SUB161(auVar124 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar124 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar124 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar124 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar124 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar124 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar124 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar124 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar124 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar124 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar124 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar124 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar124 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar124 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar124[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011d297;
  }
  else {
LAB_0011d297:
    main_cold_656();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%020.10X",0xedcb5433);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_657();
  }
  if (iVar3 == 0x14) {
    auVar125[0] = -(local_3d8 == local_448[0]);
    auVar125[1] = -(cStack_3d7 == local_448[1]);
    auVar125[2] = -(cStack_3d6 == local_448[2]);
    auVar125[3] = -(cStack_3d5 == local_448[3]);
    auVar125[4] = -(cStack_3d4 == local_448[4]);
    auVar125[5] = -(cStack_3d3 == local_448[5]);
    auVar125[6] = -(cStack_3d2 == local_448[6]);
    auVar125[7] = -(cStack_3d1 == local_448[7]);
    auVar125[8] = -((char)local_278 == local_448[8]);
    auVar125[9] = -((char)((ulong)local_278 >> 8) == local_448[9]);
    auVar125[10] = -((char)((ulong)local_278 >> 0x10) == local_448[10]);
    auVar125[0xb] = -((char)((ulong)local_278 >> 0x18) == local_448[0xb]);
    auVar125[0xc] = -((char)((ulong)local_278 >> 0x20) == local_448[0xc]);
    auVar125[0xd] = -((char)((ulong)local_278 >> 0x28) == local_448[0xd]);
    auVar125[0xe] = -((char)((ulong)local_278 >> 0x30) == local_448[0xe]);
    auVar125[0xf] = -((char)((ulong)local_278 >> 0x38) == local_448[0xf]);
    auVar298[0] = -((char)local_2c8 == local_448[5]);
    auVar298[1] = -(local_2c8._1_1_ == local_448[6]);
    auVar298[2] = -(local_2c8._2_1_ == local_448[7]);
    auVar298[3] = -(local_2c8._3_1_ == local_448[8]);
    auVar298[4] = -(local_2c8._4_1_ == local_448[9]);
    auVar298[5] = -(local_2c8._5_1_ == local_448[10]);
    auVar298[6] = -(local_2c8._6_1_ == local_448[0xb]);
    auVar298[7] = -(local_2c8._7_1_ == local_448[0xc]);
    auVar298[8] = -((char)local_318 == local_448[0xd]);
    auVar298[9] = -((char)((ulong)local_318 >> 8) == local_448[0xe]);
    auVar298[10] = -((char)((ulong)local_318 >> 0x10) == local_448[0xf]);
    auVar298[0xb] = -((char)((ulong)local_318 >> 0x18) == local_438[0]);
    auVar298[0xc] = -((char)((ulong)local_318 >> 0x20) == local_438[1]);
    auVar298[0xd] = -((char)((ulong)local_318 >> 0x28) == local_438[2]);
    auVar298[0xe] = -((char)((ulong)local_318 >> 0x30) == local_438[3]);
    auVar298[0xf] = -((char)((ulong)local_318 >> 0x38) == local_438[4]);
    auVar125 = auVar125 & auVar298;
    if ((ushort)((ushort)(SUB161(auVar125 >> 7,0) & 1) |
                 (ushort)(SUB161(auVar125 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar125 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar125 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar125 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar125 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar125 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar125 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar125 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar125 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar125 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar125 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar125 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar125 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar125 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar125[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011d2a8;
  }
  else {
LAB_0011d2a8:
    main_cold_658();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%.0s","Hallo heimur");
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_659();
  }
  if ((iVar3 != 0) || (local_448[0] != '\0')) {
    main_cold_660();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%20.0s","Hallo heimur");
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_661();
  }
  if (iVar3 == 0x14) {
    auVar126[0] = -(local_3d8 == local_448[0]);
    auVar126[1] = -(cStack_3d7 == local_448[1]);
    auVar126[2] = -(cStack_3d6 == local_448[2]);
    auVar126[3] = -(cStack_3d5 == local_448[3]);
    auVar126[4] = -(cStack_3d4 == local_448[4]);
    auVar126[5] = -(cStack_3d3 == local_448[5]);
    auVar126[6] = -(cStack_3d2 == local_448[6]);
    auVar126[7] = -(cStack_3d1 == local_448[7]);
    auVar126[8] = -(local_3d8 == local_448[8]);
    auVar126[9] = -(cStack_3d7 == local_448[9]);
    auVar126[10] = -(cStack_3d6 == local_448[10]);
    auVar126[0xb] = -(cStack_3d5 == local_448[0xb]);
    auVar126[0xc] = -(cStack_3d4 == local_448[0xc]);
    auVar126[0xd] = -(cStack_3d3 == local_448[0xd]);
    auVar126[0xe] = -(cStack_3d2 == local_448[0xe]);
    auVar126[0xf] = -(cStack_3d1 == local_448[0xf]);
    auVar299[0] = -(local_3d8 == local_448[5]);
    auVar299[1] = -(cStack_3d7 == local_448[6]);
    auVar299[2] = -(cStack_3d6 == local_448[7]);
    auVar299[3] = -(cStack_3d5 == local_448[8]);
    auVar299[4] = -(cStack_3d4 == local_448[9]);
    auVar299[5] = -(cStack_3d3 == local_448[10]);
    auVar299[6] = -(cStack_3d2 == local_448[0xb]);
    auVar299[7] = -(cStack_3d1 == local_448[0xc]);
    auVar299[8] = -((char)local_3c8 == local_448[0xd]);
    auVar299[9] = -((char)((ulong)local_3c8 >> 8) == local_448[0xe]);
    auVar299[10] = -((char)((ulong)local_3c8 >> 0x10) == local_448[0xf]);
    auVar299[0xb] = -((char)((ulong)local_3c8 >> 0x18) == local_438[0]);
    auVar299[0xc] = -((char)((ulong)local_3c8 >> 0x20) == local_438[1]);
    auVar299[0xd] = -((char)((ulong)local_3c8 >> 0x28) == local_438[2]);
    auVar299[0xe] = -((char)((ulong)local_3c8 >> 0x30) == local_438[3]);
    auVar299[0xf] = -((char)((ulong)local_3c8 >> 0x38) == local_438[4]);
    auVar126 = auVar126 & auVar299;
    if ((ushort)((ushort)(SUB161(auVar126 >> 7,0) & 1) |
                 (ushort)(SUB161(auVar126 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar126 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar126 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar126 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar126 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar126 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar126 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar126 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar126 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar126 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar126 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar126 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar126 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar126 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar126[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011d2b9;
  }
  else {
LAB_0011d2b9:
    main_cold_662();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%.s","Hallo heimur");
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_663();
  }
  if ((iVar3 != 0) || (local_448[0] != '\0')) {
    main_cold_664();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%20.s","Hallo heimur");
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_665();
  }
  if (iVar3 == 0x14) {
    auVar127[0] = -(local_3d8 == local_448[0]);
    auVar127[1] = -(cStack_3d7 == local_448[1]);
    auVar127[2] = -(cStack_3d6 == local_448[2]);
    auVar127[3] = -(cStack_3d5 == local_448[3]);
    auVar127[4] = -(cStack_3d4 == local_448[4]);
    auVar127[5] = -(cStack_3d3 == local_448[5]);
    auVar127[6] = -(cStack_3d2 == local_448[6]);
    auVar127[7] = -(cStack_3d1 == local_448[7]);
    auVar127[8] = -(local_3d8 == local_448[8]);
    auVar127[9] = -(cStack_3d7 == local_448[9]);
    auVar127[10] = -(cStack_3d6 == local_448[10]);
    auVar127[0xb] = -(cStack_3d5 == local_448[0xb]);
    auVar127[0xc] = -(cStack_3d4 == local_448[0xc]);
    auVar127[0xd] = -(cStack_3d3 == local_448[0xd]);
    auVar127[0xe] = -(cStack_3d2 == local_448[0xe]);
    auVar127[0xf] = -(cStack_3d1 == local_448[0xf]);
    auVar300[0] = -(local_3d8 == local_448[5]);
    auVar300[1] = -(cStack_3d7 == local_448[6]);
    auVar300[2] = -(cStack_3d6 == local_448[7]);
    auVar300[3] = -(cStack_3d5 == local_448[8]);
    auVar300[4] = -(cStack_3d4 == local_448[9]);
    auVar300[5] = -(cStack_3d3 == local_448[10]);
    auVar300[6] = -(cStack_3d2 == local_448[0xb]);
    auVar300[7] = -(cStack_3d1 == local_448[0xc]);
    auVar300[8] = -((char)local_3c8 == local_448[0xd]);
    auVar300[9] = -((char)((ulong)local_3c8 >> 8) == local_448[0xe]);
    auVar300[10] = -((char)((ulong)local_3c8 >> 0x10) == local_448[0xf]);
    auVar300[0xb] = -((char)((ulong)local_3c8 >> 0x18) == local_438[0]);
    auVar300[0xc] = -((char)((ulong)local_3c8 >> 0x20) == local_438[1]);
    auVar300[0xd] = -((char)((ulong)local_3c8 >> 0x28) == local_438[2]);
    auVar300[0xe] = -((char)((ulong)local_3c8 >> 0x30) == local_438[3]);
    auVar300[0xf] = -((char)((ulong)local_3c8 >> 0x38) == local_438[4]);
    auVar127 = auVar127 & auVar300;
    if ((ushort)((ushort)(SUB161(auVar127 >> 7,0) & 1) |
                 (ushort)(SUB161(auVar127 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar127 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar127 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar127 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar127 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar127 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar127 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar127 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar127 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar127 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar127 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar127 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar127 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar127 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar127[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011d2ca;
  }
  else {
LAB_0011d2ca:
    main_cold_666();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%20.0d",0x400);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_667();
  }
  if (iVar3 == 0x14) {
    auVar128[0] = -(local_3d8 == local_448[0]);
    auVar128[1] = -(cStack_3d7 == local_448[1]);
    auVar128[2] = -(cStack_3d6 == local_448[2]);
    auVar128[3] = -(cStack_3d5 == local_448[3]);
    auVar128[4] = -(cStack_3d4 == local_448[4]);
    auVar128[5] = -(cStack_3d3 == local_448[5]);
    auVar128[6] = -(cStack_3d2 == local_448[6]);
    auVar128[7] = -(cStack_3d1 == local_448[7]);
    auVar128[8] = -(local_3d8 == local_448[8]);
    auVar128[9] = -(cStack_3d7 == local_448[9]);
    auVar128[10] = -(cStack_3d6 == local_448[10]);
    auVar128[0xb] = -(cStack_3d5 == local_448[0xb]);
    auVar128[0xc] = -(cStack_3d4 == local_448[0xc]);
    auVar128[0xd] = -(cStack_3d3 == local_448[0xd]);
    auVar128[0xe] = -(cStack_3d2 == local_448[0xe]);
    auVar128[0xf] = -(cStack_3d1 == local_448[0xf]);
    auVar301[0] = -(local_3d8 == local_448[5]);
    auVar301[1] = -(cStack_3d7 == local_448[6]);
    auVar301[2] = -(cStack_3d6 == local_448[7]);
    auVar301[3] = -(cStack_3d5 == local_448[8]);
    auVar301[4] = -(cStack_3d4 == local_448[9]);
    auVar301[5] = -(cStack_3d3 == local_448[10]);
    auVar301[6] = -(cStack_3d2 == local_448[0xb]);
    auVar301[7] = -(cStack_3d1 == local_448[0xc]);
    auVar301[8] = -((char)local_358 == local_448[0xd]);
    auVar301[9] = -((char)((ulong)local_358 >> 8) == local_448[0xe]);
    auVar301[10] = -((char)((ulong)local_358 >> 0x10) == local_448[0xf]);
    auVar301[0xb] = -((char)((ulong)local_358 >> 0x18) == local_438[0]);
    auVar301[0xc] = -((char)((ulong)local_358 >> 0x20) == local_438[1]);
    auVar301[0xd] = -((char)((ulong)local_358 >> 0x28) == local_438[2]);
    auVar301[0xe] = -((char)((ulong)local_358 >> 0x30) == local_438[3]);
    auVar301[0xf] = -((char)((ulong)local_358 >> 0x38) == local_438[4]);
    auVar128 = auVar128 & auVar301;
    if ((ushort)((ushort)(SUB161(auVar128 >> 7,0) & 1) |
                 (ushort)(SUB161(auVar128 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar128 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar128 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar128 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar128 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar128 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar128 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar128 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar128 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar128 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar128 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar128 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar128 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar128 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar128[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011d2db;
  }
  else {
LAB_0011d2db:
    main_cold_668();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%20.d",0xfffffc00);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_669();
  }
  if (iVar3 == 0x14) {
    auVar129[0] = -(local_3d8 == local_448[0]);
    auVar129[1] = -(cStack_3d7 == local_448[1]);
    auVar129[2] = -(cStack_3d6 == local_448[2]);
    auVar129[3] = -(cStack_3d5 == local_448[3]);
    auVar129[4] = -(cStack_3d4 == local_448[4]);
    auVar129[5] = -(cStack_3d3 == local_448[5]);
    auVar129[6] = -(cStack_3d2 == local_448[6]);
    auVar129[7] = -(cStack_3d1 == local_448[7]);
    auVar129[8] = -((char)local_298 == local_448[8]);
    auVar129[9] = -((char)((ulong)local_298 >> 8) == local_448[9]);
    auVar129[10] = -((char)((ulong)local_298 >> 0x10) == local_448[10]);
    auVar129[0xb] = -((char)((ulong)local_298 >> 0x18) == local_448[0xb]);
    auVar129[0xc] = -((char)((ulong)local_298 >> 0x20) == local_448[0xc]);
    auVar129[0xd] = -((char)((ulong)local_298 >> 0x28) == local_448[0xd]);
    auVar129[0xe] = -((char)((ulong)local_298 >> 0x30) == local_448[0xe]);
    auVar129[0xf] = -((char)((ulong)local_298 >> 0x38) == local_448[0xf]);
    auVar302[0] = -(local_3d8 == local_448[5]);
    auVar302[1] = -(cStack_3d7 == local_448[6]);
    auVar302[2] = -(cStack_3d6 == local_448[7]);
    auVar302[3] = -(cStack_3d5 == local_448[8]);
    auVar302[4] = -(cStack_3d4 == local_448[9]);
    auVar302[5] = -(cStack_3d3 == local_448[10]);
    auVar302[6] = -(cStack_3d2 == local_448[0xb]);
    auVar302[7] = -(cStack_3d1 == local_448[0xc]);
    auVar302[8] = -((char)local_288 == local_448[0xd]);
    auVar302[9] = -((char)((ulong)local_288 >> 8) == local_448[0xe]);
    auVar302[10] = -((char)((ulong)local_288 >> 0x10) == local_448[0xf]);
    auVar302[0xb] = -((char)((ulong)local_288 >> 0x18) == local_438[0]);
    auVar302[0xc] = -((char)((ulong)local_288 >> 0x20) == local_438[1]);
    auVar302[0xd] = -((char)((ulong)local_288 >> 0x28) == local_438[2]);
    auVar302[0xe] = -((char)((ulong)local_288 >> 0x30) == local_438[3]);
    auVar302[0xf] = -((char)((ulong)local_288 >> 0x38) == local_438[4]);
    auVar129 = auVar129 & auVar302;
    if ((ushort)((ushort)(SUB161(auVar129 >> 7,0) & 1) |
                 (ushort)(SUB161(auVar129 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar129 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar129 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar129 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar129 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar129 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar129 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar129 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar129 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar129 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar129 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar129 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar129 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar129 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar129[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011d2ec;
  }
  else {
LAB_0011d2ec:
    main_cold_670();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%20.d",0);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_671();
  }
  if (iVar3 == 0x14) {
    auVar130[0] = -(local_3d8 == local_448[0]);
    auVar130[1] = -(cStack_3d7 == local_448[1]);
    auVar130[2] = -(cStack_3d6 == local_448[2]);
    auVar130[3] = -(cStack_3d5 == local_448[3]);
    auVar130[4] = -(cStack_3d4 == local_448[4]);
    auVar130[5] = -(cStack_3d3 == local_448[5]);
    auVar130[6] = -(cStack_3d2 == local_448[6]);
    auVar130[7] = -(cStack_3d1 == local_448[7]);
    auVar130[8] = -(local_3d8 == local_448[8]);
    auVar130[9] = -(cStack_3d7 == local_448[9]);
    auVar130[10] = -(cStack_3d6 == local_448[10]);
    auVar130[0xb] = -(cStack_3d5 == local_448[0xb]);
    auVar130[0xc] = -(cStack_3d4 == local_448[0xc]);
    auVar130[0xd] = -(cStack_3d3 == local_448[0xd]);
    auVar130[0xe] = -(cStack_3d2 == local_448[0xe]);
    auVar130[0xf] = -(cStack_3d1 == local_448[0xf]);
    auVar303[0] = -(local_3d8 == local_448[5]);
    auVar303[1] = -(cStack_3d7 == local_448[6]);
    auVar303[2] = -(cStack_3d6 == local_448[7]);
    auVar303[3] = -(cStack_3d5 == local_448[8]);
    auVar303[4] = -(cStack_3d4 == local_448[9]);
    auVar303[5] = -(cStack_3d3 == local_448[10]);
    auVar303[6] = -(cStack_3d2 == local_448[0xb]);
    auVar303[7] = -(cStack_3d1 == local_448[0xc]);
    auVar303[8] = -((char)local_3c8 == local_448[0xd]);
    auVar303[9] = -((char)((ulong)local_3c8 >> 8) == local_448[0xe]);
    auVar303[10] = -((char)((ulong)local_3c8 >> 0x10) == local_448[0xf]);
    auVar303[0xb] = -((char)((ulong)local_3c8 >> 0x18) == local_438[0]);
    auVar303[0xc] = -((char)((ulong)local_3c8 >> 0x20) == local_438[1]);
    auVar303[0xd] = -((char)((ulong)local_3c8 >> 0x28) == local_438[2]);
    auVar303[0xe] = -((char)((ulong)local_3c8 >> 0x30) == local_438[3]);
    auVar303[0xf] = -((char)((ulong)local_3c8 >> 0x38) == local_438[4]);
    auVar130 = auVar130 & auVar303;
    if ((ushort)((ushort)(SUB161(auVar130 >> 7,0) & 1) |
                 (ushort)(SUB161(auVar130 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar130 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar130 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar130 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar130 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar130 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar130 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar130 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar130 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar130 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar130 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar130 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar130 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar130 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar130[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011d2fd;
  }
  else {
LAB_0011d2fd:
    main_cold_672();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%20.0i",0x400);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_673();
  }
  if (iVar3 == 0x14) {
    auVar131[0] = -(local_3d8 == local_448[0]);
    auVar131[1] = -(cStack_3d7 == local_448[1]);
    auVar131[2] = -(cStack_3d6 == local_448[2]);
    auVar131[3] = -(cStack_3d5 == local_448[3]);
    auVar131[4] = -(cStack_3d4 == local_448[4]);
    auVar131[5] = -(cStack_3d3 == local_448[5]);
    auVar131[6] = -(cStack_3d2 == local_448[6]);
    auVar131[7] = -(cStack_3d1 == local_448[7]);
    auVar131[8] = -(local_3d8 == local_448[8]);
    auVar131[9] = -(cStack_3d7 == local_448[9]);
    auVar131[10] = -(cStack_3d6 == local_448[10]);
    auVar131[0xb] = -(cStack_3d5 == local_448[0xb]);
    auVar131[0xc] = -(cStack_3d4 == local_448[0xc]);
    auVar131[0xd] = -(cStack_3d3 == local_448[0xd]);
    auVar131[0xe] = -(cStack_3d2 == local_448[0xe]);
    auVar131[0xf] = -(cStack_3d1 == local_448[0xf]);
    auVar304[0] = -(local_3d8 == local_448[5]);
    auVar304[1] = -(cStack_3d7 == local_448[6]);
    auVar304[2] = -(cStack_3d6 == local_448[7]);
    auVar304[3] = -(cStack_3d5 == local_448[8]);
    auVar304[4] = -(cStack_3d4 == local_448[9]);
    auVar304[5] = -(cStack_3d3 == local_448[10]);
    auVar304[6] = -(cStack_3d2 == local_448[0xb]);
    auVar304[7] = -(cStack_3d1 == local_448[0xc]);
    auVar304[8] = -((char)local_358 == local_448[0xd]);
    auVar304[9] = -((char)((ulong)local_358 >> 8) == local_448[0xe]);
    auVar304[10] = -((char)((ulong)local_358 >> 0x10) == local_448[0xf]);
    auVar304[0xb] = -((char)((ulong)local_358 >> 0x18) == local_438[0]);
    auVar304[0xc] = -((char)((ulong)local_358 >> 0x20) == local_438[1]);
    auVar304[0xd] = -((char)((ulong)local_358 >> 0x28) == local_438[2]);
    auVar304[0xe] = -((char)((ulong)local_358 >> 0x30) == local_438[3]);
    auVar304[0xf] = -((char)((ulong)local_358 >> 0x38) == local_438[4]);
    auVar131 = auVar131 & auVar304;
    if ((ushort)((ushort)(SUB161(auVar131 >> 7,0) & 1) |
                 (ushort)(SUB161(auVar131 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar131 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar131 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar131 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar131 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar131 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar131 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar131 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar131 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar131 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar131 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar131 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar131 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar131 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar131[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011d30e;
  }
  else {
LAB_0011d30e:
    main_cold_674();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%20.i",0xfffffc00);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_675();
  }
  if (iVar3 == 0x14) {
    auVar132[0] = -(local_3d8 == local_448[0]);
    auVar132[1] = -(cStack_3d7 == local_448[1]);
    auVar132[2] = -(cStack_3d6 == local_448[2]);
    auVar132[3] = -(cStack_3d5 == local_448[3]);
    auVar132[4] = -(cStack_3d4 == local_448[4]);
    auVar132[5] = -(cStack_3d3 == local_448[5]);
    auVar132[6] = -(cStack_3d2 == local_448[6]);
    auVar132[7] = -(cStack_3d1 == local_448[7]);
    auVar132[8] = -((char)local_298 == local_448[8]);
    auVar132[9] = -((char)((ulong)local_298 >> 8) == local_448[9]);
    auVar132[10] = -((char)((ulong)local_298 >> 0x10) == local_448[10]);
    auVar132[0xb] = -((char)((ulong)local_298 >> 0x18) == local_448[0xb]);
    auVar132[0xc] = -((char)((ulong)local_298 >> 0x20) == local_448[0xc]);
    auVar132[0xd] = -((char)((ulong)local_298 >> 0x28) == local_448[0xd]);
    auVar132[0xe] = -((char)((ulong)local_298 >> 0x30) == local_448[0xe]);
    auVar132[0xf] = -((char)((ulong)local_298 >> 0x38) == local_448[0xf]);
    auVar305[0] = -(local_3d8 == local_448[5]);
    auVar305[1] = -(cStack_3d7 == local_448[6]);
    auVar305[2] = -(cStack_3d6 == local_448[7]);
    auVar305[3] = -(cStack_3d5 == local_448[8]);
    auVar305[4] = -(cStack_3d4 == local_448[9]);
    auVar305[5] = -(cStack_3d3 == local_448[10]);
    auVar305[6] = -(cStack_3d2 == local_448[0xb]);
    auVar305[7] = -(cStack_3d1 == local_448[0xc]);
    auVar305[8] = -((char)local_288 == local_448[0xd]);
    auVar305[9] = -((char)((ulong)local_288 >> 8) == local_448[0xe]);
    auVar305[10] = -((char)((ulong)local_288 >> 0x10) == local_448[0xf]);
    auVar305[0xb] = -((char)((ulong)local_288 >> 0x18) == local_438[0]);
    auVar305[0xc] = -((char)((ulong)local_288 >> 0x20) == local_438[1]);
    auVar305[0xd] = -((char)((ulong)local_288 >> 0x28) == local_438[2]);
    auVar305[0xe] = -((char)((ulong)local_288 >> 0x30) == local_438[3]);
    auVar305[0xf] = -((char)((ulong)local_288 >> 0x38) == local_438[4]);
    auVar132 = auVar132 & auVar305;
    if ((ushort)((ushort)(SUB161(auVar132 >> 7,0) & 1) |
                 (ushort)(SUB161(auVar132 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar132 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar132 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar132 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar132 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar132 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar132 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar132 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar132 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar132 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar132 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar132 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar132 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar132 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar132[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011d31f;
  }
  else {
LAB_0011d31f:
    main_cold_676();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%20.i",0);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_677();
  }
  if (iVar3 == 0x14) {
    auVar133[0] = -(local_3d8 == local_448[0]);
    auVar133[1] = -(cStack_3d7 == local_448[1]);
    auVar133[2] = -(cStack_3d6 == local_448[2]);
    auVar133[3] = -(cStack_3d5 == local_448[3]);
    auVar133[4] = -(cStack_3d4 == local_448[4]);
    auVar133[5] = -(cStack_3d3 == local_448[5]);
    auVar133[6] = -(cStack_3d2 == local_448[6]);
    auVar133[7] = -(cStack_3d1 == local_448[7]);
    auVar133[8] = -(local_3d8 == local_448[8]);
    auVar133[9] = -(cStack_3d7 == local_448[9]);
    auVar133[10] = -(cStack_3d6 == local_448[10]);
    auVar133[0xb] = -(cStack_3d5 == local_448[0xb]);
    auVar133[0xc] = -(cStack_3d4 == local_448[0xc]);
    auVar133[0xd] = -(cStack_3d3 == local_448[0xd]);
    auVar133[0xe] = -(cStack_3d2 == local_448[0xe]);
    auVar133[0xf] = -(cStack_3d1 == local_448[0xf]);
    auVar306[0] = -(local_3d8 == local_448[5]);
    auVar306[1] = -(cStack_3d7 == local_448[6]);
    auVar306[2] = -(cStack_3d6 == local_448[7]);
    auVar306[3] = -(cStack_3d5 == local_448[8]);
    auVar306[4] = -(cStack_3d4 == local_448[9]);
    auVar306[5] = -(cStack_3d3 == local_448[10]);
    auVar306[6] = -(cStack_3d2 == local_448[0xb]);
    auVar306[7] = -(cStack_3d1 == local_448[0xc]);
    auVar306[8] = -((char)local_3c8 == local_448[0xd]);
    auVar306[9] = -((char)((ulong)local_3c8 >> 8) == local_448[0xe]);
    auVar306[10] = -((char)((ulong)local_3c8 >> 0x10) == local_448[0xf]);
    auVar306[0xb] = -((char)((ulong)local_3c8 >> 0x18) == local_438[0]);
    auVar306[0xc] = -((char)((ulong)local_3c8 >> 0x20) == local_438[1]);
    auVar306[0xd] = -((char)((ulong)local_3c8 >> 0x28) == local_438[2]);
    auVar306[0xe] = -((char)((ulong)local_3c8 >> 0x30) == local_438[3]);
    auVar306[0xf] = -((char)((ulong)local_3c8 >> 0x38) == local_438[4]);
    auVar133 = auVar133 & auVar306;
    if ((ushort)((ushort)(SUB161(auVar133 >> 7,0) & 1) |
                 (ushort)(SUB161(auVar133 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar133 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar133 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar133 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar133 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar133 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar133 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar133 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar133 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar133 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar133 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar133 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar133 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar133 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar133[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011d330;
  }
  else {
LAB_0011d330:
    main_cold_678();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%20.u",0x400);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_679();
  }
  if (iVar3 == 0x14) {
    auVar134[0] = -(local_3d8 == local_448[0]);
    auVar134[1] = -(cStack_3d7 == local_448[1]);
    auVar134[2] = -(cStack_3d6 == local_448[2]);
    auVar134[3] = -(cStack_3d5 == local_448[3]);
    auVar134[4] = -(cStack_3d4 == local_448[4]);
    auVar134[5] = -(cStack_3d3 == local_448[5]);
    auVar134[6] = -(cStack_3d2 == local_448[6]);
    auVar134[7] = -(cStack_3d1 == local_448[7]);
    auVar134[8] = -(local_3d8 == local_448[8]);
    auVar134[9] = -(cStack_3d7 == local_448[9]);
    auVar134[10] = -(cStack_3d6 == local_448[10]);
    auVar134[0xb] = -(cStack_3d5 == local_448[0xb]);
    auVar134[0xc] = -(cStack_3d4 == local_448[0xc]);
    auVar134[0xd] = -(cStack_3d3 == local_448[0xd]);
    auVar134[0xe] = -(cStack_3d2 == local_448[0xe]);
    auVar134[0xf] = -(cStack_3d1 == local_448[0xf]);
    auVar307[0] = -(local_3d8 == local_448[5]);
    auVar307[1] = -(cStack_3d7 == local_448[6]);
    auVar307[2] = -(cStack_3d6 == local_448[7]);
    auVar307[3] = -(cStack_3d5 == local_448[8]);
    auVar307[4] = -(cStack_3d4 == local_448[9]);
    auVar307[5] = -(cStack_3d3 == local_448[10]);
    auVar307[6] = -(cStack_3d2 == local_448[0xb]);
    auVar307[7] = -(cStack_3d1 == local_448[0xc]);
    auVar307[8] = -((char)local_358 == local_448[0xd]);
    auVar307[9] = -((char)((ulong)local_358 >> 8) == local_448[0xe]);
    auVar307[10] = -((char)((ulong)local_358 >> 0x10) == local_448[0xf]);
    auVar307[0xb] = -((char)((ulong)local_358 >> 0x18) == local_438[0]);
    auVar307[0xc] = -((char)((ulong)local_358 >> 0x20) == local_438[1]);
    auVar307[0xd] = -((char)((ulong)local_358 >> 0x28) == local_438[2]);
    auVar307[0xe] = -((char)((ulong)local_358 >> 0x30) == local_438[3]);
    auVar307[0xf] = -((char)((ulong)local_358 >> 0x38) == local_438[4]);
    auVar134 = auVar134 & auVar307;
    if ((ushort)((ushort)(SUB161(auVar134 >> 7,0) & 1) |
                 (ushort)(SUB161(auVar134 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar134 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar134 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar134 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar134 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar134 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar134 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar134 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar134 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar134 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar134 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar134 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar134 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar134 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar134[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011d341;
  }
  else {
LAB_0011d341:
    main_cold_680();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%20.0u",0xfffffc00);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_681();
  }
  if (iVar3 == 0x14) {
    auVar135[0] = -(local_3d8 == local_448[0]);
    auVar135[1] = -(cStack_3d7 == local_448[1]);
    auVar135[2] = -(cStack_3d6 == local_448[2]);
    auVar135[3] = -(cStack_3d5 == local_448[3]);
    auVar135[4] = -(cStack_3d4 == local_448[4]);
    auVar135[5] = -(cStack_3d3 == local_448[5]);
    auVar135[6] = -(cStack_3d2 == local_448[6]);
    auVar135[7] = -(cStack_3d1 == local_448[7]);
    auVar135[8] = -((char)local_268 == local_448[8]);
    auVar135[9] = -((char)((ulong)local_268 >> 8) == local_448[9]);
    auVar135[10] = -((char)((ulong)local_268 >> 0x10) == local_448[10]);
    auVar135[0xb] = -((char)((ulong)local_268 >> 0x18) == local_448[0xb]);
    auVar135[0xc] = -((char)((ulong)local_268 >> 0x20) == local_448[0xc]);
    auVar135[0xd] = -((char)((ulong)local_268 >> 0x28) == local_448[0xd]);
    auVar135[0xe] = -((char)((ulong)local_268 >> 0x30) == local_448[0xe]);
    auVar135[0xf] = -((char)((ulong)local_268 >> 0x38) == local_448[0xf]);
    auVar308[0] = -((char)local_258 == local_448[5]);
    auVar308[1] = -(local_258._1_1_ == local_448[6]);
    auVar308[2] = -(local_258._2_1_ == local_448[7]);
    auVar308[3] = -(local_258._3_1_ == local_448[8]);
    auVar308[4] = -(local_258._4_1_ == local_448[9]);
    auVar308[5] = -(local_258._5_1_ == local_448[10]);
    auVar308[6] = -(local_258._6_1_ == local_448[0xb]);
    auVar308[7] = -(local_258._7_1_ == local_448[0xc]);
    auVar308[8] = -((char)local_2ec._4_8_ == local_448[0xd]);
    auVar308[9] = -(SUB81(local_2ec._4_8_,1) == local_448[0xe]);
    auVar308[10] = -(SUB81(local_2ec._4_8_,2) == local_448[0xf]);
    auVar308[0xb] = -(SUB81(local_2ec._4_8_,3) == local_438[0]);
    auVar308[0xc] = -(SUB81(local_2ec._4_8_,4) == local_438[1]);
    auVar308[0xd] = -(SUB81(local_2ec._4_8_,5) == local_438[2]);
    auVar308[0xe] = -(SUB81(local_2ec._4_8_,6) == local_438[3]);
    auVar308[0xf] = -(SUB81(local_2ec._4_8_,7) == local_438[4]);
    auVar135 = auVar135 & auVar308;
    if ((ushort)((ushort)(SUB161(auVar135 >> 7,0) & 1) |
                 (ushort)(SUB161(auVar135 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar135 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar135 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar135 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar135 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar135 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar135 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar135 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar135 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar135 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar135 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar135 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar135 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar135 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar135[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011d352;
  }
  else {
LAB_0011d352:
    main_cold_682();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%20.u",0);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_683();
  }
  if (iVar3 == 0x14) {
    auVar136[0] = -(local_3d8 == local_448[0]);
    auVar136[1] = -(cStack_3d7 == local_448[1]);
    auVar136[2] = -(cStack_3d6 == local_448[2]);
    auVar136[3] = -(cStack_3d5 == local_448[3]);
    auVar136[4] = -(cStack_3d4 == local_448[4]);
    auVar136[5] = -(cStack_3d3 == local_448[5]);
    auVar136[6] = -(cStack_3d2 == local_448[6]);
    auVar136[7] = -(cStack_3d1 == local_448[7]);
    auVar136[8] = -(local_3d8 == local_448[8]);
    auVar136[9] = -(cStack_3d7 == local_448[9]);
    auVar136[10] = -(cStack_3d6 == local_448[10]);
    auVar136[0xb] = -(cStack_3d5 == local_448[0xb]);
    auVar136[0xc] = -(cStack_3d4 == local_448[0xc]);
    auVar136[0xd] = -(cStack_3d3 == local_448[0xd]);
    auVar136[0xe] = -(cStack_3d2 == local_448[0xe]);
    auVar136[0xf] = -(cStack_3d1 == local_448[0xf]);
    auVar309[0] = -(local_3d8 == local_448[5]);
    auVar309[1] = -(cStack_3d7 == local_448[6]);
    auVar309[2] = -(cStack_3d6 == local_448[7]);
    auVar309[3] = -(cStack_3d5 == local_448[8]);
    auVar309[4] = -(cStack_3d4 == local_448[9]);
    auVar309[5] = -(cStack_3d3 == local_448[10]);
    auVar309[6] = -(cStack_3d2 == local_448[0xb]);
    auVar309[7] = -(cStack_3d1 == local_448[0xc]);
    auVar309[8] = -((char)local_3c8 == local_448[0xd]);
    auVar309[9] = -((char)((ulong)local_3c8 >> 8) == local_448[0xe]);
    auVar309[10] = -((char)((ulong)local_3c8 >> 0x10) == local_448[0xf]);
    auVar309[0xb] = -((char)((ulong)local_3c8 >> 0x18) == local_438[0]);
    auVar309[0xc] = -((char)((ulong)local_3c8 >> 0x20) == local_438[1]);
    auVar309[0xd] = -((char)((ulong)local_3c8 >> 0x28) == local_438[2]);
    auVar309[0xe] = -((char)((ulong)local_3c8 >> 0x30) == local_438[3]);
    auVar309[0xf] = -((char)((ulong)local_3c8 >> 0x38) == local_438[4]);
    auVar136 = auVar136 & auVar309;
    if ((ushort)((ushort)(SUB161(auVar136 >> 7,0) & 1) |
                 (ushort)(SUB161(auVar136 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar136 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar136 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar136 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar136 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar136 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar136 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar136 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar136 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar136 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar136 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar136 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar136 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar136 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar136[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011d363;
  }
  else {
LAB_0011d363:
    main_cold_684();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%20.o",0x1ff);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_685();
  }
  if (iVar3 == 0x14) {
    auVar137[0] = -(local_3d8 == local_448[0]);
    auVar137[1] = -(cStack_3d7 == local_448[1]);
    auVar137[2] = -(cStack_3d6 == local_448[2]);
    auVar137[3] = -(cStack_3d5 == local_448[3]);
    auVar137[4] = -(cStack_3d4 == local_448[4]);
    auVar137[5] = -(cStack_3d3 == local_448[5]);
    auVar137[6] = -(cStack_3d2 == local_448[6]);
    auVar137[7] = -(cStack_3d1 == local_448[7]);
    auVar137[8] = -(local_3d8 == local_448[8]);
    auVar137[9] = -(cStack_3d7 == local_448[9]);
    auVar137[10] = -(cStack_3d6 == local_448[10]);
    auVar137[0xb] = -(cStack_3d5 == local_448[0xb]);
    auVar137[0xc] = -(cStack_3d4 == local_448[0xc]);
    auVar137[0xd] = -(cStack_3d3 == local_448[0xd]);
    auVar137[0xe] = -(cStack_3d2 == local_448[0xe]);
    auVar137[0xf] = -(cStack_3d1 == local_448[0xf]);
    auVar310[0] = -(local_3d8 == local_448[5]);
    auVar310[1] = -(cStack_3d7 == local_448[6]);
    auVar310[2] = -(cStack_3d6 == local_448[7]);
    auVar310[3] = -(cStack_3d5 == local_448[8]);
    auVar310[4] = -(cStack_3d4 == local_448[9]);
    auVar310[5] = -(cStack_3d3 == local_448[10]);
    auVar310[6] = -(cStack_3d2 == local_448[0xb]);
    auVar310[7] = -(cStack_3d1 == local_448[0xc]);
    auVar310[8] = -((char)local_1c8 == local_448[0xd]);
    auVar310[9] = -((char)((ulong)local_1c8 >> 8) == local_448[0xe]);
    auVar310[10] = -((char)((ulong)local_1c8 >> 0x10) == local_448[0xf]);
    auVar310[0xb] = -((char)((ulong)local_1c8 >> 0x18) == local_438[0]);
    auVar310[0xc] = -((char)((ulong)local_1c8 >> 0x20) == local_438[1]);
    auVar310[0xd] = -((char)((ulong)local_1c8 >> 0x28) == local_438[2]);
    auVar310[0xe] = -((char)((ulong)local_1c8 >> 0x30) == local_438[3]);
    auVar310[0xf] = -((char)((ulong)local_1c8 >> 0x38) == local_438[4]);
    auVar137 = auVar137 & auVar310;
    if ((ushort)((ushort)(SUB161(auVar137 >> 7,0) & 1) |
                 (ushort)(SUB161(auVar137 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar137 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar137 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar137 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar137 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar137 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar137 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar137 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar137 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar137 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar137 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar137 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar137 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar137 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar137[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011d374;
  }
  else {
LAB_0011d374:
    main_cold_686();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%20.0o",0xfffffe01);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_687();
  }
  if (iVar3 == 0x14) {
    auVar138[0] = -(local_3d8 == local_448[0]);
    auVar138[1] = -(cStack_3d7 == local_448[1]);
    auVar138[2] = -(cStack_3d6 == local_448[2]);
    auVar138[3] = -(cStack_3d5 == local_448[3]);
    auVar138[4] = -(cStack_3d4 == local_448[4]);
    auVar138[5] = -(cStack_3d3 == local_448[5]);
    auVar138[6] = -(cStack_3d2 == local_448[6]);
    auVar138[7] = -(cStack_3d1 == local_448[7]);
    auVar138[8] = -((char)local_248 == local_448[8]);
    auVar138[9] = -((char)((ulong)local_248 >> 8) == local_448[9]);
    auVar138[10] = -((char)((ulong)local_248 >> 0x10) == local_448[10]);
    auVar138[0xb] = -((char)((ulong)local_248 >> 0x18) == local_448[0xb]);
    auVar138[0xc] = -((char)((ulong)local_248 >> 0x20) == local_448[0xc]);
    auVar138[0xd] = -((char)((ulong)local_248 >> 0x28) == local_448[0xd]);
    auVar138[0xe] = -((char)((ulong)local_248 >> 0x30) == local_448[0xe]);
    auVar138[0xf] = -((char)((ulong)local_248 >> 0x38) == local_448[0xf]);
    auVar311[0] = -((char)local_238 == local_448[5]);
    auVar311[1] = -(local_238._1_1_ == local_448[6]);
    auVar311[2] = -(local_238._2_1_ == local_448[7]);
    auVar311[3] = -(local_238._3_1_ == local_448[8]);
    auVar311[4] = -(local_238._4_1_ == local_448[9]);
    auVar311[5] = -(local_238._5_1_ == local_448[10]);
    auVar311[6] = -(local_238._6_1_ == local_448[0xb]);
    auVar311[7] = -(local_238._7_1_ == local_448[0xc]);
    auVar311[8] = -((char)local_348 == local_448[0xd]);
    auVar311[9] = -((char)((ulong)local_348 >> 8) == local_448[0xe]);
    auVar311[10] = -((char)((ulong)local_348 >> 0x10) == local_448[0xf]);
    auVar311[0xb] = -((char)((ulong)local_348 >> 0x18) == local_438[0]);
    auVar311[0xc] = -((char)((ulong)local_348 >> 0x20) == local_438[1]);
    auVar311[0xd] = -((char)((ulong)local_348 >> 0x28) == local_438[2]);
    auVar311[0xe] = -((char)((ulong)local_348 >> 0x30) == local_438[3]);
    auVar311[0xf] = -((char)((ulong)local_348 >> 0x38) == local_438[4]);
    auVar138 = auVar138 & auVar311;
    if ((ushort)((ushort)(SUB161(auVar138 >> 7,0) & 1) |
                 (ushort)(SUB161(auVar138 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar138 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar138 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar138 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar138 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar138 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar138 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar138 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar138 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar138 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar138 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar138 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar138 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar138 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar138[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011d385;
  }
  else {
LAB_0011d385:
    main_cold_688();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%20.o",0);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_689();
  }
  if (iVar3 == 0x14) {
    auVar139[0] = -(local_3d8 == local_448[0]);
    auVar139[1] = -(cStack_3d7 == local_448[1]);
    auVar139[2] = -(cStack_3d6 == local_448[2]);
    auVar139[3] = -(cStack_3d5 == local_448[3]);
    auVar139[4] = -(cStack_3d4 == local_448[4]);
    auVar139[5] = -(cStack_3d3 == local_448[5]);
    auVar139[6] = -(cStack_3d2 == local_448[6]);
    auVar139[7] = -(cStack_3d1 == local_448[7]);
    auVar139[8] = -(local_3d8 == local_448[8]);
    auVar139[9] = -(cStack_3d7 == local_448[9]);
    auVar139[10] = -(cStack_3d6 == local_448[10]);
    auVar139[0xb] = -(cStack_3d5 == local_448[0xb]);
    auVar139[0xc] = -(cStack_3d4 == local_448[0xc]);
    auVar139[0xd] = -(cStack_3d3 == local_448[0xd]);
    auVar139[0xe] = -(cStack_3d2 == local_448[0xe]);
    auVar139[0xf] = -(cStack_3d1 == local_448[0xf]);
    auVar312[0] = -(local_3d8 == local_448[5]);
    auVar312[1] = -(cStack_3d7 == local_448[6]);
    auVar312[2] = -(cStack_3d6 == local_448[7]);
    auVar312[3] = -(cStack_3d5 == local_448[8]);
    auVar312[4] = -(cStack_3d4 == local_448[9]);
    auVar312[5] = -(cStack_3d3 == local_448[10]);
    auVar312[6] = -(cStack_3d2 == local_448[0xb]);
    auVar312[7] = -(cStack_3d1 == local_448[0xc]);
    auVar312[8] = -((char)local_3c8 == local_448[0xd]);
    auVar312[9] = -((char)((ulong)local_3c8 >> 8) == local_448[0xe]);
    auVar312[10] = -((char)((ulong)local_3c8 >> 0x10) == local_448[0xf]);
    auVar312[0xb] = -((char)((ulong)local_3c8 >> 0x18) == local_438[0]);
    auVar312[0xc] = -((char)((ulong)local_3c8 >> 0x20) == local_438[1]);
    auVar312[0xd] = -((char)((ulong)local_3c8 >> 0x28) == local_438[2]);
    auVar312[0xe] = -((char)((ulong)local_3c8 >> 0x30) == local_438[3]);
    auVar312[0xf] = -((char)((ulong)local_3c8 >> 0x38) == local_438[4]);
    auVar139 = auVar139 & auVar312;
    if ((ushort)((ushort)(SUB161(auVar139 >> 7,0) & 1) |
                 (ushort)(SUB161(auVar139 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar139 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar139 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar139 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar139 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar139 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar139 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar139 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar139 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar139 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar139 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar139 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar139 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar139 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar139[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011d396;
  }
  else {
LAB_0011d396:
    main_cold_690();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%20.x",0x1234abcd);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_691();
  }
  if (iVar3 == 0x14) {
    auVar140[0] = -(local_3d8 == local_448[0]);
    auVar140[1] = -(cStack_3d7 == local_448[1]);
    auVar140[2] = -(cStack_3d6 == local_448[2]);
    auVar140[3] = -(cStack_3d5 == local_448[3]);
    auVar140[4] = -(cStack_3d4 == local_448[4]);
    auVar140[5] = -(cStack_3d3 == local_448[5]);
    auVar140[6] = -(cStack_3d2 == local_448[6]);
    auVar140[7] = -(cStack_3d1 == local_448[7]);
    auVar140[8] = -((char)local_388 == local_448[8]);
    auVar140[9] = -((char)((ulong)local_388 >> 8) == local_448[9]);
    auVar140[10] = -((char)((ulong)local_388 >> 0x10) == local_448[10]);
    auVar140[0xb] = -((char)((ulong)local_388 >> 0x18) == local_448[0xb]);
    auVar140[0xc] = -((char)((ulong)local_388 >> 0x20) == local_448[0xc]);
    auVar140[0xd] = -((char)((ulong)local_388 >> 0x28) == local_448[0xd]);
    auVar140[0xe] = -((char)((ulong)local_388 >> 0x30) == local_448[0xe]);
    auVar140[0xf] = -((char)((ulong)local_388 >> 0x38) == local_448[0xf]);
    auVar313[0] = -((char)local_398 == local_448[5]);
    auVar313[1] = -(local_398._1_1_ == local_448[6]);
    auVar313[2] = -(local_398._2_1_ == local_448[7]);
    auVar313[3] = -(local_398._3_1_ == local_448[8]);
    auVar313[4] = -(local_398._4_1_ == local_448[9]);
    auVar313[5] = -(local_398._5_1_ == local_448[10]);
    auVar313[6] = -(local_398._6_1_ == local_448[0xb]);
    auVar313[7] = -(local_398._7_1_ == local_448[0xc]);
    auVar313[8] = -((char)local_328 == local_448[0xd]);
    auVar313[9] = -((char)((ulong)local_328 >> 8) == local_448[0xe]);
    auVar313[10] = -((char)((ulong)local_328 >> 0x10) == local_448[0xf]);
    auVar313[0xb] = -((char)((ulong)local_328 >> 0x18) == local_438[0]);
    auVar313[0xc] = -((char)((ulong)local_328 >> 0x20) == local_438[1]);
    auVar313[0xd] = -((char)((ulong)local_328 >> 0x28) == local_438[2]);
    auVar313[0xe] = -((char)((ulong)local_328 >> 0x30) == local_438[3]);
    auVar313[0xf] = -((char)((ulong)local_328 >> 0x38) == local_438[4]);
    auVar140 = auVar140 & auVar313;
    if ((ushort)((ushort)(SUB161(auVar140 >> 7,0) & 1) |
                 (ushort)(SUB161(auVar140 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar140 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar140 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar140 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar140 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar140 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar140 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar140 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar140 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar140 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar140 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar140 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar140 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar140 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar140[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011d3a7;
  }
  else {
LAB_0011d3a7:
    main_cold_692();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%20.0x",0xedcb5433);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_693();
  }
  if (iVar3 == 0x14) {
    auVar141[0] = -(local_3d8 == local_448[0]);
    auVar141[1] = -(cStack_3d7 == local_448[1]);
    auVar141[2] = -(cStack_3d6 == local_448[2]);
    auVar141[3] = -(cStack_3d5 == local_448[3]);
    auVar141[4] = -(cStack_3d4 == local_448[4]);
    auVar141[5] = -(cStack_3d3 == local_448[5]);
    auVar141[6] = -(cStack_3d2 == local_448[6]);
    auVar141[7] = -(cStack_3d1 == local_448[7]);
    auVar141[8] = -((char)local_1b8 == local_448[8]);
    auVar141[9] = -((char)((ulong)local_1b8 >> 8) == local_448[9]);
    auVar141[10] = -((char)((ulong)local_1b8 >> 0x10) == local_448[10]);
    auVar141[0xb] = -((char)((ulong)local_1b8 >> 0x18) == local_448[0xb]);
    auVar141[0xc] = -((char)((ulong)local_1b8 >> 0x20) == local_448[0xc]);
    auVar141[0xd] = -((char)((ulong)local_1b8 >> 0x28) == local_448[0xd]);
    auVar141[0xe] = -((char)((ulong)local_1b8 >> 0x30) == local_448[0xe]);
    auVar141[0xf] = -((char)((ulong)local_1b8 >> 0x38) == local_448[0xf]);
    auVar314[0] = -((char)local_1a8 == local_448[5]);
    auVar314[1] = -(local_1a8._1_1_ == local_448[6]);
    auVar314[2] = -(local_1a8._2_1_ == local_448[7]);
    auVar314[3] = -(local_1a8._3_1_ == local_448[8]);
    auVar314[4] = -(local_1a8._4_1_ == local_448[9]);
    auVar314[5] = -(local_1a8._5_1_ == local_448[10]);
    auVar314[6] = -(local_1a8._6_1_ == local_448[0xb]);
    auVar314[7] = -(local_1a8._7_1_ == local_448[0xc]);
    auVar314[8] = -((char)local_338 == local_448[0xd]);
    auVar314[9] = -((char)((ulong)local_338 >> 8) == local_448[0xe]);
    auVar314[10] = -((char)((ulong)local_338 >> 0x10) == local_448[0xf]);
    auVar314[0xb] = -((char)((ulong)local_338 >> 0x18) == local_438[0]);
    auVar314[0xc] = -((char)((ulong)local_338 >> 0x20) == local_438[1]);
    auVar314[0xd] = -((char)((ulong)local_338 >> 0x28) == local_438[2]);
    auVar314[0xe] = -((char)((ulong)local_338 >> 0x30) == local_438[3]);
    auVar314[0xf] = -((char)((ulong)local_338 >> 0x38) == local_438[4]);
    auVar141 = auVar141 & auVar314;
    if ((ushort)((ushort)(SUB161(auVar141 >> 7,0) & 1) |
                 (ushort)(SUB161(auVar141 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar141 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar141 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar141 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar141 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar141 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar141 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar141 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar141 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar141 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar141 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar141 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar141 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar141 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar141[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011d3b8;
  }
  else {
LAB_0011d3b8:
    main_cold_694();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%20.x",0);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_695();
  }
  if (iVar3 == 0x14) {
    auVar142[0] = -(local_3d8 == local_448[0]);
    auVar142[1] = -(cStack_3d7 == local_448[1]);
    auVar142[2] = -(cStack_3d6 == local_448[2]);
    auVar142[3] = -(cStack_3d5 == local_448[3]);
    auVar142[4] = -(cStack_3d4 == local_448[4]);
    auVar142[5] = -(cStack_3d3 == local_448[5]);
    auVar142[6] = -(cStack_3d2 == local_448[6]);
    auVar142[7] = -(cStack_3d1 == local_448[7]);
    auVar142[8] = -(local_3d8 == local_448[8]);
    auVar142[9] = -(cStack_3d7 == local_448[9]);
    auVar142[10] = -(cStack_3d6 == local_448[10]);
    auVar142[0xb] = -(cStack_3d5 == local_448[0xb]);
    auVar142[0xc] = -(cStack_3d4 == local_448[0xc]);
    auVar142[0xd] = -(cStack_3d3 == local_448[0xd]);
    auVar142[0xe] = -(cStack_3d2 == local_448[0xe]);
    auVar142[0xf] = -(cStack_3d1 == local_448[0xf]);
    auVar315[0] = -(local_3d8 == local_448[5]);
    auVar315[1] = -(cStack_3d7 == local_448[6]);
    auVar315[2] = -(cStack_3d6 == local_448[7]);
    auVar315[3] = -(cStack_3d5 == local_448[8]);
    auVar315[4] = -(cStack_3d4 == local_448[9]);
    auVar315[5] = -(cStack_3d3 == local_448[10]);
    auVar315[6] = -(cStack_3d2 == local_448[0xb]);
    auVar315[7] = -(cStack_3d1 == local_448[0xc]);
    auVar315[8] = -((char)local_3c8 == local_448[0xd]);
    auVar315[9] = -((char)((ulong)local_3c8 >> 8) == local_448[0xe]);
    auVar315[10] = -((char)((ulong)local_3c8 >> 0x10) == local_448[0xf]);
    auVar315[0xb] = -((char)((ulong)local_3c8 >> 0x18) == local_438[0]);
    auVar315[0xc] = -((char)((ulong)local_3c8 >> 0x20) == local_438[1]);
    auVar315[0xd] = -((char)((ulong)local_3c8 >> 0x28) == local_438[2]);
    auVar315[0xe] = -((char)((ulong)local_3c8 >> 0x30) == local_438[3]);
    auVar315[0xf] = -((char)((ulong)local_3c8 >> 0x38) == local_438[4]);
    auVar142 = auVar142 & auVar315;
    if ((ushort)((ushort)(SUB161(auVar142 >> 7,0) & 1) |
                 (ushort)(SUB161(auVar142 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar142 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar142 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar142 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar142 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar142 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar142 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar142 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar142 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar142 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar142 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar142 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar142 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar142 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar142[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011d3c9;
  }
  else {
LAB_0011d3c9:
    main_cold_696();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%20.X",0x1234abcd);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_697();
  }
  if (iVar3 == 0x14) {
    auVar143[0] = -(local_3d8 == local_448[0]);
    auVar143[1] = -(cStack_3d7 == local_448[1]);
    auVar143[2] = -(cStack_3d6 == local_448[2]);
    auVar143[3] = -(cStack_3d5 == local_448[3]);
    auVar143[4] = -(cStack_3d4 == local_448[4]);
    auVar143[5] = -(cStack_3d3 == local_448[5]);
    auVar143[6] = -(cStack_3d2 == local_448[6]);
    auVar143[7] = -(cStack_3d1 == local_448[7]);
    auVar143[8] = -((char)local_388 == local_448[8]);
    auVar143[9] = -((char)((ulong)local_388 >> 8) == local_448[9]);
    auVar143[10] = -((char)((ulong)local_388 >> 0x10) == local_448[10]);
    auVar143[0xb] = -((char)((ulong)local_388 >> 0x18) == local_448[0xb]);
    auVar143[0xc] = -((char)((ulong)local_388 >> 0x20) == local_448[0xc]);
    auVar143[0xd] = -((char)((ulong)local_388 >> 0x28) == local_448[0xd]);
    auVar143[0xe] = -((char)((ulong)local_388 >> 0x30) == local_448[0xe]);
    auVar143[0xf] = -((char)((ulong)local_388 >> 0x38) == local_448[0xf]);
    auVar316[0] = -((char)local_398 == local_448[5]);
    auVar316[1] = -(local_398._1_1_ == local_448[6]);
    auVar316[2] = -(local_398._2_1_ == local_448[7]);
    auVar316[3] = -(local_398._3_1_ == local_448[8]);
    auVar316[4] = -(local_398._4_1_ == local_448[9]);
    auVar316[5] = -(local_398._5_1_ == local_448[10]);
    auVar316[6] = -(local_398._6_1_ == local_448[0xb]);
    auVar316[7] = -(local_398._7_1_ == local_448[0xc]);
    auVar316[8] = -((char)local_308 == local_448[0xd]);
    auVar316[9] = -((char)((ulong)local_308 >> 8) == local_448[0xe]);
    auVar316[10] = -((char)((ulong)local_308 >> 0x10) == local_448[0xf]);
    auVar316[0xb] = -((char)((ulong)local_308 >> 0x18) == local_438[0]);
    auVar316[0xc] = -((char)((ulong)local_308 >> 0x20) == local_438[1]);
    auVar316[0xd] = -((char)((ulong)local_308 >> 0x28) == local_438[2]);
    auVar316[0xe] = -((char)((ulong)local_308 >> 0x30) == local_438[3]);
    auVar316[0xf] = -((char)((ulong)local_308 >> 0x38) == local_438[4]);
    auVar143 = auVar143 & auVar316;
    if ((ushort)((ushort)(SUB161(auVar143 >> 7,0) & 1) |
                 (ushort)(SUB161(auVar143 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar143 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar143 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar143 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar143 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar143 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar143 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar143 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar143 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar143 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar143 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar143 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar143 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar143 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar143[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011d3da;
  }
  else {
LAB_0011d3da:
    main_cold_698();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%20.0X",0xedcb5433);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_699();
  }
  if (iVar3 == 0x14) {
    auVar144[0] = -(local_3d8 == local_448[0]);
    auVar144[1] = -(cStack_3d7 == local_448[1]);
    auVar144[2] = -(cStack_3d6 == local_448[2]);
    auVar144[3] = -(cStack_3d5 == local_448[3]);
    auVar144[4] = -(cStack_3d4 == local_448[4]);
    auVar144[5] = -(cStack_3d3 == local_448[5]);
    auVar144[6] = -(cStack_3d2 == local_448[6]);
    auVar144[7] = -(cStack_3d1 == local_448[7]);
    auVar144[8] = -((char)local_168 == local_448[8]);
    auVar144[9] = -((char)((ulong)local_168 >> 8) == local_448[9]);
    auVar144[10] = -((char)((ulong)local_168 >> 0x10) == local_448[10]);
    auVar144[0xb] = -((char)((ulong)local_168 >> 0x18) == local_448[0xb]);
    auVar144[0xc] = -((char)((ulong)local_168 >> 0x20) == local_448[0xc]);
    auVar144[0xd] = -((char)((ulong)local_168 >> 0x28) == local_448[0xd]);
    auVar144[0xe] = -((char)((ulong)local_168 >> 0x30) == local_448[0xe]);
    auVar144[0xf] = -((char)((ulong)local_168 >> 0x38) == local_448[0xf]);
    auVar317[0] = -((char)local_e8 == local_448[5]);
    auVar317[1] = -(local_e8._1_1_ == local_448[6]);
    auVar317[2] = -(local_e8._2_1_ == local_448[7]);
    auVar317[3] = -(local_e8._3_1_ == local_448[8]);
    auVar317[4] = -(local_e8._4_1_ == local_448[9]);
    auVar317[5] = -(local_e8._5_1_ == local_448[10]);
    auVar317[6] = -(local_e8._6_1_ == local_448[0xb]);
    auVar317[7] = -(local_e8._7_1_ == local_448[0xc]);
    auVar317[8] = -((char)local_318 == local_448[0xd]);
    auVar317[9] = -((char)((ulong)local_318 >> 8) == local_448[0xe]);
    auVar317[10] = -((char)((ulong)local_318 >> 0x10) == local_448[0xf]);
    auVar317[0xb] = -((char)((ulong)local_318 >> 0x18) == local_438[0]);
    auVar317[0xc] = -((char)((ulong)local_318 >> 0x20) == local_438[1]);
    auVar317[0xd] = -((char)((ulong)local_318 >> 0x28) == local_438[2]);
    auVar317[0xe] = -((char)((ulong)local_318 >> 0x30) == local_438[3]);
    auVar317[0xf] = -((char)((ulong)local_318 >> 0x38) == local_438[4]);
    auVar144 = auVar144 & auVar317;
    if ((ushort)((ushort)(SUB161(auVar144 >> 7,0) & 1) |
                 (ushort)(SUB161(auVar144 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar144 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar144 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar144 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar144 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar144 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar144 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar144 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar144 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar144 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar144 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar144 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar144 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar144 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar144[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011d3eb;
  }
  else {
LAB_0011d3eb:
    main_cold_700();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%20.X",0);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_701();
  }
  if (iVar3 == 0x14) {
    auVar145[0] = -(local_3d8 == local_448[0]);
    auVar145[1] = -(cStack_3d7 == local_448[1]);
    auVar145[2] = -(cStack_3d6 == local_448[2]);
    auVar145[3] = -(cStack_3d5 == local_448[3]);
    auVar145[4] = -(cStack_3d4 == local_448[4]);
    auVar145[5] = -(cStack_3d3 == local_448[5]);
    auVar145[6] = -(cStack_3d2 == local_448[6]);
    auVar145[7] = -(cStack_3d1 == local_448[7]);
    auVar145[8] = -(local_3d8 == local_448[8]);
    auVar145[9] = -(cStack_3d7 == local_448[9]);
    auVar145[10] = -(cStack_3d6 == local_448[10]);
    auVar145[0xb] = -(cStack_3d5 == local_448[0xb]);
    auVar145[0xc] = -(cStack_3d4 == local_448[0xc]);
    auVar145[0xd] = -(cStack_3d3 == local_448[0xd]);
    auVar145[0xe] = -(cStack_3d2 == local_448[0xe]);
    auVar145[0xf] = -(cStack_3d1 == local_448[0xf]);
    auVar318[0] = -(local_3d8 == local_448[5]);
    auVar318[1] = -(cStack_3d7 == local_448[6]);
    auVar318[2] = -(cStack_3d6 == local_448[7]);
    auVar318[3] = -(cStack_3d5 == local_448[8]);
    auVar318[4] = -(cStack_3d4 == local_448[9]);
    auVar318[5] = -(cStack_3d3 == local_448[10]);
    auVar318[6] = -(cStack_3d2 == local_448[0xb]);
    auVar318[7] = -(cStack_3d1 == local_448[0xc]);
    auVar318[8] = -((char)local_3c8 == local_448[0xd]);
    auVar318[9] = -((char)((ulong)local_3c8 >> 8) == local_448[0xe]);
    auVar318[10] = -((char)((ulong)local_3c8 >> 0x10) == local_448[0xf]);
    auVar318[0xb] = -((char)((ulong)local_3c8 >> 0x18) == local_438[0]);
    auVar318[0xc] = -((char)((ulong)local_3c8 >> 0x20) == local_438[1]);
    auVar318[0xd] = -((char)((ulong)local_3c8 >> 0x28) == local_438[2]);
    auVar318[0xe] = -((char)((ulong)local_3c8 >> 0x30) == local_438[3]);
    auVar318[0xf] = -((char)((ulong)local_3c8 >> 0x38) == local_438[4]);
    auVar145 = auVar145 & auVar318;
    if ((ushort)((ushort)(SUB161(auVar145 >> 7,0) & 1) |
                 (ushort)(SUB161(auVar145 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar145 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar145 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar145 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar145 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar145 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar145 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar145 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar145 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar145 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar145 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar145 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar145 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar145 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar145[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011d3fc;
  }
  else {
LAB_0011d3fc:
    main_cold_702();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"% -0+*.*s",0x14,5,"Hallo heimur");
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_703();
  }
  if (iVar3 == 0x14) {
    auVar319[0] = -((char)local_118 == local_448[0]);
    auVar319[1] = -(local_118._1_1_ == local_448[1]);
    auVar319[2] = -(local_118._2_1_ == local_448[2]);
    auVar319[3] = -(local_118._3_1_ == local_448[3]);
    auVar319[4] = -(local_118._4_1_ == local_448[4]);
    auVar319[5] = -(local_118._5_1_ == local_448[5]);
    auVar319[6] = -(local_118._6_1_ == local_448[6]);
    auVar319[7] = -(local_118._7_1_ == local_448[7]);
    auVar319[8] = -(local_3d8 == local_448[8]);
    auVar319[9] = -(cStack_3d7 == local_448[9]);
    auVar319[10] = -(cStack_3d6 == local_448[10]);
    auVar319[0xb] = -(cStack_3d5 == local_448[0xb]);
    auVar319[0xc] = -(cStack_3d4 == local_448[0xc]);
    auVar319[0xd] = -(cStack_3d3 == local_448[0xd]);
    auVar319[0xe] = -(cStack_3d2 == local_448[0xe]);
    auVar319[0xf] = -(cStack_3d1 == local_448[0xf]);
    auVar175[0] = -(local_3d8 == local_448[5]);
    auVar175[1] = -(cStack_3d7 == local_448[6]);
    auVar175[2] = -(cStack_3d6 == local_448[7]);
    auVar175[3] = -(cStack_3d5 == local_448[8]);
    auVar175[4] = -(cStack_3d4 == local_448[9]);
    auVar175[5] = -(cStack_3d3 == local_448[10]);
    auVar175[6] = -(cStack_3d2 == local_448[0xb]);
    auVar175[7] = -(cStack_3d1 == local_448[0xc]);
    auVar175[8] = -((char)local_3c8 == local_448[0xd]);
    auVar175[9] = -((char)((ulong)local_3c8 >> 8) == local_448[0xe]);
    auVar175[10] = -((char)((ulong)local_3c8 >> 0x10) == local_448[0xf]);
    auVar175[0xb] = -((char)((ulong)local_3c8 >> 0x18) == local_438[0]);
    auVar175[0xc] = -((char)((ulong)local_3c8 >> 0x20) == local_438[1]);
    auVar175[0xd] = -((char)((ulong)local_3c8 >> 0x28) == local_438[2]);
    auVar175[0xe] = -((char)((ulong)local_3c8 >> 0x30) == local_438[3]);
    auVar175[0xf] = -((char)((ulong)local_3c8 >> 0x38) == local_438[4]);
    auVar319 = auVar319 & auVar175;
    if ((ushort)((ushort)(SUB161(auVar319 >> 7,0) & 1) |
                 (ushort)(SUB161(auVar319 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar319 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar319 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar319 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar319 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar319 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar319 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar319 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar319 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar319 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar319 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar319 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar319 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar319 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar319[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011d40d;
  }
  else {
LAB_0011d40d:
    main_cold_704();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"% -0+*.*d",0x14,5,0x400);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_705();
  }
  local_3b8 = 0x2020202020202034;
  uStack_3b0 = 0;
  local_3a8 = 0x202034323031302b;
  uStack_3a0 = 0;
  if (iVar3 == 0x14) {
    auVar146[0] = -(local_448[0] == '+');
    auVar146[1] = -(local_448[1] == '0');
    auVar146[2] = -(local_448[2] == '1');
    auVar146[3] = -(local_448[3] == '0');
    auVar146[4] = -(local_448[4] == '2');
    auVar146[5] = -(local_448[5] == '4');
    auVar146[6] = -(local_448[6] == ' ');
    auVar146[7] = -(local_448[7] == ' ');
    auVar146[8] = -(local_3d8 == local_448[8]);
    auVar146[9] = -(cStack_3d7 == local_448[9]);
    auVar146[10] = -(cStack_3d6 == local_448[10]);
    auVar146[0xb] = -(cStack_3d5 == local_448[0xb]);
    auVar146[0xc] = -(cStack_3d4 == local_448[0xc]);
    auVar146[0xd] = -(cStack_3d3 == local_448[0xd]);
    auVar146[0xe] = -(cStack_3d2 == local_448[0xe]);
    auVar146[0xf] = -(cStack_3d1 == local_448[0xf]);
    auVar320[0] = -(local_448[5] == '4');
    auVar320[1] = -(local_448[6] == ' ');
    auVar320[2] = -(local_448[7] == ' ');
    auVar320[3] = -(local_448[8] == ' ');
    auVar320[4] = -(local_448[9] == ' ');
    auVar320[5] = -(local_448[10] == ' ');
    auVar320[6] = -(local_448[0xb] == ' ');
    auVar320[7] = -(local_448[0xc] == ' ');
    auVar320[8] = -((char)local_3c8 == local_448[0xd]);
    auVar320[9] = -((char)((ulong)local_3c8 >> 8) == local_448[0xe]);
    auVar320[10] = -((char)((ulong)local_3c8 >> 0x10) == local_448[0xf]);
    auVar320[0xb] = -((char)((ulong)local_3c8 >> 0x18) == local_438[0]);
    auVar320[0xc] = -((char)((ulong)local_3c8 >> 0x20) == local_438[1]);
    auVar320[0xd] = -((char)((ulong)local_3c8 >> 0x28) == local_438[2]);
    auVar320[0xe] = -((char)((ulong)local_3c8 >> 0x30) == local_438[3]);
    auVar320[0xf] = -((char)((ulong)local_3c8 >> 0x38) == local_438[4]);
    auVar146 = auVar146 & auVar320;
    if ((ushort)((ushort)(SUB161(auVar146 >> 7,0) & 1) |
                 (ushort)(SUB161(auVar146 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar146 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar146 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar146 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar146 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar146 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar146 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar146 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar146 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar146 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar146 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar146 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar146 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar146 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar146[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011d41e;
  }
  else {
LAB_0011d41e:
    main_cold_706();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"% -0+*.*d",0x14,5,0xfffffc00);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_707();
  }
  local_398 = 0x202034323031302d;
  uStack_390 = 0;
  if (iVar3 == 0x14) {
    auVar147[0] = -(local_448[0] == '-');
    auVar147[1] = -(local_448[1] == '0');
    auVar147[2] = -(local_448[2] == '1');
    auVar147[3] = -(local_448[3] == '0');
    auVar147[4] = -(local_448[4] == '2');
    auVar147[5] = -(local_448[5] == '4');
    auVar147[6] = -(local_448[6] == ' ');
    auVar147[7] = -(local_448[7] == ' ');
    auVar147[8] = -(local_3d8 == local_448[8]);
    auVar147[9] = -(cStack_3d7 == local_448[9]);
    auVar147[10] = -(cStack_3d6 == local_448[10]);
    auVar147[0xb] = -(cStack_3d5 == local_448[0xb]);
    auVar147[0xc] = -(cStack_3d4 == local_448[0xc]);
    auVar147[0xd] = -(cStack_3d3 == local_448[0xd]);
    auVar147[0xe] = -(cStack_3d2 == local_448[0xe]);
    auVar147[0xf] = -(cStack_3d1 == local_448[0xf]);
    auVar321[0] = -((char)local_3b8 == local_448[5]);
    auVar321[1] = -(local_3b8._1_1_ == local_448[6]);
    auVar321[2] = -(local_3b8._2_1_ == local_448[7]);
    auVar321[3] = -(local_3b8._3_1_ == local_448[8]);
    auVar321[4] = -(local_3b8._4_1_ == local_448[9]);
    auVar321[5] = -(local_3b8._5_1_ == local_448[10]);
    auVar321[6] = -(local_3b8._6_1_ == local_448[0xb]);
    auVar321[7] = -(local_3b8._7_1_ == local_448[0xc]);
    auVar321[8] = -((char)local_3c8 == local_448[0xd]);
    auVar321[9] = -((char)((ulong)local_3c8 >> 8) == local_448[0xe]);
    auVar321[10] = -((char)((ulong)local_3c8 >> 0x10) == local_448[0xf]);
    auVar321[0xb] = -((char)((ulong)local_3c8 >> 0x18) == local_438[0]);
    auVar321[0xc] = -((char)((ulong)local_3c8 >> 0x20) == local_438[1]);
    auVar321[0xd] = -((char)((ulong)local_3c8 >> 0x28) == local_438[2]);
    auVar321[0xe] = -((char)((ulong)local_3c8 >> 0x30) == local_438[3]);
    auVar321[0xf] = -((char)((ulong)local_3c8 >> 0x38) == local_438[4]);
    auVar147 = auVar147 & auVar321;
    if ((ushort)((ushort)(SUB161(auVar147 >> 7,0) & 1) |
                 (ushort)(SUB161(auVar147 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar147 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar147 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar147 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar147 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar147 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar147 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar147 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar147 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar147 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar147 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar147 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar147 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar147 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar147[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011d42f;
  }
  else {
LAB_0011d42f:
    main_cold_708();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"% -0+*.*i",0x14,5,0x400);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_709();
  }
  if (iVar3 == 0x14) {
    auVar322[0] = -((char)local_3a8 == local_448[0]);
    auVar322[1] = -(local_3a8._1_1_ == local_448[1]);
    auVar322[2] = -(local_3a8._2_1_ == local_448[2]);
    auVar322[3] = -(local_3a8._3_1_ == local_448[3]);
    auVar322[4] = -(local_3a8._4_1_ == local_448[4]);
    auVar322[5] = -(local_3a8._5_1_ == local_448[5]);
    auVar322[6] = -(local_3a8._6_1_ == local_448[6]);
    auVar322[7] = -(local_3a8._7_1_ == local_448[7]);
    auVar322[8] = -(local_3d8 == local_448[8]);
    auVar322[9] = -(cStack_3d7 == local_448[9]);
    auVar322[10] = -(cStack_3d6 == local_448[10]);
    auVar322[0xb] = -(cStack_3d5 == local_448[0xb]);
    auVar322[0xc] = -(cStack_3d4 == local_448[0xc]);
    auVar322[0xd] = -(cStack_3d3 == local_448[0xd]);
    auVar322[0xe] = -(cStack_3d2 == local_448[0xe]);
    auVar322[0xf] = -(cStack_3d1 == local_448[0xf]);
    auVar176[0] = -((char)local_3b8 == local_448[5]);
    auVar176[1] = -(local_3b8._1_1_ == local_448[6]);
    auVar176[2] = -(local_3b8._2_1_ == local_448[7]);
    auVar176[3] = -(local_3b8._3_1_ == local_448[8]);
    auVar176[4] = -(local_3b8._4_1_ == local_448[9]);
    auVar176[5] = -(local_3b8._5_1_ == local_448[10]);
    auVar176[6] = -(local_3b8._6_1_ == local_448[0xb]);
    auVar176[7] = -(local_3b8._7_1_ == local_448[0xc]);
    auVar176[8] = -((char)local_3c8 == local_448[0xd]);
    auVar176[9] = -((char)((ulong)local_3c8 >> 8) == local_448[0xe]);
    auVar176[10] = -((char)((ulong)local_3c8 >> 0x10) == local_448[0xf]);
    auVar176[0xb] = -((char)((ulong)local_3c8 >> 0x18) == local_438[0]);
    auVar176[0xc] = -((char)((ulong)local_3c8 >> 0x20) == local_438[1]);
    auVar176[0xd] = -((char)((ulong)local_3c8 >> 0x28) == local_438[2]);
    auVar176[0xe] = -((char)((ulong)local_3c8 >> 0x30) == local_438[3]);
    auVar176[0xf] = -((char)((ulong)local_3c8 >> 0x38) == local_438[4]);
    auVar322 = auVar322 & auVar176;
    if ((ushort)((ushort)(SUB161(auVar322 >> 7,0) & 1) |
                 (ushort)(SUB161(auVar322 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar322 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar322 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar322 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar322 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar322 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar322 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar322 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar322 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar322 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar322 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar322 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar322 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar322 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar322[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011d440;
  }
  else {
LAB_0011d440:
    main_cold_710();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"% 0-+*.*i",0x14,5,0xfffffc00);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_711();
  }
  if (iVar3 == 0x14) {
    auVar323[0] = -((char)local_398 == local_448[0]);
    auVar323[1] = -(local_398._1_1_ == local_448[1]);
    auVar323[2] = -(local_398._2_1_ == local_448[2]);
    auVar323[3] = -(local_398._3_1_ == local_448[3]);
    auVar323[4] = -(local_398._4_1_ == local_448[4]);
    auVar323[5] = -(local_398._5_1_ == local_448[5]);
    auVar323[6] = -(local_398._6_1_ == local_448[6]);
    auVar323[7] = -(local_398._7_1_ == local_448[7]);
    auVar323[8] = -(local_3d8 == local_448[8]);
    auVar323[9] = -(cStack_3d7 == local_448[9]);
    auVar323[10] = -(cStack_3d6 == local_448[10]);
    auVar323[0xb] = -(cStack_3d5 == local_448[0xb]);
    auVar323[0xc] = -(cStack_3d4 == local_448[0xc]);
    auVar323[0xd] = -(cStack_3d3 == local_448[0xd]);
    auVar323[0xe] = -(cStack_3d2 == local_448[0xe]);
    auVar323[0xf] = -(cStack_3d1 == local_448[0xf]);
    auVar177[0] = -((char)local_3b8 == local_448[5]);
    auVar177[1] = -(local_3b8._1_1_ == local_448[6]);
    auVar177[2] = -(local_3b8._2_1_ == local_448[7]);
    auVar177[3] = -(local_3b8._3_1_ == local_448[8]);
    auVar177[4] = -(local_3b8._4_1_ == local_448[9]);
    auVar177[5] = -(local_3b8._5_1_ == local_448[10]);
    auVar177[6] = -(local_3b8._6_1_ == local_448[0xb]);
    auVar177[7] = -(local_3b8._7_1_ == local_448[0xc]);
    auVar177[8] = -((char)local_3c8 == local_448[0xd]);
    auVar177[9] = -((char)((ulong)local_3c8 >> 8) == local_448[0xe]);
    auVar177[10] = -((char)((ulong)local_3c8 >> 0x10) == local_448[0xf]);
    auVar177[0xb] = -((char)((ulong)local_3c8 >> 0x18) == local_438[0]);
    auVar177[0xc] = -((char)((ulong)local_3c8 >> 0x20) == local_438[1]);
    auVar177[0xd] = -((char)((ulong)local_3c8 >> 0x28) == local_438[2]);
    auVar177[0xe] = -((char)((ulong)local_3c8 >> 0x30) == local_438[3]);
    auVar177[0xf] = -((char)((ulong)local_3c8 >> 0x38) == local_438[4]);
    auVar323 = auVar323 & auVar177;
    if ((ushort)((ushort)(SUB161(auVar323 >> 7,0) & 1) |
                 (ushort)(SUB161(auVar323 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar323 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar323 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar323 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar323 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar323 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar323 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar323 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar323 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar323 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar323 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar323 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar323 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar323 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar323[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011d451;
  }
  else {
LAB_0011d451:
    main_cold_712();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"% 0-+*.*u",0x14,5,0x400);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_713();
  }
  if (iVar3 == 0x14) {
    auVar148[0] = -(local_448[0] == '0');
    auVar148[1] = -(local_448[1] == '1');
    auVar148[2] = -(local_448[2] == '0');
    auVar148[3] = -(local_448[3] == '2');
    auVar148[4] = -(local_448[4] == '4');
    auVar148[5] = -(local_448[5] == ' ');
    auVar148[6] = -(local_448[6] == ' ');
    auVar148[7] = -(local_448[7] == ' ');
    auVar148[8] = -(local_448[8] == ' ');
    auVar148[9] = -(local_448[9] == ' ');
    auVar148[10] = -(local_448[10] == ' ');
    auVar148[0xb] = -(local_448[0xb] == ' ');
    auVar148[0xc] = -(local_448[0xc] == ' ');
    auVar148[0xd] = -(local_448[0xd] == ' ');
    auVar148[0xe] = -(local_448[0xe] == ' ');
    auVar148[0xf] = -(local_448[0xf] == ' ');
    auVar324[0] = -(local_3d8 == local_448[5]);
    auVar324[1] = -(cStack_3d7 == local_448[6]);
    auVar324[2] = -(cStack_3d6 == local_448[7]);
    auVar324[3] = -(cStack_3d5 == local_448[8]);
    auVar324[4] = -(cStack_3d4 == local_448[9]);
    auVar324[5] = -(cStack_3d3 == local_448[10]);
    auVar324[6] = -(cStack_3d2 == local_448[0xb]);
    auVar324[7] = -(cStack_3d1 == local_448[0xc]);
    auVar324[8] = -((char)local_3c8 == local_448[0xd]);
    auVar324[9] = -((char)((ulong)local_3c8 >> 8) == local_448[0xe]);
    auVar324[10] = -((char)((ulong)local_3c8 >> 0x10) == local_448[0xf]);
    auVar324[0xb] = -((char)((ulong)local_3c8 >> 0x18) == local_438[0]);
    auVar324[0xc] = -((char)((ulong)local_3c8 >> 0x20) == local_438[1]);
    auVar324[0xd] = -((char)((ulong)local_3c8 >> 0x28) == local_438[2]);
    auVar324[0xe] = -((char)((ulong)local_3c8 >> 0x30) == local_438[3]);
    auVar324[0xf] = -((char)((ulong)local_3c8 >> 0x38) == local_438[4]);
    auVar148 = auVar148 & auVar324;
    if ((ushort)((ushort)(SUB161(auVar148 >> 7,0) & 1) |
                 (ushort)(SUB161(auVar148 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar148 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar148 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar148 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar148 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar148 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar148 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar148 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar148 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar148 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar148 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar148 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar148 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar148 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar148[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011d462;
  }
  else {
LAB_0011d462:
    main_cold_714();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"% 0-+*.*u",0x14,5,0xfffffc00);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_715();
  }
  if (iVar3 == 0x14) {
    auVar178[0] = -((char)local_d8 == local_448[0]);
    auVar178[1] = -(local_d8._1_1_ == local_448[1]);
    auVar178[2] = -(local_d8._2_1_ == local_448[2]);
    auVar178[3] = -(local_d8._3_1_ == local_448[3]);
    auVar178[4] = -(local_d8._4_1_ == local_448[4]);
    auVar178[5] = -(local_d8._5_1_ == local_448[5]);
    auVar178[6] = -(local_d8._6_1_ == local_448[6]);
    auVar178[7] = -(local_d8._7_1_ == local_448[7]);
    auVar178[8] = -((char)local_158 == local_448[8]);
    auVar178[9] = -((char)((ulong)local_158 >> 8) == local_448[9]);
    auVar178[10] = -((char)((ulong)local_158 >> 0x10) == local_448[10]);
    auVar178[0xb] = -((char)((ulong)local_158 >> 0x18) == local_448[0xb]);
    auVar178[0xc] = -((char)((ulong)local_158 >> 0x20) == local_448[0xc]);
    auVar178[0xd] = -((char)((ulong)local_158 >> 0x28) == local_448[0xd]);
    auVar178[0xe] = -((char)((ulong)local_158 >> 0x30) == local_448[0xe]);
    auVar178[0xf] = -((char)((ulong)local_158 >> 0x38) == local_448[0xf]);
    auVar325[0] = -((char)local_f8 == local_448[5]);
    auVar325[1] = -(local_f8._1_1_ == local_448[6]);
    auVar325[2] = -(local_f8._2_1_ == local_448[7]);
    auVar325[3] = -(local_f8._3_1_ == local_448[8]);
    auVar325[4] = -(local_f8._4_1_ == local_448[9]);
    auVar325[5] = -(local_f8._5_1_ == local_448[10]);
    auVar325[6] = -(local_f8._6_1_ == local_448[0xb]);
    auVar325[7] = -(local_f8._7_1_ == local_448[0xc]);
    auVar325[8] = -((char)local_3c8 == local_448[0xd]);
    auVar325[9] = -((char)((ulong)local_3c8 >> 8) == local_448[0xe]);
    auVar325[10] = -((char)((ulong)local_3c8 >> 0x10) == local_448[0xf]);
    auVar325[0xb] = -((char)((ulong)local_3c8 >> 0x18) == local_438[0]);
    auVar325[0xc] = -((char)((ulong)local_3c8 >> 0x20) == local_438[1]);
    auVar325[0xd] = -((char)((ulong)local_3c8 >> 0x28) == local_438[2]);
    auVar325[0xe] = -((char)((ulong)local_3c8 >> 0x30) == local_438[3]);
    auVar325[0xf] = -((char)((ulong)local_3c8 >> 0x38) == local_438[4]);
    auVar178 = auVar178 & auVar325;
    if ((ushort)((ushort)(SUB161(auVar178 >> 7,0) & 1) |
                 (ushort)(SUB161(auVar178 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar178 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar178 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar178 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar178 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar178 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar178 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar178 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar178 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar178 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar178 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar178 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar178 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar178 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar178[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011d473;
  }
  else {
LAB_0011d473:
    main_cold_716();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%+ -0*.*o",0x14,5,0x1ff);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_717();
  }
  if (iVar3 == 0x14) {
    auVar149[0] = -(local_448[0] == '0');
    auVar149[1] = -(local_448[1] == '0');
    auVar149[2] = -(local_448[2] == '7');
    auVar149[3] = -(local_448[3] == '7');
    auVar149[4] = -(local_448[4] == '7');
    auVar149[5] = -(local_448[5] == ' ');
    auVar149[6] = -(local_448[6] == ' ');
    auVar149[7] = -(local_448[7] == ' ');
    auVar149[8] = -(local_448[8] == ' ');
    auVar149[9] = -(local_448[9] == ' ');
    auVar149[10] = -(local_448[10] == ' ');
    auVar149[0xb] = -(local_448[0xb] == ' ');
    auVar149[0xc] = -(local_448[0xc] == ' ');
    auVar149[0xd] = -(local_448[0xd] == ' ');
    auVar149[0xe] = -(local_448[0xe] == ' ');
    auVar149[0xf] = -(local_448[0xf] == ' ');
    auVar326[0] = -(local_3d8 == local_448[5]);
    auVar326[1] = -(cStack_3d7 == local_448[6]);
    auVar326[2] = -(cStack_3d6 == local_448[7]);
    auVar326[3] = -(cStack_3d5 == local_448[8]);
    auVar326[4] = -(cStack_3d4 == local_448[9]);
    auVar326[5] = -(cStack_3d3 == local_448[10]);
    auVar326[6] = -(cStack_3d2 == local_448[0xb]);
    auVar326[7] = -(cStack_3d1 == local_448[0xc]);
    auVar326[8] = -((char)local_3c8 == local_448[0xd]);
    auVar326[9] = -((char)((ulong)local_3c8 >> 8) == local_448[0xe]);
    auVar326[10] = -((char)((ulong)local_3c8 >> 0x10) == local_448[0xf]);
    auVar326[0xb] = -((char)((ulong)local_3c8 >> 0x18) == local_438[0]);
    auVar326[0xc] = -((char)((ulong)local_3c8 >> 0x20) == local_438[1]);
    auVar326[0xd] = -((char)((ulong)local_3c8 >> 0x28) == local_438[2]);
    auVar326[0xe] = -((char)((ulong)local_3c8 >> 0x30) == local_438[3]);
    auVar326[0xf] = -((char)((ulong)local_3c8 >> 0x38) == local_438[4]);
    auVar149 = auVar149 & auVar326;
    if ((ushort)((ushort)(SUB161(auVar149 >> 7,0) & 1) |
                 (ushort)(SUB161(auVar149 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar149 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar149 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar149 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar149 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar149 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar149 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar149 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar149 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar149 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar149 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar149 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar149 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar149 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar149[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011d484;
  }
  else {
LAB_0011d484:
    main_cold_718();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%+ -0*.*o",0x14,5,0xfffffe01);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_719();
  }
  if (iVar3 == 0x14) {
    auVar179[0] = -((char)local_108 == local_448[0]);
    auVar179[1] = -(local_108._1_1_ == local_448[1]);
    auVar179[2] = -(local_108._2_1_ == local_448[2]);
    auVar179[3] = -(local_108._3_1_ == local_448[3]);
    auVar179[4] = -(local_108._4_1_ == local_448[4]);
    auVar179[5] = -(local_108._5_1_ == local_448[5]);
    auVar179[6] = -(local_108._6_1_ == local_448[6]);
    auVar179[7] = -(local_108._7_1_ == local_448[7]);
    auVar179[8] = -((char)local_188 == local_448[8]);
    auVar179[9] = -((char)((ulong)local_188 >> 8) == local_448[9]);
    auVar179[10] = -((char)((ulong)local_188 >> 0x10) == local_448[10]);
    auVar179[0xb] = -((char)((ulong)local_188 >> 0x18) == local_448[0xb]);
    auVar179[0xc] = -((char)((ulong)local_188 >> 0x20) == local_448[0xc]);
    auVar179[0xd] = -((char)((ulong)local_188 >> 0x28) == local_448[0xd]);
    auVar179[0xe] = -((char)((ulong)local_188 >> 0x30) == local_448[0xe]);
    auVar179[0xf] = -((char)((ulong)local_188 >> 0x38) == local_448[0xf]);
    auVar327[0] = -((char)local_128 == local_448[5]);
    auVar327[1] = -(local_128._1_1_ == local_448[6]);
    auVar327[2] = -(local_128._2_1_ == local_448[7]);
    auVar327[3] = -(local_128._3_1_ == local_448[8]);
    auVar327[4] = -(local_128._4_1_ == local_448[9]);
    auVar327[5] = -(local_128._5_1_ == local_448[10]);
    auVar327[6] = -(local_128._6_1_ == local_448[0xb]);
    auVar327[7] = -(local_128._7_1_ == local_448[0xc]);
    auVar327[8] = -((char)local_3c8 == local_448[0xd]);
    auVar327[9] = -((char)((ulong)local_3c8 >> 8) == local_448[0xe]);
    auVar327[10] = -((char)((ulong)local_3c8 >> 0x10) == local_448[0xf]);
    auVar327[0xb] = -((char)((ulong)local_3c8 >> 0x18) == local_438[0]);
    auVar327[0xc] = -((char)((ulong)local_3c8 >> 0x20) == local_438[1]);
    auVar327[0xd] = -((char)((ulong)local_3c8 >> 0x28) == local_438[2]);
    auVar327[0xe] = -((char)((ulong)local_3c8 >> 0x30) == local_438[3]);
    auVar327[0xf] = -((char)((ulong)local_3c8 >> 0x38) == local_438[4]);
    auVar179 = auVar179 & auVar327;
    if ((ushort)((ushort)(SUB161(auVar179 >> 7,0) & 1) |
                 (ushort)(SUB161(auVar179 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar179 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar179 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar179 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar179 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar179 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar179 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar179 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar179 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar179 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar179 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar179 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar179 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar179 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar179[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011d495;
  }
  else {
LAB_0011d495:
    main_cold_720();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%+ -0*.*x",0x14,5,0x1234abcd);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_721();
  }
  if (iVar3 == 0x14) {
    auVar328[0] = -((char)local_138 == local_448[0]);
    auVar328[1] = -(local_138._1_1_ == local_448[1]);
    auVar328[2] = -(local_138._2_1_ == local_448[2]);
    auVar328[3] = -(local_138._3_1_ == local_448[3]);
    auVar328[4] = -(local_138._4_1_ == local_448[4]);
    auVar328[5] = -(local_138._5_1_ == local_448[5]);
    auVar328[6] = -(local_138._6_1_ == local_448[6]);
    auVar328[7] = -(local_138._7_1_ == local_448[7]);
    auVar328[8] = -(local_3d8 == local_448[8]);
    auVar328[9] = -(cStack_3d7 == local_448[9]);
    auVar328[10] = -(cStack_3d6 == local_448[10]);
    auVar328[0xb] = -(cStack_3d5 == local_448[0xb]);
    auVar328[0xc] = -(cStack_3d4 == local_448[0xc]);
    auVar328[0xd] = -(cStack_3d3 == local_448[0xd]);
    auVar328[0xe] = -(cStack_3d2 == local_448[0xe]);
    auVar328[0xf] = -(cStack_3d1 == local_448[0xf]);
    auVar331[0] = -((char)local_148 == local_448[5]);
    auVar331[1] = -(local_148._1_1_ == local_448[6]);
    auVar331[2] = -(local_148._2_1_ == local_448[7]);
    auVar331[3] = -(local_148._3_1_ == local_448[8]);
    auVar331[4] = -(local_148._4_1_ == local_448[9]);
    auVar331[5] = -(local_148._5_1_ == local_448[10]);
    auVar331[6] = -(local_148._6_1_ == local_448[0xb]);
    auVar331[7] = -(local_148._7_1_ == local_448[0xc]);
    auVar331[8] = -((char)local_3c8 == local_448[0xd]);
    auVar331[9] = -(local_3c8._1_1_ == local_448[0xe]);
    auVar331[10] = -(local_3c8._2_1_ == local_448[0xf]);
    auVar331[0xb] = -(local_3c8._3_1_ == local_438[0]);
    auVar331[0xc] = -(local_3c8._4_1_ == local_438[1]);
    auVar331[0xd] = -(local_3c8._5_1_ == local_438[2]);
    auVar331[0xe] = -(local_3c8._6_1_ == local_438[3]);
    auVar331[0xf] = -(local_3c8._7_1_ == local_438[4]);
    auVar328 = auVar328 & auVar331;
    if ((ushort)((ushort)(SUB161(auVar328 >> 7,0) & 1) |
                 (ushort)(SUB161(auVar328 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar328 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar328 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar328 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar328 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar328 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar328 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar328 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar328 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar328 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar328 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar328 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar328 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar328 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar328[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011d4a6;
  }
  else {
LAB_0011d4a6:
    main_cold_722();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"%+ -0*.*x",0x14,10,0xedcb5433);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_723();
  }
  if (iVar3 == 0x14) {
    auVar180[0] = -(local_448[5] == 'b');
    auVar180[1] = -(local_448[6] == '5');
    auVar180[2] = -(local_448[7] == '4');
    auVar180[3] = -(local_448[8] == '3');
    auVar180[4] = -(local_448[9] == '3');
    auVar180[5] = -(local_448[10] == ' ');
    auVar180[6] = -(local_448[0xb] == ' ');
    auVar180[7] = -(local_448[0xc] == ' ');
    auVar180[8] = -(local_448[0xd] == ' ');
    auVar180[9] = -(local_448[0xe] == ' ');
    auVar180[10] = -(local_448[0xf] == ' ');
    auVar180[0xb] = -(local_438[0] == ' ');
    auVar180[0xc] = -(local_438[1] == ' ');
    auVar180[0xd] = -(local_438[2] == ' ');
    auVar180[0xe] = -(local_438[3] == ' ');
    auVar180[0xf] = -(local_438[4] == '\0');
    auVar150[0] = -(local_448[0] == '0');
    auVar150[1] = -(local_448[1] == '0');
    auVar150[2] = -(local_448[2] == 'e');
    auVar150[3] = -(local_448[3] == 'd');
    auVar150[4] = -(local_448[4] == 'c');
    auVar150[5] = -(local_448[5] == 'b');
    auVar150[6] = -(local_448[6] == '5');
    auVar150[7] = -(local_448[7] == '4');
    auVar150[8] = -(local_448[8] == '3');
    auVar150[9] = -(local_448[9] == '3');
    auVar150[10] = -(local_448[10] == ' ');
    auVar150[0xb] = -(local_448[0xb] == ' ');
    auVar150[0xc] = -(local_448[0xc] == ' ');
    auVar150[0xd] = -(local_448[0xd] == ' ');
    auVar150[0xe] = -(local_448[0xe] == ' ');
    auVar150[0xf] = -(local_448[0xf] == ' ');
    auVar150 = auVar150 & auVar180;
    if ((ushort)((ushort)(SUB161(auVar150 >> 7,0) & 1) |
                 (ushort)(SUB161(auVar150 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar150 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar150 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar150 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar150 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar150 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar150 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar150 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar150 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar150 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar150 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar150 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar150 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar150 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar150[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011d4b7;
  }
  else {
LAB_0011d4b7:
    main_cold_724();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"% -+0*.*X",0x14,5,0x1234abcd);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_725();
  }
  if (iVar3 == 0x14) {
    auVar181[0] = -((char)local_178 == local_448[0]);
    auVar181[1] = -(local_178._1_1_ == local_448[1]);
    auVar181[2] = -(local_178._2_1_ == local_448[2]);
    auVar181[3] = -(local_178._3_1_ == local_448[3]);
    auVar181[4] = -(local_178._4_1_ == local_448[4]);
    auVar181[5] = -(local_178._5_1_ == local_448[5]);
    auVar181[6] = -(local_178._6_1_ == local_448[6]);
    auVar181[7] = -(local_178._7_1_ == local_448[7]);
    auVar181[8] = -(local_3d8 == local_448[8]);
    auVar181[9] = -(cStack_3d7 == local_448[9]);
    auVar181[10] = -(cStack_3d6 == local_448[10]);
    auVar181[0xb] = -(cStack_3d5 == local_448[0xb]);
    auVar181[0xc] = -(cStack_3d4 == local_448[0xc]);
    auVar181[0xd] = -(cStack_3d3 == local_448[0xd]);
    auVar181[0xe] = -(cStack_3d2 == local_448[0xe]);
    auVar181[0xf] = -(cStack_3d1 == local_448[0xf]);
    auVar329[0] = -((char)local_198 == local_448[5]);
    auVar329[1] = -(local_198._1_1_ == local_448[6]);
    auVar329[2] = -(local_198._2_1_ == local_448[7]);
    auVar329[3] = -(local_198._3_1_ == local_448[8]);
    auVar329[4] = -(local_198._4_1_ == local_448[9]);
    auVar329[5] = -(local_198._5_1_ == local_448[10]);
    auVar329[6] = -(local_198._6_1_ == local_448[0xb]);
    auVar329[7] = -(local_198._7_1_ == local_448[0xc]);
    auVar329[8] = -((char)local_3c8 == local_448[0xd]);
    auVar329[9] = -((char)((ulong)local_3c8 >> 8) == local_448[0xe]);
    auVar329[10] = -((char)((ulong)local_3c8 >> 0x10) == local_448[0xf]);
    auVar329[0xb] = -((char)((ulong)local_3c8 >> 0x18) == local_438[0]);
    auVar329[0xc] = -((char)((ulong)local_3c8 >> 0x20) == local_438[1]);
    auVar329[0xd] = -((char)((ulong)local_3c8 >> 0x28) == local_438[2]);
    auVar329[0xe] = -((char)((ulong)local_3c8 >> 0x30) == local_438[3]);
    auVar329[0xf] = -((char)((ulong)local_3c8 >> 0x38) == local_438[4]);
    auVar181 = auVar181 & auVar329;
    if ((ushort)((ushort)(SUB161(auVar181 >> 7,0) & 1) |
                 (ushort)(SUB161(auVar181 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar181 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar181 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar181 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar181 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar181 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar181 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar181 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar181 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar181 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar181 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar181 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar181 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar181 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar181[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011d4c8;
  }
  else {
LAB_0011d4c8:
    main_cold_726();
  }
  local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_3e8 = 0;
  pFVar5 = __stream;
  rewind(__stream);
  iVar3 = testprintf((FILE *)pFVar5,"% -+0*.*X",0x14,10,0xedcb5433);
  rewind(__stream);
  sVar4 = fread(local_448,1,(long)iVar3,__stream);
  if (iVar3 != (int)sVar4) {
    main_cold_727();
  }
  if (iVar3 == 0x14) {
    auVar182[0] = -(local_448[5] == 'B');
    auVar182[1] = -(local_448[6] == '5');
    auVar182[2] = -(local_448[7] == '4');
    auVar182[3] = -(local_448[8] == '3');
    auVar182[4] = -(local_448[9] == '3');
    auVar182[5] = -(local_448[10] == ' ');
    auVar182[6] = -(local_448[0xb] == ' ');
    auVar182[7] = -(local_448[0xc] == ' ');
    auVar182[8] = -(local_448[0xd] == ' ');
    auVar182[9] = -(local_448[0xe] == ' ');
    auVar182[10] = -(local_448[0xf] == ' ');
    auVar182[0xb] = -(local_438[0] == ' ');
    auVar182[0xc] = -(local_438[1] == ' ');
    auVar182[0xd] = -(local_438[2] == ' ');
    auVar182[0xe] = -(local_438[3] == ' ');
    auVar182[0xf] = -(local_438[4] == '\0');
    auVar151[0] = -(local_448[0] == '0');
    auVar151[1] = -(local_448[1] == '0');
    auVar151[2] = -(local_448[2] == 'E');
    auVar151[3] = -(local_448[3] == 'D');
    auVar151[4] = -(local_448[4] == 'C');
    auVar151[5] = -(local_448[5] == 'B');
    auVar151[6] = -(local_448[6] == '5');
    auVar151[7] = -(local_448[7] == '4');
    auVar151[8] = -(local_448[8] == '3');
    auVar151[9] = -(local_448[9] == '3');
    auVar151[10] = -(local_448[10] == ' ');
    auVar151[0xb] = -(local_448[0xb] == ' ');
    auVar151[0xc] = -(local_448[0xc] == ' ');
    auVar151[0xd] = -(local_448[0xd] == ' ');
    auVar151[0xe] = -(local_448[0xe] == ' ');
    auVar151[0xf] = -(local_448[0xf] == ' ');
    auVar151 = auVar151 & auVar182;
    if ((ushort)((ushort)(SUB161(auVar151 >> 7,0) & 1) |
                 (ushort)(SUB161(auVar151 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar151 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar151 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar151 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar151 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar151 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar151 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar151 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar151 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar151 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar151 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar151 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar151 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar151 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar151[0xf] >> 7) << 0xf) == 0xffff) goto LAB_0011be9d;
  }
  main_cold_728();
LAB_0011be9d:
  iVar3 = fclose(__stream);
  if (iVar3 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdio/vprintf.c, line %d - %s\n"
           ,0x2d,"fclose( target ) == 0");
  }
  iVar3 = remove("test_support/testfile");
  if (iVar3 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdio/vprintf.c, line %d - %s\n"
           ,0x2e,"remove( testfile ) == 0");
  }
  return TEST_RESULTS;
}

Assistant:

int main( void )
{
    FILE * target;
    TESTCASE( ( target = freopen( testfile, "wb+", stdout ) ) != NULL );
#include "printf_testcases.h"
    TESTCASE( fclose( target ) == 0 );
    TESTCASE( remove( testfile ) == 0 );
    return TEST_RESULTS;
}